

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack1to8.h
# Opt level: O0

void ncnn::conv3x3s1_pack1to8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  __m256 _v;
  __m256 _v_00;
  __m256 _v_01;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  float *pfVar75;
  Mat *in_RCX;
  long in_RSI;
  long in_RDI;
  float fVar76;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  float fVar86;
  undefined1 auVar79 [32];
  __m256 _r23_5;
  __m256 _r22_5;
  __m256 _r21_5;
  __m256 _r13_5;
  __m256 _r12_5;
  __m256 _r11_5;
  __m256 _r03_5;
  __m256 _r02_5;
  __m256 _r01_5;
  __m256 _sum0_2;
  __m256 _r24_3;
  __m256 _r14_3;
  __m256 _r04_3;
  __m256 _sum1_1;
  __m256 _r23_4;
  __m256 _r22_4;
  __m256 _r21_4;
  __m256 _r13_4;
  __m256 _r12_4;
  __m256 _r11_4;
  __m256 _r03_4;
  __m256 _r02_4;
  __m256 _r01_4;
  __m256 _sum0_1;
  __m256 _r26_1;
  __m256 _r16_1;
  __m256 _r06_1;
  __m256 _sum3;
  __m256 _r25_1;
  __m256 _r15_1;
  __m256 _r05_1;
  __m256 _sum2;
  __m256 _r24_2;
  __m256 _r14_2;
  __m256 _r04_2;
  __m256 _sum1;
  __m256 _r23_3;
  __m256 _r22_3;
  __m256 _r21_3;
  __m256 _r13_3;
  __m256 _r12_3;
  __m256 _r11_3;
  __m256 _r03_3;
  __m256 _r02_3;
  __m256 _r01_3;
  __m256 _sum0;
  int j_1;
  int i_1;
  __m256 _k22;
  __m256 _k21;
  __m256 _k20;
  __m256 _k12;
  __m256 _k11;
  __m256 _k10;
  __m256 _k02;
  __m256 _k01;
  __m256 _k00;
  float *r2_1;
  float *r1_1;
  float *r0_1;
  Mat img0_1;
  float *outptr0_1;
  int q_1;
  float *k0_1;
  __m256 _bias0_1;
  Mat out0_1;
  int p_1;
  __m256 _r23_2;
  __m256 _r22_2;
  __m256 _r21_2;
  __m256 _r13_2;
  __m256 _r12_2;
  __m256 _r11_2;
  __m256 _r03_2;
  __m256 _r02_2;
  __m256 _r01_2;
  __m256 _sum10_2;
  __m256 _sum00_2;
  __m256 _r24_1;
  __m256 _r14_1;
  __m256 _r04_1;
  __m256 _sum11_1;
  __m256 _sum01_1;
  __m256 _r23_1;
  __m256 _r22_1;
  __m256 _r21_1;
  __m256 _r13_1;
  __m256 _r12_1;
  __m256 _r11_1;
  __m256 _r03_1;
  __m256 _r02_1;
  __m256 _r01_1;
  __m256 _sum10_1;
  __m256 _sum00_1;
  __m256 _sum13;
  __m256 _sum03;
  __m256 _r26;
  __m256 _r16;
  __m256 _r06;
  __m256 _r25;
  __m256 _r15;
  __m256 _r05;
  __m256 _sum12;
  __m256 _sum02;
  __m256 _r24;
  __m256 _r14;
  __m256 _r04;
  __m256 _sum11;
  __m256 _sum01;
  __m256 _r23;
  __m256 _r22;
  __m256 _r21;
  __m256 _r13;
  __m256 _r12;
  __m256 _r11;
  __m256 _r03;
  __m256 _r02;
  __m256 _r01;
  __m256 _sum10;
  __m256 _sum00;
  int j;
  int i;
  __m256 _k22_1;
  __m256 _k21_1;
  __m256 _k20_1;
  __m256 _k12_1;
  __m256 _k11_1;
  __m256 _k10_1;
  __m256 _k02_1;
  __m256 _k01_1;
  __m256 _k00_1;
  __m256 _k22_0;
  __m256 _k21_0;
  __m256 _k20_0;
  __m256 _k12_0;
  __m256 _k11_0;
  __m256 _k10_0;
  __m256 _k02_0;
  __m256 _k01_0;
  __m256 _k00_0;
  float *r2;
  float *r1;
  float *r0;
  Mat img0;
  float *outptr1;
  float *outptr0;
  int q;
  float *k1;
  float *k0;
  __m256 _bias1;
  __m256 _bias0;
  Mat out1;
  Mat out0;
  int p;
  int pp;
  int remain_outch_start;
  int nn_outch;
  float *bias;
  int outch;
  int outh;
  int outw;
  int inch;
  float in_stack_ffffffffffff12d8;
  float in_stack_ffffffffffff12dc;
  float in_stack_ffffffffffff12e0;
  float in_stack_ffffffffffff12e4;
  float in_stack_ffffffffffff12e8;
  float in_stack_ffffffffffff12ec;
  float in_stack_ffffffffffff12f0;
  float in_stack_ffffffffffff12f4;
  float in_stack_ffffffffffff1310;
  float in_stack_ffffffffffff1314;
  undefined8 local_e520;
  undefined8 uStack_e518;
  undefined8 uStack_e510;
  undefined8 uStack_e508;
  undefined8 local_d4e0;
  undefined8 uStack_d4d8;
  undefined8 uStack_d4d0;
  undefined8 uStack_d4c8;
  undefined8 local_d480;
  undefined8 uStack_d478;
  undefined8 uStack_d470;
  undefined8 uStack_d468;
  int local_ce88;
  int local_ce84;
  float *local_cd60;
  float *local_cd58;
  float *local_cd50;
  Mat local_cd48;
  float *local_cd00;
  int local_ccf4;
  Mat local_ccf0;
  float *local_cca8;
  undefined8 local_cca0;
  undefined8 uStack_cc98;
  undefined8 uStack_cc90;
  undefined8 uStack_cc88;
  Mat local_cc70;
  int local_cc24;
  undefined8 local_cc20;
  undefined8 uStack_cc18;
  undefined8 uStack_cc10;
  undefined8 uStack_cc08;
  undefined8 local_cc00;
  undefined8 uStack_cbf8;
  undefined8 uStack_cbf0;
  undefined8 uStack_cbe8;
  undefined8 local_cbe0;
  undefined8 uStack_cbd8;
  undefined8 uStack_cbd0;
  undefined8 uStack_cbc8;
  undefined8 local_cbc0;
  undefined8 uStack_cbb8;
  undefined8 uStack_cbb0;
  undefined8 uStack_cba8;
  undefined8 local_cba0;
  undefined8 uStack_cb98;
  undefined8 uStack_cb90;
  undefined8 uStack_cb88;
  undefined8 local_cb80;
  undefined8 uStack_cb78;
  undefined8 uStack_cb70;
  undefined8 uStack_cb68;
  undefined8 local_cb60;
  undefined8 uStack_cb58;
  undefined8 uStack_cb50;
  undefined8 uStack_cb48;
  undefined8 local_cb40;
  undefined8 uStack_cb38;
  undefined8 uStack_cb30;
  undefined8 uStack_cb28;
  undefined8 local_cb20;
  undefined8 uStack_cb18;
  undefined8 uStack_cb10;
  undefined8 uStack_cb08;
  undefined8 local_cb00;
  undefined8 uStack_caf8;
  undefined8 uStack_caf0;
  undefined8 uStack_cae8;
  undefined8 local_cae0;
  undefined8 uStack_cad8;
  undefined8 uStack_cad0;
  undefined8 uStack_cac8;
  undefined8 local_cac0;
  undefined8 uStack_cab8;
  undefined8 uStack_cab0;
  undefined8 uStack_caa8;
  undefined8 local_caa0;
  undefined8 uStack_ca98;
  undefined8 uStack_ca90;
  undefined8 uStack_ca88;
  undefined8 local_ca80;
  undefined8 uStack_ca78;
  undefined8 uStack_ca70;
  undefined8 uStack_ca68;
  undefined8 local_ca60;
  undefined8 uStack_ca58;
  undefined8 uStack_ca50;
  undefined8 uStack_ca48;
  undefined8 local_ca40;
  undefined8 uStack_ca38;
  undefined8 uStack_ca30;
  undefined8 uStack_ca28;
  undefined8 local_ca20;
  undefined8 uStack_ca18;
  undefined8 uStack_ca10;
  undefined8 uStack_ca08;
  undefined8 local_ca00;
  undefined8 uStack_c9f8;
  undefined8 uStack_c9f0;
  undefined8 uStack_c9e8;
  undefined8 local_c9e0;
  undefined8 uStack_c9d8;
  undefined8 uStack_c9d0;
  undefined8 uStack_c9c8;
  undefined8 local_c9c0;
  undefined8 uStack_c9b8;
  undefined8 uStack_c9b0;
  undefined8 uStack_c9a8;
  undefined8 local_c9a0;
  undefined8 uStack_c998;
  undefined8 uStack_c990;
  undefined8 uStack_c988;
  undefined8 local_c980;
  undefined8 uStack_c978;
  undefined8 uStack_c970;
  undefined8 uStack_c968;
  undefined8 local_c960;
  undefined8 uStack_c958;
  undefined8 uStack_c950;
  undefined8 uStack_c948;
  undefined8 local_c940;
  undefined8 uStack_c938;
  undefined8 uStack_c930;
  undefined8 uStack_c928;
  undefined8 local_c920;
  undefined8 uStack_c918;
  undefined8 uStack_c910;
  undefined8 uStack_c908;
  undefined8 local_c900;
  undefined8 uStack_c8f8;
  undefined8 uStack_c8f0;
  undefined8 uStack_c8e8;
  undefined8 local_c8e0;
  undefined8 uStack_c8d8;
  undefined8 uStack_c8d0;
  undefined8 uStack_c8c8;
  undefined8 local_c8c0;
  undefined8 uStack_c8b8;
  undefined8 uStack_c8b0;
  undefined8 uStack_c8a8;
  undefined8 local_c8a0;
  undefined8 uStack_c898;
  undefined8 uStack_c890;
  undefined8 uStack_c888;
  undefined8 local_c880;
  undefined8 uStack_c878;
  undefined8 uStack_c870;
  undefined8 uStack_c868;
  undefined8 local_c860;
  undefined8 uStack_c858;
  undefined8 uStack_c850;
  undefined8 uStack_c848;
  undefined8 local_c840;
  undefined8 uStack_c838;
  undefined8 uStack_c830;
  undefined8 uStack_c828;
  undefined8 local_c820;
  undefined8 uStack_c818;
  undefined8 uStack_c810;
  undefined8 uStack_c808;
  undefined8 local_c800;
  undefined8 uStack_c7f8;
  undefined8 uStack_c7f0;
  undefined8 uStack_c7e8;
  undefined8 local_c7e0;
  undefined8 uStack_c7d8;
  undefined8 uStack_c7d0;
  undefined8 uStack_c7c8;
  undefined8 local_c7c0;
  undefined8 uStack_c7b8;
  undefined8 uStack_c7b0;
  undefined8 uStack_c7a8;
  undefined8 local_c7a0;
  undefined8 uStack_c798;
  undefined8 uStack_c790;
  undefined8 uStack_c788;
  undefined8 local_c780;
  undefined8 uStack_c778;
  undefined8 uStack_c770;
  undefined8 uStack_c768;
  undefined8 local_c760;
  undefined8 uStack_c758;
  undefined8 uStack_c750;
  undefined8 uStack_c748;
  undefined8 local_c740;
  undefined8 uStack_c738;
  undefined8 uStack_c730;
  undefined8 uStack_c728;
  undefined8 local_c720;
  undefined8 uStack_c718;
  undefined8 uStack_c710;
  undefined8 uStack_c708;
  undefined8 local_c700;
  undefined8 uStack_c6f8;
  undefined8 uStack_c6f0;
  undefined8 uStack_c6e8;
  undefined8 local_c6e0;
  undefined8 uStack_c6d8;
  undefined8 uStack_c6d0;
  undefined8 uStack_c6c8;
  undefined8 local_c6c0;
  undefined8 uStack_c6b8;
  undefined8 uStack_c6b0;
  undefined8 uStack_c6a8;
  undefined8 local_c6a0;
  undefined8 uStack_c698;
  undefined8 uStack_c690;
  undefined8 uStack_c688;
  undefined8 local_c680;
  undefined8 uStack_c678;
  undefined8 uStack_c670;
  undefined8 uStack_c668;
  undefined8 local_c660;
  undefined8 uStack_c658;
  undefined8 uStack_c650;
  undefined8 uStack_c648;
  undefined8 local_c640;
  undefined8 uStack_c638;
  undefined8 uStack_c630;
  undefined8 uStack_c628;
  undefined8 local_c620;
  undefined8 uStack_c618;
  undefined8 uStack_c610;
  undefined8 uStack_c608;
  undefined8 local_c600;
  undefined8 uStack_c5f8;
  undefined8 uStack_c5f0;
  undefined8 uStack_c5e8;
  undefined8 local_c5e0;
  undefined8 uStack_c5d8;
  undefined8 uStack_c5d0;
  undefined8 uStack_c5c8;
  undefined8 local_c5c0;
  undefined8 uStack_c5b8;
  undefined8 uStack_c5b0;
  undefined8 uStack_c5a8;
  undefined8 local_c5a0;
  undefined8 uStack_c598;
  undefined8 uStack_c590;
  undefined8 uStack_c588;
  int local_c568;
  int local_c564;
  undefined8 local_c560;
  undefined8 uStack_c558;
  undefined8 uStack_c550;
  undefined8 uStack_c548;
  undefined8 local_c540;
  undefined8 uStack_c538;
  undefined8 uStack_c530;
  undefined8 uStack_c528;
  undefined8 local_c520;
  undefined8 uStack_c518;
  undefined8 uStack_c510;
  undefined8 uStack_c508;
  undefined8 local_c500;
  undefined8 uStack_c4f8;
  undefined8 uStack_c4f0;
  undefined8 uStack_c4e8;
  undefined8 local_c4e0;
  undefined8 uStack_c4d8;
  undefined8 uStack_c4d0;
  undefined8 uStack_c4c8;
  undefined8 local_c4c0;
  undefined8 uStack_c4b8;
  undefined8 uStack_c4b0;
  undefined8 uStack_c4a8;
  undefined8 local_c4a0;
  undefined8 uStack_c498;
  undefined8 uStack_c490;
  undefined8 uStack_c488;
  undefined8 local_c480;
  undefined8 uStack_c478;
  undefined8 uStack_c470;
  undefined8 uStack_c468;
  undefined8 local_c460;
  undefined8 uStack_c458;
  undefined8 uStack_c450;
  undefined8 uStack_c448;
  undefined8 local_c440;
  undefined8 uStack_c438;
  undefined8 uStack_c430;
  undefined8 uStack_c428;
  undefined8 local_c420;
  undefined8 uStack_c418;
  undefined8 uStack_c410;
  undefined8 uStack_c408;
  undefined8 local_c400;
  undefined8 uStack_c3f8;
  undefined8 uStack_c3f0;
  undefined8 uStack_c3e8;
  undefined8 local_c3e0;
  undefined8 uStack_c3d8;
  undefined8 uStack_c3d0;
  undefined8 uStack_c3c8;
  undefined8 local_c3c0;
  undefined8 uStack_c3b8;
  undefined8 uStack_c3b0;
  undefined8 uStack_c3a8;
  undefined8 local_c3a0;
  undefined8 uStack_c398;
  undefined8 uStack_c390;
  undefined8 uStack_c388;
  undefined8 local_c380;
  undefined8 uStack_c378;
  undefined8 uStack_c370;
  undefined8 uStack_c368;
  undefined8 local_c360;
  undefined8 uStack_c358;
  undefined8 uStack_c350;
  undefined8 uStack_c348;
  undefined8 local_c340;
  undefined8 uStack_c338;
  undefined8 uStack_c330;
  undefined8 uStack_c328;
  float *local_c318;
  float *local_c310;
  float *local_c308;
  Mat local_c300;
  float *local_c2b8;
  float *local_c2b0;
  int local_c2a4;
  Mat local_c2a0;
  float *local_c258;
  Mat local_c250;
  float *local_c208;
  undefined8 local_c200;
  undefined8 uStack_c1f8;
  undefined8 uStack_c1f0;
  undefined8 uStack_c1e8;
  undefined8 local_c1e0;
  undefined8 uStack_c1d8;
  undefined8 uStack_c1d0;
  undefined8 uStack_c1c8;
  Mat local_c1a8;
  Mat local_c160;
  int local_c118;
  int local_c114;
  int local_c110;
  int local_c10c;
  float *local_c108;
  int local_c100;
  int local_c0fc;
  int local_c0f8;
  int local_c0f4;
  undefined4 local_c0c4;
  undefined4 local_c0c0;
  undefined4 local_c0bc;
  float *local_c0b8;
  float *local_c0b0;
  float *local_c0a8;
  float *local_c0a0;
  float *local_c098;
  float *local_c090;
  float *local_c088;
  float *local_c080;
  float *local_c078;
  float *local_c070;
  float *local_c068;
  float *local_c060;
  float *local_c058;
  float *local_c050;
  float *local_c048;
  float *local_c040;
  float *local_c038;
  float *local_c030;
  float *local_c028;
  float *local_c020;
  float *local_c018;
  float *local_c010;
  float *local_c008;
  float *local_c000;
  float *local_bff8;
  float *local_bff0;
  float *local_bfe8;
  float *local_bfe0;
  float *local_bfd8;
  float *local_bfd0;
  float *local_bfc8;
  float *local_bfc0;
  float *local_bfb8;
  float *local_bfb0;
  float *local_bfa8;
  float *local_bfa0;
  float *local_bf98;
  float *local_bf90;
  float *local_bf88;
  float *local_bf80;
  float *local_bf78;
  float *local_bf70;
  float *local_bf68;
  float *local_bf60;
  float *local_bf58;
  float *local_bf50;
  float *local_bf48;
  float *local_bf40;
  float *local_bf38;
  float *local_bf30;
  float *local_bf28;
  float local_bf20;
  float fStack_bf1c;
  float fStack_bf18;
  float fStack_bf14;
  float fStack_bf10;
  float fStack_bf0c;
  float fStack_bf08;
  float fStack_bf04;
  float local_beec;
  float *local_bee8;
  float local_bee0;
  float fStack_bedc;
  float fStack_bed8;
  float fStack_bed4;
  float fStack_bed0;
  float fStack_becc;
  float fStack_bec8;
  float fStack_bec4;
  float local_beac;
  float *local_bea8;
  float local_bea0;
  float fStack_be9c;
  float fStack_be98;
  float fStack_be94;
  float fStack_be90;
  float fStack_be8c;
  float fStack_be88;
  float fStack_be84;
  float local_be6c;
  float *local_be68;
  float local_be60;
  float fStack_be5c;
  float fStack_be58;
  float fStack_be54;
  float fStack_be50;
  float fStack_be4c;
  float fStack_be48;
  float fStack_be44;
  float local_be2c;
  float *local_be28;
  float local_be20;
  float fStack_be1c;
  float fStack_be18;
  float fStack_be14;
  float fStack_be10;
  float fStack_be0c;
  float fStack_be08;
  float fStack_be04;
  float local_bdec;
  float *local_bde8;
  float local_bde0;
  float fStack_bddc;
  float fStack_bdd8;
  float fStack_bdd4;
  float fStack_bdd0;
  float fStack_bdcc;
  float fStack_bdc8;
  float fStack_bdc4;
  float local_bdac;
  float *local_bda8;
  float local_bda0;
  float fStack_bd9c;
  float fStack_bd98;
  float fStack_bd94;
  float fStack_bd90;
  float fStack_bd8c;
  float fStack_bd88;
  float fStack_bd84;
  float local_bd6c;
  float *local_bd68;
  float local_bd60;
  float fStack_bd5c;
  float fStack_bd58;
  float fStack_bd54;
  float fStack_bd50;
  float fStack_bd4c;
  float fStack_bd48;
  float fStack_bd44;
  float local_bd2c;
  float *local_bd28;
  float local_bd20;
  float fStack_bd1c;
  float fStack_bd18;
  float fStack_bd14;
  float fStack_bd10;
  float fStack_bd0c;
  float fStack_bd08;
  float fStack_bd04;
  float local_bcec;
  float *local_bce8;
  float local_bce0;
  float fStack_bcdc;
  float fStack_bcd8;
  float fStack_bcd4;
  float fStack_bcd0;
  float fStack_bccc;
  float fStack_bcc8;
  float fStack_bcc4;
  float local_bcac;
  float *local_bca8;
  float local_bca0;
  float fStack_bc9c;
  float fStack_bc98;
  float fStack_bc94;
  float fStack_bc90;
  float fStack_bc8c;
  float fStack_bc88;
  float fStack_bc84;
  float local_bc6c;
  float *local_bc68;
  float local_bc60;
  float fStack_bc5c;
  float fStack_bc58;
  float fStack_bc54;
  float fStack_bc50;
  float fStack_bc4c;
  float fStack_bc48;
  float fStack_bc44;
  float local_bc2c;
  float *local_bc28;
  float local_bc20;
  float fStack_bc1c;
  float fStack_bc18;
  float fStack_bc14;
  float fStack_bc10;
  float fStack_bc0c;
  float fStack_bc08;
  float fStack_bc04;
  float local_bbec;
  float *local_bbe8;
  float local_bbe0;
  float fStack_bbdc;
  float fStack_bbd8;
  float fStack_bbd4;
  float fStack_bbd0;
  float fStack_bbcc;
  float fStack_bbc8;
  float fStack_bbc4;
  float local_bbac;
  float *local_bba8;
  float local_bba0;
  float fStack_bb9c;
  float fStack_bb98;
  float fStack_bb94;
  float fStack_bb90;
  float fStack_bb8c;
  float fStack_bb88;
  float fStack_bb84;
  float local_bb6c;
  float *local_bb68;
  float local_bb60;
  float fStack_bb5c;
  float fStack_bb58;
  float fStack_bb54;
  float fStack_bb50;
  float fStack_bb4c;
  float fStack_bb48;
  float fStack_bb44;
  float local_bb2c;
  float *local_bb28;
  float local_bb20;
  float fStack_bb1c;
  float fStack_bb18;
  float fStack_bb14;
  float fStack_bb10;
  float fStack_bb0c;
  float fStack_bb08;
  float fStack_bb04;
  float local_baec;
  float *local_bae8;
  float local_bae0;
  float fStack_badc;
  float fStack_bad8;
  float fStack_bad4;
  float fStack_bad0;
  float fStack_bacc;
  float fStack_bac8;
  float fStack_bac4;
  float local_baac;
  float *local_baa8;
  float local_baa0;
  float fStack_ba9c;
  float fStack_ba98;
  float fStack_ba94;
  float fStack_ba90;
  float fStack_ba8c;
  float fStack_ba88;
  float fStack_ba84;
  float local_ba6c;
  float *local_ba68;
  float local_ba60;
  float fStack_ba5c;
  float fStack_ba58;
  float fStack_ba54;
  float fStack_ba50;
  float fStack_ba4c;
  float fStack_ba48;
  float fStack_ba44;
  float local_ba2c;
  float *local_ba28;
  float local_ba20;
  float fStack_ba1c;
  float fStack_ba18;
  float fStack_ba14;
  float fStack_ba10;
  float fStack_ba0c;
  float fStack_ba08;
  float fStack_ba04;
  float local_b9ec;
  float *local_b9e8;
  float local_b9e0;
  float fStack_b9dc;
  float fStack_b9d8;
  float fStack_b9d4;
  float fStack_b9d0;
  float fStack_b9cc;
  float fStack_b9c8;
  float fStack_b9c4;
  float local_b9ac;
  float *local_b9a8;
  float local_b9a0;
  float fStack_b99c;
  float fStack_b998;
  float fStack_b994;
  float fStack_b990;
  float fStack_b98c;
  float fStack_b988;
  float fStack_b984;
  float local_b96c;
  float *local_b968;
  float local_b960;
  float fStack_b95c;
  float fStack_b958;
  float fStack_b954;
  float fStack_b950;
  float fStack_b94c;
  float fStack_b948;
  float fStack_b944;
  float local_b92c;
  float *local_b928;
  float local_b920;
  float fStack_b91c;
  float fStack_b918;
  float fStack_b914;
  float fStack_b910;
  float fStack_b90c;
  float fStack_b908;
  float fStack_b904;
  float local_b8ec;
  float *local_b8e8;
  float local_b8e0;
  float fStack_b8dc;
  float fStack_b8d8;
  float fStack_b8d4;
  float fStack_b8d0;
  float fStack_b8cc;
  float fStack_b8c8;
  float fStack_b8c4;
  float local_b8ac;
  float *local_b8a8;
  float local_b8a0;
  float fStack_b89c;
  float fStack_b898;
  float fStack_b894;
  float fStack_b890;
  float fStack_b88c;
  float fStack_b888;
  float fStack_b884;
  float local_b86c;
  float *local_b868;
  float local_b860;
  float fStack_b85c;
  float fStack_b858;
  float fStack_b854;
  float fStack_b850;
  float fStack_b84c;
  float fStack_b848;
  float fStack_b844;
  float local_b82c;
  float *local_b828;
  float local_b820;
  float fStack_b81c;
  float fStack_b818;
  float fStack_b814;
  float fStack_b810;
  float fStack_b80c;
  float fStack_b808;
  float fStack_b804;
  float local_b7ec;
  float *local_b7e8;
  float local_b7e0;
  float fStack_b7dc;
  float fStack_b7d8;
  float fStack_b7d4;
  float fStack_b7d0;
  float fStack_b7cc;
  float fStack_b7c8;
  float fStack_b7c4;
  float local_b7ac;
  float *local_b7a8;
  float local_b7a0;
  float fStack_b79c;
  float fStack_b798;
  float fStack_b794;
  float fStack_b790;
  float fStack_b78c;
  float fStack_b788;
  float fStack_b784;
  float local_b76c;
  float *local_b768;
  float local_b760;
  float fStack_b75c;
  float fStack_b758;
  float fStack_b754;
  float fStack_b750;
  float fStack_b74c;
  float fStack_b748;
  float fStack_b744;
  float local_b72c;
  float *local_b728;
  float local_b720;
  float fStack_b71c;
  float fStack_b718;
  float fStack_b714;
  float fStack_b710;
  float fStack_b70c;
  float fStack_b708;
  float fStack_b704;
  float local_b6ec;
  float *local_b6e8;
  float local_b6e0;
  float fStack_b6dc;
  float fStack_b6d8;
  float fStack_b6d4;
  float fStack_b6d0;
  float fStack_b6cc;
  float fStack_b6c8;
  float fStack_b6c4;
  float local_b6ac;
  float *local_b6a8;
  float local_b6a0;
  float fStack_b69c;
  float fStack_b698;
  float fStack_b694;
  float fStack_b690;
  float fStack_b68c;
  float fStack_b688;
  float fStack_b684;
  float local_b66c;
  float *local_b668;
  float local_b660;
  float fStack_b65c;
  float fStack_b658;
  float fStack_b654;
  float fStack_b650;
  float fStack_b64c;
  float fStack_b648;
  float fStack_b644;
  float local_b62c;
  float *local_b628;
  float local_b620;
  float fStack_b61c;
  float fStack_b618;
  float fStack_b614;
  float fStack_b610;
  float fStack_b60c;
  float fStack_b608;
  float fStack_b604;
  float local_b5ec;
  float *local_b5e8;
  float local_b5e0;
  float fStack_b5dc;
  float fStack_b5d8;
  float fStack_b5d4;
  float fStack_b5d0;
  float fStack_b5cc;
  float fStack_b5c8;
  float fStack_b5c4;
  float local_b5ac;
  float *local_b5a8;
  float local_b5a0;
  float fStack_b59c;
  float fStack_b598;
  float fStack_b594;
  float fStack_b590;
  float fStack_b58c;
  float fStack_b588;
  float fStack_b584;
  float local_b56c;
  float *local_b568;
  float local_b560;
  float fStack_b55c;
  float fStack_b558;
  float fStack_b554;
  float fStack_b550;
  float fStack_b54c;
  float fStack_b548;
  float fStack_b544;
  float local_b52c;
  float *local_b528;
  float local_b520;
  float fStack_b51c;
  float fStack_b518;
  float fStack_b514;
  float fStack_b510;
  float fStack_b50c;
  float fStack_b508;
  float fStack_b504;
  float local_b4ec;
  float *local_b4e8;
  float local_b4e0;
  float fStack_b4dc;
  float fStack_b4d8;
  float fStack_b4d4;
  float fStack_b4d0;
  float fStack_b4cc;
  float fStack_b4c8;
  float fStack_b4c4;
  float local_b4ac;
  float *local_b4a8;
  float local_b4a0;
  float fStack_b49c;
  float fStack_b498;
  float fStack_b494;
  float fStack_b490;
  float fStack_b48c;
  float fStack_b488;
  float fStack_b484;
  float local_b46c;
  float *local_b468;
  float local_b460;
  float fStack_b45c;
  float fStack_b458;
  float fStack_b454;
  float fStack_b450;
  float fStack_b44c;
  float fStack_b448;
  float fStack_b444;
  float local_b42c;
  float *local_b428;
  float local_b420;
  float fStack_b41c;
  float fStack_b418;
  float fStack_b414;
  float fStack_b410;
  float fStack_b40c;
  float fStack_b408;
  float fStack_b404;
  float local_b3ec;
  float *local_b3e8;
  float local_b3e0;
  float fStack_b3dc;
  float fStack_b3d8;
  float fStack_b3d4;
  float fStack_b3d0;
  float fStack_b3cc;
  float fStack_b3c8;
  float fStack_b3c4;
  float local_b3ac;
  float *local_b3a8;
  float local_b3a0;
  float fStack_b39c;
  float fStack_b398;
  float fStack_b394;
  float fStack_b390;
  float fStack_b38c;
  float fStack_b388;
  float fStack_b384;
  float local_b36c;
  float *local_b368;
  float local_b360;
  float fStack_b35c;
  float fStack_b358;
  float fStack_b354;
  float fStack_b350;
  float fStack_b34c;
  float fStack_b348;
  float fStack_b344;
  float local_b32c;
  float *local_b328;
  float local_b320;
  float fStack_b31c;
  float fStack_b318;
  float fStack_b314;
  float fStack_b310;
  float fStack_b30c;
  float fStack_b308;
  float fStack_b304;
  float local_b2ec;
  float *local_b2e8;
  float local_b2e0;
  float fStack_b2dc;
  float fStack_b2d8;
  float fStack_b2d4;
  float fStack_b2d0;
  float fStack_b2cc;
  float fStack_b2c8;
  float fStack_b2c4;
  float local_b2ac;
  float *local_b2a8;
  float local_b2a0;
  float fStack_b29c;
  float fStack_b298;
  float fStack_b294;
  float fStack_b290;
  float fStack_b28c;
  float fStack_b288;
  float fStack_b284;
  float local_b26c;
  float *local_b268;
  float local_b260;
  float fStack_b25c;
  float fStack_b258;
  float fStack_b254;
  float fStack_b250;
  float fStack_b24c;
  float fStack_b248;
  float fStack_b244;
  float local_b22c;
  float *local_b228;
  float local_b220;
  float fStack_b21c;
  float fStack_b218;
  float fStack_b214;
  float fStack_b210;
  float fStack_b20c;
  float fStack_b208;
  float fStack_b204;
  float local_b1ec;
  float *local_b1e8;
  float local_b1e0;
  float fStack_b1dc;
  float fStack_b1d8;
  float fStack_b1d4;
  float fStack_b1d0;
  float fStack_b1cc;
  float fStack_b1c8;
  float fStack_b1c4;
  float local_b1ac;
  float *local_b1a8;
  float local_b1a0;
  float fStack_b19c;
  float fStack_b198;
  float fStack_b194;
  float fStack_b190;
  float fStack_b18c;
  float fStack_b188;
  float fStack_b184;
  float local_b16c;
  float *local_b168;
  float local_b160;
  float fStack_b15c;
  float fStack_b158;
  float fStack_b154;
  float fStack_b150;
  float fStack_b14c;
  float fStack_b148;
  float fStack_b144;
  float local_b12c;
  float *local_b128;
  float local_b120;
  float fStack_b11c;
  float fStack_b118;
  float fStack_b114;
  float fStack_b110;
  float fStack_b10c;
  float fStack_b108;
  float fStack_b104;
  float local_b0ec;
  float *local_b0e8;
  float local_b0e0;
  float fStack_b0dc;
  float fStack_b0d8;
  float fStack_b0d4;
  float fStack_b0d0;
  float fStack_b0cc;
  float fStack_b0c8;
  float fStack_b0c4;
  float local_b0ac;
  float *local_b0a8;
  float local_b0a0;
  float fStack_b09c;
  float fStack_b098;
  float fStack_b094;
  float fStack_b090;
  float fStack_b08c;
  float fStack_b088;
  float fStack_b084;
  float local_b06c;
  float *local_b068;
  float local_b060;
  float fStack_b05c;
  float fStack_b058;
  float fStack_b054;
  float fStack_b050;
  float fStack_b04c;
  float fStack_b048;
  float fStack_b044;
  float local_b02c;
  float *local_b028;
  float local_b020;
  float fStack_b01c;
  float fStack_b018;
  float fStack_b014;
  float fStack_b010;
  float fStack_b00c;
  float fStack_b008;
  float fStack_b004;
  float local_afec;
  float *local_afe8;
  float local_afe0;
  float fStack_afdc;
  float fStack_afd8;
  float fStack_afd4;
  float fStack_afd0;
  float fStack_afcc;
  float fStack_afc8;
  float fStack_afc4;
  float local_afac;
  float *local_afa8;
  float local_afa0;
  float fStack_af9c;
  float fStack_af98;
  float fStack_af94;
  float fStack_af90;
  float fStack_af8c;
  float fStack_af88;
  float fStack_af84;
  float local_af6c;
  float *local_af68;
  float local_af60;
  float fStack_af5c;
  float fStack_af58;
  float fStack_af54;
  float fStack_af50;
  float fStack_af4c;
  float fStack_af48;
  float fStack_af44;
  float local_af2c;
  float *local_af28;
  float local_af20;
  float fStack_af1c;
  float fStack_af18;
  float fStack_af14;
  float fStack_af10;
  float fStack_af0c;
  float fStack_af08;
  float fStack_af04;
  float local_aeec;
  float *local_aee8;
  float local_aee0;
  float fStack_aedc;
  float fStack_aed8;
  float fStack_aed4;
  float fStack_aed0;
  float fStack_aecc;
  float fStack_aec8;
  float fStack_aec4;
  float local_aeac;
  float *local_aea8;
  float local_aea0;
  float fStack_ae9c;
  float fStack_ae98;
  float fStack_ae94;
  float fStack_ae90;
  float fStack_ae8c;
  float fStack_ae88;
  float fStack_ae84;
  float local_ae6c;
  float *local_ae68;
  float local_ae60;
  float fStack_ae5c;
  float fStack_ae58;
  float fStack_ae54;
  float fStack_ae50;
  float fStack_ae4c;
  float fStack_ae48;
  float fStack_ae44;
  float local_ae2c;
  float *local_ae28;
  float local_ae20;
  float fStack_ae1c;
  float fStack_ae18;
  float fStack_ae14;
  float fStack_ae10;
  float fStack_ae0c;
  float fStack_ae08;
  float fStack_ae04;
  float local_adec;
  float *local_ade8;
  float local_ade0;
  float fStack_addc;
  float fStack_add8;
  float fStack_add4;
  float fStack_add0;
  float fStack_adcc;
  float fStack_adc8;
  float fStack_adc4;
  float local_adac;
  float *local_ada8;
  float local_ada0;
  float fStack_ad9c;
  float fStack_ad98;
  float fStack_ad94;
  float fStack_ad90;
  float fStack_ad8c;
  float fStack_ad88;
  float fStack_ad84;
  float local_ad6c;
  float *local_ad68;
  float local_ad60;
  float fStack_ad5c;
  float fStack_ad58;
  float fStack_ad54;
  float fStack_ad50;
  float fStack_ad4c;
  float fStack_ad48;
  float fStack_ad44;
  float local_ad2c;
  float *local_ad28;
  float local_ad20;
  float fStack_ad1c;
  float fStack_ad18;
  float fStack_ad14;
  float fStack_ad10;
  float fStack_ad0c;
  float fStack_ad08;
  float fStack_ad04;
  float local_acec;
  float *local_ace8;
  float local_ace0;
  float fStack_acdc;
  float fStack_acd8;
  float fStack_acd4;
  float fStack_acd0;
  float fStack_accc;
  float fStack_acc8;
  float fStack_acc4;
  float local_acac;
  float *local_aca8;
  float local_aca0;
  float fStack_ac9c;
  float fStack_ac98;
  float fStack_ac94;
  float fStack_ac90;
  float fStack_ac8c;
  float fStack_ac88;
  float fStack_ac84;
  float local_ac6c;
  float *local_ac68;
  float local_ac60;
  float fStack_ac5c;
  float fStack_ac58;
  float fStack_ac54;
  float fStack_ac50;
  float fStack_ac4c;
  float fStack_ac48;
  float fStack_ac44;
  float local_ac2c;
  float *local_ac28;
  float local_ac20;
  float fStack_ac1c;
  float fStack_ac18;
  float fStack_ac14;
  float fStack_ac10;
  float fStack_ac0c;
  float fStack_ac08;
  float fStack_ac04;
  float local_abec;
  float *local_abe8;
  float local_abe0;
  float fStack_abdc;
  float fStack_abd8;
  float fStack_abd4;
  float fStack_abd0;
  float fStack_abcc;
  float fStack_abc8;
  float fStack_abc4;
  float local_abac;
  float *local_aba8;
  undefined8 local_aba0;
  undefined8 uStack_ab98;
  undefined8 uStack_ab90;
  undefined8 uStack_ab88;
  float *local_ab68;
  undefined8 local_ab60;
  undefined8 uStack_ab58;
  undefined8 uStack_ab50;
  undefined8 uStack_ab48;
  float *local_ab28;
  undefined8 local_ab20;
  undefined8 uStack_ab18;
  undefined8 uStack_ab10;
  undefined8 uStack_ab08;
  float *local_aae8;
  undefined8 local_aae0;
  undefined8 uStack_aad8;
  undefined8 uStack_aad0;
  undefined8 uStack_aac8;
  float *local_aaa8;
  undefined8 local_aaa0;
  undefined8 uStack_aa98;
  undefined8 uStack_aa90;
  undefined8 uStack_aa88;
  float *local_aa68;
  undefined8 local_aa60;
  undefined8 uStack_aa58;
  undefined8 uStack_aa50;
  undefined8 uStack_aa48;
  float *local_aa28;
  undefined8 local_aa20;
  undefined8 uStack_aa18;
  undefined8 uStack_aa10;
  undefined8 uStack_aa08;
  float *local_a9e8;
  undefined8 local_a9e0;
  undefined8 uStack_a9d8;
  undefined8 uStack_a9d0;
  undefined8 uStack_a9c8;
  float *local_a9a8;
  undefined8 local_a9a0;
  undefined8 uStack_a998;
  undefined8 uStack_a990;
  undefined8 uStack_a988;
  float *local_a968;
  undefined8 local_a960;
  undefined8 uStack_a958;
  undefined8 uStack_a950;
  undefined8 uStack_a948;
  float *local_a928;
  undefined8 local_a920;
  undefined8 uStack_a918;
  undefined8 uStack_a910;
  undefined8 uStack_a908;
  float *local_a8e8;
  undefined8 local_a8e0;
  undefined8 uStack_a8d8;
  undefined8 uStack_a8d0;
  undefined8 uStack_a8c8;
  float *local_a8a8;
  undefined8 local_a8a0;
  undefined8 uStack_a898;
  undefined8 uStack_a890;
  undefined8 uStack_a888;
  float *local_a868;
  undefined8 local_a860;
  undefined8 uStack_a858;
  undefined8 uStack_a850;
  undefined8 uStack_a848;
  float *local_a828;
  undefined8 local_a820;
  undefined8 uStack_a818;
  undefined8 uStack_a810;
  undefined8 uStack_a808;
  float *local_a7e8;
  undefined8 local_a7e0;
  undefined8 uStack_a7d8;
  undefined8 uStack_a7d0;
  undefined8 uStack_a7c8;
  float *local_a7a8;
  undefined8 local_a7a0;
  undefined8 uStack_a798;
  undefined8 uStack_a790;
  undefined8 uStack_a788;
  float *local_a768;
  undefined8 local_a760;
  undefined8 uStack_a758;
  undefined8 uStack_a750;
  undefined8 uStack_a748;
  float *local_a728;
  undefined8 local_a720;
  undefined8 uStack_a718;
  undefined8 uStack_a710;
  undefined8 uStack_a708;
  float *local_a6e8;
  undefined8 local_a6e0;
  undefined8 uStack_a6d8;
  undefined8 uStack_a6d0;
  undefined8 uStack_a6c8;
  float *local_a6a8;
  undefined8 local_a6a0;
  undefined8 uStack_a698;
  undefined8 uStack_a690;
  undefined8 uStack_a688;
  float *local_a668;
  undefined8 local_a660;
  undefined8 uStack_a658;
  undefined8 uStack_a650;
  undefined8 uStack_a648;
  undefined8 local_a640;
  undefined8 uStack_a638;
  undefined8 uStack_a630;
  undefined8 uStack_a628;
  undefined8 local_a620;
  undefined8 uStack_a618;
  undefined8 uStack_a610;
  undefined8 uStack_a608;
  undefined8 local_a600;
  undefined8 uStack_a5f8;
  undefined8 uStack_a5f0;
  undefined8 uStack_a5e8;
  undefined8 local_a5e0;
  undefined8 uStack_a5d8;
  undefined8 uStack_a5d0;
  undefined8 uStack_a5c8;
  undefined8 local_a5c0;
  undefined8 uStack_a5b8;
  undefined8 uStack_a5b0;
  undefined8 uStack_a5a8;
  undefined8 local_a5a0;
  undefined8 uStack_a598;
  undefined8 uStack_a590;
  undefined8 uStack_a588;
  undefined8 local_a580;
  undefined8 uStack_a578;
  undefined8 uStack_a570;
  undefined8 uStack_a568;
  undefined8 local_a560;
  undefined8 uStack_a558;
  undefined8 uStack_a550;
  undefined8 uStack_a548;
  undefined8 local_a540;
  undefined8 uStack_a538;
  undefined8 uStack_a530;
  undefined8 uStack_a528;
  undefined8 local_a520;
  undefined8 uStack_a518;
  undefined8 uStack_a510;
  undefined8 uStack_a508;
  undefined8 local_a500;
  undefined8 uStack_a4f8;
  undefined8 uStack_a4f0;
  undefined8 uStack_a4e8;
  undefined8 local_a4e0;
  undefined8 uStack_a4d8;
  undefined8 uStack_a4d0;
  undefined8 uStack_a4c8;
  undefined8 local_a4c0;
  undefined8 uStack_a4b8;
  undefined8 uStack_a4b0;
  undefined8 uStack_a4a8;
  undefined8 local_a4a0;
  undefined8 uStack_a498;
  undefined8 uStack_a490;
  undefined8 uStack_a488;
  undefined8 local_a480;
  undefined8 uStack_a478;
  undefined8 uStack_a470;
  undefined8 uStack_a468;
  undefined8 local_a460;
  undefined8 uStack_a458;
  undefined8 uStack_a450;
  undefined8 uStack_a448;
  undefined8 local_a440;
  undefined8 uStack_a438;
  undefined8 uStack_a430;
  undefined8 uStack_a428;
  undefined8 local_a420;
  undefined8 uStack_a418;
  undefined8 uStack_a410;
  undefined8 uStack_a408;
  undefined8 local_a400;
  undefined8 uStack_a3f8;
  undefined8 uStack_a3f0;
  undefined8 uStack_a3e8;
  undefined8 local_a3e0;
  undefined8 uStack_a3d8;
  undefined8 uStack_a3d0;
  undefined8 uStack_a3c8;
  undefined8 local_a3c0;
  undefined8 uStack_a3b8;
  undefined8 uStack_a3b0;
  undefined8 uStack_a3a8;
  undefined8 local_a3a0;
  undefined8 uStack_a398;
  undefined8 uStack_a390;
  undefined8 uStack_a388;
  undefined8 local_a380;
  undefined8 uStack_a378;
  undefined8 uStack_a370;
  undefined8 uStack_a368;
  undefined8 local_a360;
  undefined8 uStack_a358;
  undefined8 uStack_a350;
  undefined8 uStack_a348;
  undefined8 local_a340;
  undefined8 uStack_a338;
  undefined8 uStack_a330;
  undefined8 uStack_a328;
  undefined8 local_a320;
  undefined8 uStack_a318;
  undefined8 uStack_a310;
  undefined8 uStack_a308;
  undefined8 local_a300;
  undefined8 uStack_a2f8;
  undefined8 uStack_a2f0;
  undefined8 uStack_a2e8;
  undefined8 local_a2e0;
  undefined8 uStack_a2d8;
  undefined8 uStack_a2d0;
  undefined8 uStack_a2c8;
  undefined8 local_a2c0;
  undefined8 uStack_a2b8;
  undefined8 uStack_a2b0;
  undefined8 uStack_a2a8;
  undefined8 local_a2a0;
  undefined8 uStack_a298;
  undefined8 uStack_a290;
  undefined8 uStack_a288;
  undefined8 local_a280;
  undefined8 uStack_a278;
  undefined8 uStack_a270;
  undefined8 uStack_a268;
  undefined8 local_a260;
  undefined8 uStack_a258;
  undefined8 uStack_a250;
  undefined8 uStack_a248;
  undefined8 local_a240;
  undefined8 uStack_a238;
  undefined8 uStack_a230;
  undefined8 uStack_a228;
  undefined8 local_a220;
  undefined8 uStack_a218;
  undefined8 uStack_a210;
  undefined8 uStack_a208;
  undefined8 local_a200;
  undefined8 uStack_a1f8;
  undefined8 uStack_a1f0;
  undefined8 uStack_a1e8;
  undefined8 local_a1e0;
  undefined8 uStack_a1d8;
  undefined8 uStack_a1d0;
  undefined8 uStack_a1c8;
  undefined8 local_a1c0;
  undefined8 uStack_a1b8;
  undefined8 uStack_a1b0;
  undefined8 uStack_a1a8;
  undefined8 local_a1a0;
  undefined8 uStack_a198;
  undefined8 uStack_a190;
  undefined8 uStack_a188;
  undefined8 local_a180;
  undefined8 uStack_a178;
  undefined8 uStack_a170;
  undefined8 uStack_a168;
  undefined8 local_a160;
  undefined8 uStack_a158;
  undefined8 uStack_a150;
  undefined8 uStack_a148;
  undefined8 local_a140;
  undefined8 uStack_a138;
  undefined8 uStack_a130;
  undefined8 uStack_a128;
  undefined8 local_a120;
  undefined8 uStack_a118;
  undefined8 uStack_a110;
  undefined8 uStack_a108;
  undefined8 local_a100;
  undefined8 uStack_a0f8;
  undefined8 uStack_a0f0;
  undefined8 uStack_a0e8;
  undefined8 local_a0e0;
  undefined8 uStack_a0d8;
  undefined8 uStack_a0d0;
  undefined8 uStack_a0c8;
  undefined8 local_a0c0;
  undefined8 uStack_a0b8;
  undefined8 uStack_a0b0;
  undefined8 uStack_a0a8;
  undefined8 local_a0a0;
  undefined8 uStack_a098;
  undefined8 uStack_a090;
  undefined8 uStack_a088;
  undefined8 local_a080;
  undefined8 uStack_a078;
  undefined8 uStack_a070;
  undefined8 uStack_a068;
  undefined8 local_a060;
  undefined8 uStack_a058;
  undefined8 uStack_a050;
  undefined8 uStack_a048;
  undefined8 local_a040;
  undefined8 uStack_a038;
  undefined8 uStack_a030;
  undefined8 uStack_a028;
  undefined8 local_a020;
  undefined8 uStack_a018;
  undefined8 uStack_a010;
  undefined8 uStack_a008;
  undefined8 local_a000;
  undefined8 uStack_9ff8;
  undefined8 uStack_9ff0;
  undefined8 uStack_9fe8;
  undefined8 local_9fe0;
  undefined8 uStack_9fd8;
  undefined8 uStack_9fd0;
  undefined8 uStack_9fc8;
  undefined8 local_9fc0;
  undefined8 uStack_9fb8;
  undefined8 uStack_9fb0;
  undefined8 uStack_9fa8;
  undefined8 local_9fa0;
  undefined8 uStack_9f98;
  undefined8 uStack_9f90;
  undefined8 uStack_9f88;
  undefined8 local_9f80;
  undefined8 uStack_9f78;
  undefined8 uStack_9f70;
  undefined8 uStack_9f68;
  undefined8 local_9f60;
  undefined8 uStack_9f58;
  undefined8 uStack_9f50;
  undefined8 uStack_9f48;
  undefined8 local_9f40;
  undefined8 uStack_9f38;
  undefined8 uStack_9f30;
  undefined8 uStack_9f28;
  undefined8 local_9f20;
  undefined8 uStack_9f18;
  undefined8 uStack_9f10;
  undefined8 uStack_9f08;
  undefined8 local_9f00;
  undefined8 uStack_9ef8;
  undefined8 uStack_9ef0;
  undefined8 uStack_9ee8;
  undefined8 local_9ee0;
  undefined8 uStack_9ed8;
  undefined8 uStack_9ed0;
  undefined8 uStack_9ec8;
  undefined8 local_9ec0;
  undefined8 uStack_9eb8;
  undefined8 uStack_9eb0;
  undefined8 uStack_9ea8;
  undefined8 local_9ea0;
  undefined8 uStack_9e98;
  undefined8 uStack_9e90;
  undefined8 uStack_9e88;
  undefined8 local_9e80;
  undefined8 uStack_9e78;
  undefined8 uStack_9e70;
  undefined8 uStack_9e68;
  undefined8 local_9e60;
  undefined8 uStack_9e58;
  undefined8 uStack_9e50;
  undefined8 uStack_9e48;
  undefined8 local_9e40;
  undefined8 uStack_9e38;
  undefined8 uStack_9e30;
  undefined8 uStack_9e28;
  undefined8 local_9e20;
  undefined8 uStack_9e18;
  undefined8 uStack_9e10;
  undefined8 uStack_9e08;
  undefined8 local_9e00;
  undefined8 uStack_9df8;
  undefined8 uStack_9df0;
  undefined8 uStack_9de8;
  undefined8 local_9de0;
  undefined8 uStack_9dd8;
  undefined8 uStack_9dd0;
  undefined8 uStack_9dc8;
  undefined8 local_9dc0;
  undefined8 uStack_9db8;
  undefined8 uStack_9db0;
  undefined8 uStack_9da8;
  undefined8 local_9da0;
  undefined8 uStack_9d98;
  undefined8 uStack_9d90;
  undefined8 uStack_9d88;
  undefined8 local_9d80;
  undefined8 uStack_9d78;
  undefined8 uStack_9d70;
  undefined8 uStack_9d68;
  undefined8 local_9d60;
  undefined8 uStack_9d58;
  undefined8 uStack_9d50;
  undefined8 uStack_9d48;
  undefined8 local_9d40;
  undefined8 uStack_9d38;
  undefined8 uStack_9d30;
  undefined8 uStack_9d28;
  undefined8 local_9d20;
  undefined8 uStack_9d18;
  undefined8 uStack_9d10;
  undefined8 uStack_9d08;
  undefined8 local_9d00;
  undefined8 uStack_9cf8;
  undefined8 uStack_9cf0;
  undefined8 uStack_9ce8;
  undefined8 local_9ce0;
  undefined8 uStack_9cd8;
  undefined8 uStack_9cd0;
  undefined8 uStack_9cc8;
  undefined8 local_9cc0;
  undefined8 uStack_9cb8;
  undefined8 uStack_9cb0;
  undefined8 uStack_9ca8;
  undefined8 local_9ca0;
  undefined8 uStack_9c98;
  undefined8 uStack_9c90;
  undefined8 uStack_9c88;
  undefined8 local_9c80;
  undefined8 uStack_9c78;
  undefined8 uStack_9c70;
  undefined8 uStack_9c68;
  undefined8 local_9c60;
  undefined8 uStack_9c58;
  undefined8 uStack_9c50;
  undefined8 uStack_9c48;
  undefined8 local_9c40;
  undefined8 uStack_9c38;
  undefined8 uStack_9c30;
  undefined8 uStack_9c28;
  undefined8 local_9c20;
  undefined8 uStack_9c18;
  undefined8 uStack_9c10;
  undefined8 uStack_9c08;
  undefined8 local_9c00;
  undefined8 uStack_9bf8;
  undefined8 uStack_9bf0;
  undefined8 uStack_9be8;
  undefined8 local_9be0;
  undefined8 uStack_9bd8;
  undefined8 uStack_9bd0;
  undefined8 uStack_9bc8;
  undefined8 local_9bc0;
  undefined8 uStack_9bb8;
  undefined8 uStack_9bb0;
  undefined8 uStack_9ba8;
  undefined8 local_9ba0;
  undefined8 uStack_9b98;
  undefined8 uStack_9b90;
  undefined8 uStack_9b88;
  undefined8 local_9b80;
  undefined8 uStack_9b78;
  undefined8 uStack_9b70;
  undefined8 uStack_9b68;
  undefined8 local_9b60;
  undefined8 uStack_9b58;
  undefined8 uStack_9b50;
  undefined8 uStack_9b48;
  undefined8 local_9b40;
  undefined8 uStack_9b38;
  undefined8 uStack_9b30;
  undefined8 uStack_9b28;
  undefined8 local_9b20;
  undefined8 uStack_9b18;
  undefined8 uStack_9b10;
  undefined8 uStack_9b08;
  undefined8 local_9b00;
  undefined8 uStack_9af8;
  undefined8 uStack_9af0;
  undefined8 uStack_9ae8;
  undefined8 local_9ae0;
  undefined8 uStack_9ad8;
  undefined8 uStack_9ad0;
  undefined8 uStack_9ac8;
  undefined8 local_9ac0;
  undefined8 uStack_9ab8;
  undefined8 uStack_9ab0;
  undefined8 uStack_9aa8;
  undefined8 local_9aa0;
  undefined8 uStack_9a98;
  undefined8 uStack_9a90;
  undefined8 uStack_9a88;
  undefined8 local_9a80;
  undefined8 uStack_9a78;
  undefined8 uStack_9a70;
  undefined8 uStack_9a68;
  undefined8 local_9a60;
  undefined8 uStack_9a58;
  undefined8 uStack_9a50;
  undefined8 uStack_9a48;
  undefined8 local_9a40;
  undefined8 uStack_9a38;
  undefined8 uStack_9a30;
  undefined8 uStack_9a28;
  undefined8 local_9a20;
  undefined8 uStack_9a18;
  undefined8 uStack_9a10;
  undefined8 uStack_9a08;
  undefined8 local_9a00;
  undefined8 uStack_99f8;
  undefined8 uStack_99f0;
  undefined8 uStack_99e8;
  undefined8 local_99e0;
  undefined8 uStack_99d8;
  undefined8 uStack_99d0;
  undefined8 uStack_99c8;
  undefined8 local_99c0;
  undefined8 uStack_99b8;
  undefined8 uStack_99b0;
  undefined8 uStack_99a8;
  undefined8 local_99a0;
  undefined8 uStack_9998;
  undefined8 uStack_9990;
  undefined8 uStack_9988;
  undefined8 local_9980;
  undefined8 uStack_9978;
  undefined8 uStack_9970;
  undefined8 uStack_9968;
  undefined8 local_9960;
  undefined8 uStack_9958;
  undefined8 uStack_9950;
  undefined8 uStack_9948;
  undefined8 local_9940;
  undefined8 uStack_9938;
  undefined8 uStack_9930;
  undefined8 uStack_9928;
  undefined8 local_9920;
  undefined8 uStack_9918;
  undefined8 uStack_9910;
  undefined8 uStack_9908;
  undefined8 local_9900;
  undefined8 uStack_98f8;
  undefined8 uStack_98f0;
  undefined8 uStack_98e8;
  undefined8 local_98e0;
  undefined8 uStack_98d8;
  undefined8 uStack_98d0;
  undefined8 uStack_98c8;
  undefined8 local_98c0;
  undefined8 uStack_98b8;
  undefined8 uStack_98b0;
  undefined8 uStack_98a8;
  undefined8 local_98a0;
  undefined8 uStack_9898;
  undefined8 uStack_9890;
  undefined8 uStack_9888;
  undefined8 local_9880;
  undefined8 uStack_9878;
  undefined8 uStack_9870;
  undefined8 uStack_9868;
  undefined8 local_9860;
  undefined8 uStack_9858;
  undefined8 uStack_9850;
  undefined8 uStack_9848;
  undefined8 local_9840;
  undefined8 uStack_9838;
  undefined8 uStack_9830;
  undefined8 uStack_9828;
  undefined8 local_9820;
  undefined8 uStack_9818;
  undefined8 uStack_9810;
  undefined8 uStack_9808;
  undefined8 local_9800;
  undefined8 uStack_97f8;
  undefined8 uStack_97f0;
  undefined8 uStack_97e8;
  undefined8 local_97e0;
  undefined8 uStack_97d8;
  undefined8 uStack_97d0;
  undefined8 uStack_97c8;
  undefined8 local_97c0;
  undefined8 uStack_97b8;
  undefined8 uStack_97b0;
  undefined8 uStack_97a8;
  undefined8 local_97a0;
  undefined8 uStack_9798;
  undefined8 uStack_9790;
  undefined8 uStack_9788;
  undefined8 local_9780;
  undefined8 uStack_9778;
  undefined8 uStack_9770;
  undefined8 uStack_9768;
  undefined8 local_9760;
  undefined8 uStack_9758;
  undefined8 uStack_9750;
  undefined8 uStack_9748;
  undefined8 local_9740;
  undefined8 uStack_9738;
  undefined8 uStack_9730;
  undefined8 uStack_9728;
  undefined8 local_9720;
  undefined8 uStack_9718;
  undefined8 uStack_9710;
  undefined8 uStack_9708;
  undefined8 local_9700;
  undefined8 uStack_96f8;
  undefined8 uStack_96f0;
  undefined8 uStack_96e8;
  undefined8 local_96e0;
  undefined8 uStack_96d8;
  undefined8 uStack_96d0;
  undefined8 uStack_96c8;
  undefined8 local_96c0;
  undefined8 uStack_96b8;
  undefined8 uStack_96b0;
  undefined8 uStack_96a8;
  undefined8 local_96a0;
  undefined8 uStack_9698;
  undefined8 uStack_9690;
  undefined8 uStack_9688;
  undefined8 local_9680;
  undefined8 uStack_9678;
  undefined8 uStack_9670;
  undefined8 uStack_9668;
  undefined8 local_9660;
  undefined8 uStack_9658;
  undefined8 uStack_9650;
  undefined8 uStack_9648;
  undefined8 local_9640;
  undefined8 uStack_9638;
  undefined8 uStack_9630;
  undefined8 uStack_9628;
  undefined8 local_9620;
  undefined8 uStack_9618;
  undefined8 uStack_9610;
  undefined8 uStack_9608;
  undefined8 local_9600;
  undefined8 uStack_95f8;
  undefined8 uStack_95f0;
  undefined8 uStack_95e8;
  undefined8 local_95e0;
  undefined8 uStack_95d8;
  undefined8 uStack_95d0;
  undefined8 uStack_95c8;
  undefined8 local_95c0;
  undefined8 uStack_95b8;
  undefined8 uStack_95b0;
  undefined8 uStack_95a8;
  undefined8 local_95a0;
  undefined8 uStack_9598;
  undefined8 uStack_9590;
  undefined8 uStack_9588;
  undefined8 local_9580;
  undefined8 uStack_9578;
  undefined8 uStack_9570;
  undefined8 uStack_9568;
  undefined8 local_9560;
  undefined8 uStack_9558;
  undefined8 uStack_9550;
  undefined8 uStack_9548;
  undefined8 local_9540;
  undefined8 uStack_9538;
  undefined8 uStack_9530;
  undefined8 uStack_9528;
  undefined8 local_9520;
  undefined8 uStack_9518;
  undefined8 uStack_9510;
  undefined8 uStack_9508;
  undefined8 local_9500;
  undefined8 uStack_94f8;
  undefined8 uStack_94f0;
  undefined8 uStack_94e8;
  undefined8 local_94e0;
  undefined8 uStack_94d8;
  undefined8 uStack_94d0;
  undefined8 uStack_94c8;
  undefined8 local_94c0;
  undefined8 uStack_94b8;
  undefined8 uStack_94b0;
  undefined8 uStack_94a8;
  undefined8 local_94a0;
  undefined8 uStack_9498;
  undefined8 uStack_9490;
  undefined8 uStack_9488;
  undefined8 local_9480;
  undefined8 uStack_9478;
  undefined8 uStack_9470;
  undefined8 uStack_9468;
  undefined8 local_9460;
  undefined8 uStack_9458;
  undefined8 uStack_9450;
  undefined8 uStack_9448;
  undefined8 local_9440;
  undefined8 uStack_9438;
  undefined8 uStack_9430;
  undefined8 uStack_9428;
  undefined8 local_9420;
  undefined8 uStack_9418;
  undefined8 uStack_9410;
  undefined8 uStack_9408;
  undefined8 local_9400;
  undefined8 uStack_93f8;
  undefined8 uStack_93f0;
  undefined8 uStack_93e8;
  undefined8 local_93e0;
  undefined8 uStack_93d8;
  undefined8 uStack_93d0;
  undefined8 uStack_93c8;
  undefined8 local_93c0;
  undefined8 uStack_93b8;
  undefined8 uStack_93b0;
  undefined8 uStack_93a8;
  undefined8 local_93a0;
  undefined8 uStack_9398;
  undefined8 uStack_9390;
  undefined8 uStack_9388;
  undefined8 local_9380;
  undefined8 uStack_9378;
  undefined8 uStack_9370;
  undefined8 uStack_9368;
  undefined8 local_9360;
  undefined8 uStack_9358;
  undefined8 uStack_9350;
  undefined8 uStack_9348;
  undefined8 local_9340;
  undefined8 uStack_9338;
  undefined8 uStack_9330;
  undefined8 uStack_9328;
  undefined8 local_9320;
  undefined8 uStack_9318;
  undefined8 uStack_9310;
  undefined8 uStack_9308;
  undefined8 local_9300;
  undefined8 uStack_92f8;
  undefined8 uStack_92f0;
  undefined8 uStack_92e8;
  undefined8 local_92e0;
  undefined8 uStack_92d8;
  undefined8 uStack_92d0;
  undefined8 uStack_92c8;
  undefined8 local_92c0;
  undefined8 uStack_92b8;
  undefined8 uStack_92b0;
  undefined8 uStack_92a8;
  undefined8 local_92a0;
  undefined8 uStack_9298;
  undefined8 uStack_9290;
  undefined8 uStack_9288;
  undefined8 local_9280;
  undefined8 uStack_9278;
  undefined8 uStack_9270;
  undefined8 uStack_9268;
  undefined8 local_9260;
  undefined8 uStack_9258;
  undefined8 uStack_9250;
  undefined8 uStack_9248;
  undefined8 local_9240;
  undefined8 uStack_9238;
  undefined8 uStack_9230;
  undefined8 uStack_9228;
  undefined8 local_9220;
  undefined8 uStack_9218;
  undefined8 uStack_9210;
  undefined8 uStack_9208;
  undefined8 local_9200;
  undefined8 uStack_91f8;
  undefined8 uStack_91f0;
  undefined8 uStack_91e8;
  undefined8 local_91e0;
  undefined8 uStack_91d8;
  undefined8 uStack_91d0;
  undefined8 uStack_91c8;
  undefined8 local_91c0;
  undefined8 uStack_91b8;
  undefined8 uStack_91b0;
  undefined8 uStack_91a8;
  undefined8 local_91a0;
  undefined8 uStack_9198;
  undefined8 uStack_9190;
  undefined8 uStack_9188;
  undefined8 local_9180;
  undefined8 uStack_9178;
  undefined8 uStack_9170;
  undefined8 uStack_9168;
  undefined8 local_9160;
  undefined8 uStack_9158;
  undefined8 uStack_9150;
  undefined8 uStack_9148;
  undefined8 local_9140;
  undefined8 uStack_9138;
  undefined8 uStack_9130;
  undefined8 uStack_9128;
  undefined8 local_9120;
  undefined8 uStack_9118;
  undefined8 uStack_9110;
  undefined8 uStack_9108;
  undefined8 local_9100;
  undefined8 uStack_90f8;
  undefined8 uStack_90f0;
  undefined8 uStack_90e8;
  undefined8 local_90e0;
  undefined8 uStack_90d8;
  undefined8 uStack_90d0;
  undefined8 uStack_90c8;
  undefined8 local_90c0;
  undefined8 uStack_90b8;
  undefined8 uStack_90b0;
  undefined8 uStack_90a8;
  undefined8 local_90a0;
  undefined8 uStack_9098;
  undefined8 uStack_9090;
  undefined8 uStack_9088;
  undefined8 local_9080;
  undefined8 uStack_9078;
  undefined8 uStack_9070;
  undefined8 uStack_9068;
  undefined8 local_9060;
  undefined8 uStack_9058;
  undefined8 uStack_9050;
  undefined8 uStack_9048;
  undefined8 local_9040;
  undefined8 uStack_9038;
  undefined8 uStack_9030;
  undefined8 uStack_9028;
  undefined8 local_9020;
  undefined8 uStack_9018;
  undefined8 uStack_9010;
  undefined8 uStack_9008;
  undefined8 local_9000;
  undefined8 uStack_8ff8;
  undefined8 uStack_8ff0;
  undefined8 uStack_8fe8;
  undefined8 local_8fe0;
  undefined8 uStack_8fd8;
  undefined8 uStack_8fd0;
  undefined8 uStack_8fc8;
  undefined8 local_8fc0;
  undefined8 uStack_8fb8;
  undefined8 uStack_8fb0;
  undefined8 uStack_8fa8;
  undefined8 local_8fa0;
  undefined8 uStack_8f98;
  undefined8 uStack_8f90;
  undefined8 uStack_8f88;
  undefined8 local_8f80;
  undefined8 uStack_8f78;
  undefined8 uStack_8f70;
  undefined8 uStack_8f68;
  undefined8 local_8f60;
  undefined8 uStack_8f58;
  undefined8 uStack_8f50;
  undefined8 uStack_8f48;
  undefined8 local_8f40;
  undefined8 uStack_8f38;
  undefined8 uStack_8f30;
  undefined8 uStack_8f28;
  undefined8 local_8f20;
  undefined8 uStack_8f18;
  undefined8 uStack_8f10;
  undefined8 uStack_8f08;
  undefined8 local_8f00;
  undefined8 uStack_8ef8;
  undefined8 uStack_8ef0;
  undefined8 uStack_8ee8;
  undefined8 local_8ee0;
  undefined8 uStack_8ed8;
  undefined8 uStack_8ed0;
  undefined8 uStack_8ec8;
  undefined8 local_8ec0;
  undefined8 uStack_8eb8;
  undefined8 uStack_8eb0;
  undefined8 uStack_8ea8;
  undefined8 local_8ea0;
  undefined8 uStack_8e98;
  undefined8 uStack_8e90;
  undefined8 uStack_8e88;
  undefined8 local_8e80;
  undefined8 uStack_8e78;
  undefined8 uStack_8e70;
  undefined8 uStack_8e68;
  undefined8 local_8e60;
  undefined8 uStack_8e58;
  undefined8 uStack_8e50;
  undefined8 uStack_8e48;
  undefined8 local_8e40;
  undefined8 uStack_8e38;
  undefined8 uStack_8e30;
  undefined8 uStack_8e28;
  undefined8 local_8e20;
  undefined8 uStack_8e18;
  undefined8 uStack_8e10;
  undefined8 uStack_8e08;
  undefined8 local_8e00;
  undefined8 uStack_8df8;
  undefined8 uStack_8df0;
  undefined8 uStack_8de8;
  undefined8 local_8de0;
  undefined8 uStack_8dd8;
  undefined8 uStack_8dd0;
  undefined8 uStack_8dc8;
  undefined8 local_8dc0;
  undefined8 uStack_8db8;
  undefined8 uStack_8db0;
  undefined8 uStack_8da8;
  undefined8 local_8da0;
  undefined8 uStack_8d98;
  undefined8 uStack_8d90;
  undefined8 uStack_8d88;
  undefined8 local_8d80;
  undefined8 uStack_8d78;
  undefined8 uStack_8d70;
  undefined8 uStack_8d68;
  undefined8 local_8d60;
  undefined8 uStack_8d58;
  undefined8 uStack_8d50;
  undefined8 uStack_8d48;
  undefined8 local_8d40;
  undefined8 uStack_8d38;
  undefined8 uStack_8d30;
  undefined8 uStack_8d28;
  undefined8 local_8d20;
  undefined8 uStack_8d18;
  undefined8 uStack_8d10;
  undefined8 uStack_8d08;
  undefined8 local_8d00;
  undefined8 uStack_8cf8;
  undefined8 uStack_8cf0;
  undefined8 uStack_8ce8;
  undefined8 local_8ce0;
  undefined8 uStack_8cd8;
  undefined8 uStack_8cd0;
  undefined8 uStack_8cc8;
  undefined8 local_8cc0;
  undefined8 uStack_8cb8;
  undefined8 uStack_8cb0;
  undefined8 uStack_8ca8;
  undefined8 local_8ca0;
  undefined8 uStack_8c98;
  undefined8 uStack_8c90;
  undefined8 uStack_8c88;
  undefined8 local_8c80;
  undefined8 uStack_8c78;
  undefined8 uStack_8c70;
  undefined8 uStack_8c68;
  undefined8 local_8c60;
  undefined8 uStack_8c58;
  undefined8 uStack_8c50;
  undefined8 uStack_8c48;
  undefined8 local_8c40;
  undefined8 uStack_8c38;
  undefined8 uStack_8c30;
  undefined8 uStack_8c28;
  undefined8 local_8c20;
  undefined8 uStack_8c18;
  undefined8 uStack_8c10;
  undefined8 uStack_8c08;
  undefined8 local_8c00;
  undefined8 uStack_8bf8;
  undefined8 uStack_8bf0;
  undefined8 uStack_8be8;
  undefined8 local_8be0;
  undefined8 uStack_8bd8;
  undefined8 uStack_8bd0;
  undefined8 uStack_8bc8;
  undefined8 local_8bc0;
  undefined8 uStack_8bb8;
  undefined8 uStack_8bb0;
  undefined8 uStack_8ba8;
  undefined8 local_8ba0;
  undefined8 uStack_8b98;
  undefined8 uStack_8b90;
  undefined8 uStack_8b88;
  undefined8 local_8b80;
  undefined8 uStack_8b78;
  undefined8 uStack_8b70;
  undefined8 uStack_8b68;
  undefined8 local_8b60;
  undefined8 uStack_8b58;
  undefined8 uStack_8b50;
  undefined8 uStack_8b48;
  undefined8 local_8b40;
  undefined8 uStack_8b38;
  undefined8 uStack_8b30;
  undefined8 uStack_8b28;
  undefined8 local_8b20;
  undefined8 uStack_8b18;
  undefined8 uStack_8b10;
  undefined8 uStack_8b08;
  undefined8 local_8b00;
  undefined8 uStack_8af8;
  undefined8 uStack_8af0;
  undefined8 uStack_8ae8;
  undefined8 local_8ae0;
  undefined8 uStack_8ad8;
  undefined8 uStack_8ad0;
  undefined8 uStack_8ac8;
  undefined8 local_8ac0;
  undefined8 uStack_8ab8;
  undefined8 uStack_8ab0;
  undefined8 uStack_8aa8;
  undefined8 local_8aa0;
  undefined8 uStack_8a98;
  undefined8 uStack_8a90;
  undefined8 uStack_8a88;
  undefined8 local_8a80;
  undefined8 uStack_8a78;
  undefined8 uStack_8a70;
  undefined8 uStack_8a68;
  undefined8 local_8a60;
  undefined8 uStack_8a58;
  undefined8 uStack_8a50;
  undefined8 uStack_8a48;
  undefined8 local_8a40;
  undefined8 uStack_8a38;
  undefined8 uStack_8a30;
  undefined8 uStack_8a28;
  undefined8 local_8a20;
  undefined8 uStack_8a18;
  undefined8 uStack_8a10;
  undefined8 uStack_8a08;
  undefined8 local_8a00;
  undefined8 uStack_89f8;
  undefined8 uStack_89f0;
  undefined8 uStack_89e8;
  undefined8 local_89e0;
  undefined8 uStack_89d8;
  undefined8 uStack_89d0;
  undefined8 uStack_89c8;
  undefined8 local_89c0;
  undefined8 uStack_89b8;
  undefined8 uStack_89b0;
  undefined8 uStack_89a8;
  undefined8 local_89a0;
  undefined8 uStack_8998;
  undefined8 uStack_8990;
  undefined8 uStack_8988;
  undefined8 local_8980;
  undefined8 uStack_8978;
  undefined8 uStack_8970;
  undefined8 uStack_8968;
  undefined8 local_8960;
  undefined8 uStack_8958;
  undefined8 uStack_8950;
  undefined8 uStack_8948;
  undefined8 local_8940;
  undefined8 uStack_8938;
  undefined8 uStack_8930;
  undefined8 uStack_8928;
  undefined8 local_8920;
  undefined8 uStack_8918;
  undefined8 uStack_8910;
  undefined8 uStack_8908;
  undefined8 local_8900;
  undefined8 uStack_88f8;
  undefined8 uStack_88f0;
  undefined8 uStack_88e8;
  undefined8 local_88e0;
  undefined8 uStack_88d8;
  undefined8 uStack_88d0;
  undefined8 uStack_88c8;
  undefined8 local_88c0;
  undefined8 uStack_88b8;
  undefined8 uStack_88b0;
  undefined8 uStack_88a8;
  undefined8 local_88a0;
  undefined8 uStack_8898;
  undefined8 uStack_8890;
  undefined8 uStack_8888;
  undefined8 local_8880;
  undefined8 uStack_8878;
  undefined8 uStack_8870;
  undefined8 uStack_8868;
  undefined8 local_8860;
  undefined8 uStack_8858;
  undefined8 uStack_8850;
  undefined8 uStack_8848;
  undefined8 local_8840;
  undefined8 uStack_8838;
  undefined8 uStack_8830;
  undefined8 uStack_8828;
  undefined8 local_8820;
  undefined8 uStack_8818;
  undefined8 uStack_8810;
  undefined8 uStack_8808;
  undefined8 local_8800;
  undefined8 uStack_87f8;
  undefined8 uStack_87f0;
  undefined8 uStack_87e8;
  undefined8 local_87e0;
  undefined8 uStack_87d8;
  undefined8 uStack_87d0;
  undefined8 uStack_87c8;
  undefined8 local_87c0;
  undefined8 uStack_87b8;
  undefined8 uStack_87b0;
  undefined8 uStack_87a8;
  undefined8 local_87a0;
  undefined8 uStack_8798;
  undefined8 uStack_8790;
  undefined8 uStack_8788;
  undefined8 local_8780;
  undefined8 uStack_8778;
  undefined8 uStack_8770;
  undefined8 uStack_8768;
  undefined8 local_8760;
  undefined8 uStack_8758;
  undefined8 uStack_8750;
  undefined8 uStack_8748;
  undefined8 local_8740;
  undefined8 uStack_8738;
  undefined8 uStack_8730;
  undefined8 uStack_8728;
  undefined8 local_8720;
  undefined8 uStack_8718;
  undefined8 uStack_8710;
  undefined8 uStack_8708;
  undefined8 local_8700;
  undefined8 uStack_86f8;
  undefined8 uStack_86f0;
  undefined8 uStack_86e8;
  undefined8 local_86e0;
  undefined8 uStack_86d8;
  undefined8 uStack_86d0;
  undefined8 uStack_86c8;
  undefined8 local_86c0;
  undefined8 uStack_86b8;
  undefined8 uStack_86b0;
  undefined8 uStack_86a8;
  undefined8 local_86a0;
  undefined8 uStack_8698;
  undefined8 uStack_8690;
  undefined8 uStack_8688;
  undefined8 local_8680;
  undefined8 uStack_8678;
  undefined8 uStack_8670;
  undefined8 uStack_8668;
  undefined8 local_8660;
  undefined8 uStack_8658;
  undefined8 uStack_8650;
  undefined8 uStack_8648;
  undefined8 local_8640;
  undefined8 uStack_8638;
  undefined8 uStack_8630;
  undefined8 uStack_8628;
  undefined8 local_8620;
  undefined8 uStack_8618;
  undefined8 uStack_8610;
  undefined8 uStack_8608;
  undefined8 local_8600;
  undefined8 uStack_85f8;
  undefined8 uStack_85f0;
  undefined8 uStack_85e8;
  undefined8 local_85e0;
  undefined8 uStack_85d8;
  undefined8 uStack_85d0;
  undefined8 uStack_85c8;
  undefined8 local_85c0;
  undefined8 uStack_85b8;
  undefined8 uStack_85b0;
  undefined8 uStack_85a8;
  undefined8 local_85a0;
  undefined8 uStack_8598;
  undefined8 uStack_8590;
  undefined8 uStack_8588;
  undefined8 local_8580;
  undefined8 uStack_8578;
  undefined8 uStack_8570;
  undefined8 uStack_8568;
  undefined8 local_8560;
  undefined8 uStack_8558;
  undefined8 uStack_8550;
  undefined8 uStack_8548;
  undefined8 local_8540;
  undefined8 uStack_8538;
  undefined8 uStack_8530;
  undefined8 uStack_8528;
  undefined8 local_8520;
  undefined8 uStack_8518;
  undefined8 uStack_8510;
  undefined8 uStack_8508;
  undefined8 local_8500;
  undefined8 uStack_84f8;
  undefined8 uStack_84f0;
  undefined8 uStack_84e8;
  undefined8 local_84e0;
  undefined8 uStack_84d8;
  undefined8 uStack_84d0;
  undefined8 uStack_84c8;
  undefined8 local_84c0;
  undefined8 uStack_84b8;
  undefined8 uStack_84b0;
  undefined8 uStack_84a8;
  undefined8 local_84a0;
  undefined8 uStack_8498;
  undefined8 uStack_8490;
  undefined8 uStack_8488;
  undefined8 local_8480;
  undefined8 uStack_8478;
  undefined8 uStack_8470;
  undefined8 uStack_8468;
  undefined8 local_8460;
  undefined8 uStack_8458;
  undefined8 uStack_8450;
  undefined8 uStack_8448;
  undefined8 local_8440;
  undefined8 uStack_8438;
  undefined8 uStack_8430;
  undefined8 uStack_8428;
  undefined8 local_8420;
  undefined8 uStack_8418;
  undefined8 uStack_8410;
  undefined8 uStack_8408;
  undefined8 local_8400;
  undefined8 uStack_83f8;
  undefined8 uStack_83f0;
  undefined8 uStack_83e8;
  undefined8 local_83e0;
  undefined8 uStack_83d8;
  undefined8 uStack_83d0;
  undefined8 uStack_83c8;
  undefined8 local_83c0;
  undefined8 uStack_83b8;
  undefined8 uStack_83b0;
  undefined8 uStack_83a8;
  undefined8 local_83a0;
  undefined8 uStack_8398;
  undefined8 uStack_8390;
  undefined8 uStack_8388;
  undefined8 local_8380;
  undefined8 uStack_8378;
  undefined8 uStack_8370;
  undefined8 uStack_8368;
  undefined8 local_8360;
  undefined8 uStack_8358;
  undefined8 uStack_8350;
  undefined8 uStack_8348;
  undefined8 local_8340;
  undefined8 uStack_8338;
  undefined8 uStack_8330;
  undefined8 uStack_8328;
  undefined8 local_8320;
  undefined8 uStack_8318;
  undefined8 uStack_8310;
  undefined8 uStack_8308;
  undefined8 local_8300;
  undefined8 uStack_82f8;
  undefined8 uStack_82f0;
  undefined8 uStack_82e8;
  undefined8 local_82e0;
  undefined8 uStack_82d8;
  undefined8 uStack_82d0;
  undefined8 uStack_82c8;
  undefined8 local_82c0;
  undefined8 uStack_82b8;
  undefined8 uStack_82b0;
  undefined8 uStack_82a8;
  undefined8 local_82a0;
  undefined8 uStack_8298;
  undefined8 uStack_8290;
  undefined8 uStack_8288;
  undefined8 local_8280;
  undefined8 uStack_8278;
  undefined8 uStack_8270;
  undefined8 uStack_8268;
  undefined8 local_8260;
  undefined8 uStack_8258;
  undefined8 uStack_8250;
  undefined8 uStack_8248;
  undefined8 local_8240;
  undefined8 uStack_8238;
  undefined8 uStack_8230;
  undefined8 uStack_8228;
  undefined8 local_8220;
  undefined8 uStack_8218;
  undefined8 uStack_8210;
  undefined8 uStack_8208;
  undefined8 local_8200;
  undefined8 uStack_81f8;
  undefined8 uStack_81f0;
  undefined8 uStack_81e8;
  undefined8 local_81e0;
  undefined8 uStack_81d8;
  undefined8 uStack_81d0;
  undefined8 uStack_81c8;
  undefined8 local_81c0;
  undefined8 uStack_81b8;
  undefined8 uStack_81b0;
  undefined8 uStack_81a8;
  undefined8 local_81a0;
  undefined8 uStack_8198;
  undefined8 uStack_8190;
  undefined8 uStack_8188;
  undefined8 local_8180;
  undefined8 uStack_8178;
  undefined8 uStack_8170;
  undefined8 uStack_8168;
  undefined8 local_8160;
  undefined8 uStack_8158;
  undefined8 uStack_8150;
  undefined8 uStack_8148;
  undefined8 local_8140;
  undefined8 uStack_8138;
  undefined8 uStack_8130;
  undefined8 uStack_8128;
  undefined8 local_8120;
  undefined8 uStack_8118;
  undefined8 uStack_8110;
  undefined8 uStack_8108;
  undefined8 local_8100;
  undefined8 uStack_80f8;
  undefined8 uStack_80f0;
  undefined8 uStack_80e8;
  undefined8 local_80e0;
  undefined8 uStack_80d8;
  undefined8 uStack_80d0;
  undefined8 uStack_80c8;
  undefined8 local_80c0;
  undefined8 uStack_80b8;
  undefined8 uStack_80b0;
  undefined8 uStack_80a8;
  undefined8 local_80a0;
  undefined8 uStack_8098;
  undefined8 uStack_8090;
  undefined8 uStack_8088;
  undefined8 local_8080;
  undefined8 uStack_8078;
  undefined8 uStack_8070;
  undefined8 uStack_8068;
  undefined8 local_8060;
  undefined8 uStack_8058;
  undefined8 uStack_8050;
  undefined8 uStack_8048;
  undefined8 local_8040;
  undefined8 uStack_8038;
  undefined8 uStack_8030;
  undefined8 uStack_8028;
  undefined8 local_8020;
  undefined8 uStack_8018;
  undefined8 uStack_8010;
  undefined8 uStack_8008;
  undefined8 local_8000;
  undefined8 uStack_7ff8;
  undefined8 uStack_7ff0;
  undefined8 uStack_7fe8;
  undefined8 local_7fe0;
  undefined8 uStack_7fd8;
  undefined8 uStack_7fd0;
  undefined8 uStack_7fc8;
  undefined8 local_7fc0;
  undefined8 uStack_7fb8;
  undefined8 uStack_7fb0;
  undefined8 uStack_7fa8;
  undefined8 local_7fa0;
  undefined8 uStack_7f98;
  undefined8 uStack_7f90;
  undefined8 uStack_7f88;
  undefined8 local_7f80;
  undefined8 uStack_7f78;
  undefined8 uStack_7f70;
  undefined8 uStack_7f68;
  undefined8 local_7f60;
  undefined8 uStack_7f58;
  undefined8 uStack_7f50;
  undefined8 uStack_7f48;
  undefined8 local_7f40;
  undefined8 uStack_7f38;
  undefined8 uStack_7f30;
  undefined8 uStack_7f28;
  undefined8 local_7f20;
  undefined8 uStack_7f18;
  undefined8 uStack_7f10;
  undefined8 uStack_7f08;
  undefined8 local_7f00;
  undefined8 uStack_7ef8;
  undefined8 uStack_7ef0;
  undefined8 uStack_7ee8;
  undefined8 local_7ee0;
  undefined8 uStack_7ed8;
  undefined8 uStack_7ed0;
  undefined8 uStack_7ec8;
  undefined8 local_7ec0;
  undefined8 uStack_7eb8;
  undefined8 uStack_7eb0;
  undefined8 uStack_7ea8;
  undefined8 local_7ea0;
  undefined8 uStack_7e98;
  undefined8 uStack_7e90;
  undefined8 uStack_7e88;
  undefined8 local_7e80;
  undefined8 uStack_7e78;
  undefined8 uStack_7e70;
  undefined8 uStack_7e68;
  undefined8 local_7e60;
  undefined8 uStack_7e58;
  undefined8 uStack_7e50;
  undefined8 uStack_7e48;
  undefined8 local_7e40;
  undefined8 uStack_7e38;
  undefined8 uStack_7e30;
  undefined8 uStack_7e28;
  undefined8 local_7e20;
  undefined8 uStack_7e18;
  undefined8 uStack_7e10;
  undefined8 uStack_7e08;
  undefined8 local_7e00;
  undefined8 uStack_7df8;
  undefined8 uStack_7df0;
  undefined8 uStack_7de8;
  undefined8 local_7de0;
  undefined8 uStack_7dd8;
  undefined8 uStack_7dd0;
  undefined8 uStack_7dc8;
  undefined8 local_7dc0;
  undefined8 uStack_7db8;
  undefined8 uStack_7db0;
  undefined8 uStack_7da8;
  undefined8 local_7da0;
  undefined8 uStack_7d98;
  undefined8 uStack_7d90;
  undefined8 uStack_7d88;
  undefined8 local_7d80;
  undefined8 uStack_7d78;
  undefined8 uStack_7d70;
  undefined8 uStack_7d68;
  undefined8 local_7d60;
  undefined8 uStack_7d58;
  undefined8 uStack_7d50;
  undefined8 uStack_7d48;
  undefined8 local_7d40;
  undefined8 uStack_7d38;
  undefined8 uStack_7d30;
  undefined8 uStack_7d28;
  undefined8 local_7d20;
  undefined8 uStack_7d18;
  undefined8 uStack_7d10;
  undefined8 uStack_7d08;
  undefined8 local_7d00;
  undefined8 uStack_7cf8;
  undefined8 uStack_7cf0;
  undefined8 uStack_7ce8;
  undefined8 local_7ce0;
  undefined8 uStack_7cd8;
  undefined8 uStack_7cd0;
  undefined8 uStack_7cc8;
  undefined8 local_7cc0;
  undefined8 uStack_7cb8;
  undefined8 uStack_7cb0;
  undefined8 uStack_7ca8;
  undefined8 local_7ca0;
  undefined8 uStack_7c98;
  undefined8 uStack_7c90;
  undefined8 uStack_7c88;
  undefined8 local_7c80;
  undefined8 uStack_7c78;
  undefined8 uStack_7c70;
  undefined8 uStack_7c68;
  undefined8 local_7c60;
  undefined8 uStack_7c58;
  undefined8 uStack_7c50;
  undefined8 uStack_7c48;
  undefined8 local_7c40;
  undefined8 uStack_7c38;
  undefined8 uStack_7c30;
  undefined8 uStack_7c28;
  undefined8 local_7c20;
  undefined8 uStack_7c18;
  undefined8 uStack_7c10;
  undefined8 uStack_7c08;
  undefined8 local_7c00;
  undefined8 uStack_7bf8;
  undefined8 uStack_7bf0;
  undefined8 uStack_7be8;
  undefined8 local_7be0;
  undefined8 uStack_7bd8;
  undefined8 uStack_7bd0;
  undefined8 uStack_7bc8;
  undefined8 local_7bc0;
  undefined8 uStack_7bb8;
  undefined8 uStack_7bb0;
  undefined8 uStack_7ba8;
  undefined8 local_7ba0;
  undefined8 uStack_7b98;
  undefined8 uStack_7b90;
  undefined8 uStack_7b88;
  undefined8 local_7b80;
  undefined8 uStack_7b78;
  undefined8 uStack_7b70;
  undefined8 uStack_7b68;
  undefined8 local_7b60;
  undefined8 uStack_7b58;
  undefined8 uStack_7b50;
  undefined8 uStack_7b48;
  undefined8 local_7b40;
  undefined8 uStack_7b38;
  undefined8 uStack_7b30;
  undefined8 uStack_7b28;
  undefined8 local_7b20;
  undefined8 uStack_7b18;
  undefined8 uStack_7b10;
  undefined8 uStack_7b08;
  undefined8 local_7b00;
  undefined8 uStack_7af8;
  undefined8 uStack_7af0;
  undefined8 uStack_7ae8;
  undefined8 local_7ae0;
  undefined8 uStack_7ad8;
  undefined8 uStack_7ad0;
  undefined8 uStack_7ac8;
  undefined8 local_7ac0;
  undefined8 uStack_7ab8;
  undefined8 uStack_7ab0;
  undefined8 uStack_7aa8;
  undefined8 local_7aa0;
  undefined8 uStack_7a98;
  undefined8 uStack_7a90;
  undefined8 uStack_7a88;
  undefined8 local_7a80;
  undefined8 uStack_7a78;
  undefined8 uStack_7a70;
  undefined8 uStack_7a68;
  undefined8 local_7a60;
  undefined8 uStack_7a58;
  undefined8 uStack_7a50;
  undefined8 uStack_7a48;
  undefined8 local_7a40;
  undefined8 uStack_7a38;
  undefined8 uStack_7a30;
  undefined8 uStack_7a28;
  undefined8 local_7a20;
  undefined8 uStack_7a18;
  undefined8 uStack_7a10;
  undefined8 uStack_7a08;
  undefined8 local_7a00;
  undefined8 uStack_79f8;
  undefined8 uStack_79f0;
  undefined8 uStack_79e8;
  undefined8 local_79e0;
  undefined8 uStack_79d8;
  undefined8 uStack_79d0;
  undefined8 uStack_79c8;
  undefined8 local_79c0;
  undefined8 uStack_79b8;
  undefined8 uStack_79b0;
  undefined8 uStack_79a8;
  undefined8 local_79a0;
  undefined8 uStack_7998;
  undefined8 uStack_7990;
  undefined8 uStack_7988;
  undefined8 local_7980;
  undefined8 uStack_7978;
  undefined8 uStack_7970;
  undefined8 uStack_7968;
  undefined8 local_7960;
  undefined8 uStack_7958;
  undefined8 uStack_7950;
  undefined8 uStack_7948;
  undefined8 local_7940;
  undefined8 uStack_7938;
  undefined8 uStack_7930;
  undefined8 uStack_7928;
  undefined8 local_7920;
  undefined8 uStack_7918;
  undefined8 uStack_7910;
  undefined8 uStack_7908;
  undefined8 local_7900;
  undefined8 uStack_78f8;
  undefined8 uStack_78f0;
  undefined8 uStack_78e8;
  undefined8 local_78e0;
  undefined8 uStack_78d8;
  undefined8 uStack_78d0;
  undefined8 uStack_78c8;
  undefined8 local_78c0;
  undefined8 uStack_78b8;
  undefined8 uStack_78b0;
  undefined8 uStack_78a8;
  undefined8 local_78a0;
  undefined8 uStack_7898;
  undefined8 uStack_7890;
  undefined8 uStack_7888;
  undefined8 local_7880;
  undefined8 uStack_7878;
  undefined8 uStack_7870;
  undefined8 uStack_7868;
  undefined8 local_7860;
  undefined8 uStack_7858;
  undefined8 uStack_7850;
  undefined8 uStack_7848;
  undefined8 local_7840;
  undefined8 uStack_7838;
  undefined8 uStack_7830;
  undefined8 uStack_7828;
  undefined8 local_7820;
  undefined8 uStack_7818;
  undefined8 uStack_7810;
  undefined8 uStack_7808;
  undefined8 local_7800;
  undefined8 uStack_77f8;
  undefined8 uStack_77f0;
  undefined8 uStack_77e8;
  undefined8 local_77e0;
  undefined8 uStack_77d8;
  undefined8 uStack_77d0;
  undefined8 uStack_77c8;
  undefined8 local_77c0;
  undefined8 uStack_77b8;
  undefined8 uStack_77b0;
  undefined8 uStack_77a8;
  undefined8 local_77a0;
  undefined8 uStack_7798;
  undefined8 uStack_7790;
  undefined8 uStack_7788;
  undefined8 local_7780;
  undefined8 uStack_7778;
  undefined8 uStack_7770;
  undefined8 uStack_7768;
  undefined8 local_7760;
  undefined8 uStack_7758;
  undefined8 uStack_7750;
  undefined8 uStack_7748;
  undefined8 local_7740;
  undefined8 uStack_7738;
  undefined8 uStack_7730;
  undefined8 uStack_7728;
  undefined8 local_7720;
  undefined8 uStack_7718;
  undefined8 uStack_7710;
  undefined8 uStack_7708;
  undefined8 local_7700;
  undefined8 uStack_76f8;
  undefined8 uStack_76f0;
  undefined8 uStack_76e8;
  undefined8 local_76e0;
  undefined8 uStack_76d8;
  undefined8 uStack_76d0;
  undefined8 uStack_76c8;
  undefined8 local_76c0;
  undefined8 uStack_76b8;
  undefined8 uStack_76b0;
  undefined8 uStack_76a8;
  undefined8 local_76a0;
  undefined8 uStack_7698;
  undefined8 uStack_7690;
  undefined8 uStack_7688;
  undefined8 local_7680;
  undefined8 uStack_7678;
  undefined8 uStack_7670;
  undefined8 uStack_7668;
  undefined8 local_7660;
  undefined8 uStack_7658;
  undefined8 uStack_7650;
  undefined8 uStack_7648;
  undefined8 local_7640;
  undefined8 uStack_7638;
  undefined8 uStack_7630;
  undefined8 uStack_7628;
  undefined8 local_7620;
  undefined8 uStack_7618;
  undefined8 uStack_7610;
  undefined8 uStack_7608;
  undefined8 local_7600;
  undefined8 uStack_75f8;
  undefined8 uStack_75f0;
  undefined8 uStack_75e8;
  undefined8 local_75e0;
  undefined8 uStack_75d8;
  undefined8 uStack_75d0;
  undefined8 uStack_75c8;
  undefined8 local_75c0;
  undefined8 uStack_75b8;
  undefined8 uStack_75b0;
  undefined8 uStack_75a8;
  undefined8 local_75a0;
  undefined8 uStack_7598;
  undefined8 uStack_7590;
  undefined8 uStack_7588;
  undefined8 local_7580;
  undefined8 uStack_7578;
  undefined8 uStack_7570;
  undefined8 uStack_7568;
  undefined8 local_7560;
  undefined8 uStack_7558;
  undefined8 uStack_7550;
  undefined8 uStack_7548;
  undefined8 local_7540;
  undefined8 uStack_7538;
  undefined8 uStack_7530;
  undefined8 uStack_7528;
  undefined8 local_7520;
  undefined8 uStack_7518;
  undefined8 uStack_7510;
  undefined8 uStack_7508;
  undefined8 local_7500;
  undefined8 uStack_74f8;
  undefined8 uStack_74f0;
  undefined8 uStack_74e8;
  undefined8 local_74e0;
  undefined8 uStack_74d8;
  undefined8 uStack_74d0;
  undefined8 uStack_74c8;
  undefined8 local_74c0;
  undefined8 uStack_74b8;
  undefined8 uStack_74b0;
  undefined8 uStack_74a8;
  undefined8 local_74a0;
  undefined8 uStack_7498;
  undefined8 uStack_7490;
  undefined8 uStack_7488;
  undefined8 local_7480;
  undefined8 uStack_7478;
  undefined8 uStack_7470;
  undefined8 uStack_7468;
  undefined8 local_7460;
  undefined8 uStack_7458;
  undefined8 uStack_7450;
  undefined8 uStack_7448;
  undefined8 local_7440;
  undefined8 uStack_7438;
  undefined8 uStack_7430;
  undefined8 uStack_7428;
  undefined8 local_7420;
  undefined8 uStack_7418;
  undefined8 uStack_7410;
  undefined8 uStack_7408;
  undefined8 local_7400;
  undefined8 uStack_73f8;
  undefined8 uStack_73f0;
  undefined8 uStack_73e8;
  undefined8 local_73e0;
  undefined8 uStack_73d8;
  undefined8 uStack_73d0;
  undefined8 uStack_73c8;
  undefined8 local_73c0;
  undefined8 uStack_73b8;
  undefined8 uStack_73b0;
  undefined8 uStack_73a8;
  undefined8 local_73a0;
  undefined8 uStack_7398;
  undefined8 uStack_7390;
  undefined8 uStack_7388;
  undefined8 local_7380;
  undefined8 uStack_7378;
  undefined8 uStack_7370;
  undefined8 uStack_7368;
  undefined8 local_7360;
  undefined8 uStack_7358;
  undefined8 uStack_7350;
  undefined8 uStack_7348;
  undefined8 local_7340;
  undefined8 uStack_7338;
  undefined8 uStack_7330;
  undefined8 uStack_7328;
  undefined8 local_7320;
  undefined8 uStack_7318;
  undefined8 uStack_7310;
  undefined8 uStack_7308;
  undefined8 local_7300;
  undefined8 uStack_72f8;
  undefined8 uStack_72f0;
  undefined8 uStack_72e8;
  undefined8 local_72e0;
  undefined8 uStack_72d8;
  undefined8 uStack_72d0;
  undefined8 uStack_72c8;
  undefined8 local_72c0;
  undefined8 uStack_72b8;
  undefined8 uStack_72b0;
  undefined8 uStack_72a8;
  undefined8 local_72a0;
  undefined8 uStack_7298;
  undefined8 uStack_7290;
  undefined8 uStack_7288;
  undefined8 local_7280;
  undefined8 uStack_7278;
  undefined8 uStack_7270;
  undefined8 uStack_7268;
  undefined8 local_7260;
  undefined8 uStack_7258;
  undefined8 uStack_7250;
  undefined8 uStack_7248;
  undefined8 local_7240;
  undefined8 uStack_7238;
  undefined8 uStack_7230;
  undefined8 uStack_7228;
  undefined8 local_7220;
  undefined8 uStack_7218;
  undefined8 uStack_7210;
  undefined8 uStack_7208;
  undefined8 local_7200;
  undefined8 uStack_71f8;
  undefined8 uStack_71f0;
  undefined8 uStack_71e8;
  undefined8 local_71e0;
  undefined8 uStack_71d8;
  undefined8 uStack_71d0;
  undefined8 uStack_71c8;
  undefined8 local_71c0;
  undefined8 uStack_71b8;
  undefined8 uStack_71b0;
  undefined8 uStack_71a8;
  undefined8 local_71a0;
  undefined8 uStack_7198;
  undefined8 uStack_7190;
  undefined8 uStack_7188;
  undefined8 local_7180;
  undefined8 uStack_7178;
  undefined8 uStack_7170;
  undefined8 uStack_7168;
  undefined8 local_7160;
  undefined8 uStack_7158;
  undefined8 uStack_7150;
  undefined8 uStack_7148;
  undefined8 local_7140;
  undefined8 uStack_7138;
  undefined8 uStack_7130;
  undefined8 uStack_7128;
  undefined8 local_7120;
  undefined8 uStack_7118;
  undefined8 uStack_7110;
  undefined8 uStack_7108;
  undefined8 local_7100;
  undefined8 uStack_70f8;
  undefined8 uStack_70f0;
  undefined8 uStack_70e8;
  undefined8 local_70e0;
  undefined8 uStack_70d8;
  undefined8 uStack_70d0;
  undefined8 uStack_70c8;
  undefined8 local_70c0;
  undefined8 uStack_70b8;
  undefined8 uStack_70b0;
  undefined8 uStack_70a8;
  undefined8 local_70a0;
  undefined8 uStack_7098;
  undefined8 uStack_7090;
  undefined8 uStack_7088;
  undefined8 local_7080;
  undefined8 uStack_7078;
  undefined8 uStack_7070;
  undefined8 uStack_7068;
  undefined8 local_7060;
  undefined8 uStack_7058;
  undefined8 uStack_7050;
  undefined8 uStack_7048;
  undefined8 local_7040;
  undefined8 uStack_7038;
  undefined8 uStack_7030;
  undefined8 uStack_7028;
  undefined8 local_7020;
  undefined8 uStack_7018;
  undefined8 uStack_7010;
  undefined8 uStack_7008;
  undefined8 local_7000;
  undefined8 uStack_6ff8;
  undefined8 uStack_6ff0;
  undefined8 uStack_6fe8;
  undefined8 local_6fe0;
  undefined8 uStack_6fd8;
  undefined8 uStack_6fd0;
  undefined8 uStack_6fc8;
  undefined8 local_6fc0;
  undefined8 uStack_6fb8;
  undefined8 uStack_6fb0;
  undefined8 uStack_6fa8;
  undefined8 local_6fa0;
  undefined8 uStack_6f98;
  undefined8 uStack_6f90;
  undefined8 uStack_6f88;
  undefined8 local_6f80;
  undefined8 uStack_6f78;
  undefined8 uStack_6f70;
  undefined8 uStack_6f68;
  undefined8 local_6f60;
  undefined8 uStack_6f58;
  undefined8 uStack_6f50;
  undefined8 uStack_6f48;
  undefined8 local_6f40;
  undefined8 uStack_6f38;
  undefined8 uStack_6f30;
  undefined8 uStack_6f28;
  undefined8 local_6f20;
  undefined8 uStack_6f18;
  undefined8 uStack_6f10;
  undefined8 uStack_6f08;
  undefined8 local_6f00;
  undefined8 uStack_6ef8;
  undefined8 uStack_6ef0;
  undefined8 uStack_6ee8;
  undefined8 local_6ee0;
  undefined8 uStack_6ed8;
  undefined8 uStack_6ed0;
  undefined8 uStack_6ec8;
  undefined8 local_6ec0;
  undefined8 uStack_6eb8;
  undefined8 uStack_6eb0;
  undefined8 uStack_6ea8;
  undefined8 local_6ea0;
  undefined8 uStack_6e98;
  undefined8 uStack_6e90;
  undefined8 uStack_6e88;
  undefined8 local_6e80;
  undefined8 uStack_6e78;
  undefined8 uStack_6e70;
  undefined8 uStack_6e68;
  undefined8 local_6e60;
  undefined8 uStack_6e58;
  undefined8 uStack_6e50;
  undefined8 uStack_6e48;
  undefined8 local_6e40;
  undefined8 uStack_6e38;
  undefined8 uStack_6e30;
  undefined8 uStack_6e28;
  undefined8 local_6e20;
  undefined8 uStack_6e18;
  undefined8 uStack_6e10;
  undefined8 uStack_6e08;
  undefined8 local_6e00;
  undefined8 uStack_6df8;
  undefined8 uStack_6df0;
  undefined8 uStack_6de8;
  undefined8 local_6de0;
  undefined8 uStack_6dd8;
  undefined8 uStack_6dd0;
  undefined8 uStack_6dc8;
  undefined8 local_6dc0;
  undefined8 uStack_6db8;
  undefined8 uStack_6db0;
  undefined8 uStack_6da8;
  undefined8 local_6da0;
  undefined8 uStack_6d98;
  undefined8 uStack_6d90;
  undefined8 uStack_6d88;
  undefined8 local_6d80;
  undefined8 uStack_6d78;
  undefined8 uStack_6d70;
  undefined8 uStack_6d68;
  undefined8 local_6d60;
  undefined8 uStack_6d58;
  undefined8 uStack_6d50;
  undefined8 uStack_6d48;
  undefined8 local_6d40;
  undefined8 uStack_6d38;
  undefined8 uStack_6d30;
  undefined8 uStack_6d28;
  undefined8 local_6d20;
  undefined8 uStack_6d18;
  undefined8 uStack_6d10;
  undefined8 uStack_6d08;
  undefined8 local_6d00;
  undefined8 uStack_6cf8;
  undefined8 uStack_6cf0;
  undefined8 uStack_6ce8;
  undefined8 local_6ce0;
  undefined8 uStack_6cd8;
  undefined8 uStack_6cd0;
  undefined8 uStack_6cc8;
  undefined8 local_6cc0;
  undefined8 uStack_6cb8;
  undefined8 uStack_6cb0;
  undefined8 uStack_6ca8;
  undefined8 local_6ca0;
  undefined8 uStack_6c98;
  undefined8 uStack_6c90;
  undefined8 uStack_6c88;
  undefined8 local_6c80;
  undefined8 uStack_6c78;
  undefined8 uStack_6c70;
  undefined8 uStack_6c68;
  undefined8 local_6c60;
  undefined8 uStack_6c58;
  undefined8 uStack_6c50;
  undefined8 uStack_6c48;
  undefined8 local_6c40;
  undefined8 uStack_6c38;
  undefined8 uStack_6c30;
  undefined8 uStack_6c28;
  undefined8 local_6c20;
  undefined8 uStack_6c18;
  undefined8 uStack_6c10;
  undefined8 uStack_6c08;
  undefined8 local_6c00;
  undefined8 uStack_6bf8;
  undefined8 uStack_6bf0;
  undefined8 uStack_6be8;
  undefined8 local_6be0;
  undefined8 uStack_6bd8;
  undefined8 uStack_6bd0;
  undefined8 uStack_6bc8;
  undefined8 local_6bc0;
  undefined8 uStack_6bb8;
  undefined8 uStack_6bb0;
  undefined8 uStack_6ba8;
  undefined8 local_6ba0;
  undefined8 uStack_6b98;
  undefined8 uStack_6b90;
  undefined8 uStack_6b88;
  undefined8 local_6b80;
  undefined8 uStack_6b78;
  undefined8 uStack_6b70;
  undefined8 uStack_6b68;
  undefined8 local_6b60;
  undefined8 uStack_6b58;
  undefined8 uStack_6b50;
  undefined8 uStack_6b48;
  undefined8 local_6b40;
  undefined8 uStack_6b38;
  undefined8 uStack_6b30;
  undefined8 uStack_6b28;
  undefined8 local_6b20;
  undefined8 uStack_6b18;
  undefined8 uStack_6b10;
  undefined8 uStack_6b08;
  undefined8 local_6b00;
  undefined8 uStack_6af8;
  undefined8 uStack_6af0;
  undefined8 uStack_6ae8;
  undefined8 local_6ae0;
  undefined8 uStack_6ad8;
  undefined8 uStack_6ad0;
  undefined8 uStack_6ac8;
  undefined8 local_6ac0;
  undefined8 uStack_6ab8;
  undefined8 uStack_6ab0;
  undefined8 uStack_6aa8;
  undefined8 local_6aa0;
  undefined8 uStack_6a98;
  undefined8 uStack_6a90;
  undefined8 uStack_6a88;
  undefined8 local_6a80;
  undefined8 uStack_6a78;
  undefined8 uStack_6a70;
  undefined8 uStack_6a68;
  undefined8 local_6a60;
  undefined8 uStack_6a58;
  undefined8 uStack_6a50;
  undefined8 uStack_6a48;
  undefined8 local_6a40;
  undefined8 uStack_6a38;
  undefined8 uStack_6a30;
  undefined8 uStack_6a28;
  undefined8 local_6a20;
  undefined8 uStack_6a18;
  undefined8 uStack_6a10;
  undefined8 uStack_6a08;
  undefined8 local_6a00;
  undefined8 uStack_69f8;
  undefined8 uStack_69f0;
  undefined8 uStack_69e8;
  undefined8 local_69e0;
  undefined8 uStack_69d8;
  undefined8 uStack_69d0;
  undefined8 uStack_69c8;
  undefined8 local_69c0;
  undefined8 uStack_69b8;
  undefined8 uStack_69b0;
  undefined8 uStack_69a8;
  undefined8 local_69a0;
  undefined8 uStack_6998;
  undefined8 uStack_6990;
  undefined8 uStack_6988;
  undefined8 local_6980;
  undefined8 uStack_6978;
  undefined8 uStack_6970;
  undefined8 uStack_6968;
  undefined8 local_6960;
  undefined8 uStack_6958;
  undefined8 uStack_6950;
  undefined8 uStack_6948;
  undefined8 local_6940;
  undefined8 uStack_6938;
  undefined8 uStack_6930;
  undefined8 uStack_6928;
  undefined8 local_6920;
  undefined8 uStack_6918;
  undefined8 uStack_6910;
  undefined8 uStack_6908;
  undefined8 local_6900;
  undefined8 uStack_68f8;
  undefined8 uStack_68f0;
  undefined8 uStack_68e8;
  undefined8 local_68e0;
  undefined8 uStack_68d8;
  undefined8 uStack_68d0;
  undefined8 uStack_68c8;
  undefined8 local_68c0;
  undefined8 uStack_68b8;
  undefined8 uStack_68b0;
  undefined8 uStack_68a8;
  undefined8 local_68a0;
  undefined8 uStack_6898;
  undefined8 uStack_6890;
  undefined8 uStack_6888;
  undefined8 local_6880;
  undefined8 uStack_6878;
  undefined8 uStack_6870;
  undefined8 uStack_6868;
  undefined8 local_6860;
  undefined8 uStack_6858;
  undefined8 uStack_6850;
  undefined8 uStack_6848;
  undefined8 local_6840;
  undefined8 uStack_6838;
  undefined8 uStack_6830;
  undefined8 uStack_6828;
  undefined8 local_6820;
  undefined8 uStack_6818;
  undefined8 uStack_6810;
  undefined8 uStack_6808;
  undefined8 local_6800;
  undefined8 uStack_67f8;
  undefined8 uStack_67f0;
  undefined8 uStack_67e8;
  undefined8 local_67e0;
  undefined8 uStack_67d8;
  undefined8 uStack_67d0;
  undefined8 uStack_67c8;
  undefined8 local_67c0;
  undefined8 uStack_67b8;
  undefined8 uStack_67b0;
  undefined8 uStack_67a8;
  undefined8 local_67a0;
  undefined8 uStack_6798;
  undefined8 uStack_6790;
  undefined8 uStack_6788;
  undefined8 local_6780;
  undefined8 uStack_6778;
  undefined8 uStack_6770;
  undefined8 uStack_6768;
  undefined8 local_6760;
  undefined8 uStack_6758;
  undefined8 uStack_6750;
  undefined8 uStack_6748;
  undefined8 local_6740;
  undefined8 uStack_6738;
  undefined8 uStack_6730;
  undefined8 uStack_6728;
  undefined8 local_6720;
  undefined8 uStack_6718;
  undefined8 uStack_6710;
  undefined8 uStack_6708;
  undefined8 local_6700;
  undefined8 uStack_66f8;
  undefined8 uStack_66f0;
  undefined8 uStack_66e8;
  undefined8 local_66e0;
  undefined8 uStack_66d8;
  undefined8 uStack_66d0;
  undefined8 uStack_66c8;
  undefined8 local_66c0;
  undefined8 uStack_66b8;
  undefined8 uStack_66b0;
  undefined8 uStack_66a8;
  undefined8 local_66a0;
  undefined8 uStack_6698;
  undefined8 uStack_6690;
  undefined8 uStack_6688;
  undefined8 local_6680;
  undefined8 uStack_6678;
  undefined8 uStack_6670;
  undefined8 uStack_6668;
  undefined8 local_6660;
  undefined8 uStack_6658;
  undefined8 uStack_6650;
  undefined8 uStack_6648;
  undefined8 local_6640;
  undefined8 uStack_6638;
  undefined8 uStack_6630;
  undefined8 uStack_6628;
  undefined8 local_6620;
  undefined8 uStack_6618;
  undefined8 uStack_6610;
  undefined8 uStack_6608;
  undefined8 local_6600;
  undefined8 uStack_65f8;
  undefined8 uStack_65f0;
  undefined8 uStack_65e8;
  undefined8 local_65e0;
  undefined8 uStack_65d8;
  undefined8 uStack_65d0;
  undefined8 uStack_65c8;
  undefined8 local_65c0;
  undefined8 uStack_65b8;
  undefined8 uStack_65b0;
  undefined8 uStack_65a8;
  undefined8 local_65a0;
  undefined8 uStack_6598;
  undefined8 uStack_6590;
  undefined8 uStack_6588;
  undefined8 local_6580;
  undefined8 uStack_6578;
  undefined8 uStack_6570;
  undefined8 uStack_6568;
  undefined8 local_6560;
  undefined8 uStack_6558;
  undefined8 uStack_6550;
  undefined8 uStack_6548;
  undefined8 local_6540;
  undefined8 uStack_6538;
  undefined8 uStack_6530;
  undefined8 uStack_6528;
  undefined8 local_6520;
  undefined8 uStack_6518;
  undefined8 uStack_6510;
  undefined8 uStack_6508;
  undefined8 local_6500;
  undefined8 uStack_64f8;
  undefined8 uStack_64f0;
  undefined8 uStack_64e8;
  undefined8 local_64e0;
  undefined8 uStack_64d8;
  undefined8 uStack_64d0;
  undefined8 uStack_64c8;
  undefined8 local_64c0;
  undefined8 uStack_64b8;
  undefined8 uStack_64b0;
  undefined8 uStack_64a8;
  undefined8 local_64a0;
  undefined8 uStack_6498;
  undefined8 uStack_6490;
  undefined8 uStack_6488;
  undefined8 local_6480;
  undefined8 uStack_6478;
  undefined8 uStack_6470;
  undefined8 uStack_6468;
  undefined8 local_6460;
  undefined8 uStack_6458;
  undefined8 uStack_6450;
  undefined8 uStack_6448;
  undefined8 local_6440;
  undefined8 uStack_6438;
  undefined8 uStack_6430;
  undefined8 uStack_6428;
  undefined8 local_6420;
  undefined8 uStack_6418;
  undefined8 uStack_6410;
  undefined8 uStack_6408;
  undefined8 local_6400;
  undefined8 uStack_63f8;
  undefined8 uStack_63f0;
  undefined8 uStack_63e8;
  undefined8 local_63e0;
  undefined8 uStack_63d8;
  undefined8 uStack_63d0;
  undefined8 uStack_63c8;
  undefined8 local_63c0;
  undefined8 uStack_63b8;
  undefined8 uStack_63b0;
  undefined8 uStack_63a8;
  undefined8 local_63a0;
  undefined8 uStack_6398;
  undefined8 uStack_6390;
  undefined8 uStack_6388;
  undefined8 local_6380;
  undefined8 uStack_6378;
  undefined8 uStack_6370;
  undefined8 uStack_6368;
  undefined8 local_6360;
  undefined8 uStack_6358;
  undefined8 uStack_6350;
  undefined8 uStack_6348;
  undefined8 local_6340;
  undefined8 uStack_6338;
  undefined8 uStack_6330;
  undefined8 uStack_6328;
  undefined8 local_6320;
  undefined8 uStack_6318;
  undefined8 uStack_6310;
  undefined8 uStack_6308;
  undefined8 local_6300;
  undefined8 uStack_62f8;
  undefined8 uStack_62f0;
  undefined8 uStack_62e8;
  undefined8 local_62e0;
  undefined8 uStack_62d8;
  undefined8 uStack_62d0;
  undefined8 uStack_62c8;
  undefined8 local_62c0;
  undefined8 uStack_62b8;
  undefined8 uStack_62b0;
  undefined8 uStack_62a8;
  undefined8 local_62a0;
  undefined8 uStack_6298;
  undefined8 uStack_6290;
  undefined8 uStack_6288;
  undefined8 local_6280;
  undefined8 uStack_6278;
  undefined8 uStack_6270;
  undefined8 uStack_6268;
  undefined8 local_6260;
  undefined8 uStack_6258;
  undefined8 uStack_6250;
  undefined8 uStack_6248;
  undefined8 local_6240;
  undefined8 uStack_6238;
  undefined8 uStack_6230;
  undefined8 uStack_6228;
  undefined8 local_6220;
  undefined8 uStack_6218;
  undefined8 uStack_6210;
  undefined8 uStack_6208;
  undefined8 local_6200;
  undefined8 uStack_61f8;
  undefined8 uStack_61f0;
  undefined8 uStack_61e8;
  undefined8 local_61e0;
  undefined8 uStack_61d8;
  undefined8 uStack_61d0;
  undefined8 uStack_61c8;
  undefined8 local_61c0;
  undefined8 uStack_61b8;
  undefined8 uStack_61b0;
  undefined8 uStack_61a8;
  undefined8 local_61a0;
  undefined8 uStack_6198;
  undefined8 uStack_6190;
  undefined8 uStack_6188;
  undefined8 local_6180;
  undefined8 uStack_6178;
  undefined8 uStack_6170;
  undefined8 uStack_6168;
  undefined8 local_6160;
  undefined8 uStack_6158;
  undefined8 uStack_6150;
  undefined8 uStack_6148;
  undefined8 local_6140;
  undefined8 uStack_6138;
  undefined8 uStack_6130;
  undefined8 uStack_6128;
  undefined8 local_6120;
  undefined8 uStack_6118;
  undefined8 uStack_6110;
  undefined8 uStack_6108;
  undefined8 local_6100;
  undefined8 uStack_60f8;
  undefined8 uStack_60f0;
  undefined8 uStack_60e8;
  undefined8 local_60e0;
  undefined8 uStack_60d8;
  undefined8 uStack_60d0;
  undefined8 uStack_60c8;
  undefined8 local_60c0;
  undefined8 uStack_60b8;
  undefined8 uStack_60b0;
  undefined8 uStack_60a8;
  undefined8 local_60a0;
  undefined8 uStack_6098;
  undefined8 uStack_6090;
  undefined8 uStack_6088;
  undefined8 local_6080;
  undefined8 uStack_6078;
  undefined8 uStack_6070;
  undefined8 uStack_6068;
  undefined8 local_6060;
  undefined8 uStack_6058;
  undefined8 uStack_6050;
  undefined8 uStack_6048;
  undefined8 local_6040;
  undefined8 uStack_6038;
  undefined8 uStack_6030;
  undefined8 uStack_6028;
  undefined8 local_6020;
  undefined8 uStack_6018;
  undefined8 uStack_6010;
  undefined8 uStack_6008;
  undefined8 local_6000;
  undefined8 uStack_5ff8;
  undefined8 uStack_5ff0;
  undefined8 uStack_5fe8;
  undefined8 local_5fe0;
  undefined8 uStack_5fd8;
  undefined8 uStack_5fd0;
  undefined8 uStack_5fc8;
  undefined8 local_5fc0;
  undefined8 uStack_5fb8;
  undefined8 uStack_5fb0;
  undefined8 uStack_5fa8;
  undefined8 local_5fa0;
  undefined8 uStack_5f98;
  undefined8 uStack_5f90;
  undefined8 uStack_5f88;
  undefined8 local_5f80;
  undefined8 uStack_5f78;
  undefined8 uStack_5f70;
  undefined8 uStack_5f68;
  float local_5f60;
  float fStack_5f5c;
  float fStack_5f58;
  float fStack_5f54;
  float fStack_5f50;
  float fStack_5f4c;
  float fStack_5f48;
  float fStack_5f44;
  undefined8 local_5f40;
  undefined8 uStack_5f38;
  undefined8 uStack_5f30;
  undefined8 uStack_5f28;
  float local_5f20;
  float fStack_5f1c;
  float fStack_5f18;
  float fStack_5f14;
  float fStack_5f10;
  float fStack_5f0c;
  float fStack_5f08;
  float fStack_5f04;
  undefined8 local_5f00;
  undefined8 uStack_5ef8;
  undefined8 uStack_5ef0;
  undefined8 uStack_5ee8;
  float local_5ee0;
  float fStack_5edc;
  float fStack_5ed8;
  float fStack_5ed4;
  float fStack_5ed0;
  float fStack_5ecc;
  float fStack_5ec8;
  float fStack_5ec4;
  undefined8 local_5ec0;
  undefined8 uStack_5eb8;
  undefined8 uStack_5eb0;
  undefined8 uStack_5ea8;
  float local_5ea0;
  float fStack_5e9c;
  float fStack_5e98;
  float fStack_5e94;
  float fStack_5e90;
  float fStack_5e8c;
  float fStack_5e88;
  float fStack_5e84;
  undefined8 local_5e80;
  undefined8 uStack_5e78;
  undefined8 uStack_5e70;
  undefined8 uStack_5e68;
  float local_5e60;
  float fStack_5e5c;
  float fStack_5e58;
  float fStack_5e54;
  float fStack_5e50;
  float fStack_5e4c;
  float fStack_5e48;
  float fStack_5e44;
  undefined8 local_5e40;
  undefined8 uStack_5e38;
  undefined8 uStack_5e30;
  undefined8 uStack_5e28;
  float local_5e20;
  float fStack_5e1c;
  float fStack_5e18;
  float fStack_5e14;
  float fStack_5e10;
  float fStack_5e0c;
  float fStack_5e08;
  float fStack_5e04;
  undefined8 local_5e00;
  undefined8 uStack_5df8;
  undefined8 uStack_5df0;
  undefined8 uStack_5de8;
  float local_5de0;
  float fStack_5ddc;
  float fStack_5dd8;
  float fStack_5dd4;
  float fStack_5dd0;
  float fStack_5dcc;
  float fStack_5dc8;
  float fStack_5dc4;
  undefined8 local_5dc0;
  undefined8 uStack_5db8;
  undefined8 uStack_5db0;
  undefined8 uStack_5da8;
  float local_5da0;
  float fStack_5d9c;
  float fStack_5d98;
  float fStack_5d94;
  float fStack_5d90;
  float fStack_5d8c;
  float fStack_5d88;
  float fStack_5d84;
  undefined8 local_5d80;
  undefined8 uStack_5d78;
  undefined8 uStack_5d70;
  undefined8 uStack_5d68;
  float local_5d60;
  float fStack_5d5c;
  float fStack_5d58;
  float fStack_5d54;
  float fStack_5d50;
  float fStack_5d4c;
  float fStack_5d48;
  float fStack_5d44;
  undefined8 local_5d40;
  undefined8 uStack_5d38;
  undefined8 uStack_5d30;
  undefined8 uStack_5d28;
  float local_5d20;
  float fStack_5d1c;
  float fStack_5d18;
  float fStack_5d14;
  float fStack_5d10;
  float fStack_5d0c;
  float fStack_5d08;
  float fStack_5d04;
  undefined8 local_5d00;
  undefined8 uStack_5cf8;
  undefined8 uStack_5cf0;
  undefined8 uStack_5ce8;
  float local_5ce0;
  float fStack_5cdc;
  float fStack_5cd8;
  float fStack_5cd4;
  float fStack_5cd0;
  float fStack_5ccc;
  float fStack_5cc8;
  float fStack_5cc4;
  undefined8 local_5cc0;
  undefined8 uStack_5cb8;
  undefined8 uStack_5cb0;
  undefined8 uStack_5ca8;
  float local_5ca0;
  float fStack_5c9c;
  float fStack_5c98;
  float fStack_5c94;
  float fStack_5c90;
  float fStack_5c8c;
  float fStack_5c88;
  float fStack_5c84;
  undefined8 local_5c80;
  undefined8 uStack_5c78;
  undefined8 uStack_5c70;
  undefined8 uStack_5c68;
  float local_5c60;
  float fStack_5c5c;
  float fStack_5c58;
  float fStack_5c54;
  float fStack_5c50;
  float fStack_5c4c;
  float fStack_5c48;
  float fStack_5c44;
  undefined8 local_5c40;
  undefined8 uStack_5c38;
  undefined8 uStack_5c30;
  undefined8 uStack_5c28;
  float local_5c20;
  float fStack_5c1c;
  float fStack_5c18;
  float fStack_5c14;
  float fStack_5c10;
  float fStack_5c0c;
  float fStack_5c08;
  float fStack_5c04;
  undefined8 local_5c00;
  undefined8 uStack_5bf8;
  undefined8 uStack_5bf0;
  undefined8 uStack_5be8;
  float local_5be0;
  float fStack_5bdc;
  float fStack_5bd8;
  float fStack_5bd4;
  float fStack_5bd0;
  float fStack_5bcc;
  float fStack_5bc8;
  float fStack_5bc4;
  undefined8 local_5bc0;
  undefined8 uStack_5bb8;
  undefined8 uStack_5bb0;
  undefined8 uStack_5ba8;
  float local_5ba0;
  float fStack_5b9c;
  float fStack_5b98;
  float fStack_5b94;
  float fStack_5b90;
  float fStack_5b8c;
  float fStack_5b88;
  float fStack_5b84;
  undefined8 local_5b80;
  undefined8 uStack_5b78;
  undefined8 uStack_5b70;
  undefined8 uStack_5b68;
  float local_5b60;
  float fStack_5b5c;
  float fStack_5b58;
  float fStack_5b54;
  float fStack_5b50;
  float fStack_5b4c;
  float fStack_5b48;
  float fStack_5b44;
  undefined8 local_5b40;
  undefined8 uStack_5b38;
  undefined8 uStack_5b30;
  undefined8 uStack_5b28;
  float local_5b20;
  float fStack_5b1c;
  float fStack_5b18;
  float fStack_5b14;
  float fStack_5b10;
  float fStack_5b0c;
  float fStack_5b08;
  float fStack_5b04;
  undefined8 local_5b00;
  undefined8 uStack_5af8;
  undefined8 uStack_5af0;
  undefined8 uStack_5ae8;
  float local_5ae0;
  float fStack_5adc;
  float fStack_5ad8;
  float fStack_5ad4;
  float fStack_5ad0;
  float fStack_5acc;
  float fStack_5ac8;
  float fStack_5ac4;
  undefined8 local_5ac0;
  undefined8 uStack_5ab8;
  undefined8 uStack_5ab0;
  undefined8 uStack_5aa8;
  float local_5aa0;
  float fStack_5a9c;
  float fStack_5a98;
  float fStack_5a94;
  float fStack_5a90;
  float fStack_5a8c;
  float fStack_5a88;
  float fStack_5a84;
  undefined8 local_5a80;
  undefined8 uStack_5a78;
  undefined8 uStack_5a70;
  undefined8 uStack_5a68;
  float local_5a60;
  float fStack_5a5c;
  float fStack_5a58;
  float fStack_5a54;
  float fStack_5a50;
  float fStack_5a4c;
  float fStack_5a48;
  float fStack_5a44;
  undefined8 local_5a40;
  undefined8 uStack_5a38;
  undefined8 uStack_5a30;
  undefined8 uStack_5a28;
  float local_5a20;
  float fStack_5a1c;
  float fStack_5a18;
  float fStack_5a14;
  float fStack_5a10;
  float fStack_5a0c;
  float fStack_5a08;
  float fStack_5a04;
  undefined8 local_5a00;
  undefined8 uStack_59f8;
  undefined8 uStack_59f0;
  undefined8 uStack_59e8;
  float local_59e0;
  float fStack_59dc;
  float fStack_59d8;
  float fStack_59d4;
  float fStack_59d0;
  float fStack_59cc;
  float fStack_59c8;
  float fStack_59c4;
  undefined8 local_59c0;
  undefined8 uStack_59b8;
  undefined8 uStack_59b0;
  undefined8 uStack_59a8;
  float local_59a0;
  float fStack_599c;
  float fStack_5998;
  float fStack_5994;
  float fStack_5990;
  float fStack_598c;
  float fStack_5988;
  float fStack_5984;
  undefined8 local_5980;
  undefined8 uStack_5978;
  undefined8 uStack_5970;
  undefined8 uStack_5968;
  float local_5960;
  float fStack_595c;
  float fStack_5958;
  float fStack_5954;
  float fStack_5950;
  float fStack_594c;
  float fStack_5948;
  float fStack_5944;
  undefined8 local_5940;
  undefined8 uStack_5938;
  undefined8 uStack_5930;
  undefined8 uStack_5928;
  float local_5920;
  float fStack_591c;
  float fStack_5918;
  float fStack_5914;
  float fStack_5910;
  float fStack_590c;
  float fStack_5908;
  float fStack_5904;
  undefined8 local_5900;
  undefined8 uStack_58f8;
  undefined8 uStack_58f0;
  undefined8 uStack_58e8;
  float local_58e0;
  float fStack_58dc;
  float fStack_58d8;
  float fStack_58d4;
  float fStack_58d0;
  float fStack_58cc;
  float fStack_58c8;
  float fStack_58c4;
  undefined8 local_58c0;
  undefined8 uStack_58b8;
  undefined8 uStack_58b0;
  undefined8 uStack_58a8;
  float local_58a0;
  float fStack_589c;
  float fStack_5898;
  float fStack_5894;
  float fStack_5890;
  float fStack_588c;
  float fStack_5888;
  float fStack_5884;
  undefined8 local_5880;
  undefined8 uStack_5878;
  undefined8 uStack_5870;
  undefined8 uStack_5868;
  float local_5860;
  float fStack_585c;
  float fStack_5858;
  float fStack_5854;
  float fStack_5850;
  float fStack_584c;
  float fStack_5848;
  float fStack_5844;
  undefined8 local_5840;
  undefined8 uStack_5838;
  undefined8 uStack_5830;
  undefined8 uStack_5828;
  float local_5820;
  float fStack_581c;
  float fStack_5818;
  float fStack_5814;
  float fStack_5810;
  float fStack_580c;
  float fStack_5808;
  float fStack_5804;
  undefined8 local_5800;
  undefined8 uStack_57f8;
  undefined8 uStack_57f0;
  undefined8 uStack_57e8;
  float local_57e0;
  float fStack_57dc;
  float fStack_57d8;
  float fStack_57d4;
  float fStack_57d0;
  float fStack_57cc;
  float fStack_57c8;
  float fStack_57c4;
  undefined8 local_57c0;
  undefined8 uStack_57b8;
  undefined8 uStack_57b0;
  undefined8 uStack_57a8;
  float local_57a0;
  float fStack_579c;
  float fStack_5798;
  float fStack_5794;
  float fStack_5790;
  float fStack_578c;
  float fStack_5788;
  float fStack_5784;
  undefined8 local_5780;
  undefined8 uStack_5778;
  undefined8 uStack_5770;
  undefined8 uStack_5768;
  float local_5760;
  float fStack_575c;
  float fStack_5758;
  float fStack_5754;
  float fStack_5750;
  float fStack_574c;
  float fStack_5748;
  float fStack_5744;
  undefined8 local_5740;
  undefined8 uStack_5738;
  undefined8 uStack_5730;
  undefined8 uStack_5728;
  float local_5720;
  float fStack_571c;
  float fStack_5718;
  float fStack_5714;
  float fStack_5710;
  float fStack_570c;
  float fStack_5708;
  float fStack_5704;
  undefined8 local_5700;
  undefined8 uStack_56f8;
  undefined8 uStack_56f0;
  undefined8 uStack_56e8;
  float local_56e0;
  float fStack_56dc;
  float fStack_56d8;
  float fStack_56d4;
  float fStack_56d0;
  float fStack_56cc;
  float fStack_56c8;
  float fStack_56c4;
  undefined8 local_56c0;
  undefined8 uStack_56b8;
  undefined8 uStack_56b0;
  undefined8 uStack_56a8;
  float local_56a0;
  float fStack_569c;
  float fStack_5698;
  float fStack_5694;
  float fStack_5690;
  float fStack_568c;
  float fStack_5688;
  float fStack_5684;
  undefined8 local_5680;
  undefined8 uStack_5678;
  undefined8 uStack_5670;
  undefined8 uStack_5668;
  float local_5660;
  float fStack_565c;
  float fStack_5658;
  float fStack_5654;
  float fStack_5650;
  float fStack_564c;
  float fStack_5648;
  float fStack_5644;
  undefined8 local_5640;
  undefined8 uStack_5638;
  undefined8 uStack_5630;
  undefined8 uStack_5628;
  float local_5620;
  float fStack_561c;
  float fStack_5618;
  float fStack_5614;
  float fStack_5610;
  float fStack_560c;
  float fStack_5608;
  float fStack_5604;
  undefined8 local_5600;
  undefined8 uStack_55f8;
  undefined8 uStack_55f0;
  undefined8 uStack_55e8;
  float local_55e0;
  float fStack_55dc;
  float fStack_55d8;
  float fStack_55d4;
  float fStack_55d0;
  float fStack_55cc;
  float fStack_55c8;
  float fStack_55c4;
  undefined8 local_55c0;
  undefined8 uStack_55b8;
  undefined8 uStack_55b0;
  undefined8 uStack_55a8;
  float local_55a0;
  float fStack_559c;
  float fStack_5598;
  float fStack_5594;
  float fStack_5590;
  float fStack_558c;
  float fStack_5588;
  float fStack_5584;
  undefined8 local_5580;
  undefined8 uStack_5578;
  undefined8 uStack_5570;
  undefined8 uStack_5568;
  float local_5560;
  float fStack_555c;
  float fStack_5558;
  float fStack_5554;
  float fStack_5550;
  float fStack_554c;
  float fStack_5548;
  float fStack_5544;
  undefined8 local_5540;
  undefined8 uStack_5538;
  undefined8 uStack_5530;
  undefined8 uStack_5528;
  float local_5520;
  float fStack_551c;
  float fStack_5518;
  float fStack_5514;
  float fStack_5510;
  float fStack_550c;
  float fStack_5508;
  float fStack_5504;
  undefined8 local_5500;
  undefined8 uStack_54f8;
  undefined8 uStack_54f0;
  undefined8 uStack_54e8;
  float local_54e0;
  float fStack_54dc;
  float fStack_54d8;
  float fStack_54d4;
  float fStack_54d0;
  float fStack_54cc;
  float fStack_54c8;
  float fStack_54c4;
  undefined8 local_54c0;
  undefined8 uStack_54b8;
  undefined8 uStack_54b0;
  undefined8 uStack_54a8;
  float local_54a0;
  float fStack_549c;
  float fStack_5498;
  float fStack_5494;
  float fStack_5490;
  float fStack_548c;
  float fStack_5488;
  float fStack_5484;
  undefined8 local_5480;
  undefined8 uStack_5478;
  undefined8 uStack_5470;
  undefined8 uStack_5468;
  float local_5460;
  float fStack_545c;
  float fStack_5458;
  float fStack_5454;
  float fStack_5450;
  float fStack_544c;
  float fStack_5448;
  float fStack_5444;
  undefined8 local_5440;
  undefined8 uStack_5438;
  undefined8 uStack_5430;
  undefined8 uStack_5428;
  float local_5420;
  float fStack_541c;
  float fStack_5418;
  float fStack_5414;
  float fStack_5410;
  float fStack_540c;
  float fStack_5408;
  float fStack_5404;
  undefined8 local_5400;
  undefined8 uStack_53f8;
  undefined8 uStack_53f0;
  undefined8 uStack_53e8;
  float local_53e0;
  float fStack_53dc;
  float fStack_53d8;
  float fStack_53d4;
  float fStack_53d0;
  float fStack_53cc;
  float fStack_53c8;
  float fStack_53c4;
  undefined8 local_53c0;
  undefined8 uStack_53b8;
  undefined8 uStack_53b0;
  undefined8 uStack_53a8;
  float local_53a0;
  float fStack_539c;
  float fStack_5398;
  float fStack_5394;
  float fStack_5390;
  float fStack_538c;
  float fStack_5388;
  float fStack_5384;
  undefined8 local_5380;
  undefined8 uStack_5378;
  undefined8 uStack_5370;
  undefined8 uStack_5368;
  float local_5360;
  float fStack_535c;
  float fStack_5358;
  float fStack_5354;
  float fStack_5350;
  float fStack_534c;
  float fStack_5348;
  float fStack_5344;
  undefined8 local_5340;
  undefined8 uStack_5338;
  undefined8 uStack_5330;
  undefined8 uStack_5328;
  float local_5320;
  float fStack_531c;
  float fStack_5318;
  float fStack_5314;
  float fStack_5310;
  float fStack_530c;
  float fStack_5308;
  float fStack_5304;
  undefined8 local_5300;
  undefined8 uStack_52f8;
  undefined8 uStack_52f0;
  undefined8 uStack_52e8;
  float local_52e0;
  float fStack_52dc;
  float fStack_52d8;
  float fStack_52d4;
  float fStack_52d0;
  float fStack_52cc;
  float fStack_52c8;
  float fStack_52c4;
  undefined8 local_52c0;
  undefined8 uStack_52b8;
  undefined8 uStack_52b0;
  undefined8 uStack_52a8;
  float local_52a0;
  float fStack_529c;
  float fStack_5298;
  float fStack_5294;
  float fStack_5290;
  float fStack_528c;
  float fStack_5288;
  float fStack_5284;
  undefined8 local_5280;
  undefined8 uStack_5278;
  undefined8 uStack_5270;
  undefined8 uStack_5268;
  float local_5260;
  float fStack_525c;
  float fStack_5258;
  float fStack_5254;
  float fStack_5250;
  float fStack_524c;
  float fStack_5248;
  float fStack_5244;
  undefined8 local_5240;
  undefined8 uStack_5238;
  undefined8 uStack_5230;
  undefined8 uStack_5228;
  float local_5220;
  float fStack_521c;
  float fStack_5218;
  float fStack_5214;
  float fStack_5210;
  float fStack_520c;
  float fStack_5208;
  float fStack_5204;
  undefined8 local_5200;
  undefined8 uStack_51f8;
  undefined8 uStack_51f0;
  undefined8 uStack_51e8;
  float local_51e0;
  float fStack_51dc;
  float fStack_51d8;
  float fStack_51d4;
  float fStack_51d0;
  float fStack_51cc;
  float fStack_51c8;
  float fStack_51c4;
  undefined8 local_51c0;
  undefined8 uStack_51b8;
  undefined8 uStack_51b0;
  undefined8 uStack_51a8;
  float local_51a0;
  float fStack_519c;
  float fStack_5198;
  float fStack_5194;
  float fStack_5190;
  float fStack_518c;
  float fStack_5188;
  float fStack_5184;
  undefined8 local_5180;
  undefined8 uStack_5178;
  undefined8 uStack_5170;
  undefined8 uStack_5168;
  float local_5160;
  float fStack_515c;
  float fStack_5158;
  float fStack_5154;
  float fStack_5150;
  float fStack_514c;
  float fStack_5148;
  float fStack_5144;
  undefined8 local_5140;
  undefined8 uStack_5138;
  undefined8 uStack_5130;
  undefined8 uStack_5128;
  float local_5120;
  float fStack_511c;
  float fStack_5118;
  float fStack_5114;
  float fStack_5110;
  float fStack_510c;
  float fStack_5108;
  float fStack_5104;
  undefined8 local_5100;
  undefined8 uStack_50f8;
  undefined8 uStack_50f0;
  undefined8 uStack_50e8;
  float local_50e0;
  float fStack_50dc;
  float fStack_50d8;
  float fStack_50d4;
  float fStack_50d0;
  float fStack_50cc;
  float fStack_50c8;
  float fStack_50c4;
  undefined8 local_50c0;
  undefined8 uStack_50b8;
  undefined8 uStack_50b0;
  undefined8 uStack_50a8;
  float local_50a0;
  float fStack_509c;
  float fStack_5098;
  float fStack_5094;
  float fStack_5090;
  float fStack_508c;
  float fStack_5088;
  float fStack_5084;
  undefined8 local_5080;
  undefined8 uStack_5078;
  undefined8 uStack_5070;
  undefined8 uStack_5068;
  float local_5060;
  float fStack_505c;
  float fStack_5058;
  float fStack_5054;
  float fStack_5050;
  float fStack_504c;
  float fStack_5048;
  float fStack_5044;
  undefined8 local_5040;
  undefined8 uStack_5038;
  undefined8 uStack_5030;
  undefined8 uStack_5028;
  float local_5020;
  float fStack_501c;
  float fStack_5018;
  float fStack_5014;
  float fStack_5010;
  float fStack_500c;
  float fStack_5008;
  float fStack_5004;
  undefined8 local_5000;
  undefined8 uStack_4ff8;
  undefined8 uStack_4ff0;
  undefined8 uStack_4fe8;
  float local_4fe0;
  float fStack_4fdc;
  float fStack_4fd8;
  float fStack_4fd4;
  float fStack_4fd0;
  float fStack_4fcc;
  float fStack_4fc8;
  float fStack_4fc4;
  undefined8 local_4fc0;
  undefined8 uStack_4fb8;
  undefined8 uStack_4fb0;
  undefined8 uStack_4fa8;
  float local_4fa0;
  float fStack_4f9c;
  float fStack_4f98;
  float fStack_4f94;
  float fStack_4f90;
  float fStack_4f8c;
  float fStack_4f88;
  float fStack_4f84;
  undefined8 local_4f80;
  undefined8 uStack_4f78;
  undefined8 uStack_4f70;
  undefined8 uStack_4f68;
  float local_4f60;
  float fStack_4f5c;
  float fStack_4f58;
  float fStack_4f54;
  float fStack_4f50;
  float fStack_4f4c;
  float fStack_4f48;
  float fStack_4f44;
  undefined8 local_4f40;
  undefined8 uStack_4f38;
  undefined8 uStack_4f30;
  undefined8 uStack_4f28;
  float local_4f20;
  float fStack_4f1c;
  float fStack_4f18;
  float fStack_4f14;
  float fStack_4f10;
  float fStack_4f0c;
  float fStack_4f08;
  float fStack_4f04;
  undefined8 local_4f00;
  undefined8 uStack_4ef8;
  undefined8 uStack_4ef0;
  undefined8 uStack_4ee8;
  float local_4ee0;
  float fStack_4edc;
  float fStack_4ed8;
  float fStack_4ed4;
  float fStack_4ed0;
  float fStack_4ecc;
  float fStack_4ec8;
  float fStack_4ec4;
  undefined8 local_4ec0;
  undefined8 uStack_4eb8;
  undefined8 uStack_4eb0;
  undefined8 uStack_4ea8;
  float local_4ea0;
  float fStack_4e9c;
  float fStack_4e98;
  float fStack_4e94;
  float fStack_4e90;
  float fStack_4e8c;
  float fStack_4e88;
  float fStack_4e84;
  undefined8 local_4e80;
  undefined8 uStack_4e78;
  undefined8 uStack_4e70;
  undefined8 uStack_4e68;
  float local_4e60;
  float fStack_4e5c;
  float fStack_4e58;
  float fStack_4e54;
  float fStack_4e50;
  float fStack_4e4c;
  float fStack_4e48;
  float fStack_4e44;
  undefined8 local_4e40;
  undefined8 uStack_4e38;
  undefined8 uStack_4e30;
  undefined8 uStack_4e28;
  float local_4e20;
  float fStack_4e1c;
  float fStack_4e18;
  float fStack_4e14;
  float fStack_4e10;
  float fStack_4e0c;
  float fStack_4e08;
  float fStack_4e04;
  undefined8 local_4e00;
  undefined8 uStack_4df8;
  undefined8 uStack_4df0;
  undefined8 uStack_4de8;
  float local_4de0;
  float fStack_4ddc;
  float fStack_4dd8;
  float fStack_4dd4;
  float fStack_4dd0;
  float fStack_4dcc;
  float fStack_4dc8;
  float fStack_4dc4;
  undefined8 local_4dc0;
  undefined8 uStack_4db8;
  undefined8 uStack_4db0;
  undefined8 uStack_4da8;
  float local_4da0;
  float fStack_4d9c;
  float fStack_4d98;
  float fStack_4d94;
  float fStack_4d90;
  float fStack_4d8c;
  float fStack_4d88;
  float fStack_4d84;
  undefined8 local_4d80;
  undefined8 uStack_4d78;
  undefined8 uStack_4d70;
  undefined8 uStack_4d68;
  float local_4d60;
  float fStack_4d5c;
  float fStack_4d58;
  float fStack_4d54;
  float fStack_4d50;
  float fStack_4d4c;
  float fStack_4d48;
  float fStack_4d44;
  undefined8 local_4d40;
  undefined8 uStack_4d38;
  undefined8 uStack_4d30;
  undefined8 uStack_4d28;
  float local_4d20;
  float fStack_4d1c;
  float fStack_4d18;
  float fStack_4d14;
  float fStack_4d10;
  float fStack_4d0c;
  float fStack_4d08;
  float fStack_4d04;
  undefined8 local_4d00;
  undefined8 uStack_4cf8;
  undefined8 uStack_4cf0;
  undefined8 uStack_4ce8;
  float local_4ce0;
  float fStack_4cdc;
  float fStack_4cd8;
  float fStack_4cd4;
  float fStack_4cd0;
  float fStack_4ccc;
  float fStack_4cc8;
  float fStack_4cc4;
  undefined8 local_4cc0;
  undefined8 uStack_4cb8;
  undefined8 uStack_4cb0;
  undefined8 uStack_4ca8;
  float local_4ca0;
  float fStack_4c9c;
  float fStack_4c98;
  float fStack_4c94;
  float fStack_4c90;
  float fStack_4c8c;
  float fStack_4c88;
  float fStack_4c84;
  undefined8 local_4c80;
  undefined8 uStack_4c78;
  undefined8 uStack_4c70;
  undefined8 uStack_4c68;
  float local_4c60;
  float fStack_4c5c;
  float fStack_4c58;
  float fStack_4c54;
  float fStack_4c50;
  float fStack_4c4c;
  float fStack_4c48;
  float fStack_4c44;
  undefined8 local_4c40;
  undefined8 uStack_4c38;
  undefined8 uStack_4c30;
  undefined8 uStack_4c28;
  float local_4c20;
  float fStack_4c1c;
  float fStack_4c18;
  float fStack_4c14;
  float fStack_4c10;
  float fStack_4c0c;
  float fStack_4c08;
  float fStack_4c04;
  undefined8 local_4c00;
  undefined8 uStack_4bf8;
  undefined8 uStack_4bf0;
  undefined8 uStack_4be8;
  float local_4be0;
  float fStack_4bdc;
  float fStack_4bd8;
  float fStack_4bd4;
  float fStack_4bd0;
  float fStack_4bcc;
  float fStack_4bc8;
  float fStack_4bc4;
  undefined8 local_4bc0;
  undefined8 uStack_4bb8;
  undefined8 uStack_4bb0;
  undefined8 uStack_4ba8;
  float local_4ba0;
  float fStack_4b9c;
  float fStack_4b98;
  float fStack_4b94;
  float fStack_4b90;
  float fStack_4b8c;
  float fStack_4b88;
  float fStack_4b84;
  undefined8 local_4b80;
  undefined8 uStack_4b78;
  undefined8 uStack_4b70;
  undefined8 uStack_4b68;
  float local_4b60;
  float fStack_4b5c;
  float fStack_4b58;
  float fStack_4b54;
  float fStack_4b50;
  float fStack_4b4c;
  float fStack_4b48;
  float fStack_4b44;
  undefined8 local_4b40;
  undefined8 uStack_4b38;
  undefined8 uStack_4b30;
  undefined8 uStack_4b28;
  float local_4b20;
  float fStack_4b1c;
  float fStack_4b18;
  float fStack_4b14;
  float fStack_4b10;
  float fStack_4b0c;
  float fStack_4b08;
  float fStack_4b04;
  undefined8 local_4b00;
  undefined8 uStack_4af8;
  undefined8 uStack_4af0;
  undefined8 uStack_4ae8;
  float local_4ae0;
  float fStack_4adc;
  float fStack_4ad8;
  float fStack_4ad4;
  float fStack_4ad0;
  float fStack_4acc;
  float fStack_4ac8;
  float fStack_4ac4;
  undefined8 local_4ac0;
  undefined8 uStack_4ab8;
  undefined8 uStack_4ab0;
  undefined8 uStack_4aa8;
  float local_4aa0;
  float fStack_4a9c;
  float fStack_4a98;
  float fStack_4a94;
  float fStack_4a90;
  float fStack_4a8c;
  float fStack_4a88;
  float fStack_4a84;
  undefined8 local_4a80;
  undefined8 uStack_4a78;
  undefined8 uStack_4a70;
  undefined8 uStack_4a68;
  float local_4a60;
  float fStack_4a5c;
  float fStack_4a58;
  float fStack_4a54;
  float fStack_4a50;
  float fStack_4a4c;
  float fStack_4a48;
  float fStack_4a44;
  undefined8 local_4a40;
  undefined8 uStack_4a38;
  undefined8 uStack_4a30;
  undefined8 uStack_4a28;
  float local_4a20;
  float fStack_4a1c;
  float fStack_4a18;
  float fStack_4a14;
  float fStack_4a10;
  float fStack_4a0c;
  float fStack_4a08;
  float fStack_4a04;
  undefined8 local_4a00;
  undefined8 uStack_49f8;
  undefined8 uStack_49f0;
  undefined8 uStack_49e8;
  float local_49e0;
  float fStack_49dc;
  float fStack_49d8;
  float fStack_49d4;
  float fStack_49d0;
  float fStack_49cc;
  float fStack_49c8;
  float fStack_49c4;
  undefined8 local_49c0;
  undefined8 uStack_49b8;
  undefined8 uStack_49b0;
  undefined8 uStack_49a8;
  float local_49a0;
  float fStack_499c;
  float fStack_4998;
  float fStack_4994;
  float fStack_4990;
  float fStack_498c;
  float fStack_4988;
  float fStack_4984;
  undefined8 local_4980;
  undefined8 uStack_4978;
  undefined8 uStack_4970;
  undefined8 uStack_4968;
  float local_4960;
  float fStack_495c;
  float fStack_4958;
  float fStack_4954;
  float fStack_4950;
  float fStack_494c;
  float fStack_4948;
  float fStack_4944;
  undefined8 local_4940;
  undefined8 uStack_4938;
  undefined8 uStack_4930;
  undefined8 uStack_4928;
  float local_4920;
  float fStack_491c;
  float fStack_4918;
  float fStack_4914;
  float fStack_4910;
  float fStack_490c;
  float fStack_4908;
  float fStack_4904;
  undefined8 local_4900;
  undefined8 uStack_48f8;
  undefined8 uStack_48f0;
  undefined8 uStack_48e8;
  float local_48e0;
  float fStack_48dc;
  float fStack_48d8;
  float fStack_48d4;
  float fStack_48d0;
  float fStack_48cc;
  float fStack_48c8;
  float fStack_48c4;
  undefined8 local_48c0;
  undefined8 uStack_48b8;
  undefined8 uStack_48b0;
  undefined8 uStack_48a8;
  float local_48a0;
  float fStack_489c;
  float fStack_4898;
  float fStack_4894;
  float fStack_4890;
  float fStack_488c;
  float fStack_4888;
  float fStack_4884;
  undefined8 local_4880;
  undefined8 uStack_4878;
  undefined8 uStack_4870;
  undefined8 uStack_4868;
  float local_4860;
  float fStack_485c;
  float fStack_4858;
  float fStack_4854;
  float fStack_4850;
  float fStack_484c;
  float fStack_4848;
  float fStack_4844;
  undefined8 local_4840;
  undefined8 uStack_4838;
  undefined8 uStack_4830;
  undefined8 uStack_4828;
  float local_4820;
  float fStack_481c;
  float fStack_4818;
  float fStack_4814;
  float fStack_4810;
  float fStack_480c;
  float fStack_4808;
  float fStack_4804;
  undefined8 local_4800;
  undefined8 uStack_47f8;
  undefined8 uStack_47f0;
  undefined8 uStack_47e8;
  float local_47e0;
  float fStack_47dc;
  float fStack_47d8;
  float fStack_47d4;
  float fStack_47d0;
  float fStack_47cc;
  float fStack_47c8;
  float fStack_47c4;
  undefined8 local_47c0;
  undefined8 uStack_47b8;
  undefined8 uStack_47b0;
  undefined8 uStack_47a8;
  float local_47a0;
  float fStack_479c;
  float fStack_4798;
  float fStack_4794;
  float fStack_4790;
  float fStack_478c;
  float fStack_4788;
  float fStack_4784;
  undefined8 local_4780;
  undefined8 uStack_4778;
  undefined8 uStack_4770;
  undefined8 uStack_4768;
  float local_4760;
  float fStack_475c;
  float fStack_4758;
  float fStack_4754;
  float fStack_4750;
  float fStack_474c;
  float fStack_4748;
  float fStack_4744;
  undefined8 local_4740;
  undefined8 uStack_4738;
  undefined8 uStack_4730;
  undefined8 uStack_4728;
  float local_4720;
  float fStack_471c;
  float fStack_4718;
  float fStack_4714;
  float fStack_4710;
  float fStack_470c;
  float fStack_4708;
  float fStack_4704;
  undefined8 local_4700;
  undefined8 uStack_46f8;
  undefined8 uStack_46f0;
  undefined8 uStack_46e8;
  float local_46e0;
  float fStack_46dc;
  float fStack_46d8;
  float fStack_46d4;
  float fStack_46d0;
  float fStack_46cc;
  float fStack_46c8;
  float fStack_46c4;
  undefined8 local_46c0;
  undefined8 uStack_46b8;
  undefined8 uStack_46b0;
  undefined8 uStack_46a8;
  float local_46a0;
  float fStack_469c;
  float fStack_4698;
  float fStack_4694;
  float fStack_4690;
  float fStack_468c;
  float fStack_4688;
  float fStack_4684;
  undefined8 local_4680;
  undefined8 uStack_4678;
  undefined8 uStack_4670;
  undefined8 uStack_4668;
  float local_4660;
  float fStack_465c;
  float fStack_4658;
  float fStack_4654;
  float fStack_4650;
  float fStack_464c;
  float fStack_4648;
  float fStack_4644;
  undefined8 local_4640;
  undefined8 uStack_4638;
  undefined8 uStack_4630;
  undefined8 uStack_4628;
  float local_4620;
  float fStack_461c;
  float fStack_4618;
  float fStack_4614;
  float fStack_4610;
  float fStack_460c;
  float fStack_4608;
  float fStack_4604;
  undefined8 local_4600;
  undefined8 uStack_45f8;
  undefined8 uStack_45f0;
  undefined8 uStack_45e8;
  float local_45e0;
  float fStack_45dc;
  float fStack_45d8;
  float fStack_45d4;
  float fStack_45d0;
  float fStack_45cc;
  float fStack_45c8;
  float fStack_45c4;
  undefined8 local_45c0;
  undefined8 uStack_45b8;
  undefined8 uStack_45b0;
  undefined8 uStack_45a8;
  float local_45a0;
  float fStack_459c;
  float fStack_4598;
  float fStack_4594;
  float fStack_4590;
  float fStack_458c;
  float fStack_4588;
  float fStack_4584;
  undefined8 local_4580;
  undefined8 uStack_4578;
  undefined8 uStack_4570;
  undefined8 uStack_4568;
  float local_4560;
  float fStack_455c;
  float fStack_4558;
  float fStack_4554;
  float fStack_4550;
  float fStack_454c;
  float fStack_4548;
  float fStack_4544;
  undefined8 local_4540;
  undefined8 uStack_4538;
  undefined8 uStack_4530;
  undefined8 uStack_4528;
  float local_4520;
  float fStack_451c;
  float fStack_4518;
  float fStack_4514;
  float fStack_4510;
  float fStack_450c;
  float fStack_4508;
  float fStack_4504;
  undefined8 local_4500;
  undefined8 uStack_44f8;
  undefined8 uStack_44f0;
  undefined8 uStack_44e8;
  float local_44e0;
  float fStack_44dc;
  float fStack_44d8;
  float fStack_44d4;
  float fStack_44d0;
  float fStack_44cc;
  float fStack_44c8;
  float fStack_44c4;
  undefined8 local_44c0;
  undefined8 uStack_44b8;
  undefined8 uStack_44b0;
  undefined8 uStack_44a8;
  float local_44a0;
  float fStack_449c;
  float fStack_4498;
  float fStack_4494;
  float fStack_4490;
  float fStack_448c;
  float fStack_4488;
  float fStack_4484;
  undefined8 local_4480;
  undefined8 uStack_4478;
  undefined8 uStack_4470;
  undefined8 uStack_4468;
  float local_4460;
  float fStack_445c;
  float fStack_4458;
  float fStack_4454;
  float fStack_4450;
  float fStack_444c;
  float fStack_4448;
  float fStack_4444;
  undefined8 local_4440;
  undefined8 uStack_4438;
  undefined8 uStack_4430;
  undefined8 uStack_4428;
  float local_4420;
  float fStack_441c;
  float fStack_4418;
  float fStack_4414;
  float fStack_4410;
  float fStack_440c;
  float fStack_4408;
  float fStack_4404;
  undefined8 local_4400;
  undefined8 uStack_43f8;
  undefined8 uStack_43f0;
  undefined8 uStack_43e8;
  float local_43e0;
  float fStack_43dc;
  float fStack_43d8;
  float fStack_43d4;
  float fStack_43d0;
  float fStack_43cc;
  float fStack_43c8;
  float fStack_43c4;
  undefined8 local_43c0;
  undefined8 uStack_43b8;
  undefined8 uStack_43b0;
  undefined8 uStack_43a8;
  float local_43a0;
  float fStack_439c;
  float fStack_4398;
  float fStack_4394;
  float fStack_4390;
  float fStack_438c;
  float fStack_4388;
  float fStack_4384;
  undefined8 local_4380;
  undefined8 uStack_4378;
  undefined8 uStack_4370;
  undefined8 uStack_4368;
  float local_4360;
  float fStack_435c;
  float fStack_4358;
  float fStack_4354;
  float fStack_4350;
  float fStack_434c;
  float fStack_4348;
  float fStack_4344;
  undefined8 local_4340;
  undefined8 uStack_4338;
  undefined8 uStack_4330;
  undefined8 uStack_4328;
  float local_4320;
  float fStack_431c;
  float fStack_4318;
  float fStack_4314;
  float fStack_4310;
  float fStack_430c;
  float fStack_4308;
  float fStack_4304;
  undefined8 local_4300;
  undefined8 uStack_42f8;
  undefined8 uStack_42f0;
  undefined8 uStack_42e8;
  float local_42e0;
  float fStack_42dc;
  float fStack_42d8;
  float fStack_42d4;
  float fStack_42d0;
  float fStack_42cc;
  float fStack_42c8;
  float fStack_42c4;
  undefined8 local_42c0;
  undefined8 uStack_42b8;
  undefined8 uStack_42b0;
  undefined8 uStack_42a8;
  float local_42a0;
  float fStack_429c;
  float fStack_4298;
  float fStack_4294;
  float fStack_4290;
  float fStack_428c;
  float fStack_4288;
  float fStack_4284;
  undefined8 local_4280;
  undefined8 uStack_4278;
  undefined8 uStack_4270;
  undefined8 uStack_4268;
  float local_4260;
  float fStack_425c;
  float fStack_4258;
  float fStack_4254;
  float fStack_4250;
  float fStack_424c;
  float fStack_4248;
  float fStack_4244;
  undefined8 local_4240;
  undefined8 uStack_4238;
  undefined8 uStack_4230;
  undefined8 uStack_4228;
  float local_4220;
  float fStack_421c;
  float fStack_4218;
  float fStack_4214;
  float fStack_4210;
  float fStack_420c;
  float fStack_4208;
  float fStack_4204;
  undefined8 local_4200;
  undefined8 uStack_41f8;
  undefined8 uStack_41f0;
  undefined8 uStack_41e8;
  float local_41e0;
  float fStack_41dc;
  float fStack_41d8;
  float fStack_41d4;
  float fStack_41d0;
  float fStack_41cc;
  float fStack_41c8;
  float fStack_41c4;
  undefined8 local_41c0;
  undefined8 uStack_41b8;
  undefined8 uStack_41b0;
  undefined8 uStack_41a8;
  float local_41a0;
  float fStack_419c;
  float fStack_4198;
  float fStack_4194;
  float fStack_4190;
  float fStack_418c;
  float fStack_4188;
  float fStack_4184;
  undefined8 local_4180;
  undefined8 uStack_4178;
  undefined8 uStack_4170;
  undefined8 uStack_4168;
  float local_4160;
  float fStack_415c;
  float fStack_4158;
  float fStack_4154;
  float fStack_4150;
  float fStack_414c;
  float fStack_4148;
  float fStack_4144;
  undefined8 local_4140;
  undefined8 uStack_4138;
  undefined8 uStack_4130;
  undefined8 uStack_4128;
  float local_4120;
  float fStack_411c;
  float fStack_4118;
  float fStack_4114;
  float fStack_4110;
  float fStack_410c;
  float fStack_4108;
  float fStack_4104;
  undefined8 local_4100;
  undefined8 uStack_40f8;
  undefined8 uStack_40f0;
  undefined8 uStack_40e8;
  float local_40e0;
  float fStack_40dc;
  float fStack_40d8;
  float fStack_40d4;
  float fStack_40d0;
  float fStack_40cc;
  float fStack_40c8;
  float fStack_40c4;
  undefined8 local_40c0;
  undefined8 uStack_40b8;
  undefined8 uStack_40b0;
  undefined8 uStack_40a8;
  float local_40a0;
  float fStack_409c;
  float fStack_4098;
  float fStack_4094;
  float fStack_4090;
  float fStack_408c;
  float fStack_4088;
  float fStack_4084;
  undefined8 local_4080;
  undefined8 uStack_4078;
  undefined8 uStack_4070;
  undefined8 uStack_4068;
  float local_4060;
  float fStack_405c;
  float fStack_4058;
  float fStack_4054;
  float fStack_4050;
  float fStack_404c;
  float fStack_4048;
  float fStack_4044;
  undefined8 local_4040;
  undefined8 uStack_4038;
  undefined8 uStack_4030;
  undefined8 uStack_4028;
  float local_4020;
  float fStack_401c;
  float fStack_4018;
  float fStack_4014;
  float fStack_4010;
  float fStack_400c;
  float fStack_4008;
  float fStack_4004;
  undefined8 local_4000;
  undefined8 uStack_3ff8;
  undefined8 uStack_3ff0;
  undefined8 uStack_3fe8;
  float local_3fe0;
  float fStack_3fdc;
  float fStack_3fd8;
  float fStack_3fd4;
  float fStack_3fd0;
  float fStack_3fcc;
  float fStack_3fc8;
  float fStack_3fc4;
  undefined8 local_3fc0;
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  float local_3fa0;
  float fStack_3f9c;
  float fStack_3f98;
  float fStack_3f94;
  float fStack_3f90;
  float fStack_3f8c;
  float fStack_3f88;
  float fStack_3f84;
  undefined8 local_3f80;
  undefined8 uStack_3f78;
  undefined8 uStack_3f70;
  undefined8 uStack_3f68;
  float local_3f60;
  float fStack_3f5c;
  float fStack_3f58;
  float fStack_3f54;
  float fStack_3f50;
  float fStack_3f4c;
  float fStack_3f48;
  float fStack_3f44;
  undefined8 local_3f40;
  undefined8 uStack_3f38;
  undefined8 uStack_3f30;
  undefined8 uStack_3f28;
  float local_3f20;
  float fStack_3f1c;
  float fStack_3f18;
  float fStack_3f14;
  float fStack_3f10;
  float fStack_3f0c;
  float fStack_3f08;
  float fStack_3f04;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  float local_3ee0;
  float fStack_3edc;
  float fStack_3ed8;
  float fStack_3ed4;
  float fStack_3ed0;
  float fStack_3ecc;
  float fStack_3ec8;
  float fStack_3ec4;
  undefined8 local_3ec0;
  undefined8 uStack_3eb8;
  undefined8 uStack_3eb0;
  undefined8 uStack_3ea8;
  float local_3ea0;
  float fStack_3e9c;
  float fStack_3e98;
  float fStack_3e94;
  float fStack_3e90;
  float fStack_3e8c;
  float fStack_3e88;
  float fStack_3e84;
  undefined8 local_3e80;
  undefined8 uStack_3e78;
  undefined8 uStack_3e70;
  undefined8 uStack_3e68;
  float local_3e60;
  float fStack_3e5c;
  float fStack_3e58;
  float fStack_3e54;
  float fStack_3e50;
  float fStack_3e4c;
  float fStack_3e48;
  float fStack_3e44;
  undefined8 local_3e40;
  undefined8 uStack_3e38;
  undefined8 uStack_3e30;
  undefined8 uStack_3e28;
  float local_3e20;
  float fStack_3e1c;
  float fStack_3e18;
  float fStack_3e14;
  float fStack_3e10;
  float fStack_3e0c;
  float fStack_3e08;
  float fStack_3e04;
  undefined8 local_3e00;
  undefined8 uStack_3df8;
  undefined8 uStack_3df0;
  undefined8 uStack_3de8;
  float local_3de0;
  float fStack_3ddc;
  float fStack_3dd8;
  float fStack_3dd4;
  float fStack_3dd0;
  float fStack_3dcc;
  float fStack_3dc8;
  float fStack_3dc4;
  undefined8 local_3dc0;
  undefined8 uStack_3db8;
  undefined8 uStack_3db0;
  undefined8 uStack_3da8;
  float local_3da0;
  float fStack_3d9c;
  float fStack_3d98;
  float fStack_3d94;
  float fStack_3d90;
  float fStack_3d8c;
  float fStack_3d88;
  float fStack_3d84;
  undefined8 local_3d80;
  undefined8 uStack_3d78;
  undefined8 uStack_3d70;
  undefined8 uStack_3d68;
  float local_3d60;
  float fStack_3d5c;
  float fStack_3d58;
  float fStack_3d54;
  float fStack_3d50;
  float fStack_3d4c;
  float fStack_3d48;
  float fStack_3d44;
  undefined8 local_3d40;
  undefined8 uStack_3d38;
  undefined8 uStack_3d30;
  undefined8 uStack_3d28;
  float local_3d20;
  float fStack_3d1c;
  float fStack_3d18;
  float fStack_3d14;
  float fStack_3d10;
  float fStack_3d0c;
  float fStack_3d08;
  float fStack_3d04;
  undefined8 local_3d00;
  undefined8 uStack_3cf8;
  undefined8 uStack_3cf0;
  undefined8 uStack_3ce8;
  float local_3ce0;
  float fStack_3cdc;
  float fStack_3cd8;
  float fStack_3cd4;
  float fStack_3cd0;
  float fStack_3ccc;
  float fStack_3cc8;
  float fStack_3cc4;
  undefined8 local_3cc0;
  undefined8 uStack_3cb8;
  undefined8 uStack_3cb0;
  undefined8 uStack_3ca8;
  float local_3ca0;
  float fStack_3c9c;
  float fStack_3c98;
  float fStack_3c94;
  float fStack_3c90;
  float fStack_3c8c;
  float fStack_3c88;
  float fStack_3c84;
  undefined8 local_3c80;
  undefined8 uStack_3c78;
  undefined8 uStack_3c70;
  undefined8 uStack_3c68;
  float local_3c60;
  float fStack_3c5c;
  float fStack_3c58;
  float fStack_3c54;
  float fStack_3c50;
  float fStack_3c4c;
  float fStack_3c48;
  float fStack_3c44;
  undefined8 local_3c40;
  undefined8 uStack_3c38;
  undefined8 uStack_3c30;
  undefined8 uStack_3c28;
  float local_3c20;
  float fStack_3c1c;
  float fStack_3c18;
  float fStack_3c14;
  float fStack_3c10;
  float fStack_3c0c;
  float fStack_3c08;
  float fStack_3c04;
  undefined8 local_3c00;
  undefined8 uStack_3bf8;
  undefined8 uStack_3bf0;
  undefined8 uStack_3be8;
  float local_3be0;
  float fStack_3bdc;
  float fStack_3bd8;
  float fStack_3bd4;
  float fStack_3bd0;
  float fStack_3bcc;
  float fStack_3bc8;
  float fStack_3bc4;
  undefined8 local_3bc0;
  undefined8 uStack_3bb8;
  undefined8 uStack_3bb0;
  undefined8 uStack_3ba8;
  float local_3ba0;
  float fStack_3b9c;
  float fStack_3b98;
  float fStack_3b94;
  float fStack_3b90;
  float fStack_3b8c;
  float fStack_3b88;
  float fStack_3b84;
  undefined8 local_3b80;
  undefined8 uStack_3b78;
  undefined8 uStack_3b70;
  undefined8 uStack_3b68;
  float local_3b60;
  float fStack_3b5c;
  float fStack_3b58;
  float fStack_3b54;
  float fStack_3b50;
  float fStack_3b4c;
  float fStack_3b48;
  float fStack_3b44;
  undefined8 local_3b40;
  undefined8 uStack_3b38;
  undefined8 uStack_3b30;
  undefined8 uStack_3b28;
  float local_3b20;
  float fStack_3b1c;
  float fStack_3b18;
  float fStack_3b14;
  float fStack_3b10;
  float fStack_3b0c;
  float fStack_3b08;
  float fStack_3b04;
  undefined8 local_3b00;
  undefined8 uStack_3af8;
  undefined8 uStack_3af0;
  undefined8 uStack_3ae8;
  float local_3ae0;
  float fStack_3adc;
  float fStack_3ad8;
  float fStack_3ad4;
  float fStack_3ad0;
  float fStack_3acc;
  float fStack_3ac8;
  float fStack_3ac4;
  undefined8 local_3ac0;
  undefined8 uStack_3ab8;
  undefined8 uStack_3ab0;
  undefined8 uStack_3aa8;
  float local_3aa0;
  float fStack_3a9c;
  float fStack_3a98;
  float fStack_3a94;
  float fStack_3a90;
  float fStack_3a8c;
  float fStack_3a88;
  float fStack_3a84;
  undefined8 local_3a80;
  undefined8 uStack_3a78;
  undefined8 uStack_3a70;
  undefined8 uStack_3a68;
  float local_3a60;
  float fStack_3a5c;
  float fStack_3a58;
  float fStack_3a54;
  float fStack_3a50;
  float fStack_3a4c;
  float fStack_3a48;
  float fStack_3a44;
  undefined8 local_3a40;
  undefined8 uStack_3a38;
  undefined8 uStack_3a30;
  undefined8 uStack_3a28;
  float local_3a20;
  float fStack_3a1c;
  float fStack_3a18;
  float fStack_3a14;
  float fStack_3a10;
  float fStack_3a0c;
  float fStack_3a08;
  float fStack_3a04;
  undefined8 local_3a00;
  undefined8 uStack_39f8;
  undefined8 uStack_39f0;
  undefined8 uStack_39e8;
  float local_39e0;
  float fStack_39dc;
  float fStack_39d8;
  float fStack_39d4;
  float fStack_39d0;
  float fStack_39cc;
  float fStack_39c8;
  float fStack_39c4;
  undefined8 local_39c0;
  undefined8 uStack_39b8;
  undefined8 uStack_39b0;
  undefined8 uStack_39a8;
  float local_39a0;
  float fStack_399c;
  float fStack_3998;
  float fStack_3994;
  float fStack_3990;
  float fStack_398c;
  float fStack_3988;
  float fStack_3984;
  undefined8 local_3980;
  undefined8 uStack_3978;
  undefined8 uStack_3970;
  undefined8 uStack_3968;
  float local_3960;
  float fStack_395c;
  float fStack_3958;
  float fStack_3954;
  float fStack_3950;
  float fStack_394c;
  float fStack_3948;
  float fStack_3944;
  undefined8 local_3940;
  undefined8 uStack_3938;
  undefined8 uStack_3930;
  undefined8 uStack_3928;
  float local_3920;
  float fStack_391c;
  float fStack_3918;
  float fStack_3914;
  float fStack_3910;
  float fStack_390c;
  float fStack_3908;
  float fStack_3904;
  undefined8 local_3900;
  undefined8 uStack_38f8;
  undefined8 uStack_38f0;
  undefined8 uStack_38e8;
  float local_38e0;
  float fStack_38dc;
  float fStack_38d8;
  float fStack_38d4;
  float fStack_38d0;
  float fStack_38cc;
  float fStack_38c8;
  float fStack_38c4;
  undefined8 local_38c0;
  undefined8 uStack_38b8;
  undefined8 uStack_38b0;
  undefined8 uStack_38a8;
  float local_38a0;
  float fStack_389c;
  float fStack_3898;
  float fStack_3894;
  float fStack_3890;
  float fStack_388c;
  float fStack_3888;
  float fStack_3884;
  undefined8 local_3880;
  undefined8 uStack_3878;
  undefined8 uStack_3870;
  undefined8 uStack_3868;
  float local_3860;
  float fStack_385c;
  float fStack_3858;
  float fStack_3854;
  float fStack_3850;
  float fStack_384c;
  float fStack_3848;
  float fStack_3844;
  undefined8 local_3840;
  undefined8 uStack_3838;
  undefined8 uStack_3830;
  undefined8 uStack_3828;
  float local_3820;
  float fStack_381c;
  float fStack_3818;
  float fStack_3814;
  float fStack_3810;
  float fStack_380c;
  float fStack_3808;
  float fStack_3804;
  undefined8 local_3800;
  undefined8 uStack_37f8;
  undefined8 uStack_37f0;
  undefined8 uStack_37e8;
  float local_37e0;
  float fStack_37dc;
  float fStack_37d8;
  float fStack_37d4;
  float fStack_37d0;
  float fStack_37cc;
  float fStack_37c8;
  float fStack_37c4;
  undefined8 local_37c0;
  undefined8 uStack_37b8;
  undefined8 uStack_37b0;
  undefined8 uStack_37a8;
  float local_37a0;
  float fStack_379c;
  float fStack_3798;
  float fStack_3794;
  float fStack_3790;
  float fStack_378c;
  float fStack_3788;
  float fStack_3784;
  undefined8 local_3780;
  undefined8 uStack_3778;
  undefined8 uStack_3770;
  undefined8 uStack_3768;
  float local_3760;
  float fStack_375c;
  float fStack_3758;
  float fStack_3754;
  float fStack_3750;
  float fStack_374c;
  float fStack_3748;
  float fStack_3744;
  undefined8 local_3740;
  undefined8 uStack_3738;
  undefined8 uStack_3730;
  undefined8 uStack_3728;
  float local_3720;
  float fStack_371c;
  float fStack_3718;
  float fStack_3714;
  float fStack_3710;
  float fStack_370c;
  float fStack_3708;
  float fStack_3704;
  undefined8 local_3700;
  undefined8 uStack_36f8;
  undefined8 uStack_36f0;
  undefined8 uStack_36e8;
  float local_36e0;
  float fStack_36dc;
  float fStack_36d8;
  float fStack_36d4;
  float fStack_36d0;
  float fStack_36cc;
  float fStack_36c8;
  float fStack_36c4;
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  float local_36a0;
  float fStack_369c;
  float fStack_3698;
  float fStack_3694;
  float fStack_3690;
  float fStack_368c;
  float fStack_3688;
  float fStack_3684;
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  float local_3660;
  float fStack_365c;
  float fStack_3658;
  float fStack_3654;
  float fStack_3650;
  float fStack_364c;
  float fStack_3648;
  float fStack_3644;
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  float local_3620;
  float fStack_361c;
  float fStack_3618;
  float fStack_3614;
  float fStack_3610;
  float fStack_360c;
  float fStack_3608;
  float fStack_3604;
  undefined8 local_3600;
  undefined8 uStack_35f8;
  undefined8 uStack_35f0;
  undefined8 uStack_35e8;
  float local_35e0;
  float fStack_35dc;
  float fStack_35d8;
  float fStack_35d4;
  float fStack_35d0;
  float fStack_35cc;
  float fStack_35c8;
  float fStack_35c4;
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 uStack_35b0;
  undefined8 uStack_35a8;
  float local_35a0;
  float fStack_359c;
  float fStack_3598;
  float fStack_3594;
  float fStack_3590;
  float fStack_358c;
  float fStack_3588;
  float fStack_3584;
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  float local_3560;
  float fStack_355c;
  float fStack_3558;
  float fStack_3554;
  float fStack_3550;
  float fStack_354c;
  float fStack_3548;
  float fStack_3544;
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 uStack_3530;
  undefined8 uStack_3528;
  float local_3520;
  float fStack_351c;
  float fStack_3518;
  float fStack_3514;
  float fStack_3510;
  float fStack_350c;
  float fStack_3508;
  float fStack_3504;
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  float local_34e0;
  float fStack_34dc;
  float fStack_34d8;
  float fStack_34d4;
  float fStack_34d0;
  float fStack_34cc;
  float fStack_34c8;
  float fStack_34c4;
  undefined8 local_34c0;
  undefined8 uStack_34b8;
  undefined8 uStack_34b0;
  undefined8 uStack_34a8;
  float local_34a0;
  float fStack_349c;
  float fStack_3498;
  float fStack_3494;
  float fStack_3490;
  float fStack_348c;
  float fStack_3488;
  float fStack_3484;
  undefined8 local_3480;
  undefined8 uStack_3478;
  undefined8 uStack_3470;
  undefined8 uStack_3468;
  float local_3460;
  float fStack_345c;
  float fStack_3458;
  float fStack_3454;
  float fStack_3450;
  float fStack_344c;
  float fStack_3448;
  float fStack_3444;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  float local_3420;
  float fStack_341c;
  float fStack_3418;
  float fStack_3414;
  float fStack_3410;
  float fStack_340c;
  float fStack_3408;
  float fStack_3404;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  float local_33e0;
  float fStack_33dc;
  float fStack_33d8;
  float fStack_33d4;
  float fStack_33d0;
  float fStack_33cc;
  float fStack_33c8;
  float fStack_33c4;
  undefined8 local_33c0;
  undefined8 uStack_33b8;
  undefined8 uStack_33b0;
  undefined8 uStack_33a8;
  float local_33a0;
  float fStack_339c;
  float fStack_3398;
  float fStack_3394;
  float fStack_3390;
  float fStack_338c;
  float fStack_3388;
  float fStack_3384;
  undefined8 local_3380;
  undefined8 uStack_3378;
  undefined8 uStack_3370;
  undefined8 uStack_3368;
  float local_3360;
  float fStack_335c;
  float fStack_3358;
  float fStack_3354;
  float fStack_3350;
  float fStack_334c;
  float fStack_3348;
  float fStack_3344;
  undefined8 local_3340;
  undefined8 uStack_3338;
  undefined8 uStack_3330;
  undefined8 uStack_3328;
  float local_3320;
  float fStack_331c;
  float fStack_3318;
  float fStack_3314;
  float fStack_3310;
  float fStack_330c;
  float fStack_3308;
  float fStack_3304;
  undefined8 local_3300;
  undefined8 uStack_32f8;
  undefined8 uStack_32f0;
  undefined8 uStack_32e8;
  float local_32e0;
  float fStack_32dc;
  float fStack_32d8;
  float fStack_32d4;
  float fStack_32d0;
  float fStack_32cc;
  float fStack_32c8;
  float fStack_32c4;
  undefined8 local_32c0;
  undefined8 uStack_32b8;
  undefined8 uStack_32b0;
  undefined8 uStack_32a8;
  float local_32a0;
  float fStack_329c;
  float fStack_3298;
  float fStack_3294;
  float fStack_3290;
  float fStack_328c;
  float fStack_3288;
  float fStack_3284;
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 uStack_3270;
  undefined8 uStack_3268;
  float local_3260;
  float fStack_325c;
  float fStack_3258;
  float fStack_3254;
  float fStack_3250;
  float fStack_324c;
  float fStack_3248;
  float fStack_3244;
  undefined8 local_3240;
  undefined8 uStack_3238;
  undefined8 uStack_3230;
  undefined8 uStack_3228;
  float local_3220;
  float fStack_321c;
  float fStack_3218;
  float fStack_3214;
  float fStack_3210;
  float fStack_320c;
  float fStack_3208;
  float fStack_3204;
  undefined8 local_3200;
  undefined8 uStack_31f8;
  undefined8 uStack_31f0;
  undefined8 uStack_31e8;
  float local_31e0;
  float fStack_31dc;
  float fStack_31d8;
  float fStack_31d4;
  float fStack_31d0;
  float fStack_31cc;
  float fStack_31c8;
  float fStack_31c4;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  float local_31a0;
  float fStack_319c;
  float fStack_3198;
  float fStack_3194;
  float fStack_3190;
  float fStack_318c;
  float fStack_3188;
  float fStack_3184;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  float local_3160;
  float fStack_315c;
  float fStack_3158;
  float fStack_3154;
  float fStack_3150;
  float fStack_314c;
  float fStack_3148;
  float fStack_3144;
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  float local_3120;
  float fStack_311c;
  float fStack_3118;
  float fStack_3114;
  float fStack_3110;
  float fStack_310c;
  float fStack_3108;
  float fStack_3104;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  float local_30e0;
  float fStack_30dc;
  float fStack_30d8;
  float fStack_30d4;
  float fStack_30d0;
  float fStack_30cc;
  float fStack_30c8;
  float fStack_30c4;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  float local_30a0;
  float fStack_309c;
  float fStack_3098;
  float fStack_3094;
  float fStack_3090;
  float fStack_308c;
  float fStack_3088;
  float fStack_3084;
  undefined8 local_3080;
  undefined8 uStack_3078;
  undefined8 uStack_3070;
  undefined8 uStack_3068;
  float local_3060;
  float fStack_305c;
  float fStack_3058;
  float fStack_3054;
  float fStack_3050;
  float fStack_304c;
  float fStack_3048;
  float fStack_3044;
  undefined8 local_3040;
  undefined8 uStack_3038;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  float local_3020;
  float fStack_301c;
  float fStack_3018;
  float fStack_3014;
  float fStack_3010;
  float fStack_300c;
  float fStack_3008;
  float fStack_3004;
  undefined8 local_3000;
  undefined8 uStack_2ff8;
  undefined8 uStack_2ff0;
  undefined8 uStack_2fe8;
  float local_2fe0;
  float fStack_2fdc;
  float fStack_2fd8;
  float fStack_2fd4;
  float fStack_2fd0;
  float fStack_2fcc;
  float fStack_2fc8;
  float fStack_2fc4;
  undefined8 local_2fc0;
  undefined8 uStack_2fb8;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  float local_2fa0;
  float fStack_2f9c;
  float fStack_2f98;
  float fStack_2f94;
  float fStack_2f90;
  float fStack_2f8c;
  float fStack_2f88;
  float fStack_2f84;
  undefined8 local_2f80;
  undefined8 uStack_2f78;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  float local_2f60;
  float fStack_2f5c;
  float fStack_2f58;
  float fStack_2f54;
  float fStack_2f50;
  float fStack_2f4c;
  float fStack_2f48;
  float fStack_2f44;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  float local_2f20;
  float fStack_2f1c;
  float fStack_2f18;
  float fStack_2f14;
  float fStack_2f10;
  float fStack_2f0c;
  float fStack_2f08;
  float fStack_2f04;
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  float local_2ee0;
  float fStack_2edc;
  float fStack_2ed8;
  float fStack_2ed4;
  float fStack_2ed0;
  float fStack_2ecc;
  float fStack_2ec8;
  float fStack_2ec4;
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 uStack_2eb0;
  undefined8 uStack_2ea8;
  float local_2ea0;
  float fStack_2e9c;
  float fStack_2e98;
  float fStack_2e94;
  float fStack_2e90;
  float fStack_2e8c;
  float fStack_2e88;
  float fStack_2e84;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  float local_2e60;
  float fStack_2e5c;
  float fStack_2e58;
  float fStack_2e54;
  float fStack_2e50;
  float fStack_2e4c;
  float fStack_2e48;
  float fStack_2e44;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  float local_2e20;
  float fStack_2e1c;
  float fStack_2e18;
  float fStack_2e14;
  float fStack_2e10;
  float fStack_2e0c;
  float fStack_2e08;
  float fStack_2e04;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  float local_2de0;
  float fStack_2ddc;
  float fStack_2dd8;
  float fStack_2dd4;
  float fStack_2dd0;
  float fStack_2dcc;
  float fStack_2dc8;
  float fStack_2dc4;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  float local_2da0;
  float fStack_2d9c;
  float fStack_2d98;
  float fStack_2d94;
  float fStack_2d90;
  float fStack_2d8c;
  float fStack_2d88;
  float fStack_2d84;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  float local_2d60;
  float fStack_2d5c;
  float fStack_2d58;
  float fStack_2d54;
  float fStack_2d50;
  float fStack_2d4c;
  float fStack_2d48;
  float fStack_2d44;
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  float local_2d20;
  float fStack_2d1c;
  float fStack_2d18;
  float fStack_2d14;
  float fStack_2d10;
  float fStack_2d0c;
  float fStack_2d08;
  float fStack_2d04;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  float local_2ce0;
  float fStack_2cdc;
  float fStack_2cd8;
  float fStack_2cd4;
  float fStack_2cd0;
  float fStack_2ccc;
  float fStack_2cc8;
  float fStack_2cc4;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  float local_2ca0;
  float fStack_2c9c;
  float fStack_2c98;
  float fStack_2c94;
  float fStack_2c90;
  float fStack_2c8c;
  float fStack_2c88;
  float fStack_2c84;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  float local_2c60;
  float fStack_2c5c;
  float fStack_2c58;
  float fStack_2c54;
  float fStack_2c50;
  float fStack_2c4c;
  float fStack_2c48;
  float fStack_2c44;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  float local_2c20;
  float fStack_2c1c;
  float fStack_2c18;
  float fStack_2c14;
  float fStack_2c10;
  float fStack_2c0c;
  float fStack_2c08;
  float fStack_2c04;
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  float local_2be0;
  float fStack_2bdc;
  float fStack_2bd8;
  float fStack_2bd4;
  float fStack_2bd0;
  float fStack_2bcc;
  float fStack_2bc8;
  float fStack_2bc4;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  float local_2ba0;
  float fStack_2b9c;
  float fStack_2b98;
  float fStack_2b94;
  float fStack_2b90;
  float fStack_2b8c;
  float fStack_2b88;
  float fStack_2b84;
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  float local_2b60;
  float fStack_2b5c;
  float fStack_2b58;
  float fStack_2b54;
  float fStack_2b50;
  float fStack_2b4c;
  float fStack_2b48;
  float fStack_2b44;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  float local_2b20;
  float fStack_2b1c;
  float fStack_2b18;
  float fStack_2b14;
  float fStack_2b10;
  float fStack_2b0c;
  float fStack_2b08;
  float fStack_2b04;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  float local_2ae0;
  float fStack_2adc;
  float fStack_2ad8;
  float fStack_2ad4;
  float fStack_2ad0;
  float fStack_2acc;
  float fStack_2ac8;
  float fStack_2ac4;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  float local_2aa0;
  float fStack_2a9c;
  float fStack_2a98;
  float fStack_2a94;
  float fStack_2a90;
  float fStack_2a8c;
  float fStack_2a88;
  float fStack_2a84;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  float local_2a60;
  float fStack_2a5c;
  float fStack_2a58;
  float fStack_2a54;
  float fStack_2a50;
  float fStack_2a4c;
  float fStack_2a48;
  float fStack_2a44;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  float local_2a20;
  float fStack_2a1c;
  float fStack_2a18;
  float fStack_2a14;
  float fStack_2a10;
  float fStack_2a0c;
  float fStack_2a08;
  float fStack_2a04;
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  float local_29e0;
  float fStack_29dc;
  float fStack_29d8;
  float fStack_29d4;
  float fStack_29d0;
  float fStack_29cc;
  float fStack_29c8;
  float fStack_29c4;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  float local_29a0;
  float fStack_299c;
  float fStack_2998;
  float fStack_2994;
  float fStack_2990;
  float fStack_298c;
  float fStack_2988;
  float fStack_2984;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  float local_2960;
  float fStack_295c;
  float fStack_2958;
  float fStack_2954;
  float fStack_2950;
  float fStack_294c;
  float fStack_2948;
  float fStack_2944;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  float local_2920;
  float fStack_291c;
  float fStack_2918;
  float fStack_2914;
  float fStack_2910;
  float fStack_290c;
  float fStack_2908;
  float fStack_2904;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  float local_28e0;
  float fStack_28dc;
  float fStack_28d8;
  float fStack_28d4;
  float fStack_28d0;
  float fStack_28cc;
  float fStack_28c8;
  float fStack_28c4;
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  float local_28a0;
  float fStack_289c;
  float fStack_2898;
  float fStack_2894;
  float fStack_2890;
  float fStack_288c;
  float fStack_2888;
  float fStack_2884;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  float local_2860;
  float fStack_285c;
  float fStack_2858;
  float fStack_2854;
  float fStack_2850;
  float fStack_284c;
  float fStack_2848;
  float fStack_2844;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  float local_2820;
  float fStack_281c;
  float fStack_2818;
  float fStack_2814;
  float fStack_2810;
  float fStack_280c;
  float fStack_2808;
  float fStack_2804;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  float local_27e0;
  float fStack_27dc;
  float fStack_27d8;
  float fStack_27d4;
  float fStack_27d0;
  float fStack_27cc;
  float fStack_27c8;
  float fStack_27c4;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  float local_27a0;
  float fStack_279c;
  float fStack_2798;
  float fStack_2794;
  float fStack_2790;
  float fStack_278c;
  float fStack_2788;
  float fStack_2784;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  float local_2760;
  float fStack_275c;
  float fStack_2758;
  float fStack_2754;
  float fStack_2750;
  float fStack_274c;
  float fStack_2748;
  float fStack_2744;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  float local_2720;
  float fStack_271c;
  float fStack_2718;
  float fStack_2714;
  float fStack_2710;
  float fStack_270c;
  float fStack_2708;
  float fStack_2704;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  float local_26e0;
  float fStack_26dc;
  float fStack_26d8;
  float fStack_26d4;
  float fStack_26d0;
  float fStack_26cc;
  float fStack_26c8;
  float fStack_26c4;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  float local_26a0;
  float fStack_269c;
  float fStack_2698;
  float fStack_2694;
  float fStack_2690;
  float fStack_268c;
  float fStack_2688;
  float fStack_2684;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  float local_2660;
  float fStack_265c;
  float fStack_2658;
  float fStack_2654;
  float fStack_2650;
  float fStack_264c;
  float fStack_2648;
  float fStack_2644;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  float local_2620;
  float fStack_261c;
  float fStack_2618;
  float fStack_2614;
  float fStack_2610;
  float fStack_260c;
  float fStack_2608;
  float fStack_2604;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  float local_25e0;
  float fStack_25dc;
  float fStack_25d8;
  float fStack_25d4;
  float fStack_25d0;
  float fStack_25cc;
  float fStack_25c8;
  float fStack_25c4;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  float local_25a0;
  float fStack_259c;
  float fStack_2598;
  float fStack_2594;
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  float fStack_2584;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  float local_2560;
  float fStack_255c;
  float fStack_2558;
  float fStack_2554;
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  float fStack_2544;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  float local_2520;
  float fStack_251c;
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  float fStack_2504;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  float local_24e0;
  float fStack_24dc;
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  float fStack_24c4;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  float local_24a0;
  float fStack_249c;
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  float fStack_2484;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  float local_2460;
  float fStack_245c;
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  float local_2420;
  float fStack_241c;
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  float fStack_2404;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  float local_23e0;
  float fStack_23dc;
  float fStack_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  float fStack_23c4;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  float local_23a0;
  float fStack_239c;
  float fStack_2398;
  float fStack_2394;
  float fStack_2390;
  float fStack_238c;
  float fStack_2388;
  float fStack_2384;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  float local_2360;
  float fStack_235c;
  float fStack_2358;
  float fStack_2354;
  float fStack_2350;
  float fStack_234c;
  float fStack_2348;
  float fStack_2344;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  float local_2320;
  float fStack_231c;
  float fStack_2318;
  float fStack_2314;
  float fStack_2310;
  float fStack_230c;
  float fStack_2308;
  float fStack_2304;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  float local_22e0;
  float fStack_22dc;
  float fStack_22d8;
  float fStack_22d4;
  float fStack_22d0;
  float fStack_22cc;
  float fStack_22c8;
  float fStack_22c4;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  float local_22a0;
  float fStack_229c;
  float fStack_2298;
  float fStack_2294;
  float fStack_2290;
  float fStack_228c;
  float fStack_2288;
  float fStack_2284;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  float local_2260;
  float fStack_225c;
  float fStack_2258;
  float fStack_2254;
  float fStack_2250;
  float fStack_224c;
  float fStack_2248;
  float fStack_2244;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  float local_2220;
  float fStack_221c;
  float fStack_2218;
  float fStack_2214;
  float fStack_2210;
  float fStack_220c;
  float fStack_2208;
  float fStack_2204;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  float local_21e0;
  float fStack_21dc;
  float fStack_21d8;
  float fStack_21d4;
  float fStack_21d0;
  float fStack_21cc;
  float fStack_21c8;
  float fStack_21c4;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  float local_21a0;
  float fStack_219c;
  float fStack_2198;
  float fStack_2194;
  float fStack_2190;
  float fStack_218c;
  float fStack_2188;
  float fStack_2184;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  float local_2160;
  float fStack_215c;
  float fStack_2158;
  float fStack_2154;
  float fStack_2150;
  float fStack_214c;
  float fStack_2148;
  float fStack_2144;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  float local_2120;
  float fStack_211c;
  float fStack_2118;
  float fStack_2114;
  float fStack_2110;
  float fStack_210c;
  float fStack_2108;
  float fStack_2104;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  float local_20e0;
  float fStack_20dc;
  float fStack_20d8;
  float fStack_20d4;
  float fStack_20d0;
  float fStack_20cc;
  float fStack_20c8;
  float fStack_20c4;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  float local_20a0;
  float fStack_209c;
  float fStack_2098;
  float fStack_2094;
  float fStack_2090;
  float fStack_208c;
  float fStack_2088;
  float fStack_2084;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  float local_2060;
  float fStack_205c;
  float fStack_2058;
  float fStack_2054;
  float fStack_2050;
  float fStack_204c;
  float fStack_2048;
  float fStack_2044;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  float local_2020;
  float fStack_201c;
  float fStack_2018;
  float fStack_2014;
  float fStack_2010;
  float fStack_200c;
  float fStack_2008;
  float fStack_2004;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  float local_1fe0;
  float fStack_1fdc;
  float fStack_1fd8;
  float fStack_1fd4;
  float fStack_1fd0;
  float fStack_1fcc;
  float fStack_1fc8;
  float fStack_1fc4;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  float local_1fa0;
  float fStack_1f9c;
  float fStack_1f98;
  float fStack_1f94;
  float fStack_1f90;
  float fStack_1f8c;
  float fStack_1f88;
  float fStack_1f84;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  float local_1f60;
  float fStack_1f5c;
  float fStack_1f58;
  float fStack_1f54;
  float fStack_1f50;
  float fStack_1f4c;
  float fStack_1f48;
  float fStack_1f44;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  float local_1f20;
  float fStack_1f1c;
  float fStack_1f18;
  float fStack_1f14;
  float fStack_1f10;
  float fStack_1f0c;
  float fStack_1f08;
  float fStack_1f04;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  float local_1ee0;
  float fStack_1edc;
  float fStack_1ed8;
  float fStack_1ed4;
  float fStack_1ed0;
  float fStack_1ecc;
  float fStack_1ec8;
  float fStack_1ec4;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  float local_1ea0;
  float fStack_1e9c;
  float fStack_1e98;
  float fStack_1e94;
  float fStack_1e90;
  float fStack_1e8c;
  float fStack_1e88;
  float fStack_1e84;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  float local_1e60;
  float fStack_1e5c;
  float fStack_1e58;
  float fStack_1e54;
  float fStack_1e50;
  float fStack_1e4c;
  float fStack_1e48;
  float fStack_1e44;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  float local_1e20;
  float fStack_1e1c;
  float fStack_1e18;
  float fStack_1e14;
  float fStack_1e10;
  float fStack_1e0c;
  float fStack_1e08;
  float fStack_1e04;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  float local_1de0;
  float fStack_1ddc;
  float fStack_1dd8;
  float fStack_1dd4;
  float fStack_1dd0;
  float fStack_1dcc;
  float fStack_1dc8;
  float fStack_1dc4;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  float local_1da0;
  float fStack_1d9c;
  float fStack_1d98;
  float fStack_1d94;
  float fStack_1d90;
  float fStack_1d8c;
  float fStack_1d88;
  float fStack_1d84;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  float local_1d60;
  float fStack_1d5c;
  float fStack_1d58;
  float fStack_1d54;
  float fStack_1d50;
  float fStack_1d4c;
  float fStack_1d48;
  float fStack_1d44;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  float local_1d20;
  float fStack_1d1c;
  float fStack_1d18;
  float fStack_1d14;
  float fStack_1d10;
  float fStack_1d0c;
  float fStack_1d08;
  float fStack_1d04;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  float local_1ce0;
  float fStack_1cdc;
  float fStack_1cd8;
  float fStack_1cd4;
  float fStack_1cd0;
  float fStack_1ccc;
  float fStack_1cc8;
  float fStack_1cc4;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  float local_1ca0;
  float fStack_1c9c;
  float fStack_1c98;
  float fStack_1c94;
  float fStack_1c90;
  float fStack_1c8c;
  float fStack_1c88;
  float fStack_1c84;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  float local_1c60;
  float fStack_1c5c;
  float fStack_1c58;
  float fStack_1c54;
  float fStack_1c50;
  float fStack_1c4c;
  float fStack_1c48;
  float fStack_1c44;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  float local_1c20;
  float fStack_1c1c;
  float fStack_1c18;
  float fStack_1c14;
  float fStack_1c10;
  float fStack_1c0c;
  float fStack_1c08;
  float fStack_1c04;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  float local_1be0;
  float fStack_1bdc;
  float fStack_1bd8;
  float fStack_1bd4;
  float fStack_1bd0;
  float fStack_1bcc;
  float fStack_1bc8;
  float fStack_1bc4;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  float local_1ba0;
  float fStack_1b9c;
  float fStack_1b98;
  float fStack_1b94;
  float fStack_1b90;
  float fStack_1b8c;
  float fStack_1b88;
  float fStack_1b84;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  float local_1b60;
  float fStack_1b5c;
  float fStack_1b58;
  float fStack_1b54;
  float fStack_1b50;
  float fStack_1b4c;
  float fStack_1b48;
  float fStack_1b44;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  float local_1b20;
  float fStack_1b1c;
  float fStack_1b18;
  float fStack_1b14;
  float fStack_1b10;
  float fStack_1b0c;
  float fStack_1b08;
  float fStack_1b04;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  float local_1ae0;
  float fStack_1adc;
  float fStack_1ad8;
  float fStack_1ad4;
  float fStack_1ad0;
  float fStack_1acc;
  float fStack_1ac8;
  float fStack_1ac4;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  float local_1aa0;
  float fStack_1a9c;
  float fStack_1a98;
  float fStack_1a94;
  float fStack_1a90;
  float fStack_1a8c;
  float fStack_1a88;
  float fStack_1a84;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  float local_1a60;
  float fStack_1a5c;
  float fStack_1a58;
  float fStack_1a54;
  float fStack_1a50;
  float fStack_1a4c;
  float fStack_1a48;
  float fStack_1a44;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  float local_1a20;
  float fStack_1a1c;
  float fStack_1a18;
  float fStack_1a14;
  float fStack_1a10;
  float fStack_1a0c;
  float fStack_1a08;
  float fStack_1a04;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  float local_19e0;
  float fStack_19dc;
  float fStack_19d8;
  float fStack_19d4;
  float fStack_19d0;
  float fStack_19cc;
  float fStack_19c8;
  float fStack_19c4;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  float local_19a0;
  float fStack_199c;
  float fStack_1998;
  float fStack_1994;
  float fStack_1990;
  float fStack_198c;
  float fStack_1988;
  float fStack_1984;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  float local_1960;
  float fStack_195c;
  float fStack_1958;
  float fStack_1954;
  float fStack_1950;
  float fStack_194c;
  float fStack_1948;
  float fStack_1944;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  float local_1920;
  float fStack_191c;
  float fStack_1918;
  float fStack_1914;
  float fStack_1910;
  float fStack_190c;
  float fStack_1908;
  float fStack_1904;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  float local_18e0;
  float fStack_18dc;
  float fStack_18d8;
  float fStack_18d4;
  float fStack_18d0;
  float fStack_18cc;
  float fStack_18c8;
  float fStack_18c4;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  float local_18a0;
  float fStack_189c;
  float fStack_1898;
  float fStack_1894;
  float fStack_1890;
  float fStack_188c;
  float fStack_1888;
  float fStack_1884;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  float local_1860;
  float fStack_185c;
  float fStack_1858;
  float fStack_1854;
  float fStack_1850;
  float fStack_184c;
  float fStack_1848;
  float fStack_1844;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  float local_1820;
  float fStack_181c;
  float fStack_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  float fStack_1808;
  float fStack_1804;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  float local_17e0;
  float fStack_17dc;
  float fStack_17d8;
  float fStack_17d4;
  float fStack_17d0;
  float fStack_17cc;
  float fStack_17c8;
  float fStack_17c4;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  float local_17a0;
  float fStack_179c;
  float fStack_1798;
  float fStack_1794;
  float fStack_1790;
  float fStack_178c;
  float fStack_1788;
  float fStack_1784;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  float local_1760;
  float fStack_175c;
  float fStack_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float fStack_1748;
  float fStack_1744;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  float local_1720;
  float fStack_171c;
  float fStack_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float fStack_1708;
  float fStack_1704;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  float local_16e0;
  float fStack_16dc;
  float fStack_16d8;
  float fStack_16d4;
  float fStack_16d0;
  float fStack_16cc;
  float fStack_16c8;
  float fStack_16c4;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  float local_16a0;
  float fStack_169c;
  float fStack_1698;
  float fStack_1694;
  float fStack_1690;
  float fStack_168c;
  float fStack_1688;
  float fStack_1684;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  float local_1660;
  float fStack_165c;
  float fStack_1658;
  float fStack_1654;
  float fStack_1650;
  float fStack_164c;
  float fStack_1648;
  float fStack_1644;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  float local_1620;
  float fStack_161c;
  float fStack_1618;
  float fStack_1614;
  float fStack_1610;
  float fStack_160c;
  float fStack_1608;
  float fStack_1604;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  float local_15e0;
  float fStack_15dc;
  float fStack_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float fStack_15c8;
  float fStack_15c4;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  float local_15a0;
  float fStack_159c;
  float fStack_1598;
  float fStack_1594;
  float fStack_1590;
  float fStack_158c;
  float fStack_1588;
  float fStack_1584;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  float local_1560;
  float fStack_155c;
  float fStack_1558;
  float fStack_1554;
  float fStack_1550;
  float fStack_154c;
  float fStack_1548;
  float fStack_1544;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  float local_1520;
  float fStack_151c;
  float fStack_1518;
  float fStack_1514;
  float fStack_1510;
  float fStack_150c;
  float fStack_1508;
  float fStack_1504;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  float local_14e0;
  float fStack_14dc;
  float fStack_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  float local_14a0;
  float fStack_149c;
  float fStack_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  float fStack_1488;
  float fStack_1484;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  float local_1460;
  float fStack_145c;
  float fStack_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float fStack_1448;
  float fStack_1444;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  float local_1360;
  float fStack_135c;
  float fStack_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float fStack_1348;
  float fStack_1344;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  float local_1320;
  float fStack_131c;
  float fStack_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  float fStack_1308;
  float fStack_1304;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  float local_12e0;
  float fStack_12dc;
  float fStack_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  float local_1260;
  float fStack_125c;
  float fStack_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  float local_1220;
  float fStack_121c;
  float fStack_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float fStack_11c8;
  float fStack_11c4;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  float fStack_1184;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  float fStack_1144;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  float local_1120;
  float fStack_111c;
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  float fStack_1104;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  float fStack_10c4;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  float local_10a0;
  float fStack_109c;
  float fStack_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  float fStack_1084;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  float fStack_1044;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  float local_1020;
  float fStack_101c;
  float fStack_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  float fStack_1004;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  float local_fe0;
  float fStack_fdc;
  float fStack_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float fStack_fc8;
  float fStack_fc4;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  float local_fa0;
  float fStack_f9c;
  float fStack_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float fStack_f88;
  float fStack_f84;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  float local_f60;
  float fStack_f5c;
  float fStack_f58;
  float fStack_f54;
  float fStack_f50;
  float fStack_f4c;
  float fStack_f48;
  float fStack_f44;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  float local_f20;
  float fStack_f1c;
  float fStack_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  float fStack_f08;
  float fStack_f04;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  float local_ee0;
  float fStack_edc;
  float fStack_ed8;
  float fStack_ed4;
  float fStack_ed0;
  float fStack_ecc;
  float fStack_ec8;
  float fStack_ec4;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  float local_ea0;
  float fStack_e9c;
  float fStack_e98;
  float fStack_e94;
  float fStack_e90;
  float fStack_e8c;
  float fStack_e88;
  float fStack_e84;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  float local_e60;
  float fStack_e5c;
  float fStack_e58;
  float fStack_e54;
  float fStack_e50;
  float fStack_e4c;
  float fStack_e48;
  float fStack_e44;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  float local_e20;
  float fStack_e1c;
  float fStack_e18;
  float fStack_e14;
  float fStack_e10;
  float fStack_e0c;
  float fStack_e08;
  float fStack_e04;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  float local_de0;
  float fStack_ddc;
  float fStack_dd8;
  float fStack_dd4;
  float fStack_dd0;
  float fStack_dcc;
  float fStack_dc8;
  float fStack_dc4;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  float local_da0;
  float fStack_d9c;
  float fStack_d98;
  float fStack_d94;
  float fStack_d90;
  float fStack_d8c;
  float fStack_d88;
  float fStack_d84;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  float local_d60;
  float fStack_d5c;
  float fStack_d58;
  float fStack_d54;
  float fStack_d50;
  float fStack_d4c;
  float fStack_d48;
  float fStack_d44;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  float local_d20;
  float fStack_d1c;
  float fStack_d18;
  float fStack_d14;
  float fStack_d10;
  float fStack_d0c;
  float fStack_d08;
  float fStack_d04;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  float local_ce0;
  float fStack_cdc;
  float fStack_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  float fStack_cc8;
  float fStack_cc4;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  float local_ca0;
  float fStack_c9c;
  float fStack_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float fStack_c88;
  float fStack_c84;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  float local_c60;
  float fStack_c5c;
  float fStack_c58;
  float fStack_c54;
  float fStack_c50;
  float fStack_c4c;
  float fStack_c48;
  float fStack_c44;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  float local_c20;
  float fStack_c1c;
  float fStack_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  float fStack_c08;
  float fStack_c04;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  float local_be0;
  float fStack_bdc;
  float fStack_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float fStack_bc8;
  float fStack_bc4;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  float local_ba0;
  float fStack_b9c;
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  float local_b60;
  float fStack_b5c;
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  float fStack_b04;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  float local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  float local_7e0;
  float fStack_7dc;
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined4 local_e0;
  undefined4 local_dc;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined1 local_c0 [32];
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined1 local_80 [32];
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  local_c0f4 = *(int *)(in_RDI + 0x38);
  local_c0f8 = *(int *)(in_RSI + 0x2c);
  local_c0fc = *(int *)(in_RSI + 0x30);
  local_c100 = *(int *)(in_RSI + 0x38);
  local_c108 = Mat::operator_cast_to_float_(in_RCX);
  local_c10c = local_c100 >> 1;
  local_c110 = local_c10c << 1;
  for (local_c114 = 0; local_c114 < local_c10c; local_c114 = local_c114 + 1) {
    local_c118 = local_c114 * 2;
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffff12f4,in_stack_ffffffffffff12f0),
                 (int)in_stack_ffffffffffff12ec);
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffff12f4,in_stack_ffffffffffff12f0),
                 (int)in_stack_ffffffffffff12ec);
    if (local_c108 == (float *)0x0) {
      local_c0bc = 0;
      local_c4 = 0;
      local_c8 = 0;
      local_cc = 0;
      local_d0 = 0;
      local_d4 = 0;
      local_d8 = 0;
      local_dc = 0;
      local_e0 = 0;
      auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
      auVar77._16_16_ = auVar1;
      auVar77._0_16_ = auVar2;
      local_100._0_8_ = auVar2._0_8_;
      local_100._8_8_ = auVar2._8_8_;
      local_100._16_8_ = auVar1._0_8_;
      local_100._24_8_ = auVar1._8_8_;
      local_d480 = local_100._0_8_;
      uStack_d478 = local_100._8_8_;
      uStack_d470 = local_100._16_8_;
      uStack_d468 = local_100._24_8_;
      local_100 = auVar77;
    }
    else {
      local_bf28 = local_c108 + (local_c118 << 3);
      local_d480 = *(undefined8 *)local_bf28;
      uStack_d478 = *(undefined8 *)(local_bf28 + 2);
      uStack_d470 = *(undefined8 *)(local_bf28 + 4);
      uStack_d468 = *(undefined8 *)(local_bf28 + 6);
    }
    local_c1e0 = local_d480;
    uStack_c1d8 = uStack_d478;
    uStack_c1d0 = uStack_d470;
    uStack_c1c8 = uStack_d468;
    if (local_c108 == (float *)0x0) {
      local_c0c0 = 0;
      local_84 = 0;
      local_88 = 0;
      local_8c = 0;
      local_90 = 0;
      local_94 = 0;
      local_98 = 0;
      local_9c = 0;
      local_a0 = 0;
      auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
      auVar78._16_16_ = auVar1;
      auVar78._0_16_ = auVar2;
      local_c0._0_8_ = auVar2._0_8_;
      local_c0._8_8_ = auVar2._8_8_;
      local_c0._16_8_ = auVar1._0_8_;
      local_c0._24_8_ = auVar1._8_8_;
      local_d4e0 = local_c0._0_8_;
      uStack_d4d8 = local_c0._8_8_;
      uStack_d4d0 = local_c0._16_8_;
      uStack_d4c8 = local_c0._24_8_;
      local_c0 = auVar78;
    }
    else {
      local_bf30 = local_c108 + (local_c118 + 1) * 8;
      local_d4e0 = *(undefined8 *)local_bf30;
      uStack_d4d8 = *(undefined8 *)(local_bf30 + 2);
      uStack_d4d0 = *(undefined8 *)(local_bf30 + 4);
      uStack_d4c8 = *(undefined8 *)(local_bf30 + 6);
    }
    local_c200 = local_d4e0;
    uStack_c1f8 = uStack_d4d8;
    uStack_c1f0 = uStack_d4d0;
    uStack_c1e8 = uStack_d4c8;
    _v[1] = in_stack_ffffffffffff12dc;
    _v[0] = in_stack_ffffffffffff12d8;
    _v[2] = in_stack_ffffffffffff12e0;
    _v[3] = in_stack_ffffffffffff12e4;
    _v[4] = in_stack_ffffffffffff12e8;
    _v[5] = in_stack_ffffffffffff12ec;
    _v[6] = in_stack_ffffffffffff12f0;
    _v[7] = in_stack_ffffffffffff12f4;
    Mat::fill((Mat *)CONCAT44(in_stack_ffffffffffff1314,in_stack_ffffffffffff1310),_v);
    _v_00[1] = in_stack_ffffffffffff12dc;
    _v_00[0] = in_stack_ffffffffffff12d8;
    _v_00[2] = in_stack_ffffffffffff12e0;
    _v_00[3] = in_stack_ffffffffffff12e4;
    _v_00[4] = in_stack_ffffffffffff12e8;
    _v_00[5] = in_stack_ffffffffffff12ec;
    _v_00[6] = in_stack_ffffffffffff12f0;
    _v_00[7] = in_stack_ffffffffffff12f4;
    Mat::fill((Mat *)CONCAT44(in_stack_ffffffffffff1314,in_stack_ffffffffffff1310),_v_00);
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffff12f4,in_stack_ffffffffffff12f0),
                 (int)in_stack_ffffffffffff12ec);
    pfVar75 = Mat::operator_cast_to_float_(&local_c250);
    Mat::~Mat((Mat *)0x313681);
    local_c208 = pfVar75;
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffff12f4,in_stack_ffffffffffff12f0),
                 (int)in_stack_ffffffffffff12ec);
    pfVar75 = Mat::operator_cast_to_float_(&local_c2a0);
    Mat::~Mat((Mat *)0x3136d5);
    local_c258 = pfVar75;
    for (local_c2a4 = 0; local_c2a4 < local_c0f4; local_c2a4 = local_c2a4 + 1) {
      local_c2b0 = Mat::operator_cast_to_float_(&local_c160);
      local_c2b8 = Mat::operator_cast_to_float_(&local_c1a8);
      Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffff12f4,in_stack_ffffffffffff12f0),
                   (int)in_stack_ffffffffffff12ec);
      local_c308 = Mat::row(&local_c300,0);
      local_c310 = Mat::row(&local_c300,1);
      local_c318 = Mat::row(&local_c300,2);
      local_bf38 = local_c208;
      local_c340 = *(undefined8 *)local_c208;
      uStack_c338 = *(undefined8 *)(local_c208 + 2);
      uStack_c330 = *(undefined8 *)(local_c208 + 4);
      uStack_c328 = *(undefined8 *)(local_c208 + 6);
      local_bf40 = local_c208 + 8;
      local_c360 = *(undefined8 *)local_bf40;
      uStack_c358 = *(undefined8 *)(local_c208 + 10);
      uStack_c350 = *(undefined8 *)(local_c208 + 0xc);
      uStack_c348 = *(undefined8 *)(local_c208 + 0xe);
      local_bf48 = local_c208 + 0x10;
      local_c380 = *(undefined8 *)local_bf48;
      uStack_c378 = *(undefined8 *)(local_c208 + 0x12);
      uStack_c370 = *(undefined8 *)(local_c208 + 0x14);
      uStack_c368 = *(undefined8 *)(local_c208 + 0x16);
      local_bf50 = local_c208 + 0x18;
      local_c3a0 = *(undefined8 *)local_bf50;
      uStack_c398 = *(undefined8 *)(local_c208 + 0x1a);
      uStack_c390 = *(undefined8 *)(local_c208 + 0x1c);
      uStack_c388 = *(undefined8 *)(local_c208 + 0x1e);
      local_bf58 = local_c208 + 0x20;
      local_c3c0 = *(undefined8 *)local_bf58;
      uStack_c3b8 = *(undefined8 *)(local_c208 + 0x22);
      uStack_c3b0 = *(undefined8 *)(local_c208 + 0x24);
      uStack_c3a8 = *(undefined8 *)(local_c208 + 0x26);
      local_bf60 = local_c208 + 0x28;
      local_c3e0 = *(undefined8 *)local_bf60;
      uStack_c3d8 = *(undefined8 *)(local_c208 + 0x2a);
      uStack_c3d0 = *(undefined8 *)(local_c208 + 0x2c);
      uStack_c3c8 = *(undefined8 *)(local_c208 + 0x2e);
      local_bf68 = local_c208 + 0x30;
      local_c400 = *(undefined8 *)local_bf68;
      uStack_c3f8 = *(undefined8 *)(local_c208 + 0x32);
      uStack_c3f0 = *(undefined8 *)(local_c208 + 0x34);
      uStack_c3e8 = *(undefined8 *)(local_c208 + 0x36);
      local_bf70 = local_c208 + 0x38;
      local_c420 = *(undefined8 *)local_bf70;
      uStack_c418 = *(undefined8 *)(local_c208 + 0x3a);
      uStack_c410 = *(undefined8 *)(local_c208 + 0x3c);
      uStack_c408 = *(undefined8 *)(local_c208 + 0x3e);
      local_bf78 = local_c208 + 0x40;
      local_c440 = *(undefined8 *)local_bf78;
      uStack_c438 = *(undefined8 *)(local_c208 + 0x42);
      uStack_c430 = *(undefined8 *)(local_c208 + 0x44);
      uStack_c428 = *(undefined8 *)(local_c208 + 0x46);
      local_bf80 = local_c258;
      local_c460 = *(undefined8 *)local_c258;
      uStack_c458 = *(undefined8 *)(local_c258 + 2);
      uStack_c450 = *(undefined8 *)(local_c258 + 4);
      uStack_c448 = *(undefined8 *)(local_c258 + 6);
      local_bf88 = local_c258 + 8;
      local_c480 = *(undefined8 *)local_bf88;
      uStack_c478 = *(undefined8 *)(local_c258 + 10);
      uStack_c470 = *(undefined8 *)(local_c258 + 0xc);
      uStack_c468 = *(undefined8 *)(local_c258 + 0xe);
      local_bf90 = local_c258 + 0x10;
      local_c4a0 = *(undefined8 *)local_bf90;
      uStack_c498 = *(undefined8 *)(local_c258 + 0x12);
      uStack_c490 = *(undefined8 *)(local_c258 + 0x14);
      uStack_c488 = *(undefined8 *)(local_c258 + 0x16);
      local_bf98 = local_c258 + 0x18;
      local_c4c0 = *(undefined8 *)local_bf98;
      uStack_c4b8 = *(undefined8 *)(local_c258 + 0x1a);
      uStack_c4b0 = *(undefined8 *)(local_c258 + 0x1c);
      uStack_c4a8 = *(undefined8 *)(local_c258 + 0x1e);
      local_bfa0 = local_c258 + 0x20;
      local_c4e0 = *(undefined8 *)local_bfa0;
      uStack_c4d8 = *(undefined8 *)(local_c258 + 0x22);
      uStack_c4d0 = *(undefined8 *)(local_c258 + 0x24);
      uStack_c4c8 = *(undefined8 *)(local_c258 + 0x26);
      local_bfa8 = local_c258 + 0x28;
      local_c500 = *(undefined8 *)local_bfa8;
      uStack_c4f8 = *(undefined8 *)(local_c258 + 0x2a);
      uStack_c4f0 = *(undefined8 *)(local_c258 + 0x2c);
      uStack_c4e8 = *(undefined8 *)(local_c258 + 0x2e);
      local_bfb0 = local_c258 + 0x30;
      local_c520 = *(undefined8 *)local_bfb0;
      uStack_c518 = *(undefined8 *)(local_c258 + 0x32);
      uStack_c510 = *(undefined8 *)(local_c258 + 0x34);
      uStack_c508 = *(undefined8 *)(local_c258 + 0x36);
      local_bfb8 = local_c258 + 0x38;
      local_c540 = *(undefined8 *)local_bfb8;
      uStack_c538 = *(undefined8 *)(local_c258 + 0x3a);
      uStack_c530 = *(undefined8 *)(local_c258 + 0x3c);
      uStack_c528 = *(undefined8 *)(local_c258 + 0x3e);
      local_bfc0 = local_c258 + 0x40;
      local_c560 = *(undefined8 *)local_bfc0;
      uStack_c558 = *(undefined8 *)(local_c258 + 0x42);
      uStack_c550 = *(undefined8 *)(local_c258 + 0x44);
      uStack_c548 = *(undefined8 *)(local_c258 + 0x46);
      for (local_c564 = 0; local_c564 < local_c0fc; local_c564 = local_c564 + 1) {
        local_c568 = 0;
        while( true ) {
          uVar74 = uStack_5b28;
          uVar73 = uStack_5b30;
          uVar72 = uStack_5b38;
          uVar71 = local_5b40;
          uVar70 = uStack_5b68;
          uVar69 = uStack_5b70;
          uVar68 = uStack_5b78;
          uVar67 = local_5b80;
          uVar66 = uStack_5ba8;
          uVar65 = uStack_5bb0;
          uVar64 = uStack_5bb8;
          uVar63 = local_5bc0;
          uVar62 = uStack_5be8;
          uVar61 = uStack_5bf0;
          uVar60 = uStack_5bf8;
          uVar59 = local_5c00;
          uVar58 = uStack_5c28;
          uVar57 = uStack_5c30;
          uVar56 = uStack_5c38;
          uVar55 = local_5c40;
          uVar54 = uStack_5c68;
          uVar53 = uStack_5c70;
          uVar52 = uStack_5c78;
          uVar51 = local_5c80;
          uVar50 = uStack_5ca8;
          uVar49 = uStack_5cb0;
          uVar48 = uStack_5cb8;
          uVar47 = local_5cc0;
          uVar46 = uStack_5ce8;
          uVar45 = uStack_5cf0;
          uVar44 = uStack_5cf8;
          uVar43 = local_5d00;
          uVar42 = uStack_5d28;
          uVar41 = uStack_5d30;
          uVar40 = uStack_5d38;
          uVar39 = local_5d40;
          uVar38 = uStack_5d68;
          uVar37 = uStack_5d70;
          uVar36 = uStack_5d78;
          uVar35 = local_5d80;
          uVar34 = uStack_5da8;
          uVar33 = uStack_5db0;
          uVar32 = uStack_5db8;
          uVar31 = local_5dc0;
          uVar30 = uStack_5de8;
          uVar29 = uStack_5df0;
          uVar28 = uStack_5df8;
          uVar27 = local_5e00;
          uVar26 = uStack_5e28;
          uVar25 = uStack_5e30;
          uVar24 = uStack_5e38;
          uVar23 = local_5e40;
          uVar22 = uStack_5e68;
          uVar21 = uStack_5e70;
          uVar20 = uStack_5e78;
          uVar19 = local_5e80;
          uVar18 = uStack_5ea8;
          uVar17 = uStack_5eb0;
          uVar16 = uStack_5eb8;
          uVar15 = local_5ec0;
          uVar14 = uStack_5ee8;
          uVar13 = uStack_5ef0;
          uVar12 = uStack_5ef8;
          uVar11 = local_5f00;
          uVar10 = uStack_5f28;
          uVar9 = uStack_5f30;
          uVar8 = uStack_5f38;
          uVar7 = local_5f40;
          uVar6 = uStack_5f68;
          uVar5 = uStack_5f70;
          uVar4 = uStack_5f78;
          uVar3 = local_5f80;
          local_5f80._0_4_ = (float)local_c340;
          local_5f80._4_4_ = (float)((ulong)local_c340 >> 0x20);
          uStack_5f78._0_4_ = (float)uStack_c338;
          uStack_5f78._4_4_ = (float)((ulong)uStack_c338 >> 0x20);
          uStack_5f70._0_4_ = (float)uStack_c330;
          uStack_5f70._4_4_ = (float)((ulong)uStack_c330 >> 0x20);
          local_5f40._0_4_ = (float)local_c360;
          local_5f40._4_4_ = (float)((ulong)local_c360 >> 0x20);
          uStack_5f38._0_4_ = (float)uStack_c358;
          uStack_5f38._4_4_ = (float)((ulong)uStack_c358 >> 0x20);
          uStack_5f30._0_4_ = (float)uStack_c350;
          uStack_5f30._4_4_ = (float)((ulong)uStack_c350 >> 0x20);
          local_5f00._0_4_ = (float)local_c380;
          local_5f00._4_4_ = (float)((ulong)local_c380 >> 0x20);
          uStack_5ef8._0_4_ = (float)uStack_c378;
          uStack_5ef8._4_4_ = (float)((ulong)uStack_c378 >> 0x20);
          uStack_5ef0._0_4_ = (float)uStack_c370;
          uStack_5ef0._4_4_ = (float)((ulong)uStack_c370 >> 0x20);
          local_5ec0._0_4_ = (float)local_c3a0;
          local_5ec0._4_4_ = (float)((ulong)local_c3a0 >> 0x20);
          uStack_5eb8._0_4_ = (float)uStack_c398;
          uStack_5eb8._4_4_ = (float)((ulong)uStack_c398 >> 0x20);
          uStack_5eb0._0_4_ = (float)uStack_c390;
          uStack_5eb0._4_4_ = (float)((ulong)uStack_c390 >> 0x20);
          local_5e80._0_4_ = (float)local_c3c0;
          local_5e80._4_4_ = (float)((ulong)local_c3c0 >> 0x20);
          uStack_5e78._0_4_ = (float)uStack_c3b8;
          uStack_5e78._4_4_ = (float)((ulong)uStack_c3b8 >> 0x20);
          uStack_5e70._0_4_ = (float)uStack_c3b0;
          uStack_5e70._4_4_ = (float)((ulong)uStack_c3b0 >> 0x20);
          local_5e40._0_4_ = (float)local_c3e0;
          local_5e40._4_4_ = (float)((ulong)local_c3e0 >> 0x20);
          uStack_5e38._0_4_ = (float)uStack_c3d8;
          uStack_5e38._4_4_ = (float)((ulong)uStack_c3d8 >> 0x20);
          uStack_5e30._0_4_ = (float)uStack_c3d0;
          uStack_5e30._4_4_ = (float)((ulong)uStack_c3d0 >> 0x20);
          local_5e00._0_4_ = (float)local_c400;
          local_5e00._4_4_ = (float)((ulong)local_c400 >> 0x20);
          uStack_5df8._0_4_ = (float)uStack_c3f8;
          uStack_5df8._4_4_ = (float)((ulong)uStack_c3f8 >> 0x20);
          uStack_5df0._0_4_ = (float)uStack_c3f0;
          uStack_5df0._4_4_ = (float)((ulong)uStack_c3f0 >> 0x20);
          local_5dc0._0_4_ = (float)local_c420;
          local_5dc0._4_4_ = (float)((ulong)local_c420 >> 0x20);
          uStack_5db8._0_4_ = (float)uStack_c418;
          uStack_5db8._4_4_ = (float)((ulong)uStack_c418 >> 0x20);
          uStack_5db0._0_4_ = (float)uStack_c410;
          uStack_5db0._4_4_ = (float)((ulong)uStack_c410 >> 0x20);
          local_5d80._0_4_ = (float)local_c440;
          local_5d80._4_4_ = (float)((ulong)local_c440 >> 0x20);
          uStack_5d78._0_4_ = (float)uStack_c438;
          uStack_5d78._4_4_ = (float)((ulong)uStack_c438 >> 0x20);
          uStack_5d70._0_4_ = (float)uStack_c430;
          uStack_5d70._4_4_ = (float)((ulong)uStack_c430 >> 0x20);
          local_5d40._0_4_ = (float)local_c460;
          local_5d40._4_4_ = (float)((ulong)local_c460 >> 0x20);
          uStack_5d38._0_4_ = (float)uStack_c458;
          uStack_5d38._4_4_ = (float)((ulong)uStack_c458 >> 0x20);
          uStack_5d30._0_4_ = (float)uStack_c450;
          uStack_5d30._4_4_ = (float)((ulong)uStack_c450 >> 0x20);
          local_5d00._0_4_ = (float)local_c480;
          local_5d00._4_4_ = (float)((ulong)local_c480 >> 0x20);
          uStack_5cf8._0_4_ = (float)uStack_c478;
          uStack_5cf8._4_4_ = (float)((ulong)uStack_c478 >> 0x20);
          uStack_5cf0._0_4_ = (float)uStack_c470;
          uStack_5cf0._4_4_ = (float)((ulong)uStack_c470 >> 0x20);
          local_5cc0._0_4_ = (float)local_c4a0;
          local_5cc0._4_4_ = (float)((ulong)local_c4a0 >> 0x20);
          uStack_5cb8._0_4_ = (float)uStack_c498;
          uStack_5cb8._4_4_ = (float)((ulong)uStack_c498 >> 0x20);
          uStack_5cb0._0_4_ = (float)uStack_c490;
          uStack_5cb0._4_4_ = (float)((ulong)uStack_c490 >> 0x20);
          local_5c80._0_4_ = (float)local_c4c0;
          local_5c80._4_4_ = (float)((ulong)local_c4c0 >> 0x20);
          uStack_5c78._0_4_ = (float)uStack_c4b8;
          uStack_5c78._4_4_ = (float)((ulong)uStack_c4b8 >> 0x20);
          uStack_5c70._0_4_ = (float)uStack_c4b0;
          uStack_5c70._4_4_ = (float)((ulong)uStack_c4b0 >> 0x20);
          local_5c40._0_4_ = (float)local_c4e0;
          local_5c40._4_4_ = (float)((ulong)local_c4e0 >> 0x20);
          uStack_5c38._0_4_ = (float)uStack_c4d8;
          uStack_5c38._4_4_ = (float)((ulong)uStack_c4d8 >> 0x20);
          uStack_5c30._0_4_ = (float)uStack_c4d0;
          uStack_5c30._4_4_ = (float)((ulong)uStack_c4d0 >> 0x20);
          local_5c00._0_4_ = (float)local_c500;
          local_5c00._4_4_ = (float)((ulong)local_c500 >> 0x20);
          uStack_5bf8._0_4_ = (float)uStack_c4f8;
          uStack_5bf8._4_4_ = (float)((ulong)uStack_c4f8 >> 0x20);
          uStack_5bf0._0_4_ = (float)uStack_c4f0;
          uStack_5bf0._4_4_ = (float)((ulong)uStack_c4f0 >> 0x20);
          local_5bc0._0_4_ = (float)local_c520;
          local_5bc0._4_4_ = (float)((ulong)local_c520 >> 0x20);
          uStack_5bb8._0_4_ = (float)uStack_c518;
          uStack_5bb8._4_4_ = (float)((ulong)uStack_c518 >> 0x20);
          uStack_5bb0._0_4_ = (float)uStack_c510;
          uStack_5bb0._4_4_ = (float)((ulong)uStack_c510 >> 0x20);
          local_5b80._0_4_ = (float)local_c540;
          local_5b80._4_4_ = (float)((ulong)local_c540 >> 0x20);
          uStack_5b78._0_4_ = (float)uStack_c538;
          uStack_5b78._4_4_ = (float)((ulong)uStack_c538 >> 0x20);
          uStack_5b70._0_4_ = (float)uStack_c530;
          uStack_5b70._4_4_ = (float)((ulong)uStack_c530 >> 0x20);
          local_5b40._0_4_ = (float)local_c560;
          local_5b40._4_4_ = (float)((ulong)local_c560 >> 0x20);
          uStack_5b38._0_4_ = (float)uStack_c558;
          uStack_5b38._4_4_ = (float)((ulong)uStack_c558 >> 0x20);
          uStack_5b30._0_4_ = (float)uStack_c550;
          uStack_5b30._4_4_ = (float)((ulong)uStack_c550 >> 0x20);
          uStack_5f68._0_4_ = (float)uStack_c328;
          uStack_5f28._0_4_ = (float)uStack_c348;
          uStack_5ee8._0_4_ = (float)uStack_c368;
          uStack_5ea8._0_4_ = (float)uStack_c388;
          uStack_5e68._0_4_ = (float)uStack_c3a8;
          uStack_5e28._0_4_ = (float)uStack_c3c8;
          uStack_5de8._0_4_ = (float)uStack_c3e8;
          uStack_5da8._0_4_ = (float)uStack_c408;
          uStack_5d68._0_4_ = (float)uStack_c428;
          uStack_5d28._0_4_ = (float)uStack_c448;
          uStack_5ce8._0_4_ = (float)uStack_c468;
          uStack_5ca8._0_4_ = (float)uStack_c488;
          uStack_5c68._0_4_ = (float)uStack_c4a8;
          uStack_5c28._0_4_ = (float)uStack_c4c8;
          uStack_5be8._0_4_ = (float)uStack_c4e8;
          uStack_5ba8._0_4_ = (float)uStack_c508;
          uStack_5b68._0_4_ = (float)uStack_c528;
          uStack_5b28._0_4_ = (float)uStack_c548;
          if (local_c0f8 <= local_c568 + 3) break;
          local_bfc8 = local_c2b0;
          local_5fe0 = *(undefined8 *)local_c2b0;
          uStack_5fd8 = *(undefined8 *)(local_c2b0 + 2);
          uStack_5fd0 = *(undefined8 *)(local_c2b0 + 4);
          uStack_5fc8 = *(undefined8 *)(local_c2b0 + 6);
          local_bfd0 = local_c2b8;
          local_6340 = *(undefined8 *)local_c2b8;
          uStack_6338 = *(undefined8 *)(local_c2b8 + 2);
          uStack_6330 = *(undefined8 *)(local_c2b8 + 4);
          uStack_6328 = *(undefined8 *)(local_c2b8 + 6);
          local_aba8 = local_c308;
          local_abe0 = *local_c308;
          local_c5e0 = CONCAT44(local_abe0,local_abe0);
          uStack_c5d8 = CONCAT44(local_abe0,local_abe0);
          uStack_c5d0 = CONCAT44(local_abe0,local_abe0);
          uStack_c5c8 = CONCAT44(local_abe0,local_abe0);
          local_abe8 = local_c308 + 1;
          local_ac20 = *local_abe8;
          local_c600 = CONCAT44(local_ac20,local_ac20);
          uStack_c5f8 = CONCAT44(local_ac20,local_ac20);
          uStack_c5f0 = CONCAT44(local_ac20,local_ac20);
          uStack_c5e8 = CONCAT44(local_ac20,local_ac20);
          local_ac28 = local_c308 + 2;
          local_ac60 = *local_ac28;
          local_c620 = CONCAT44(local_ac60,local_ac60);
          uStack_c618 = CONCAT44(local_ac60,local_ac60);
          uStack_c610 = CONCAT44(local_ac60,local_ac60);
          uStack_c608 = CONCAT44(local_ac60,local_ac60);
          local_ac68 = local_c310;
          local_aca0 = *local_c310;
          local_c640 = CONCAT44(local_aca0,local_aca0);
          uStack_c638 = CONCAT44(local_aca0,local_aca0);
          uStack_c630 = CONCAT44(local_aca0,local_aca0);
          uStack_c628 = CONCAT44(local_aca0,local_aca0);
          local_aca8 = local_c310 + 1;
          local_ace0 = *local_aca8;
          local_c660 = CONCAT44(local_ace0,local_ace0);
          uStack_c658 = CONCAT44(local_ace0,local_ace0);
          uStack_c650 = CONCAT44(local_ace0,local_ace0);
          uStack_c648 = CONCAT44(local_ace0,local_ace0);
          local_ace8 = local_c310 + 2;
          local_ad20 = *local_ace8;
          local_c680 = CONCAT44(local_ad20,local_ad20);
          uStack_c678 = CONCAT44(local_ad20,local_ad20);
          uStack_c670 = CONCAT44(local_ad20,local_ad20);
          uStack_c668 = CONCAT44(local_ad20,local_ad20);
          local_ad28 = local_c318;
          local_ad60 = *local_c318;
          local_c6a0 = CONCAT44(local_ad60,local_ad60);
          uStack_c698 = CONCAT44(local_ad60,local_ad60);
          uStack_c690 = CONCAT44(local_ad60,local_ad60);
          uStack_c688 = CONCAT44(local_ad60,local_ad60);
          local_ad68 = local_c318 + 1;
          local_ada0 = *local_ad68;
          local_c6c0 = CONCAT44(local_ada0,local_ada0);
          uStack_c6b8 = CONCAT44(local_ada0,local_ada0);
          uStack_c6b0 = CONCAT44(local_ada0,local_ada0);
          uStack_c6a8 = CONCAT44(local_ada0,local_ada0);
          local_ada8 = local_c318 + 2;
          local_ade0 = *local_ada8;
          local_c6e0 = CONCAT44(local_ade0,local_ade0);
          uStack_c6d8 = CONCAT44(local_ade0,local_ade0);
          uStack_c6d0 = CONCAT44(local_ade0,local_ade0);
          uStack_c6c8 = CONCAT44(local_ade0,local_ade0);
          local_3020 = local_abe0 * (float)local_5f80;
          fStack_301c = local_abe0 * local_5f80._4_4_;
          fStack_3018 = local_abe0 * (float)uStack_5f78;
          fStack_3014 = local_abe0 * uStack_5f78._4_4_;
          fStack_3010 = local_abe0 * (float)uStack_5f70;
          fStack_300c = local_abe0 * uStack_5f70._4_4_;
          fStack_3008 = local_abe0 * (float)uStack_5f68;
          local_3040._0_4_ = (float)local_5fe0;
          local_3040._4_4_ = (float)((ulong)local_5fe0 >> 0x20);
          uStack_3038._0_4_ = (float)uStack_5fd8;
          uStack_3038._4_4_ = (float)((ulong)uStack_5fd8 >> 0x20);
          uStack_3030._0_4_ = (float)uStack_5fd0;
          uStack_3030._4_4_ = (float)((ulong)uStack_5fd0 >> 0x20);
          uStack_3028._0_4_ = (float)uStack_5fc8;
          uStack_3028._4_4_ = (float)((ulong)uStack_5fc8 >> 0x20);
          local_6040 = CONCAT44(fStack_301c + local_3040._4_4_,local_3020 + (float)local_3040);
          uStack_6038 = CONCAT44(fStack_3014 + uStack_3038._4_4_,fStack_3018 + (float)uStack_3038);
          uStack_6030 = CONCAT44(fStack_300c + uStack_3030._4_4_,fStack_3010 + (float)uStack_3030);
          uStack_6028 = CONCAT44(local_abe0 + uStack_3028._4_4_,fStack_3008 + (float)uStack_3028);
          local_2fe0 = local_ac20 * (float)local_5f40;
          fStack_2fdc = local_ac20 * local_5f40._4_4_;
          fStack_2fd8 = local_ac20 * (float)uStack_5f38;
          fStack_2fd4 = local_ac20 * uStack_5f38._4_4_;
          fStack_2fd0 = local_ac20 * (float)uStack_5f30;
          fStack_2fcc = local_ac20 * uStack_5f30._4_4_;
          fStack_2fc8 = local_ac20 * (float)uStack_5f28;
          fVar76 = local_2fe0 + local_3020 + (float)local_3040;
          fVar80 = fStack_2fdc + fStack_301c + local_3040._4_4_;
          fVar81 = fStack_2fd8 + fStack_3018 + (float)uStack_3038;
          fVar82 = fStack_2fd4 + fStack_3014 + uStack_3038._4_4_;
          fVar83 = fStack_2fd0 + fStack_3010 + (float)uStack_3030;
          fVar84 = fStack_2fcc + fStack_300c + uStack_3030._4_4_;
          fVar85 = fStack_2fc8 + fStack_3008 + (float)uStack_3028;
          fVar86 = local_ac20 + local_abe0 + uStack_3028._4_4_;
          local_60a0 = CONCAT44(fVar80,fVar76);
          uStack_6098 = CONCAT44(fVar82,fVar81);
          uStack_6090 = CONCAT44(fVar84,fVar83);
          uStack_6088 = CONCAT44(fVar86,fVar85);
          local_2fa0 = local_ac60 * (float)local_5f00;
          fStack_2f9c = local_ac60 * local_5f00._4_4_;
          fStack_2f98 = local_ac60 * (float)uStack_5ef8;
          fStack_2f94 = local_ac60 * uStack_5ef8._4_4_;
          fStack_2f90 = local_ac60 * (float)uStack_5ef0;
          fStack_2f8c = local_ac60 * uStack_5ef0._4_4_;
          fStack_2f88 = local_ac60 * (float)uStack_5ee8;
          fVar76 = local_2fa0 + fVar76;
          fVar80 = fStack_2f9c + fVar80;
          fVar81 = fStack_2f98 + fVar81;
          fVar82 = fStack_2f94 + fVar82;
          fVar83 = fStack_2f90 + fVar83;
          fVar84 = fStack_2f8c + fVar84;
          fVar85 = fStack_2f88 + fVar85;
          fVar86 = local_ac60 + fVar86;
          local_6100 = CONCAT44(fVar80,fVar76);
          uStack_60f8 = CONCAT44(fVar82,fVar81);
          uStack_60f0 = CONCAT44(fVar84,fVar83);
          uStack_60e8 = CONCAT44(fVar86,fVar85);
          local_2f60 = local_aca0 * (float)local_5ec0;
          fStack_2f5c = local_aca0 * local_5ec0._4_4_;
          fStack_2f58 = local_aca0 * (float)uStack_5eb8;
          fStack_2f54 = local_aca0 * uStack_5eb8._4_4_;
          fStack_2f50 = local_aca0 * (float)uStack_5eb0;
          fStack_2f4c = local_aca0 * uStack_5eb0._4_4_;
          fStack_2f48 = local_aca0 * (float)uStack_5ea8;
          fVar76 = local_2f60 + fVar76;
          fVar80 = fStack_2f5c + fVar80;
          fVar81 = fStack_2f58 + fVar81;
          fVar82 = fStack_2f54 + fVar82;
          fVar83 = fStack_2f50 + fVar83;
          fVar84 = fStack_2f4c + fVar84;
          fVar85 = fStack_2f48 + fVar85;
          fVar86 = local_aca0 + fVar86;
          local_6160 = CONCAT44(fVar80,fVar76);
          uStack_6158 = CONCAT44(fVar82,fVar81);
          uStack_6150 = CONCAT44(fVar84,fVar83);
          uStack_6148 = CONCAT44(fVar86,fVar85);
          local_2f20 = local_ace0 * (float)local_5e80;
          fStack_2f1c = local_ace0 * local_5e80._4_4_;
          fStack_2f18 = local_ace0 * (float)uStack_5e78;
          fStack_2f14 = local_ace0 * uStack_5e78._4_4_;
          fStack_2f10 = local_ace0 * (float)uStack_5e70;
          fStack_2f0c = local_ace0 * uStack_5e70._4_4_;
          fStack_2f08 = local_ace0 * (float)uStack_5e68;
          fVar76 = local_2f20 + fVar76;
          fVar80 = fStack_2f1c + fVar80;
          fVar81 = fStack_2f18 + fVar81;
          fVar82 = fStack_2f14 + fVar82;
          fVar83 = fStack_2f10 + fVar83;
          fVar84 = fStack_2f0c + fVar84;
          fVar85 = fStack_2f08 + fVar85;
          fVar86 = local_ace0 + fVar86;
          local_61c0 = CONCAT44(fVar80,fVar76);
          uStack_61b8 = CONCAT44(fVar82,fVar81);
          uStack_61b0 = CONCAT44(fVar84,fVar83);
          uStack_61a8 = CONCAT44(fVar86,fVar85);
          local_2ee0 = local_ad20 * (float)local_5e40;
          fStack_2edc = local_ad20 * local_5e40._4_4_;
          fStack_2ed8 = local_ad20 * (float)uStack_5e38;
          fStack_2ed4 = local_ad20 * uStack_5e38._4_4_;
          fStack_2ed0 = local_ad20 * (float)uStack_5e30;
          fStack_2ecc = local_ad20 * uStack_5e30._4_4_;
          fStack_2ec8 = local_ad20 * (float)uStack_5e28;
          fVar76 = local_2ee0 + fVar76;
          fVar80 = fStack_2edc + fVar80;
          fVar81 = fStack_2ed8 + fVar81;
          fVar82 = fStack_2ed4 + fVar82;
          fVar83 = fStack_2ed0 + fVar83;
          fVar84 = fStack_2ecc + fVar84;
          fVar85 = fStack_2ec8 + fVar85;
          fVar86 = local_ad20 + fVar86;
          local_6220 = CONCAT44(fVar80,fVar76);
          uStack_6218 = CONCAT44(fVar82,fVar81);
          uStack_6210 = CONCAT44(fVar84,fVar83);
          uStack_6208 = CONCAT44(fVar86,fVar85);
          local_2ea0 = local_ad60 * (float)local_5e00;
          fStack_2e9c = local_ad60 * local_5e00._4_4_;
          fStack_2e98 = local_ad60 * (float)uStack_5df8;
          fStack_2e94 = local_ad60 * uStack_5df8._4_4_;
          fStack_2e90 = local_ad60 * (float)uStack_5df0;
          fStack_2e8c = local_ad60 * uStack_5df0._4_4_;
          fStack_2e88 = local_ad60 * (float)uStack_5de8;
          fVar76 = local_2ea0 + fVar76;
          fVar80 = fStack_2e9c + fVar80;
          fVar81 = fStack_2e98 + fVar81;
          fVar82 = fStack_2e94 + fVar82;
          fVar83 = fStack_2e90 + fVar83;
          fVar84 = fStack_2e8c + fVar84;
          fVar85 = fStack_2e88 + fVar85;
          fVar86 = local_ad60 + fVar86;
          local_6280 = CONCAT44(fVar80,fVar76);
          uStack_6278 = CONCAT44(fVar82,fVar81);
          uStack_6270 = CONCAT44(fVar84,fVar83);
          uStack_6268 = CONCAT44(fVar86,fVar85);
          local_2e60 = local_ada0 * (float)local_5dc0;
          fStack_2e5c = local_ada0 * local_5dc0._4_4_;
          fStack_2e58 = local_ada0 * (float)uStack_5db8;
          fStack_2e54 = local_ada0 * uStack_5db8._4_4_;
          fStack_2e50 = local_ada0 * (float)uStack_5db0;
          fStack_2e4c = local_ada0 * uStack_5db0._4_4_;
          fStack_2e48 = local_ada0 * (float)uStack_5da8;
          fVar76 = local_2e60 + fVar76;
          fVar80 = fStack_2e5c + fVar80;
          fVar81 = fStack_2e58 + fVar81;
          fVar82 = fStack_2e54 + fVar82;
          fVar83 = fStack_2e50 + fVar83;
          fVar84 = fStack_2e4c + fVar84;
          fVar85 = fStack_2e48 + fVar85;
          fVar86 = local_ada0 + fVar86;
          local_62e0 = CONCAT44(fVar80,fVar76);
          uStack_62d8 = CONCAT44(fVar82,fVar81);
          uStack_62d0 = CONCAT44(fVar84,fVar83);
          uStack_62c8 = CONCAT44(fVar86,fVar85);
          local_2e20 = local_ade0 * (float)local_5d80;
          fStack_2e1c = local_ade0 * local_5d80._4_4_;
          fStack_2e18 = local_ade0 * (float)uStack_5d78;
          fStack_2e14 = local_ade0 * uStack_5d78._4_4_;
          fStack_2e10 = local_ade0 * (float)uStack_5d70;
          fStack_2e0c = local_ade0 * uStack_5d70._4_4_;
          fStack_2e08 = local_ade0 * (float)uStack_5d68;
          local_c5a0 = CONCAT44(fStack_2e1c + fVar80,local_2e20 + fVar76);
          uStack_c598 = CONCAT44(fStack_2e14 + fVar82,fStack_2e18 + fVar81);
          uStack_c590 = CONCAT44(fStack_2e0c + fVar84,fStack_2e10 + fVar83);
          uStack_c588 = CONCAT44(local_ade0 + fVar86,fStack_2e08 + fVar85);
          local_2de0 = local_abe0 * (float)local_5d40;
          fStack_2ddc = local_abe0 * local_5d40._4_4_;
          fStack_2dd8 = local_abe0 * (float)uStack_5d38;
          fStack_2dd4 = local_abe0 * uStack_5d38._4_4_;
          fStack_2dd0 = local_abe0 * (float)uStack_5d30;
          fStack_2dcc = local_abe0 * uStack_5d30._4_4_;
          fStack_2dc8 = local_abe0 * (float)uStack_5d28;
          local_2e00._0_4_ = (float)local_6340;
          local_2e00._4_4_ = (float)((ulong)local_6340 >> 0x20);
          uStack_2df8._0_4_ = (float)uStack_6338;
          uStack_2df8._4_4_ = (float)((ulong)uStack_6338 >> 0x20);
          uStack_2df0._0_4_ = (float)uStack_6330;
          uStack_2df0._4_4_ = (float)((ulong)uStack_6330 >> 0x20);
          uStack_2de8._0_4_ = (float)uStack_6328;
          uStack_2de8._4_4_ = (float)((ulong)uStack_6328 >> 0x20);
          local_63a0 = CONCAT44(fStack_2ddc + local_2e00._4_4_,local_2de0 + (float)local_2e00);
          uStack_6398 = CONCAT44(fStack_2dd4 + uStack_2df8._4_4_,fStack_2dd8 + (float)uStack_2df8);
          uStack_6390 = CONCAT44(fStack_2dcc + uStack_2df0._4_4_,fStack_2dd0 + (float)uStack_2df0);
          uStack_6388 = CONCAT44(local_abe0 + uStack_2de8._4_4_,fStack_2dc8 + (float)uStack_2de8);
          local_2da0 = local_ac20 * (float)local_5d00;
          fStack_2d9c = local_ac20 * local_5d00._4_4_;
          fStack_2d98 = local_ac20 * (float)uStack_5cf8;
          fStack_2d94 = local_ac20 * uStack_5cf8._4_4_;
          fStack_2d90 = local_ac20 * (float)uStack_5cf0;
          fStack_2d8c = local_ac20 * uStack_5cf0._4_4_;
          fStack_2d88 = local_ac20 * (float)uStack_5ce8;
          fVar76 = local_2da0 + local_2de0 + (float)local_2e00;
          fVar80 = fStack_2d9c + fStack_2ddc + local_2e00._4_4_;
          fVar81 = fStack_2d98 + fStack_2dd8 + (float)uStack_2df8;
          fVar82 = fStack_2d94 + fStack_2dd4 + uStack_2df8._4_4_;
          fVar83 = fStack_2d90 + fStack_2dd0 + (float)uStack_2df0;
          fVar84 = fStack_2d8c + fStack_2dcc + uStack_2df0._4_4_;
          fVar85 = fStack_2d88 + fStack_2dc8 + (float)uStack_2de8;
          fVar86 = local_ac20 + local_abe0 + uStack_2de8._4_4_;
          local_6400 = CONCAT44(fVar80,fVar76);
          uStack_63f8 = CONCAT44(fVar82,fVar81);
          uStack_63f0 = CONCAT44(fVar84,fVar83);
          uStack_63e8 = CONCAT44(fVar86,fVar85);
          local_2d60 = local_ac60 * (float)local_5cc0;
          fStack_2d5c = local_ac60 * local_5cc0._4_4_;
          fStack_2d58 = local_ac60 * (float)uStack_5cb8;
          fStack_2d54 = local_ac60 * uStack_5cb8._4_4_;
          fStack_2d50 = local_ac60 * (float)uStack_5cb0;
          fStack_2d4c = local_ac60 * uStack_5cb0._4_4_;
          fStack_2d48 = local_ac60 * (float)uStack_5ca8;
          fVar76 = local_2d60 + fVar76;
          fVar80 = fStack_2d5c + fVar80;
          fVar81 = fStack_2d58 + fVar81;
          fVar82 = fStack_2d54 + fVar82;
          fVar83 = fStack_2d50 + fVar83;
          fVar84 = fStack_2d4c + fVar84;
          fVar85 = fStack_2d48 + fVar85;
          fVar86 = local_ac60 + fVar86;
          local_6460 = CONCAT44(fVar80,fVar76);
          uStack_6458 = CONCAT44(fVar82,fVar81);
          uStack_6450 = CONCAT44(fVar84,fVar83);
          uStack_6448 = CONCAT44(fVar86,fVar85);
          local_2d20 = local_aca0 * (float)local_5c80;
          fStack_2d1c = local_aca0 * local_5c80._4_4_;
          fStack_2d18 = local_aca0 * (float)uStack_5c78;
          fStack_2d14 = local_aca0 * uStack_5c78._4_4_;
          fStack_2d10 = local_aca0 * (float)uStack_5c70;
          fStack_2d0c = local_aca0 * uStack_5c70._4_4_;
          fStack_2d08 = local_aca0 * (float)uStack_5c68;
          fVar76 = local_2d20 + fVar76;
          fVar80 = fStack_2d1c + fVar80;
          fVar81 = fStack_2d18 + fVar81;
          fVar82 = fStack_2d14 + fVar82;
          fVar83 = fStack_2d10 + fVar83;
          fVar84 = fStack_2d0c + fVar84;
          fVar85 = fStack_2d08 + fVar85;
          fVar86 = local_aca0 + fVar86;
          local_64c0 = CONCAT44(fVar80,fVar76);
          uStack_64b8 = CONCAT44(fVar82,fVar81);
          uStack_64b0 = CONCAT44(fVar84,fVar83);
          uStack_64a8 = CONCAT44(fVar86,fVar85);
          local_2ce0 = local_ace0 * (float)local_5c40;
          fStack_2cdc = local_ace0 * local_5c40._4_4_;
          fStack_2cd8 = local_ace0 * (float)uStack_5c38;
          fStack_2cd4 = local_ace0 * uStack_5c38._4_4_;
          fStack_2cd0 = local_ace0 * (float)uStack_5c30;
          fStack_2ccc = local_ace0 * uStack_5c30._4_4_;
          fStack_2cc8 = local_ace0 * (float)uStack_5c28;
          fVar76 = local_2ce0 + fVar76;
          fVar80 = fStack_2cdc + fVar80;
          fVar81 = fStack_2cd8 + fVar81;
          fVar82 = fStack_2cd4 + fVar82;
          fVar83 = fStack_2cd0 + fVar83;
          fVar84 = fStack_2ccc + fVar84;
          fVar85 = fStack_2cc8 + fVar85;
          fVar86 = local_ace0 + fVar86;
          local_6520 = CONCAT44(fVar80,fVar76);
          uStack_6518 = CONCAT44(fVar82,fVar81);
          uStack_6510 = CONCAT44(fVar84,fVar83);
          uStack_6508 = CONCAT44(fVar86,fVar85);
          local_2ca0 = local_ad20 * (float)local_5c00;
          fStack_2c9c = local_ad20 * local_5c00._4_4_;
          fStack_2c98 = local_ad20 * (float)uStack_5bf8;
          fStack_2c94 = local_ad20 * uStack_5bf8._4_4_;
          fStack_2c90 = local_ad20 * (float)uStack_5bf0;
          fStack_2c8c = local_ad20 * uStack_5bf0._4_4_;
          fStack_2c88 = local_ad20 * (float)uStack_5be8;
          fVar76 = local_2ca0 + fVar76;
          fVar80 = fStack_2c9c + fVar80;
          fVar81 = fStack_2c98 + fVar81;
          fVar82 = fStack_2c94 + fVar82;
          fVar83 = fStack_2c90 + fVar83;
          fVar84 = fStack_2c8c + fVar84;
          fVar85 = fStack_2c88 + fVar85;
          fVar86 = local_ad20 + fVar86;
          local_6580 = CONCAT44(fVar80,fVar76);
          uStack_6578 = CONCAT44(fVar82,fVar81);
          uStack_6570 = CONCAT44(fVar84,fVar83);
          uStack_6568 = CONCAT44(fVar86,fVar85);
          local_2c60 = local_ad60 * (float)local_5bc0;
          fStack_2c5c = local_ad60 * local_5bc0._4_4_;
          fStack_2c58 = local_ad60 * (float)uStack_5bb8;
          fStack_2c54 = local_ad60 * uStack_5bb8._4_4_;
          fStack_2c50 = local_ad60 * (float)uStack_5bb0;
          fStack_2c4c = local_ad60 * uStack_5bb0._4_4_;
          fStack_2c48 = local_ad60 * (float)uStack_5ba8;
          fVar76 = local_2c60 + fVar76;
          fVar80 = fStack_2c5c + fVar80;
          fVar81 = fStack_2c58 + fVar81;
          fVar82 = fStack_2c54 + fVar82;
          fVar83 = fStack_2c50 + fVar83;
          fVar84 = fStack_2c4c + fVar84;
          fVar85 = fStack_2c48 + fVar85;
          fVar86 = local_ad60 + fVar86;
          local_65e0 = CONCAT44(fVar80,fVar76);
          uStack_65d8 = CONCAT44(fVar82,fVar81);
          uStack_65d0 = CONCAT44(fVar84,fVar83);
          uStack_65c8 = CONCAT44(fVar86,fVar85);
          local_2c20 = local_ada0 * (float)local_5b80;
          fStack_2c1c = local_ada0 * local_5b80._4_4_;
          fStack_2c18 = local_ada0 * (float)uStack_5b78;
          fStack_2c14 = local_ada0 * uStack_5b78._4_4_;
          fStack_2c10 = local_ada0 * (float)uStack_5b70;
          fStack_2c0c = local_ada0 * uStack_5b70._4_4_;
          fStack_2c08 = local_ada0 * (float)uStack_5b68;
          fVar76 = local_2c20 + fVar76;
          fVar80 = fStack_2c1c + fVar80;
          fVar81 = fStack_2c18 + fVar81;
          fVar82 = fStack_2c14 + fVar82;
          fVar83 = fStack_2c10 + fVar83;
          fVar84 = fStack_2c0c + fVar84;
          fVar85 = fStack_2c08 + fVar85;
          fVar86 = local_ada0 + fVar86;
          local_6640 = CONCAT44(fVar80,fVar76);
          uStack_6638 = CONCAT44(fVar82,fVar81);
          uStack_6630 = CONCAT44(fVar84,fVar83);
          uStack_6628 = CONCAT44(fVar86,fVar85);
          local_2be0 = local_ade0 * (float)local_5b40;
          fStack_2bdc = local_ade0 * local_5b40._4_4_;
          fStack_2bd8 = local_ade0 * (float)uStack_5b38;
          fStack_2bd4 = local_ade0 * uStack_5b38._4_4_;
          fStack_2bd0 = local_ade0 * (float)uStack_5b30;
          fStack_2bcc = local_ade0 * uStack_5b30._4_4_;
          fStack_2bc8 = local_ade0 * (float)uStack_5b28;
          local_c5c0 = CONCAT44(fStack_2bdc + fVar80,local_2be0 + fVar76);
          uStack_c5b8 = CONCAT44(fStack_2bd4 + fVar82,fStack_2bd8 + fVar81);
          uStack_c5b0 = CONCAT44(fStack_2bcc + fVar84,fStack_2bd0 + fVar83);
          uStack_c5a8 = CONCAT44(local_ade0 + fVar86,fStack_2bc8 + fVar85);
          local_a668 = local_c2b0;
          *(undefined8 *)local_c2b0 = local_c5a0;
          *(undefined8 *)(local_c2b0 + 2) = uStack_c598;
          *(undefined8 *)(local_c2b0 + 4) = uStack_c590;
          *(undefined8 *)(local_c2b0 + 6) = uStack_c588;
          local_a6a8 = local_c2b8;
          *(undefined8 *)local_c2b8 = local_c5c0;
          *(undefined8 *)(local_c2b8 + 2) = uStack_c5b8;
          *(undefined8 *)(local_c2b8 + 4) = uStack_c5b0;
          *(undefined8 *)(local_c2b8 + 6) = uStack_c5a8;
          local_bfd8 = local_c2b0 + 8;
          local_66a0 = *(undefined8 *)local_bfd8;
          uStack_6698 = *(undefined8 *)(local_c2b0 + 10);
          uStack_6690 = *(undefined8 *)(local_c2b0 + 0xc);
          uStack_6688 = *(undefined8 *)(local_c2b0 + 0xe);
          local_bfe0 = local_c2b8 + 8;
          local_6a00 = *(undefined8 *)local_bfe0;
          uStack_69f8 = *(undefined8 *)(local_c2b8 + 10);
          uStack_69f0 = *(undefined8 *)(local_c2b8 + 0xc);
          uStack_69e8 = *(undefined8 *)(local_c2b8 + 0xe);
          local_ade8 = local_c308 + 3;
          local_ae20 = *local_ade8;
          local_c740 = CONCAT44(local_ae20,local_ae20);
          uStack_c738 = CONCAT44(local_ae20,local_ae20);
          uStack_c730 = CONCAT44(local_ae20,local_ae20);
          uStack_c728 = CONCAT44(local_ae20,local_ae20);
          local_ae28 = local_c310 + 3;
          local_ae60 = *local_ae28;
          local_c760 = CONCAT44(local_ae60,local_ae60);
          uStack_c758 = CONCAT44(local_ae60,local_ae60);
          uStack_c750 = CONCAT44(local_ae60,local_ae60);
          uStack_c748 = CONCAT44(local_ae60,local_ae60);
          local_ae68 = local_c318 + 3;
          local_aea0 = *local_ae68;
          local_c780 = CONCAT44(local_aea0,local_aea0);
          uStack_c778 = CONCAT44(local_aea0,local_aea0);
          uStack_c770 = CONCAT44(local_aea0,local_aea0);
          uStack_c768 = CONCAT44(local_aea0,local_aea0);
          local_2ba0 = local_ac20 * (float)local_5f80;
          fStack_2b9c = local_ac20 * local_5f80._4_4_;
          fStack_2b98 = local_ac20 * (float)uStack_5f78;
          fStack_2b94 = local_ac20 * uStack_5f78._4_4_;
          fStack_2b90 = local_ac20 * (float)uStack_5f70;
          fStack_2b8c = local_ac20 * uStack_5f70._4_4_;
          fStack_2b88 = local_ac20 * (float)uStack_5f68;
          local_2bc0._0_4_ = (float)local_66a0;
          local_2bc0._4_4_ = (float)((ulong)local_66a0 >> 0x20);
          uStack_2bb8._0_4_ = (float)uStack_6698;
          uStack_2bb8._4_4_ = (float)((ulong)uStack_6698 >> 0x20);
          uStack_2bb0._0_4_ = (float)uStack_6690;
          uStack_2bb0._4_4_ = (float)((ulong)uStack_6690 >> 0x20);
          uStack_2ba8._0_4_ = (float)uStack_6688;
          uStack_2ba8._4_4_ = (float)((ulong)uStack_6688 >> 0x20);
          local_6700 = CONCAT44(fStack_2b9c + local_2bc0._4_4_,local_2ba0 + (float)local_2bc0);
          uStack_66f8 = CONCAT44(fStack_2b94 + uStack_2bb8._4_4_,fStack_2b98 + (float)uStack_2bb8);
          uStack_66f0 = CONCAT44(fStack_2b8c + uStack_2bb0._4_4_,fStack_2b90 + (float)uStack_2bb0);
          uStack_66e8 = CONCAT44(local_ac20 + uStack_2ba8._4_4_,fStack_2b88 + (float)uStack_2ba8);
          local_2b60 = local_ac60 * (float)local_5f40;
          fStack_2b5c = local_ac60 * local_5f40._4_4_;
          fStack_2b58 = local_ac60 * (float)uStack_5f38;
          fStack_2b54 = local_ac60 * uStack_5f38._4_4_;
          fStack_2b50 = local_ac60 * (float)uStack_5f30;
          fStack_2b4c = local_ac60 * uStack_5f30._4_4_;
          fStack_2b48 = local_ac60 * (float)uStack_5f28;
          fVar76 = local_2b60 + local_2ba0 + (float)local_2bc0;
          fVar80 = fStack_2b5c + fStack_2b9c + local_2bc0._4_4_;
          fVar81 = fStack_2b58 + fStack_2b98 + (float)uStack_2bb8;
          fVar82 = fStack_2b54 + fStack_2b94 + uStack_2bb8._4_4_;
          fVar83 = fStack_2b50 + fStack_2b90 + (float)uStack_2bb0;
          fVar84 = fStack_2b4c + fStack_2b8c + uStack_2bb0._4_4_;
          fVar85 = fStack_2b48 + fStack_2b88 + (float)uStack_2ba8;
          fVar86 = local_ac60 + local_ac20 + uStack_2ba8._4_4_;
          local_6760 = CONCAT44(fVar80,fVar76);
          uStack_6758 = CONCAT44(fVar82,fVar81);
          uStack_6750 = CONCAT44(fVar84,fVar83);
          uStack_6748 = CONCAT44(fVar86,fVar85);
          local_2b20 = local_ae20 * (float)local_5f00;
          fStack_2b1c = local_ae20 * local_5f00._4_4_;
          fStack_2b18 = local_ae20 * (float)uStack_5ef8;
          fStack_2b14 = local_ae20 * uStack_5ef8._4_4_;
          fStack_2b10 = local_ae20 * (float)uStack_5ef0;
          fStack_2b0c = local_ae20 * uStack_5ef0._4_4_;
          fStack_2b08 = local_ae20 * (float)uStack_5ee8;
          fVar76 = local_2b20 + fVar76;
          fVar80 = fStack_2b1c + fVar80;
          fVar81 = fStack_2b18 + fVar81;
          fVar82 = fStack_2b14 + fVar82;
          fVar83 = fStack_2b10 + fVar83;
          fVar84 = fStack_2b0c + fVar84;
          fVar85 = fStack_2b08 + fVar85;
          fVar86 = local_ae20 + fVar86;
          local_67c0 = CONCAT44(fVar80,fVar76);
          uStack_67b8 = CONCAT44(fVar82,fVar81);
          uStack_67b0 = CONCAT44(fVar84,fVar83);
          uStack_67a8 = CONCAT44(fVar86,fVar85);
          local_2ae0 = local_ace0 * (float)local_5ec0;
          fStack_2adc = local_ace0 * local_5ec0._4_4_;
          fStack_2ad8 = local_ace0 * (float)uStack_5eb8;
          fStack_2ad4 = local_ace0 * uStack_5eb8._4_4_;
          fStack_2ad0 = local_ace0 * (float)uStack_5eb0;
          fStack_2acc = local_ace0 * uStack_5eb0._4_4_;
          fStack_2ac8 = local_ace0 * (float)uStack_5ea8;
          fVar76 = local_2ae0 + fVar76;
          fVar80 = fStack_2adc + fVar80;
          fVar81 = fStack_2ad8 + fVar81;
          fVar82 = fStack_2ad4 + fVar82;
          fVar83 = fStack_2ad0 + fVar83;
          fVar84 = fStack_2acc + fVar84;
          fVar85 = fStack_2ac8 + fVar85;
          fVar86 = local_ace0 + fVar86;
          local_6820 = CONCAT44(fVar80,fVar76);
          uStack_6818 = CONCAT44(fVar82,fVar81);
          uStack_6810 = CONCAT44(fVar84,fVar83);
          uStack_6808 = CONCAT44(fVar86,fVar85);
          local_2aa0 = local_ad20 * (float)local_5e80;
          fStack_2a9c = local_ad20 * local_5e80._4_4_;
          fStack_2a98 = local_ad20 * (float)uStack_5e78;
          fStack_2a94 = local_ad20 * uStack_5e78._4_4_;
          fStack_2a90 = local_ad20 * (float)uStack_5e70;
          fStack_2a8c = local_ad20 * uStack_5e70._4_4_;
          fStack_2a88 = local_ad20 * (float)uStack_5e68;
          fVar76 = local_2aa0 + fVar76;
          fVar80 = fStack_2a9c + fVar80;
          fVar81 = fStack_2a98 + fVar81;
          fVar82 = fStack_2a94 + fVar82;
          fVar83 = fStack_2a90 + fVar83;
          fVar84 = fStack_2a8c + fVar84;
          fVar85 = fStack_2a88 + fVar85;
          fVar86 = local_ad20 + fVar86;
          local_6880 = CONCAT44(fVar80,fVar76);
          uStack_6878 = CONCAT44(fVar82,fVar81);
          uStack_6870 = CONCAT44(fVar84,fVar83);
          uStack_6868 = CONCAT44(fVar86,fVar85);
          local_2a60 = local_ae60 * (float)local_5e40;
          fStack_2a5c = local_ae60 * local_5e40._4_4_;
          fStack_2a58 = local_ae60 * (float)uStack_5e38;
          fStack_2a54 = local_ae60 * uStack_5e38._4_4_;
          fStack_2a50 = local_ae60 * (float)uStack_5e30;
          fStack_2a4c = local_ae60 * uStack_5e30._4_4_;
          fStack_2a48 = local_ae60 * (float)uStack_5e28;
          fVar76 = local_2a60 + fVar76;
          fVar80 = fStack_2a5c + fVar80;
          fVar81 = fStack_2a58 + fVar81;
          fVar82 = fStack_2a54 + fVar82;
          fVar83 = fStack_2a50 + fVar83;
          fVar84 = fStack_2a4c + fVar84;
          fVar85 = fStack_2a48 + fVar85;
          fVar86 = local_ae60 + fVar86;
          local_68e0 = CONCAT44(fVar80,fVar76);
          uStack_68d8 = CONCAT44(fVar82,fVar81);
          uStack_68d0 = CONCAT44(fVar84,fVar83);
          uStack_68c8 = CONCAT44(fVar86,fVar85);
          local_2a20 = local_ada0 * (float)local_5e00;
          fStack_2a1c = local_ada0 * local_5e00._4_4_;
          fStack_2a18 = local_ada0 * (float)uStack_5df8;
          fStack_2a14 = local_ada0 * uStack_5df8._4_4_;
          fStack_2a10 = local_ada0 * (float)uStack_5df0;
          fStack_2a0c = local_ada0 * uStack_5df0._4_4_;
          fStack_2a08 = local_ada0 * (float)uStack_5de8;
          fVar76 = local_2a20 + fVar76;
          fVar80 = fStack_2a1c + fVar80;
          fVar81 = fStack_2a18 + fVar81;
          fVar82 = fStack_2a14 + fVar82;
          fVar83 = fStack_2a10 + fVar83;
          fVar84 = fStack_2a0c + fVar84;
          fVar85 = fStack_2a08 + fVar85;
          fVar86 = local_ada0 + fVar86;
          local_6940 = CONCAT44(fVar80,fVar76);
          uStack_6938 = CONCAT44(fVar82,fVar81);
          uStack_6930 = CONCAT44(fVar84,fVar83);
          uStack_6928 = CONCAT44(fVar86,fVar85);
          local_29e0 = local_ade0 * (float)local_5dc0;
          fStack_29dc = local_ade0 * local_5dc0._4_4_;
          fStack_29d8 = local_ade0 * (float)uStack_5db8;
          fStack_29d4 = local_ade0 * uStack_5db8._4_4_;
          fStack_29d0 = local_ade0 * (float)uStack_5db0;
          fStack_29cc = local_ade0 * uStack_5db0._4_4_;
          fStack_29c8 = local_ade0 * (float)uStack_5da8;
          fVar76 = local_29e0 + fVar76;
          fVar80 = fStack_29dc + fVar80;
          fVar81 = fStack_29d8 + fVar81;
          fVar82 = fStack_29d4 + fVar82;
          fVar83 = fStack_29d0 + fVar83;
          fVar84 = fStack_29cc + fVar84;
          fVar85 = fStack_29c8 + fVar85;
          fVar86 = local_ade0 + fVar86;
          local_69a0 = CONCAT44(fVar80,fVar76);
          uStack_6998 = CONCAT44(fVar82,fVar81);
          uStack_6990 = CONCAT44(fVar84,fVar83);
          uStack_6988 = CONCAT44(fVar86,fVar85);
          local_29a0 = local_aea0 * (float)local_5d80;
          fStack_299c = local_aea0 * local_5d80._4_4_;
          fStack_2998 = local_aea0 * (float)uStack_5d78;
          fStack_2994 = local_aea0 * uStack_5d78._4_4_;
          fStack_2990 = local_aea0 * (float)uStack_5d70;
          fStack_298c = local_aea0 * uStack_5d70._4_4_;
          fStack_2988 = local_aea0 * (float)uStack_5d68;
          local_c700 = CONCAT44(fStack_299c + fVar80,local_29a0 + fVar76);
          uStack_c6f8 = CONCAT44(fStack_2994 + fVar82,fStack_2998 + fVar81);
          uStack_c6f0 = CONCAT44(fStack_298c + fVar84,fStack_2990 + fVar83);
          uStack_c6e8 = CONCAT44(local_aea0 + fVar86,fStack_2988 + fVar85);
          local_2960 = local_ac20 * (float)local_5d40;
          fStack_295c = local_ac20 * local_5d40._4_4_;
          fStack_2958 = local_ac20 * (float)uStack_5d38;
          fStack_2954 = local_ac20 * uStack_5d38._4_4_;
          fStack_2950 = local_ac20 * (float)uStack_5d30;
          fStack_294c = local_ac20 * uStack_5d30._4_4_;
          fStack_2948 = local_ac20 * (float)uStack_5d28;
          local_2980._0_4_ = (float)local_6a00;
          local_2980._4_4_ = (float)((ulong)local_6a00 >> 0x20);
          uStack_2978._0_4_ = (float)uStack_69f8;
          uStack_2978._4_4_ = (float)((ulong)uStack_69f8 >> 0x20);
          uStack_2970._0_4_ = (float)uStack_69f0;
          uStack_2970._4_4_ = (float)((ulong)uStack_69f0 >> 0x20);
          uStack_2968._0_4_ = (float)uStack_69e8;
          uStack_2968._4_4_ = (float)((ulong)uStack_69e8 >> 0x20);
          local_6a60 = CONCAT44(fStack_295c + local_2980._4_4_,local_2960 + (float)local_2980);
          uStack_6a58 = CONCAT44(fStack_2954 + uStack_2978._4_4_,fStack_2958 + (float)uStack_2978);
          uStack_6a50 = CONCAT44(fStack_294c + uStack_2970._4_4_,fStack_2950 + (float)uStack_2970);
          uStack_6a48 = CONCAT44(local_ac20 + uStack_2968._4_4_,fStack_2948 + (float)uStack_2968);
          local_2920 = local_ac60 * (float)local_5d00;
          fStack_291c = local_ac60 * local_5d00._4_4_;
          fStack_2918 = local_ac60 * (float)uStack_5cf8;
          fStack_2914 = local_ac60 * uStack_5cf8._4_4_;
          fStack_2910 = local_ac60 * (float)uStack_5cf0;
          fStack_290c = local_ac60 * uStack_5cf0._4_4_;
          fStack_2908 = local_ac60 * (float)uStack_5ce8;
          fVar76 = local_2920 + local_2960 + (float)local_2980;
          fVar80 = fStack_291c + fStack_295c + local_2980._4_4_;
          fVar81 = fStack_2918 + fStack_2958 + (float)uStack_2978;
          fVar82 = fStack_2914 + fStack_2954 + uStack_2978._4_4_;
          fVar83 = fStack_2910 + fStack_2950 + (float)uStack_2970;
          fVar84 = fStack_290c + fStack_294c + uStack_2970._4_4_;
          fVar85 = fStack_2908 + fStack_2948 + (float)uStack_2968;
          fVar86 = local_ac60 + local_ac20 + uStack_2968._4_4_;
          local_6ac0 = CONCAT44(fVar80,fVar76);
          uStack_6ab8 = CONCAT44(fVar82,fVar81);
          uStack_6ab0 = CONCAT44(fVar84,fVar83);
          uStack_6aa8 = CONCAT44(fVar86,fVar85);
          local_28e0 = local_ae20 * (float)local_5cc0;
          fStack_28dc = local_ae20 * local_5cc0._4_4_;
          fStack_28d8 = local_ae20 * (float)uStack_5cb8;
          fStack_28d4 = local_ae20 * uStack_5cb8._4_4_;
          fStack_28d0 = local_ae20 * (float)uStack_5cb0;
          fStack_28cc = local_ae20 * uStack_5cb0._4_4_;
          fStack_28c8 = local_ae20 * (float)uStack_5ca8;
          fVar76 = local_28e0 + fVar76;
          fVar80 = fStack_28dc + fVar80;
          fVar81 = fStack_28d8 + fVar81;
          fVar82 = fStack_28d4 + fVar82;
          fVar83 = fStack_28d0 + fVar83;
          fVar84 = fStack_28cc + fVar84;
          fVar85 = fStack_28c8 + fVar85;
          fVar86 = local_ae20 + fVar86;
          local_6b20 = CONCAT44(fVar80,fVar76);
          uStack_6b18 = CONCAT44(fVar82,fVar81);
          uStack_6b10 = CONCAT44(fVar84,fVar83);
          uStack_6b08 = CONCAT44(fVar86,fVar85);
          local_28a0 = local_ace0 * (float)local_5c80;
          fStack_289c = local_ace0 * local_5c80._4_4_;
          fStack_2898 = local_ace0 * (float)uStack_5c78;
          fStack_2894 = local_ace0 * uStack_5c78._4_4_;
          fStack_2890 = local_ace0 * (float)uStack_5c70;
          fStack_288c = local_ace0 * uStack_5c70._4_4_;
          fStack_2888 = local_ace0 * (float)uStack_5c68;
          fVar76 = local_28a0 + fVar76;
          fVar80 = fStack_289c + fVar80;
          fVar81 = fStack_2898 + fVar81;
          fVar82 = fStack_2894 + fVar82;
          fVar83 = fStack_2890 + fVar83;
          fVar84 = fStack_288c + fVar84;
          fVar85 = fStack_2888 + fVar85;
          fVar86 = local_ace0 + fVar86;
          local_6b80 = CONCAT44(fVar80,fVar76);
          uStack_6b78 = CONCAT44(fVar82,fVar81);
          uStack_6b70 = CONCAT44(fVar84,fVar83);
          uStack_6b68 = CONCAT44(fVar86,fVar85);
          local_2860 = local_ad20 * (float)local_5c40;
          fStack_285c = local_ad20 * local_5c40._4_4_;
          fStack_2858 = local_ad20 * (float)uStack_5c38;
          fStack_2854 = local_ad20 * uStack_5c38._4_4_;
          fStack_2850 = local_ad20 * (float)uStack_5c30;
          fStack_284c = local_ad20 * uStack_5c30._4_4_;
          fStack_2848 = local_ad20 * (float)uStack_5c28;
          fVar76 = local_2860 + fVar76;
          fVar80 = fStack_285c + fVar80;
          fVar81 = fStack_2858 + fVar81;
          fVar82 = fStack_2854 + fVar82;
          fVar83 = fStack_2850 + fVar83;
          fVar84 = fStack_284c + fVar84;
          fVar85 = fStack_2848 + fVar85;
          fVar86 = local_ad20 + fVar86;
          local_6be0 = CONCAT44(fVar80,fVar76);
          uStack_6bd8 = CONCAT44(fVar82,fVar81);
          uStack_6bd0 = CONCAT44(fVar84,fVar83);
          uStack_6bc8 = CONCAT44(fVar86,fVar85);
          local_2820 = local_ae60 * (float)local_5c00;
          fStack_281c = local_ae60 * local_5c00._4_4_;
          fStack_2818 = local_ae60 * (float)uStack_5bf8;
          fStack_2814 = local_ae60 * uStack_5bf8._4_4_;
          fStack_2810 = local_ae60 * (float)uStack_5bf0;
          fStack_280c = local_ae60 * uStack_5bf0._4_4_;
          fStack_2808 = local_ae60 * (float)uStack_5be8;
          fVar76 = local_2820 + fVar76;
          fVar80 = fStack_281c + fVar80;
          fVar81 = fStack_2818 + fVar81;
          fVar82 = fStack_2814 + fVar82;
          fVar83 = fStack_2810 + fVar83;
          fVar84 = fStack_280c + fVar84;
          fVar85 = fStack_2808 + fVar85;
          fVar86 = local_ae60 + fVar86;
          local_6c40 = CONCAT44(fVar80,fVar76);
          uStack_6c38 = CONCAT44(fVar82,fVar81);
          uStack_6c30 = CONCAT44(fVar84,fVar83);
          uStack_6c28 = CONCAT44(fVar86,fVar85);
          local_27e0 = local_ada0 * (float)local_5bc0;
          fStack_27dc = local_ada0 * local_5bc0._4_4_;
          fStack_27d8 = local_ada0 * (float)uStack_5bb8;
          fStack_27d4 = local_ada0 * uStack_5bb8._4_4_;
          fStack_27d0 = local_ada0 * (float)uStack_5bb0;
          fStack_27cc = local_ada0 * uStack_5bb0._4_4_;
          fStack_27c8 = local_ada0 * (float)uStack_5ba8;
          fVar76 = local_27e0 + fVar76;
          fVar80 = fStack_27dc + fVar80;
          fVar81 = fStack_27d8 + fVar81;
          fVar82 = fStack_27d4 + fVar82;
          fVar83 = fStack_27d0 + fVar83;
          fVar84 = fStack_27cc + fVar84;
          fVar85 = fStack_27c8 + fVar85;
          fVar86 = local_ada0 + fVar86;
          local_6ca0 = CONCAT44(fVar80,fVar76);
          uStack_6c98 = CONCAT44(fVar82,fVar81);
          uStack_6c90 = CONCAT44(fVar84,fVar83);
          uStack_6c88 = CONCAT44(fVar86,fVar85);
          local_27a0 = local_ade0 * (float)local_5b80;
          fStack_279c = local_ade0 * local_5b80._4_4_;
          fStack_2798 = local_ade0 * (float)uStack_5b78;
          fStack_2794 = local_ade0 * uStack_5b78._4_4_;
          fStack_2790 = local_ade0 * (float)uStack_5b70;
          fStack_278c = local_ade0 * uStack_5b70._4_4_;
          fStack_2788 = local_ade0 * (float)uStack_5b68;
          fVar76 = local_27a0 + fVar76;
          fVar80 = fStack_279c + fVar80;
          fVar81 = fStack_2798 + fVar81;
          fVar82 = fStack_2794 + fVar82;
          fVar83 = fStack_2790 + fVar83;
          fVar84 = fStack_278c + fVar84;
          fVar85 = fStack_2788 + fVar85;
          fVar86 = local_ade0 + fVar86;
          local_6d00 = CONCAT44(fVar80,fVar76);
          uStack_6cf8 = CONCAT44(fVar82,fVar81);
          uStack_6cf0 = CONCAT44(fVar84,fVar83);
          uStack_6ce8 = CONCAT44(fVar86,fVar85);
          local_2760 = local_aea0 * (float)local_5b40;
          fStack_275c = local_aea0 * local_5b40._4_4_;
          fStack_2758 = local_aea0 * (float)uStack_5b38;
          fStack_2754 = local_aea0 * uStack_5b38._4_4_;
          fStack_2750 = local_aea0 * (float)uStack_5b30;
          fStack_274c = local_aea0 * uStack_5b30._4_4_;
          fStack_2748 = local_aea0 * (float)uStack_5b28;
          local_c720 = CONCAT44(fStack_275c + fVar80,local_2760 + fVar76);
          uStack_c718 = CONCAT44(fStack_2754 + fVar82,fStack_2758 + fVar81);
          uStack_c710 = CONCAT44(fStack_274c + fVar84,fStack_2750 + fVar83);
          uStack_c708 = CONCAT44(local_aea0 + fVar86,fStack_2748 + fVar85);
          local_a6e8 = local_c2b0 + 8;
          *(undefined8 *)local_a6e8 = local_c700;
          *(undefined8 *)(local_c2b0 + 10) = uStack_c6f8;
          *(undefined8 *)(local_c2b0 + 0xc) = uStack_c6f0;
          *(undefined8 *)(local_c2b0 + 0xe) = uStack_c6e8;
          local_a728 = local_c2b8 + 8;
          *(undefined8 *)local_a728 = local_c720;
          *(undefined8 *)(local_c2b8 + 10) = uStack_c718;
          *(undefined8 *)(local_c2b8 + 0xc) = uStack_c710;
          *(undefined8 *)(local_c2b8 + 0xe) = uStack_c708;
          local_bfe8 = local_c2b0 + 0x10;
          local_6d60 = *(undefined8 *)local_bfe8;
          uStack_6d58 = *(undefined8 *)(local_c2b0 + 0x12);
          uStack_6d50 = *(undefined8 *)(local_c2b0 + 0x14);
          uStack_6d48 = *(undefined8 *)(local_c2b0 + 0x16);
          local_bff0 = local_c2b8 + 0x10;
          local_70c0 = *(undefined8 *)local_bff0;
          uStack_70b8 = *(undefined8 *)(local_c2b8 + 0x12);
          uStack_70b0 = *(undefined8 *)(local_c2b8 + 0x14);
          uStack_70a8 = *(undefined8 *)(local_c2b8 + 0x16);
          local_aea8 = local_c308 + 4;
          local_aee0 = *local_aea8;
          local_c7e0 = CONCAT44(local_aee0,local_aee0);
          uStack_c7d8 = CONCAT44(local_aee0,local_aee0);
          uStack_c7d0 = CONCAT44(local_aee0,local_aee0);
          uStack_c7c8 = CONCAT44(local_aee0,local_aee0);
          local_aee8 = local_c310 + 4;
          local_af20 = *local_aee8;
          local_c800 = CONCAT44(local_af20,local_af20);
          uStack_c7f8 = CONCAT44(local_af20,local_af20);
          uStack_c7f0 = CONCAT44(local_af20,local_af20);
          uStack_c7e8 = CONCAT44(local_af20,local_af20);
          local_af28 = local_c318 + 4;
          local_af60 = *local_af28;
          local_c820 = CONCAT44(local_af60,local_af60);
          uStack_c818 = CONCAT44(local_af60,local_af60);
          uStack_c810 = CONCAT44(local_af60,local_af60);
          uStack_c808 = CONCAT44(local_af60,local_af60);
          local_2720 = local_ac60 * (float)local_5f80;
          fStack_271c = local_ac60 * local_5f80._4_4_;
          fStack_2718 = local_ac60 * (float)uStack_5f78;
          fStack_2714 = local_ac60 * uStack_5f78._4_4_;
          fStack_2710 = local_ac60 * (float)uStack_5f70;
          fStack_270c = local_ac60 * uStack_5f70._4_4_;
          fStack_2708 = local_ac60 * (float)uStack_5f68;
          local_2740._0_4_ = (float)local_6d60;
          local_2740._4_4_ = (float)((ulong)local_6d60 >> 0x20);
          uStack_2738._0_4_ = (float)uStack_6d58;
          uStack_2738._4_4_ = (float)((ulong)uStack_6d58 >> 0x20);
          uStack_2730._0_4_ = (float)uStack_6d50;
          uStack_2730._4_4_ = (float)((ulong)uStack_6d50 >> 0x20);
          uStack_2728._0_4_ = (float)uStack_6d48;
          uStack_2728._4_4_ = (float)((ulong)uStack_6d48 >> 0x20);
          local_6dc0 = CONCAT44(fStack_271c + local_2740._4_4_,local_2720 + (float)local_2740);
          uStack_6db8 = CONCAT44(fStack_2714 + uStack_2738._4_4_,fStack_2718 + (float)uStack_2738);
          uStack_6db0 = CONCAT44(fStack_270c + uStack_2730._4_4_,fStack_2710 + (float)uStack_2730);
          uStack_6da8 = CONCAT44(local_ac60 + uStack_2728._4_4_,fStack_2708 + (float)uStack_2728);
          local_26e0 = local_ae20 * (float)local_5f40;
          fStack_26dc = local_ae20 * local_5f40._4_4_;
          fStack_26d8 = local_ae20 * (float)uStack_5f38;
          fStack_26d4 = local_ae20 * uStack_5f38._4_4_;
          fStack_26d0 = local_ae20 * (float)uStack_5f30;
          fStack_26cc = local_ae20 * uStack_5f30._4_4_;
          fStack_26c8 = local_ae20 * (float)uStack_5f28;
          fVar76 = local_26e0 + local_2720 + (float)local_2740;
          fVar80 = fStack_26dc + fStack_271c + local_2740._4_4_;
          fVar81 = fStack_26d8 + fStack_2718 + (float)uStack_2738;
          fVar82 = fStack_26d4 + fStack_2714 + uStack_2738._4_4_;
          fVar83 = fStack_26d0 + fStack_2710 + (float)uStack_2730;
          fVar84 = fStack_26cc + fStack_270c + uStack_2730._4_4_;
          fVar85 = fStack_26c8 + fStack_2708 + (float)uStack_2728;
          fVar86 = local_ae20 + local_ac60 + uStack_2728._4_4_;
          local_6e20 = CONCAT44(fVar80,fVar76);
          uStack_6e18 = CONCAT44(fVar82,fVar81);
          uStack_6e10 = CONCAT44(fVar84,fVar83);
          uStack_6e08 = CONCAT44(fVar86,fVar85);
          local_26a0 = local_aee0 * (float)local_5f00;
          fStack_269c = local_aee0 * local_5f00._4_4_;
          fStack_2698 = local_aee0 * (float)uStack_5ef8;
          fStack_2694 = local_aee0 * uStack_5ef8._4_4_;
          fStack_2690 = local_aee0 * (float)uStack_5ef0;
          fStack_268c = local_aee0 * uStack_5ef0._4_4_;
          fStack_2688 = local_aee0 * (float)uStack_5ee8;
          fVar76 = local_26a0 + fVar76;
          fVar80 = fStack_269c + fVar80;
          fVar81 = fStack_2698 + fVar81;
          fVar82 = fStack_2694 + fVar82;
          fVar83 = fStack_2690 + fVar83;
          fVar84 = fStack_268c + fVar84;
          fVar85 = fStack_2688 + fVar85;
          fVar86 = local_aee0 + fVar86;
          local_6e80 = CONCAT44(fVar80,fVar76);
          uStack_6e78 = CONCAT44(fVar82,fVar81);
          uStack_6e70 = CONCAT44(fVar84,fVar83);
          uStack_6e68 = CONCAT44(fVar86,fVar85);
          local_2660 = local_ad20 * (float)local_5ec0;
          fStack_265c = local_ad20 * local_5ec0._4_4_;
          fStack_2658 = local_ad20 * (float)uStack_5eb8;
          fStack_2654 = local_ad20 * uStack_5eb8._4_4_;
          fStack_2650 = local_ad20 * (float)uStack_5eb0;
          fStack_264c = local_ad20 * uStack_5eb0._4_4_;
          fStack_2648 = local_ad20 * (float)uStack_5ea8;
          fVar76 = local_2660 + fVar76;
          fVar80 = fStack_265c + fVar80;
          fVar81 = fStack_2658 + fVar81;
          fVar82 = fStack_2654 + fVar82;
          fVar83 = fStack_2650 + fVar83;
          fVar84 = fStack_264c + fVar84;
          fVar85 = fStack_2648 + fVar85;
          fVar86 = local_ad20 + fVar86;
          local_6ee0 = CONCAT44(fVar80,fVar76);
          uStack_6ed8 = CONCAT44(fVar82,fVar81);
          uStack_6ed0 = CONCAT44(fVar84,fVar83);
          uStack_6ec8 = CONCAT44(fVar86,fVar85);
          local_2620 = local_ae60 * (float)local_5e80;
          fStack_261c = local_ae60 * local_5e80._4_4_;
          fStack_2618 = local_ae60 * (float)uStack_5e78;
          fStack_2614 = local_ae60 * uStack_5e78._4_4_;
          fStack_2610 = local_ae60 * (float)uStack_5e70;
          fStack_260c = local_ae60 * uStack_5e70._4_4_;
          fStack_2608 = local_ae60 * (float)uStack_5e68;
          fVar76 = local_2620 + fVar76;
          fVar80 = fStack_261c + fVar80;
          fVar81 = fStack_2618 + fVar81;
          fVar82 = fStack_2614 + fVar82;
          fVar83 = fStack_2610 + fVar83;
          fVar84 = fStack_260c + fVar84;
          fVar85 = fStack_2608 + fVar85;
          fVar86 = local_ae60 + fVar86;
          local_6f40 = CONCAT44(fVar80,fVar76);
          uStack_6f38 = CONCAT44(fVar82,fVar81);
          uStack_6f30 = CONCAT44(fVar84,fVar83);
          uStack_6f28 = CONCAT44(fVar86,fVar85);
          local_25e0 = local_af20 * (float)local_5e40;
          fStack_25dc = local_af20 * local_5e40._4_4_;
          fStack_25d8 = local_af20 * (float)uStack_5e38;
          fStack_25d4 = local_af20 * uStack_5e38._4_4_;
          fStack_25d0 = local_af20 * (float)uStack_5e30;
          fStack_25cc = local_af20 * uStack_5e30._4_4_;
          fStack_25c8 = local_af20 * (float)uStack_5e28;
          fVar76 = local_25e0 + fVar76;
          fVar80 = fStack_25dc + fVar80;
          fVar81 = fStack_25d8 + fVar81;
          fVar82 = fStack_25d4 + fVar82;
          fVar83 = fStack_25d0 + fVar83;
          fVar84 = fStack_25cc + fVar84;
          fVar85 = fStack_25c8 + fVar85;
          fVar86 = local_af20 + fVar86;
          local_6fa0 = CONCAT44(fVar80,fVar76);
          uStack_6f98 = CONCAT44(fVar82,fVar81);
          uStack_6f90 = CONCAT44(fVar84,fVar83);
          uStack_6f88 = CONCAT44(fVar86,fVar85);
          local_25a0 = local_ade0 * (float)local_5e00;
          fStack_259c = local_ade0 * local_5e00._4_4_;
          fStack_2598 = local_ade0 * (float)uStack_5df8;
          fStack_2594 = local_ade0 * uStack_5df8._4_4_;
          fStack_2590 = local_ade0 * (float)uStack_5df0;
          fStack_258c = local_ade0 * uStack_5df0._4_4_;
          fStack_2588 = local_ade0 * (float)uStack_5de8;
          fVar76 = local_25a0 + fVar76;
          fVar80 = fStack_259c + fVar80;
          fVar81 = fStack_2598 + fVar81;
          fVar82 = fStack_2594 + fVar82;
          fVar83 = fStack_2590 + fVar83;
          fVar84 = fStack_258c + fVar84;
          fVar85 = fStack_2588 + fVar85;
          fVar86 = local_ade0 + fVar86;
          local_7000 = CONCAT44(fVar80,fVar76);
          uStack_6ff8 = CONCAT44(fVar82,fVar81);
          uStack_6ff0 = CONCAT44(fVar84,fVar83);
          uStack_6fe8 = CONCAT44(fVar86,fVar85);
          local_2560 = local_aea0 * (float)local_5dc0;
          fStack_255c = local_aea0 * local_5dc0._4_4_;
          fStack_2558 = local_aea0 * (float)uStack_5db8;
          fStack_2554 = local_aea0 * uStack_5db8._4_4_;
          fStack_2550 = local_aea0 * (float)uStack_5db0;
          fStack_254c = local_aea0 * uStack_5db0._4_4_;
          fStack_2548 = local_aea0 * (float)uStack_5da8;
          fVar76 = local_2560 + fVar76;
          fVar80 = fStack_255c + fVar80;
          fVar81 = fStack_2558 + fVar81;
          fVar82 = fStack_2554 + fVar82;
          fVar83 = fStack_2550 + fVar83;
          fVar84 = fStack_254c + fVar84;
          fVar85 = fStack_2548 + fVar85;
          fVar86 = local_aea0 + fVar86;
          local_7060 = CONCAT44(fVar80,fVar76);
          uStack_7058 = CONCAT44(fVar82,fVar81);
          uStack_7050 = CONCAT44(fVar84,fVar83);
          uStack_7048 = CONCAT44(fVar86,fVar85);
          local_2520 = local_af60 * (float)local_5d80;
          fStack_251c = local_af60 * local_5d80._4_4_;
          fStack_2518 = local_af60 * (float)uStack_5d78;
          fStack_2514 = local_af60 * uStack_5d78._4_4_;
          fStack_2510 = local_af60 * (float)uStack_5d70;
          fStack_250c = local_af60 * uStack_5d70._4_4_;
          fStack_2508 = local_af60 * (float)uStack_5d68;
          local_c7a0 = CONCAT44(fStack_251c + fVar80,local_2520 + fVar76);
          uStack_c798 = CONCAT44(fStack_2514 + fVar82,fStack_2518 + fVar81);
          uStack_c790 = CONCAT44(fStack_250c + fVar84,fStack_2510 + fVar83);
          uStack_c788 = CONCAT44(local_af60 + fVar86,fStack_2508 + fVar85);
          local_24e0 = local_ac60 * (float)local_5d40;
          fStack_24dc = local_ac60 * local_5d40._4_4_;
          fStack_24d8 = local_ac60 * (float)uStack_5d38;
          fStack_24d4 = local_ac60 * uStack_5d38._4_4_;
          fStack_24d0 = local_ac60 * (float)uStack_5d30;
          fStack_24cc = local_ac60 * uStack_5d30._4_4_;
          fStack_24c8 = local_ac60 * (float)uStack_5d28;
          local_2500._0_4_ = (float)local_70c0;
          local_2500._4_4_ = (float)((ulong)local_70c0 >> 0x20);
          uStack_24f8._0_4_ = (float)uStack_70b8;
          uStack_24f8._4_4_ = (float)((ulong)uStack_70b8 >> 0x20);
          uStack_24f0._0_4_ = (float)uStack_70b0;
          uStack_24f0._4_4_ = (float)((ulong)uStack_70b0 >> 0x20);
          uStack_24e8._0_4_ = (float)uStack_70a8;
          uStack_24e8._4_4_ = (float)((ulong)uStack_70a8 >> 0x20);
          local_7120 = CONCAT44(fStack_24dc + local_2500._4_4_,local_24e0 + (float)local_2500);
          uStack_7118 = CONCAT44(fStack_24d4 + uStack_24f8._4_4_,fStack_24d8 + (float)uStack_24f8);
          uStack_7110 = CONCAT44(fStack_24cc + uStack_24f0._4_4_,fStack_24d0 + (float)uStack_24f0);
          uStack_7108 = CONCAT44(local_ac60 + uStack_24e8._4_4_,fStack_24c8 + (float)uStack_24e8);
          local_24a0 = local_ae20 * (float)local_5d00;
          fStack_249c = local_ae20 * local_5d00._4_4_;
          fStack_2498 = local_ae20 * (float)uStack_5cf8;
          fStack_2494 = local_ae20 * uStack_5cf8._4_4_;
          fStack_2490 = local_ae20 * (float)uStack_5cf0;
          fStack_248c = local_ae20 * uStack_5cf0._4_4_;
          fStack_2488 = local_ae20 * (float)uStack_5ce8;
          fVar76 = local_24a0 + local_24e0 + (float)local_2500;
          fVar80 = fStack_249c + fStack_24dc + local_2500._4_4_;
          fVar81 = fStack_2498 + fStack_24d8 + (float)uStack_24f8;
          fVar82 = fStack_2494 + fStack_24d4 + uStack_24f8._4_4_;
          fVar83 = fStack_2490 + fStack_24d0 + (float)uStack_24f0;
          fVar84 = fStack_248c + fStack_24cc + uStack_24f0._4_4_;
          fVar85 = fStack_2488 + fStack_24c8 + (float)uStack_24e8;
          fVar86 = local_ae20 + local_ac60 + uStack_24e8._4_4_;
          local_7180 = CONCAT44(fVar80,fVar76);
          uStack_7178 = CONCAT44(fVar82,fVar81);
          uStack_7170 = CONCAT44(fVar84,fVar83);
          uStack_7168 = CONCAT44(fVar86,fVar85);
          local_2460 = local_aee0 * (float)local_5cc0;
          fStack_245c = local_aee0 * local_5cc0._4_4_;
          fStack_2458 = local_aee0 * (float)uStack_5cb8;
          fStack_2454 = local_aee0 * uStack_5cb8._4_4_;
          fStack_2450 = local_aee0 * (float)uStack_5cb0;
          fStack_244c = local_aee0 * uStack_5cb0._4_4_;
          fStack_2448 = local_aee0 * (float)uStack_5ca8;
          fVar76 = local_2460 + fVar76;
          fVar80 = fStack_245c + fVar80;
          fVar81 = fStack_2458 + fVar81;
          fVar82 = fStack_2454 + fVar82;
          fVar83 = fStack_2450 + fVar83;
          fVar84 = fStack_244c + fVar84;
          fVar85 = fStack_2448 + fVar85;
          fVar86 = local_aee0 + fVar86;
          local_71e0 = CONCAT44(fVar80,fVar76);
          uStack_71d8 = CONCAT44(fVar82,fVar81);
          uStack_71d0 = CONCAT44(fVar84,fVar83);
          uStack_71c8 = CONCAT44(fVar86,fVar85);
          local_2420 = local_ad20 * (float)local_5c80;
          fStack_241c = local_ad20 * local_5c80._4_4_;
          fStack_2418 = local_ad20 * (float)uStack_5c78;
          fStack_2414 = local_ad20 * uStack_5c78._4_4_;
          fStack_2410 = local_ad20 * (float)uStack_5c70;
          fStack_240c = local_ad20 * uStack_5c70._4_4_;
          fStack_2408 = local_ad20 * (float)uStack_5c68;
          fVar76 = local_2420 + fVar76;
          fVar80 = fStack_241c + fVar80;
          fVar81 = fStack_2418 + fVar81;
          fVar82 = fStack_2414 + fVar82;
          fVar83 = fStack_2410 + fVar83;
          fVar84 = fStack_240c + fVar84;
          fVar85 = fStack_2408 + fVar85;
          fVar86 = local_ad20 + fVar86;
          local_7240 = CONCAT44(fVar80,fVar76);
          uStack_7238 = CONCAT44(fVar82,fVar81);
          uStack_7230 = CONCAT44(fVar84,fVar83);
          uStack_7228 = CONCAT44(fVar86,fVar85);
          local_23e0 = local_ae60 * (float)local_5c40;
          fStack_23dc = local_ae60 * local_5c40._4_4_;
          fStack_23d8 = local_ae60 * (float)uStack_5c38;
          fStack_23d4 = local_ae60 * uStack_5c38._4_4_;
          fStack_23d0 = local_ae60 * (float)uStack_5c30;
          fStack_23cc = local_ae60 * uStack_5c30._4_4_;
          fStack_23c8 = local_ae60 * (float)uStack_5c28;
          fVar76 = local_23e0 + fVar76;
          fVar80 = fStack_23dc + fVar80;
          fVar81 = fStack_23d8 + fVar81;
          fVar82 = fStack_23d4 + fVar82;
          fVar83 = fStack_23d0 + fVar83;
          fVar84 = fStack_23cc + fVar84;
          fVar85 = fStack_23c8 + fVar85;
          fVar86 = local_ae60 + fVar86;
          local_72a0 = CONCAT44(fVar80,fVar76);
          uStack_7298 = CONCAT44(fVar82,fVar81);
          uStack_7290 = CONCAT44(fVar84,fVar83);
          uStack_7288 = CONCAT44(fVar86,fVar85);
          local_23a0 = local_af20 * (float)local_5c00;
          fStack_239c = local_af20 * local_5c00._4_4_;
          fStack_2398 = local_af20 * (float)uStack_5bf8;
          fStack_2394 = local_af20 * uStack_5bf8._4_4_;
          fStack_2390 = local_af20 * (float)uStack_5bf0;
          fStack_238c = local_af20 * uStack_5bf0._4_4_;
          fStack_2388 = local_af20 * (float)uStack_5be8;
          fVar76 = local_23a0 + fVar76;
          fVar80 = fStack_239c + fVar80;
          fVar81 = fStack_2398 + fVar81;
          fVar82 = fStack_2394 + fVar82;
          fVar83 = fStack_2390 + fVar83;
          fVar84 = fStack_238c + fVar84;
          fVar85 = fStack_2388 + fVar85;
          fVar86 = local_af20 + fVar86;
          local_7300 = CONCAT44(fVar80,fVar76);
          uStack_72f8 = CONCAT44(fVar82,fVar81);
          uStack_72f0 = CONCAT44(fVar84,fVar83);
          uStack_72e8 = CONCAT44(fVar86,fVar85);
          local_2360 = local_ade0 * (float)local_5bc0;
          fStack_235c = local_ade0 * local_5bc0._4_4_;
          fStack_2358 = local_ade0 * (float)uStack_5bb8;
          fStack_2354 = local_ade0 * uStack_5bb8._4_4_;
          fStack_2350 = local_ade0 * (float)uStack_5bb0;
          fStack_234c = local_ade0 * uStack_5bb0._4_4_;
          fStack_2348 = local_ade0 * (float)uStack_5ba8;
          fVar76 = local_2360 + fVar76;
          fVar80 = fStack_235c + fVar80;
          fVar81 = fStack_2358 + fVar81;
          fVar82 = fStack_2354 + fVar82;
          fVar83 = fStack_2350 + fVar83;
          fVar84 = fStack_234c + fVar84;
          fVar85 = fStack_2348 + fVar85;
          fVar86 = local_ade0 + fVar86;
          local_7360 = CONCAT44(fVar80,fVar76);
          uStack_7358 = CONCAT44(fVar82,fVar81);
          uStack_7350 = CONCAT44(fVar84,fVar83);
          uStack_7348 = CONCAT44(fVar86,fVar85);
          local_2320 = local_aea0 * (float)local_5b80;
          fStack_231c = local_aea0 * local_5b80._4_4_;
          fStack_2318 = local_aea0 * (float)uStack_5b78;
          fStack_2314 = local_aea0 * uStack_5b78._4_4_;
          fStack_2310 = local_aea0 * (float)uStack_5b70;
          fStack_230c = local_aea0 * uStack_5b70._4_4_;
          fStack_2308 = local_aea0 * (float)uStack_5b68;
          fVar76 = local_2320 + fVar76;
          fVar80 = fStack_231c + fVar80;
          fVar81 = fStack_2318 + fVar81;
          fVar82 = fStack_2314 + fVar82;
          fVar83 = fStack_2310 + fVar83;
          fVar84 = fStack_230c + fVar84;
          fVar85 = fStack_2308 + fVar85;
          fVar86 = local_aea0 + fVar86;
          local_73c0 = CONCAT44(fVar80,fVar76);
          uStack_73b8 = CONCAT44(fVar82,fVar81);
          uStack_73b0 = CONCAT44(fVar84,fVar83);
          uStack_73a8 = CONCAT44(fVar86,fVar85);
          local_22e0 = local_af60 * (float)local_5b40;
          fStack_22dc = local_af60 * local_5b40._4_4_;
          fStack_22d8 = local_af60 * (float)uStack_5b38;
          fStack_22d4 = local_af60 * uStack_5b38._4_4_;
          fStack_22d0 = local_af60 * (float)uStack_5b30;
          fStack_22cc = local_af60 * uStack_5b30._4_4_;
          fStack_22c8 = local_af60 * (float)uStack_5b28;
          local_c7c0 = CONCAT44(fStack_22dc + fVar80,local_22e0 + fVar76);
          uStack_c7b8 = CONCAT44(fStack_22d4 + fVar82,fStack_22d8 + fVar81);
          uStack_c7b0 = CONCAT44(fStack_22cc + fVar84,fStack_22d0 + fVar83);
          uStack_c7a8 = CONCAT44(local_af60 + fVar86,fStack_22c8 + fVar85);
          local_a768 = local_c2b0 + 0x10;
          *(undefined8 *)local_a768 = local_c7a0;
          *(undefined8 *)(local_c2b0 + 0x12) = uStack_c798;
          *(undefined8 *)(local_c2b0 + 0x14) = uStack_c790;
          *(undefined8 *)(local_c2b0 + 0x16) = uStack_c788;
          local_a7a8 = local_c2b8 + 0x10;
          *(undefined8 *)local_a7a8 = local_c7c0;
          *(undefined8 *)(local_c2b8 + 0x12) = uStack_c7b8;
          *(undefined8 *)(local_c2b8 + 0x14) = uStack_c7b0;
          *(undefined8 *)(local_c2b8 + 0x16) = uStack_c7a8;
          local_af68 = local_c308 + 5;
          local_afa0 = *local_af68;
          local_c840 = CONCAT44(local_afa0,local_afa0);
          uStack_c838 = CONCAT44(local_afa0,local_afa0);
          uStack_c830 = CONCAT44(local_afa0,local_afa0);
          uStack_c828 = CONCAT44(local_afa0,local_afa0);
          local_afa8 = local_c310 + 5;
          local_afe0 = *local_afa8;
          local_c860 = CONCAT44(local_afe0,local_afe0);
          uStack_c858 = CONCAT44(local_afe0,local_afe0);
          uStack_c850 = CONCAT44(local_afe0,local_afe0);
          uStack_c848 = CONCAT44(local_afe0,local_afe0);
          local_afe8 = local_c318 + 5;
          local_b020 = *local_afe8;
          local_c880 = CONCAT44(local_b020,local_b020);
          uStack_c878 = CONCAT44(local_b020,local_b020);
          uStack_c870 = CONCAT44(local_b020,local_b020);
          uStack_c868 = CONCAT44(local_b020,local_b020);
          local_bff8 = local_c2b0 + 0x18;
          local_7420 = *(undefined8 *)local_bff8;
          uStack_7418 = *(undefined8 *)(local_c2b0 + 0x1a);
          uStack_7410 = *(undefined8 *)(local_c2b0 + 0x1c);
          uStack_7408 = *(undefined8 *)(local_c2b0 + 0x1e);
          local_c000 = local_c2b8 + 0x18;
          local_7780 = *(undefined8 *)local_c000;
          uStack_7778 = *(undefined8 *)(local_c2b8 + 0x1a);
          uStack_7770 = *(undefined8 *)(local_c2b8 + 0x1c);
          uStack_7768 = *(undefined8 *)(local_c2b8 + 0x1e);
          local_22a0 = local_ae20 * (float)local_5f80;
          fStack_229c = local_ae20 * local_5f80._4_4_;
          fStack_2298 = local_ae20 * (float)uStack_5f78;
          fStack_2294 = local_ae20 * uStack_5f78._4_4_;
          fStack_2290 = local_ae20 * (float)uStack_5f70;
          fStack_228c = local_ae20 * uStack_5f70._4_4_;
          fStack_2288 = local_ae20 * (float)uStack_5f68;
          local_22c0._0_4_ = (float)local_7420;
          local_22c0._4_4_ = (float)((ulong)local_7420 >> 0x20);
          uStack_22b8._0_4_ = (float)uStack_7418;
          uStack_22b8._4_4_ = (float)((ulong)uStack_7418 >> 0x20);
          uStack_22b0._0_4_ = (float)uStack_7410;
          uStack_22b0._4_4_ = (float)((ulong)uStack_7410 >> 0x20);
          uStack_22a8._0_4_ = (float)uStack_7408;
          uStack_22a8._4_4_ = (float)((ulong)uStack_7408 >> 0x20);
          local_7480 = CONCAT44(fStack_229c + local_22c0._4_4_,local_22a0 + (float)local_22c0);
          uStack_7478 = CONCAT44(fStack_2294 + uStack_22b8._4_4_,fStack_2298 + (float)uStack_22b8);
          uStack_7470 = CONCAT44(fStack_228c + uStack_22b0._4_4_,fStack_2290 + (float)uStack_22b0);
          uStack_7468 = CONCAT44(local_ae20 + uStack_22a8._4_4_,fStack_2288 + (float)uStack_22a8);
          local_2260 = local_aee0 * (float)local_5f40;
          fStack_225c = local_aee0 * local_5f40._4_4_;
          fStack_2258 = local_aee0 * (float)uStack_5f38;
          fStack_2254 = local_aee0 * uStack_5f38._4_4_;
          fStack_2250 = local_aee0 * (float)uStack_5f30;
          fStack_224c = local_aee0 * uStack_5f30._4_4_;
          fStack_2248 = local_aee0 * (float)uStack_5f28;
          fVar76 = local_2260 + local_22a0 + (float)local_22c0;
          fVar80 = fStack_225c + fStack_229c + local_22c0._4_4_;
          fVar81 = fStack_2258 + fStack_2298 + (float)uStack_22b8;
          fVar82 = fStack_2254 + fStack_2294 + uStack_22b8._4_4_;
          fVar83 = fStack_2250 + fStack_2290 + (float)uStack_22b0;
          fVar84 = fStack_224c + fStack_228c + uStack_22b0._4_4_;
          fVar85 = fStack_2248 + fStack_2288 + (float)uStack_22a8;
          fVar86 = local_aee0 + local_ae20 + uStack_22a8._4_4_;
          local_74e0 = CONCAT44(fVar80,fVar76);
          uStack_74d8 = CONCAT44(fVar82,fVar81);
          uStack_74d0 = CONCAT44(fVar84,fVar83);
          uStack_74c8 = CONCAT44(fVar86,fVar85);
          local_2220 = local_afa0 * (float)local_5f00;
          fStack_221c = local_afa0 * local_5f00._4_4_;
          fStack_2218 = local_afa0 * (float)uStack_5ef8;
          fStack_2214 = local_afa0 * uStack_5ef8._4_4_;
          fStack_2210 = local_afa0 * (float)uStack_5ef0;
          fStack_220c = local_afa0 * uStack_5ef0._4_4_;
          fStack_2208 = local_afa0 * (float)uStack_5ee8;
          fVar76 = local_2220 + fVar76;
          fVar80 = fStack_221c + fVar80;
          fVar81 = fStack_2218 + fVar81;
          fVar82 = fStack_2214 + fVar82;
          fVar83 = fStack_2210 + fVar83;
          fVar84 = fStack_220c + fVar84;
          fVar85 = fStack_2208 + fVar85;
          fVar86 = local_afa0 + fVar86;
          local_7540 = CONCAT44(fVar80,fVar76);
          uStack_7538 = CONCAT44(fVar82,fVar81);
          uStack_7530 = CONCAT44(fVar84,fVar83);
          uStack_7528 = CONCAT44(fVar86,fVar85);
          local_21e0 = local_ae60 * (float)local_5ec0;
          fStack_21dc = local_ae60 * local_5ec0._4_4_;
          fStack_21d8 = local_ae60 * (float)uStack_5eb8;
          fStack_21d4 = local_ae60 * uStack_5eb8._4_4_;
          fStack_21d0 = local_ae60 * (float)uStack_5eb0;
          fStack_21cc = local_ae60 * uStack_5eb0._4_4_;
          fStack_21c8 = local_ae60 * (float)uStack_5ea8;
          fVar76 = local_21e0 + fVar76;
          fVar80 = fStack_21dc + fVar80;
          fVar81 = fStack_21d8 + fVar81;
          fVar82 = fStack_21d4 + fVar82;
          fVar83 = fStack_21d0 + fVar83;
          fVar84 = fStack_21cc + fVar84;
          fVar85 = fStack_21c8 + fVar85;
          fVar86 = local_ae60 + fVar86;
          local_75a0 = CONCAT44(fVar80,fVar76);
          uStack_7598 = CONCAT44(fVar82,fVar81);
          uStack_7590 = CONCAT44(fVar84,fVar83);
          uStack_7588 = CONCAT44(fVar86,fVar85);
          local_21a0 = local_af20 * (float)local_5e80;
          fStack_219c = local_af20 * local_5e80._4_4_;
          fStack_2198 = local_af20 * (float)uStack_5e78;
          fStack_2194 = local_af20 * uStack_5e78._4_4_;
          fStack_2190 = local_af20 * (float)uStack_5e70;
          fStack_218c = local_af20 * uStack_5e70._4_4_;
          fStack_2188 = local_af20 * (float)uStack_5e68;
          fVar76 = local_21a0 + fVar76;
          fVar80 = fStack_219c + fVar80;
          fVar81 = fStack_2198 + fVar81;
          fVar82 = fStack_2194 + fVar82;
          fVar83 = fStack_2190 + fVar83;
          fVar84 = fStack_218c + fVar84;
          fVar85 = fStack_2188 + fVar85;
          fVar86 = local_af20 + fVar86;
          local_7600 = CONCAT44(fVar80,fVar76);
          uStack_75f8 = CONCAT44(fVar82,fVar81);
          uStack_75f0 = CONCAT44(fVar84,fVar83);
          uStack_75e8 = CONCAT44(fVar86,fVar85);
          local_2160 = local_afe0 * (float)local_5e40;
          fStack_215c = local_afe0 * local_5e40._4_4_;
          fStack_2158 = local_afe0 * (float)uStack_5e38;
          fStack_2154 = local_afe0 * uStack_5e38._4_4_;
          fStack_2150 = local_afe0 * (float)uStack_5e30;
          fStack_214c = local_afe0 * uStack_5e30._4_4_;
          fStack_2148 = local_afe0 * (float)uStack_5e28;
          fVar76 = local_2160 + fVar76;
          fVar80 = fStack_215c + fVar80;
          fVar81 = fStack_2158 + fVar81;
          fVar82 = fStack_2154 + fVar82;
          fVar83 = fStack_2150 + fVar83;
          fVar84 = fStack_214c + fVar84;
          fVar85 = fStack_2148 + fVar85;
          fVar86 = local_afe0 + fVar86;
          local_7660 = CONCAT44(fVar80,fVar76);
          uStack_7658 = CONCAT44(fVar82,fVar81);
          uStack_7650 = CONCAT44(fVar84,fVar83);
          uStack_7648 = CONCAT44(fVar86,fVar85);
          local_2120 = local_aea0 * (float)local_5e00;
          fStack_211c = local_aea0 * local_5e00._4_4_;
          fStack_2118 = local_aea0 * (float)uStack_5df8;
          fStack_2114 = local_aea0 * uStack_5df8._4_4_;
          fStack_2110 = local_aea0 * (float)uStack_5df0;
          fStack_210c = local_aea0 * uStack_5df0._4_4_;
          fStack_2108 = local_aea0 * (float)uStack_5de8;
          fVar76 = local_2120 + fVar76;
          fVar80 = fStack_211c + fVar80;
          fVar81 = fStack_2118 + fVar81;
          fVar82 = fStack_2114 + fVar82;
          fVar83 = fStack_2110 + fVar83;
          fVar84 = fStack_210c + fVar84;
          fVar85 = fStack_2108 + fVar85;
          fVar86 = local_aea0 + fVar86;
          local_76c0 = CONCAT44(fVar80,fVar76);
          uStack_76b8 = CONCAT44(fVar82,fVar81);
          uStack_76b0 = CONCAT44(fVar84,fVar83);
          uStack_76a8 = CONCAT44(fVar86,fVar85);
          local_20e0 = local_af60 * (float)local_5dc0;
          fStack_20dc = local_af60 * local_5dc0._4_4_;
          fStack_20d8 = local_af60 * (float)uStack_5db8;
          fStack_20d4 = local_af60 * uStack_5db8._4_4_;
          fStack_20d0 = local_af60 * (float)uStack_5db0;
          fStack_20cc = local_af60 * uStack_5db0._4_4_;
          fStack_20c8 = local_af60 * (float)uStack_5da8;
          fVar76 = local_20e0 + fVar76;
          fVar80 = fStack_20dc + fVar80;
          fVar81 = fStack_20d8 + fVar81;
          fVar82 = fStack_20d4 + fVar82;
          fVar83 = fStack_20d0 + fVar83;
          fVar84 = fStack_20cc + fVar84;
          fVar85 = fStack_20c8 + fVar85;
          fVar86 = local_af60 + fVar86;
          local_7720 = CONCAT44(fVar80,fVar76);
          uStack_7718 = CONCAT44(fVar82,fVar81);
          uStack_7710 = CONCAT44(fVar84,fVar83);
          uStack_7708 = CONCAT44(fVar86,fVar85);
          local_20a0 = local_b020 * (float)local_5d80;
          fStack_209c = local_b020 * local_5d80._4_4_;
          fStack_2098 = local_b020 * (float)uStack_5d78;
          fStack_2094 = local_b020 * uStack_5d78._4_4_;
          fStack_2090 = local_b020 * (float)uStack_5d70;
          fStack_208c = local_b020 * uStack_5d70._4_4_;
          fStack_2088 = local_b020 * (float)uStack_5d68;
          local_c8a0 = CONCAT44(fStack_209c + fVar80,local_20a0 + fVar76);
          uStack_c898 = CONCAT44(fStack_2094 + fVar82,fStack_2098 + fVar81);
          uStack_c890 = CONCAT44(fStack_208c + fVar84,fStack_2090 + fVar83);
          uStack_c888 = CONCAT44(local_b020 + fVar86,fStack_2088 + fVar85);
          local_2060 = local_ae20 * (float)local_5d40;
          fStack_205c = local_ae20 * local_5d40._4_4_;
          fStack_2058 = local_ae20 * (float)uStack_5d38;
          fStack_2054 = local_ae20 * uStack_5d38._4_4_;
          fStack_2050 = local_ae20 * (float)uStack_5d30;
          fStack_204c = local_ae20 * uStack_5d30._4_4_;
          fStack_2048 = local_ae20 * (float)uStack_5d28;
          local_2080._0_4_ = (float)local_7780;
          local_2080._4_4_ = (float)((ulong)local_7780 >> 0x20);
          uStack_2078._0_4_ = (float)uStack_7778;
          uStack_2078._4_4_ = (float)((ulong)uStack_7778 >> 0x20);
          uStack_2070._0_4_ = (float)uStack_7770;
          uStack_2070._4_4_ = (float)((ulong)uStack_7770 >> 0x20);
          uStack_2068._0_4_ = (float)uStack_7768;
          uStack_2068._4_4_ = (float)((ulong)uStack_7768 >> 0x20);
          local_77e0 = CONCAT44(fStack_205c + local_2080._4_4_,local_2060 + (float)local_2080);
          uStack_77d8 = CONCAT44(fStack_2054 + uStack_2078._4_4_,fStack_2058 + (float)uStack_2078);
          uStack_77d0 = CONCAT44(fStack_204c + uStack_2070._4_4_,fStack_2050 + (float)uStack_2070);
          uStack_77c8 = CONCAT44(local_ae20 + uStack_2068._4_4_,fStack_2048 + (float)uStack_2068);
          local_2020 = local_aee0 * (float)local_5d00;
          fStack_201c = local_aee0 * local_5d00._4_4_;
          fStack_2018 = local_aee0 * (float)uStack_5cf8;
          fStack_2014 = local_aee0 * uStack_5cf8._4_4_;
          fStack_2010 = local_aee0 * (float)uStack_5cf0;
          fStack_200c = local_aee0 * uStack_5cf0._4_4_;
          fStack_2008 = local_aee0 * (float)uStack_5ce8;
          fVar76 = local_2020 + local_2060 + (float)local_2080;
          fVar80 = fStack_201c + fStack_205c + local_2080._4_4_;
          fVar81 = fStack_2018 + fStack_2058 + (float)uStack_2078;
          fVar82 = fStack_2014 + fStack_2054 + uStack_2078._4_4_;
          fVar83 = fStack_2010 + fStack_2050 + (float)uStack_2070;
          fVar84 = fStack_200c + fStack_204c + uStack_2070._4_4_;
          fVar85 = fStack_2008 + fStack_2048 + (float)uStack_2068;
          fVar86 = local_aee0 + local_ae20 + uStack_2068._4_4_;
          local_7840 = CONCAT44(fVar80,fVar76);
          uStack_7838 = CONCAT44(fVar82,fVar81);
          uStack_7830 = CONCAT44(fVar84,fVar83);
          uStack_7828 = CONCAT44(fVar86,fVar85);
          local_1fe0 = local_afa0 * (float)local_5cc0;
          fStack_1fdc = local_afa0 * local_5cc0._4_4_;
          fStack_1fd8 = local_afa0 * (float)uStack_5cb8;
          fStack_1fd4 = local_afa0 * uStack_5cb8._4_4_;
          fStack_1fd0 = local_afa0 * (float)uStack_5cb0;
          fStack_1fcc = local_afa0 * uStack_5cb0._4_4_;
          fStack_1fc8 = local_afa0 * (float)uStack_5ca8;
          fVar76 = local_1fe0 + fVar76;
          fVar80 = fStack_1fdc + fVar80;
          fVar81 = fStack_1fd8 + fVar81;
          fVar82 = fStack_1fd4 + fVar82;
          fVar83 = fStack_1fd0 + fVar83;
          fVar84 = fStack_1fcc + fVar84;
          fVar85 = fStack_1fc8 + fVar85;
          fVar86 = local_afa0 + fVar86;
          local_78a0 = CONCAT44(fVar80,fVar76);
          uStack_7898 = CONCAT44(fVar82,fVar81);
          uStack_7890 = CONCAT44(fVar84,fVar83);
          uStack_7888 = CONCAT44(fVar86,fVar85);
          local_1fa0 = local_ae60 * (float)local_5c80;
          fStack_1f9c = local_ae60 * local_5c80._4_4_;
          fStack_1f98 = local_ae60 * (float)uStack_5c78;
          fStack_1f94 = local_ae60 * uStack_5c78._4_4_;
          fStack_1f90 = local_ae60 * (float)uStack_5c70;
          fStack_1f8c = local_ae60 * uStack_5c70._4_4_;
          fStack_1f88 = local_ae60 * (float)uStack_5c68;
          fVar76 = local_1fa0 + fVar76;
          fVar80 = fStack_1f9c + fVar80;
          fVar81 = fStack_1f98 + fVar81;
          fVar82 = fStack_1f94 + fVar82;
          fVar83 = fStack_1f90 + fVar83;
          fVar84 = fStack_1f8c + fVar84;
          fVar85 = fStack_1f88 + fVar85;
          fVar86 = local_ae60 + fVar86;
          local_7900 = CONCAT44(fVar80,fVar76);
          uStack_78f8 = CONCAT44(fVar82,fVar81);
          uStack_78f0 = CONCAT44(fVar84,fVar83);
          uStack_78e8 = CONCAT44(fVar86,fVar85);
          local_1f60 = local_af20 * (float)local_5c40;
          fStack_1f5c = local_af20 * local_5c40._4_4_;
          fStack_1f58 = local_af20 * (float)uStack_5c38;
          fStack_1f54 = local_af20 * uStack_5c38._4_4_;
          fStack_1f50 = local_af20 * (float)uStack_5c30;
          fStack_1f4c = local_af20 * uStack_5c30._4_4_;
          fStack_1f48 = local_af20 * (float)uStack_5c28;
          fVar76 = local_1f60 + fVar76;
          fVar80 = fStack_1f5c + fVar80;
          fVar81 = fStack_1f58 + fVar81;
          fVar82 = fStack_1f54 + fVar82;
          fVar83 = fStack_1f50 + fVar83;
          fVar84 = fStack_1f4c + fVar84;
          fVar85 = fStack_1f48 + fVar85;
          fVar86 = local_af20 + fVar86;
          local_7960 = CONCAT44(fVar80,fVar76);
          uStack_7958 = CONCAT44(fVar82,fVar81);
          uStack_7950 = CONCAT44(fVar84,fVar83);
          uStack_7948 = CONCAT44(fVar86,fVar85);
          local_1f20 = local_afe0 * (float)local_5c00;
          fStack_1f1c = local_afe0 * local_5c00._4_4_;
          fStack_1f18 = local_afe0 * (float)uStack_5bf8;
          fStack_1f14 = local_afe0 * uStack_5bf8._4_4_;
          fStack_1f10 = local_afe0 * (float)uStack_5bf0;
          fStack_1f0c = local_afe0 * uStack_5bf0._4_4_;
          fStack_1f08 = local_afe0 * (float)uStack_5be8;
          fVar76 = local_1f20 + fVar76;
          fVar80 = fStack_1f1c + fVar80;
          fVar81 = fStack_1f18 + fVar81;
          fVar82 = fStack_1f14 + fVar82;
          fVar83 = fStack_1f10 + fVar83;
          fVar84 = fStack_1f0c + fVar84;
          fVar85 = fStack_1f08 + fVar85;
          fVar86 = local_afe0 + fVar86;
          local_79c0 = CONCAT44(fVar80,fVar76);
          uStack_79b8 = CONCAT44(fVar82,fVar81);
          uStack_79b0 = CONCAT44(fVar84,fVar83);
          uStack_79a8 = CONCAT44(fVar86,fVar85);
          local_1ee0 = local_aea0 * (float)local_5bc0;
          fStack_1edc = local_aea0 * local_5bc0._4_4_;
          fStack_1ed8 = local_aea0 * (float)uStack_5bb8;
          fStack_1ed4 = local_aea0 * uStack_5bb8._4_4_;
          fStack_1ed0 = local_aea0 * (float)uStack_5bb0;
          fStack_1ecc = local_aea0 * uStack_5bb0._4_4_;
          fStack_1ec8 = local_aea0 * (float)uStack_5ba8;
          fVar76 = local_1ee0 + fVar76;
          fVar80 = fStack_1edc + fVar80;
          fVar81 = fStack_1ed8 + fVar81;
          fVar82 = fStack_1ed4 + fVar82;
          fVar83 = fStack_1ed0 + fVar83;
          fVar84 = fStack_1ecc + fVar84;
          fVar85 = fStack_1ec8 + fVar85;
          fVar86 = local_aea0 + fVar86;
          local_7a20 = CONCAT44(fVar80,fVar76);
          uStack_7a18 = CONCAT44(fVar82,fVar81);
          uStack_7a10 = CONCAT44(fVar84,fVar83);
          uStack_7a08 = CONCAT44(fVar86,fVar85);
          local_1ea0 = local_af60 * (float)local_5b80;
          fStack_1e9c = local_af60 * local_5b80._4_4_;
          fStack_1e98 = local_af60 * (float)uStack_5b78;
          fStack_1e94 = local_af60 * uStack_5b78._4_4_;
          fStack_1e90 = local_af60 * (float)uStack_5b70;
          fStack_1e8c = local_af60 * uStack_5b70._4_4_;
          fStack_1e88 = local_af60 * (float)uStack_5b68;
          fVar76 = local_1ea0 + fVar76;
          fVar80 = fStack_1e9c + fVar80;
          fVar81 = fStack_1e98 + fVar81;
          fVar82 = fStack_1e94 + fVar82;
          fVar83 = fStack_1e90 + fVar83;
          fVar84 = fStack_1e8c + fVar84;
          fVar85 = fStack_1e88 + fVar85;
          fVar86 = local_af60 + fVar86;
          local_7a80 = CONCAT44(fVar80,fVar76);
          uStack_7a78 = CONCAT44(fVar82,fVar81);
          uStack_7a70 = CONCAT44(fVar84,fVar83);
          uStack_7a68 = CONCAT44(fVar86,fVar85);
          local_1e60 = local_b020 * (float)local_5b40;
          fStack_1e5c = local_b020 * local_5b40._4_4_;
          fStack_1e58 = local_b020 * (float)uStack_5b38;
          fStack_1e54 = local_b020 * uStack_5b38._4_4_;
          fStack_1e50 = local_b020 * (float)uStack_5b30;
          fStack_1e4c = local_b020 * uStack_5b30._4_4_;
          fStack_1e48 = local_b020 * (float)uStack_5b28;
          local_c8c0 = CONCAT44(fStack_1e5c + fVar80,local_1e60 + fVar76);
          uStack_c8b8 = CONCAT44(fStack_1e54 + fVar82,fStack_1e58 + fVar81);
          uStack_c8b0 = CONCAT44(fStack_1e4c + fVar84,fStack_1e50 + fVar83);
          uStack_c8a8 = CONCAT44(local_b020 + fVar86,fStack_1e48 + fVar85);
          local_a7e8 = local_c2b0 + 0x18;
          *(undefined8 *)local_a7e8 = local_c8a0;
          *(undefined8 *)(local_c2b0 + 0x1a) = uStack_c898;
          *(undefined8 *)(local_c2b0 + 0x1c) = uStack_c890;
          *(undefined8 *)(local_c2b0 + 0x1e) = uStack_c888;
          local_a828 = local_c2b8 + 0x18;
          *(undefined8 *)local_a828 = local_c8c0;
          *(undefined8 *)(local_c2b8 + 0x1a) = uStack_c8b8;
          *(undefined8 *)(local_c2b8 + 0x1c) = uStack_c8b0;
          *(undefined8 *)(local_c2b8 + 0x1e) = uStack_c8a8;
          local_c308 = local_c308 + 4;
          local_c310 = local_c310 + 4;
          local_c318 = local_c318 + 4;
          local_c2b0 = local_c2b0 + 0x20;
          local_c2b8 = local_c2b8 + 0x20;
          local_c568 = local_c568 + 4;
          fStack_b01c = local_b020;
          fStack_b018 = local_b020;
          fStack_b014 = local_b020;
          fStack_b010 = local_b020;
          fStack_b00c = local_b020;
          fStack_b008 = local_b020;
          fStack_b004 = local_b020;
          local_afec = local_b020;
          fStack_afdc = local_afe0;
          fStack_afd8 = local_afe0;
          fStack_afd4 = local_afe0;
          fStack_afd0 = local_afe0;
          fStack_afcc = local_afe0;
          fStack_afc8 = local_afe0;
          fStack_afc4 = local_afe0;
          local_afac = local_afe0;
          fStack_af9c = local_afa0;
          fStack_af98 = local_afa0;
          fStack_af94 = local_afa0;
          fStack_af90 = local_afa0;
          fStack_af8c = local_afa0;
          fStack_af88 = local_afa0;
          fStack_af84 = local_afa0;
          local_af6c = local_afa0;
          fStack_af5c = local_af60;
          fStack_af58 = local_af60;
          fStack_af54 = local_af60;
          fStack_af50 = local_af60;
          fStack_af4c = local_af60;
          fStack_af48 = local_af60;
          fStack_af44 = local_af60;
          local_af2c = local_af60;
          fStack_af1c = local_af20;
          fStack_af18 = local_af20;
          fStack_af14 = local_af20;
          fStack_af10 = local_af20;
          fStack_af0c = local_af20;
          fStack_af08 = local_af20;
          fStack_af04 = local_af20;
          local_aeec = local_af20;
          fStack_aedc = local_aee0;
          fStack_aed8 = local_aee0;
          fStack_aed4 = local_aee0;
          fStack_aed0 = local_aee0;
          fStack_aecc = local_aee0;
          fStack_aec8 = local_aee0;
          fStack_aec4 = local_aee0;
          local_aeac = local_aee0;
          fStack_ae9c = local_aea0;
          fStack_ae98 = local_aea0;
          fStack_ae94 = local_aea0;
          fStack_ae90 = local_aea0;
          fStack_ae8c = local_aea0;
          fStack_ae88 = local_aea0;
          fStack_ae84 = local_aea0;
          local_ae6c = local_aea0;
          fStack_ae5c = local_ae60;
          fStack_ae58 = local_ae60;
          fStack_ae54 = local_ae60;
          fStack_ae50 = local_ae60;
          fStack_ae4c = local_ae60;
          fStack_ae48 = local_ae60;
          fStack_ae44 = local_ae60;
          local_ae2c = local_ae60;
          fStack_ae1c = local_ae20;
          fStack_ae18 = local_ae20;
          fStack_ae14 = local_ae20;
          fStack_ae10 = local_ae20;
          fStack_ae0c = local_ae20;
          fStack_ae08 = local_ae20;
          fStack_ae04 = local_ae20;
          local_adec = local_ae20;
          fStack_addc = local_ade0;
          fStack_add8 = local_ade0;
          fStack_add4 = local_ade0;
          fStack_add0 = local_ade0;
          fStack_adcc = local_ade0;
          fStack_adc8 = local_ade0;
          fStack_adc4 = local_ade0;
          local_adac = local_ade0;
          fStack_ad9c = local_ada0;
          fStack_ad98 = local_ada0;
          fStack_ad94 = local_ada0;
          fStack_ad90 = local_ada0;
          fStack_ad8c = local_ada0;
          fStack_ad88 = local_ada0;
          fStack_ad84 = local_ada0;
          local_ad6c = local_ada0;
          fStack_ad5c = local_ad60;
          fStack_ad58 = local_ad60;
          fStack_ad54 = local_ad60;
          fStack_ad50 = local_ad60;
          fStack_ad4c = local_ad60;
          fStack_ad48 = local_ad60;
          fStack_ad44 = local_ad60;
          local_ad2c = local_ad60;
          fStack_ad1c = local_ad20;
          fStack_ad18 = local_ad20;
          fStack_ad14 = local_ad20;
          fStack_ad10 = local_ad20;
          fStack_ad0c = local_ad20;
          fStack_ad08 = local_ad20;
          fStack_ad04 = local_ad20;
          local_acec = local_ad20;
          fStack_acdc = local_ace0;
          fStack_acd8 = local_ace0;
          fStack_acd4 = local_ace0;
          fStack_acd0 = local_ace0;
          fStack_accc = local_ace0;
          fStack_acc8 = local_ace0;
          fStack_acc4 = local_ace0;
          local_acac = local_ace0;
          fStack_ac9c = local_aca0;
          fStack_ac98 = local_aca0;
          fStack_ac94 = local_aca0;
          fStack_ac90 = local_aca0;
          fStack_ac8c = local_aca0;
          fStack_ac88 = local_aca0;
          fStack_ac84 = local_aca0;
          local_ac6c = local_aca0;
          fStack_ac5c = local_ac60;
          fStack_ac58 = local_ac60;
          fStack_ac54 = local_ac60;
          fStack_ac50 = local_ac60;
          fStack_ac4c = local_ac60;
          fStack_ac48 = local_ac60;
          fStack_ac44 = local_ac60;
          local_ac2c = local_ac60;
          fStack_ac1c = local_ac20;
          fStack_ac18 = local_ac20;
          fStack_ac14 = local_ac20;
          fStack_ac10 = local_ac20;
          fStack_ac0c = local_ac20;
          fStack_ac08 = local_ac20;
          fStack_ac04 = local_ac20;
          local_abec = local_ac20;
          fStack_abdc = local_abe0;
          fStack_abd8 = local_abe0;
          fStack_abd4 = local_abe0;
          fStack_abd0 = local_abe0;
          fStack_abcc = local_abe0;
          fStack_abc8 = local_abe0;
          fStack_abc4 = local_abe0;
          local_abac = local_abe0;
          local_a860 = local_c8c0;
          uStack_a858 = uStack_c8b8;
          uStack_a850 = uStack_c8b0;
          uStack_a848 = uStack_c8a8;
          local_a820 = local_c8a0;
          uStack_a818 = uStack_c898;
          uStack_a810 = uStack_c890;
          uStack_a808 = uStack_c888;
          local_a7e0 = local_c7c0;
          uStack_a7d8 = uStack_c7b8;
          uStack_a7d0 = uStack_c7b0;
          uStack_a7c8 = uStack_c7a8;
          local_a7a0 = local_c7a0;
          uStack_a798 = uStack_c798;
          uStack_a790 = uStack_c790;
          uStack_a788 = uStack_c788;
          local_a760 = local_c720;
          uStack_a758 = uStack_c718;
          uStack_a750 = uStack_c710;
          uStack_a748 = uStack_c708;
          local_a720 = local_c700;
          uStack_a718 = uStack_c6f8;
          uStack_a710 = uStack_c6f0;
          uStack_a708 = uStack_c6e8;
          local_a6e0 = local_c5c0;
          uStack_a6d8 = uStack_c5b8;
          uStack_a6d0 = uStack_c5b0;
          uStack_a6c8 = uStack_c5a8;
          local_a6a0 = local_c5a0;
          uStack_a698 = uStack_c598;
          uStack_a690 = uStack_c590;
          uStack_a688 = uStack_c588;
          local_7a60 = local_c560;
          uStack_7a58 = uStack_c558;
          uStack_7a50 = uStack_c550;
          uStack_7a48 = uStack_c548;
          local_7a40 = local_c880;
          uStack_7a38 = uStack_c878;
          uStack_7a30 = uStack_c870;
          uStack_7a28 = uStack_c868;
          local_7a00 = local_c540;
          uStack_79f8 = uStack_c538;
          uStack_79f0 = uStack_c530;
          uStack_79e8 = uStack_c528;
          local_79e0 = local_c820;
          uStack_79d8 = uStack_c818;
          uStack_79d0 = uStack_c810;
          uStack_79c8 = uStack_c808;
          local_79a0 = local_c520;
          uStack_7998 = uStack_c518;
          uStack_7990 = uStack_c510;
          uStack_7988 = uStack_c508;
          local_7980 = local_c780;
          uStack_7978 = uStack_c778;
          uStack_7970 = uStack_c770;
          uStack_7968 = uStack_c768;
          local_7940 = local_c500;
          uStack_7938 = uStack_c4f8;
          uStack_7930 = uStack_c4f0;
          uStack_7928 = uStack_c4e8;
          local_7920 = local_c860;
          uStack_7918 = uStack_c858;
          uStack_7910 = uStack_c850;
          uStack_7908 = uStack_c848;
          local_78e0 = local_c4e0;
          uStack_78d8 = uStack_c4d8;
          uStack_78d0 = uStack_c4d0;
          uStack_78c8 = uStack_c4c8;
          local_78c0 = local_c800;
          uStack_78b8 = uStack_c7f8;
          uStack_78b0 = uStack_c7f0;
          uStack_78a8 = uStack_c7e8;
          local_7880 = local_c4c0;
          uStack_7878 = uStack_c4b8;
          uStack_7870 = uStack_c4b0;
          uStack_7868 = uStack_c4a8;
          local_7860 = local_c760;
          uStack_7858 = uStack_c758;
          uStack_7850 = uStack_c750;
          uStack_7848 = uStack_c748;
          local_7820 = local_c4a0;
          uStack_7818 = uStack_c498;
          uStack_7810 = uStack_c490;
          uStack_7808 = uStack_c488;
          local_7800 = local_c840;
          uStack_77f8 = uStack_c838;
          uStack_77f0 = uStack_c830;
          uStack_77e8 = uStack_c828;
          local_77c0 = local_c480;
          uStack_77b8 = uStack_c478;
          uStack_77b0 = uStack_c470;
          uStack_77a8 = uStack_c468;
          local_77a0 = local_c7e0;
          uStack_7798 = uStack_c7d8;
          uStack_7790 = uStack_c7d0;
          uStack_7788 = uStack_c7c8;
          local_7760 = local_c460;
          uStack_7758 = uStack_c458;
          uStack_7750 = uStack_c450;
          uStack_7748 = uStack_c448;
          local_7740 = local_c740;
          uStack_7738 = uStack_c738;
          uStack_7730 = uStack_c730;
          uStack_7728 = uStack_c728;
          local_7700 = local_c440;
          uStack_76f8 = uStack_c438;
          uStack_76f0 = uStack_c430;
          uStack_76e8 = uStack_c428;
          local_76e0 = local_c880;
          uStack_76d8 = uStack_c878;
          uStack_76d0 = uStack_c870;
          uStack_76c8 = uStack_c868;
          local_76a0 = local_c420;
          uStack_7698 = uStack_c418;
          uStack_7690 = uStack_c410;
          uStack_7688 = uStack_c408;
          local_7680 = local_c820;
          uStack_7678 = uStack_c818;
          uStack_7670 = uStack_c810;
          uStack_7668 = uStack_c808;
          local_7640 = local_c400;
          uStack_7638 = uStack_c3f8;
          uStack_7630 = uStack_c3f0;
          uStack_7628 = uStack_c3e8;
          local_7620 = local_c780;
          uStack_7618 = uStack_c778;
          uStack_7610 = uStack_c770;
          uStack_7608 = uStack_c768;
          local_75e0 = local_c3e0;
          uStack_75d8 = uStack_c3d8;
          uStack_75d0 = uStack_c3d0;
          uStack_75c8 = uStack_c3c8;
          local_75c0 = local_c860;
          uStack_75b8 = uStack_c858;
          uStack_75b0 = uStack_c850;
          uStack_75a8 = uStack_c848;
          local_7580 = local_c3c0;
          uStack_7578 = uStack_c3b8;
          uStack_7570 = uStack_c3b0;
          uStack_7568 = uStack_c3a8;
          local_7560 = local_c800;
          uStack_7558 = uStack_c7f8;
          uStack_7550 = uStack_c7f0;
          uStack_7548 = uStack_c7e8;
          local_7520 = local_c3a0;
          uStack_7518 = uStack_c398;
          uStack_7510 = uStack_c390;
          uStack_7508 = uStack_c388;
          local_7500 = local_c760;
          uStack_74f8 = uStack_c758;
          uStack_74f0 = uStack_c750;
          uStack_74e8 = uStack_c748;
          local_74c0 = local_c380;
          uStack_74b8 = uStack_c378;
          uStack_74b0 = uStack_c370;
          uStack_74a8 = uStack_c368;
          local_74a0 = local_c840;
          uStack_7498 = uStack_c838;
          uStack_7490 = uStack_c830;
          uStack_7488 = uStack_c828;
          local_7460 = local_c360;
          uStack_7458 = uStack_c358;
          uStack_7450 = uStack_c350;
          uStack_7448 = uStack_c348;
          local_7440 = local_c7e0;
          uStack_7438 = uStack_c7d8;
          uStack_7430 = uStack_c7d0;
          uStack_7428 = uStack_c7c8;
          local_7400 = local_c340;
          uStack_73f8 = uStack_c338;
          uStack_73f0 = uStack_c330;
          uStack_73e8 = uStack_c328;
          local_73e0 = local_c740;
          uStack_73d8 = uStack_c738;
          uStack_73d0 = uStack_c730;
          uStack_73c8 = uStack_c728;
          local_73a0 = local_c560;
          uStack_7398 = uStack_c558;
          uStack_7390 = uStack_c550;
          uStack_7388 = uStack_c548;
          local_7380 = local_c820;
          uStack_7378 = uStack_c818;
          uStack_7370 = uStack_c810;
          uStack_7368 = uStack_c808;
          local_7340 = local_c540;
          uStack_7338 = uStack_c538;
          uStack_7330 = uStack_c530;
          uStack_7328 = uStack_c528;
          local_7320 = local_c780;
          uStack_7318 = uStack_c778;
          uStack_7310 = uStack_c770;
          uStack_7308 = uStack_c768;
          local_72e0 = local_c520;
          uStack_72d8 = uStack_c518;
          uStack_72d0 = uStack_c510;
          uStack_72c8 = uStack_c508;
          local_72c0 = local_c6e0;
          uStack_72b8 = uStack_c6d8;
          uStack_72b0 = uStack_c6d0;
          uStack_72a8 = uStack_c6c8;
          local_7280 = local_c500;
          uStack_7278 = uStack_c4f8;
          uStack_7270 = uStack_c4f0;
          uStack_7268 = uStack_c4e8;
          local_7260 = local_c800;
          uStack_7258 = uStack_c7f8;
          uStack_7250 = uStack_c7f0;
          uStack_7248 = uStack_c7e8;
          local_7220 = local_c4e0;
          uStack_7218 = uStack_c4d8;
          uStack_7210 = uStack_c4d0;
          uStack_7208 = uStack_c4c8;
          local_7200 = local_c760;
          uStack_71f8 = uStack_c758;
          uStack_71f0 = uStack_c750;
          uStack_71e8 = uStack_c748;
          local_71c0 = local_c4c0;
          uStack_71b8 = uStack_c4b8;
          uStack_71b0 = uStack_c4b0;
          uStack_71a8 = uStack_c4a8;
          local_71a0 = local_c680;
          uStack_7198 = uStack_c678;
          uStack_7190 = uStack_c670;
          uStack_7188 = uStack_c668;
          local_7160 = local_c4a0;
          uStack_7158 = uStack_c498;
          uStack_7150 = uStack_c490;
          uStack_7148 = uStack_c488;
          local_7140 = local_c7e0;
          uStack_7138 = uStack_c7d8;
          uStack_7130 = uStack_c7d0;
          uStack_7128 = uStack_c7c8;
          local_7100 = local_c480;
          uStack_70f8 = uStack_c478;
          uStack_70f0 = uStack_c470;
          uStack_70e8 = uStack_c468;
          local_70e0 = local_c740;
          uStack_70d8 = uStack_c738;
          uStack_70d0 = uStack_c730;
          uStack_70c8 = uStack_c728;
          local_70a0 = local_c460;
          uStack_7098 = uStack_c458;
          uStack_7090 = uStack_c450;
          uStack_7088 = uStack_c448;
          local_7080 = local_c620;
          uStack_7078 = uStack_c618;
          uStack_7070 = uStack_c610;
          uStack_7068 = uStack_c608;
          local_7040 = local_c440;
          uStack_7038 = uStack_c438;
          uStack_7030 = uStack_c430;
          uStack_7028 = uStack_c428;
          local_7020 = local_c820;
          uStack_7018 = uStack_c818;
          uStack_7010 = uStack_c810;
          uStack_7008 = uStack_c808;
          local_6fe0 = local_c420;
          uStack_6fd8 = uStack_c418;
          uStack_6fd0 = uStack_c410;
          uStack_6fc8 = uStack_c408;
          local_6fc0 = local_c780;
          uStack_6fb8 = uStack_c778;
          uStack_6fb0 = uStack_c770;
          uStack_6fa8 = uStack_c768;
          local_6f80 = local_c400;
          uStack_6f78 = uStack_c3f8;
          uStack_6f70 = uStack_c3f0;
          uStack_6f68 = uStack_c3e8;
          local_6f60 = local_c6e0;
          uStack_6f58 = uStack_c6d8;
          uStack_6f50 = uStack_c6d0;
          uStack_6f48 = uStack_c6c8;
          local_6f20 = local_c3e0;
          uStack_6f18 = uStack_c3d8;
          uStack_6f10 = uStack_c3d0;
          uStack_6f08 = uStack_c3c8;
          local_6f00 = local_c800;
          uStack_6ef8 = uStack_c7f8;
          uStack_6ef0 = uStack_c7f0;
          uStack_6ee8 = uStack_c7e8;
          local_6ec0 = local_c3c0;
          uStack_6eb8 = uStack_c3b8;
          uStack_6eb0 = uStack_c3b0;
          uStack_6ea8 = uStack_c3a8;
          local_6ea0 = local_c760;
          uStack_6e98 = uStack_c758;
          uStack_6e90 = uStack_c750;
          uStack_6e88 = uStack_c748;
          local_6e60 = local_c3a0;
          uStack_6e58 = uStack_c398;
          uStack_6e50 = uStack_c390;
          uStack_6e48 = uStack_c388;
          local_6e40 = local_c680;
          uStack_6e38 = uStack_c678;
          uStack_6e30 = uStack_c670;
          uStack_6e28 = uStack_c668;
          local_6e00 = local_c380;
          uStack_6df8 = uStack_c378;
          uStack_6df0 = uStack_c370;
          uStack_6de8 = uStack_c368;
          local_6de0 = local_c7e0;
          uStack_6dd8 = uStack_c7d8;
          uStack_6dd0 = uStack_c7d0;
          uStack_6dc8 = uStack_c7c8;
          local_6da0 = local_c360;
          uStack_6d98 = uStack_c358;
          uStack_6d90 = uStack_c350;
          uStack_6d88 = uStack_c348;
          local_6d80 = local_c740;
          uStack_6d78 = uStack_c738;
          uStack_6d70 = uStack_c730;
          uStack_6d68 = uStack_c728;
          local_6d40 = local_c340;
          uStack_6d38 = uStack_c338;
          uStack_6d30 = uStack_c330;
          uStack_6d28 = uStack_c328;
          local_6d20 = local_c620;
          uStack_6d18 = uStack_c618;
          uStack_6d10 = uStack_c610;
          uStack_6d08 = uStack_c608;
          local_6ce0 = local_c560;
          uStack_6cd8 = uStack_c558;
          uStack_6cd0 = uStack_c550;
          uStack_6cc8 = uStack_c548;
          local_6cc0 = local_c780;
          uStack_6cb8 = uStack_c778;
          uStack_6cb0 = uStack_c770;
          uStack_6ca8 = uStack_c768;
          local_6c80 = local_c540;
          uStack_6c78 = uStack_c538;
          uStack_6c70 = uStack_c530;
          uStack_6c68 = uStack_c528;
          local_6c60 = local_c6e0;
          uStack_6c58 = uStack_c6d8;
          uStack_6c50 = uStack_c6d0;
          uStack_6c48 = uStack_c6c8;
          local_6c20 = local_c520;
          uStack_6c18 = uStack_c518;
          uStack_6c10 = uStack_c510;
          uStack_6c08 = uStack_c508;
          local_6c00 = local_c6c0;
          uStack_6bf8 = uStack_c6b8;
          uStack_6bf0 = uStack_c6b0;
          uStack_6be8 = uStack_c6a8;
          local_6bc0 = local_c500;
          uStack_6bb8 = uStack_c4f8;
          uStack_6bb0 = uStack_c4f0;
          uStack_6ba8 = uStack_c4e8;
          local_6ba0 = local_c760;
          uStack_6b98 = uStack_c758;
          uStack_6b90 = uStack_c750;
          uStack_6b88 = uStack_c748;
          local_6b60 = local_c4e0;
          uStack_6b58 = uStack_c4d8;
          uStack_6b50 = uStack_c4d0;
          uStack_6b48 = uStack_c4c8;
          local_6b40 = local_c680;
          uStack_6b38 = uStack_c678;
          uStack_6b30 = uStack_c670;
          uStack_6b28 = uStack_c668;
          local_6b00 = local_c4c0;
          uStack_6af8 = uStack_c4b8;
          uStack_6af0 = uStack_c4b0;
          uStack_6ae8 = uStack_c4a8;
          local_6ae0 = local_c660;
          uStack_6ad8 = uStack_c658;
          uStack_6ad0 = uStack_c650;
          uStack_6ac8 = uStack_c648;
          local_6aa0 = local_c4a0;
          uStack_6a98 = uStack_c498;
          uStack_6a90 = uStack_c490;
          uStack_6a88 = uStack_c488;
          local_6a80 = local_c740;
          uStack_6a78 = uStack_c738;
          uStack_6a70 = uStack_c730;
          uStack_6a68 = uStack_c728;
          local_6a40 = local_c480;
          uStack_6a38 = uStack_c478;
          uStack_6a30 = uStack_c470;
          uStack_6a28 = uStack_c468;
          local_6a20 = local_c620;
          uStack_6a18 = uStack_c618;
          uStack_6a10 = uStack_c610;
          uStack_6a08 = uStack_c608;
          local_69e0 = local_c460;
          uStack_69d8 = uStack_c458;
          uStack_69d0 = uStack_c450;
          uStack_69c8 = uStack_c448;
          local_69c0 = local_c600;
          uStack_69b8 = uStack_c5f8;
          uStack_69b0 = uStack_c5f0;
          uStack_69a8 = uStack_c5e8;
          local_6980 = local_c440;
          uStack_6978 = uStack_c438;
          uStack_6970 = uStack_c430;
          uStack_6968 = uStack_c428;
          local_6960 = local_c780;
          uStack_6958 = uStack_c778;
          uStack_6950 = uStack_c770;
          uStack_6948 = uStack_c768;
          local_6920 = local_c420;
          uStack_6918 = uStack_c418;
          uStack_6910 = uStack_c410;
          uStack_6908 = uStack_c408;
          local_6900 = local_c6e0;
          uStack_68f8 = uStack_c6d8;
          uStack_68f0 = uStack_c6d0;
          uStack_68e8 = uStack_c6c8;
          local_68c0 = local_c400;
          uStack_68b8 = uStack_c3f8;
          uStack_68b0 = uStack_c3f0;
          uStack_68a8 = uStack_c3e8;
          local_68a0 = local_c6c0;
          uStack_6898 = uStack_c6b8;
          uStack_6890 = uStack_c6b0;
          uStack_6888 = uStack_c6a8;
          local_6860 = local_c3e0;
          uStack_6858 = uStack_c3d8;
          uStack_6850 = uStack_c3d0;
          uStack_6848 = uStack_c3c8;
          local_6840 = local_c760;
          uStack_6838 = uStack_c758;
          uStack_6830 = uStack_c750;
          uStack_6828 = uStack_c748;
          local_6800 = local_c3c0;
          uStack_67f8 = uStack_c3b8;
          uStack_67f0 = uStack_c3b0;
          uStack_67e8 = uStack_c3a8;
          local_67e0 = local_c680;
          uStack_67d8 = uStack_c678;
          uStack_67d0 = uStack_c670;
          uStack_67c8 = uStack_c668;
          local_67a0 = local_c3a0;
          uStack_6798 = uStack_c398;
          uStack_6790 = uStack_c390;
          uStack_6788 = uStack_c388;
          local_6780 = local_c660;
          uStack_6778 = uStack_c658;
          uStack_6770 = uStack_c650;
          uStack_6768 = uStack_c648;
          local_6740 = local_c380;
          uStack_6738 = uStack_c378;
          uStack_6730 = uStack_c370;
          uStack_6728 = uStack_c368;
          local_6720 = local_c740;
          uStack_6718 = uStack_c738;
          uStack_6710 = uStack_c730;
          uStack_6708 = uStack_c728;
          local_66e0 = local_c360;
          uStack_66d8 = uStack_c358;
          uStack_66d0 = uStack_c350;
          uStack_66c8 = uStack_c348;
          local_66c0 = local_c620;
          uStack_66b8 = uStack_c618;
          uStack_66b0 = uStack_c610;
          uStack_66a8 = uStack_c608;
          local_6680 = local_c340;
          uStack_6678 = uStack_c338;
          uStack_6670 = uStack_c330;
          uStack_6668 = uStack_c328;
          local_6660 = local_c600;
          uStack_6658 = uStack_c5f8;
          uStack_6650 = uStack_c5f0;
          uStack_6648 = uStack_c5e8;
          local_6620 = local_c560;
          uStack_6618 = uStack_c558;
          uStack_6610 = uStack_c550;
          uStack_6608 = uStack_c548;
          local_6600 = local_c6e0;
          uStack_65f8 = uStack_c6d8;
          uStack_65f0 = uStack_c6d0;
          uStack_65e8 = uStack_c6c8;
          local_65c0 = local_c540;
          uStack_65b8 = uStack_c538;
          uStack_65b0 = uStack_c530;
          uStack_65a8 = uStack_c528;
          local_65a0 = local_c6c0;
          uStack_6598 = uStack_c6b8;
          uStack_6590 = uStack_c6b0;
          uStack_6588 = uStack_c6a8;
          local_6560 = local_c520;
          uStack_6558 = uStack_c518;
          uStack_6550 = uStack_c510;
          uStack_6548 = uStack_c508;
          local_6540 = local_c6a0;
          uStack_6538 = uStack_c698;
          uStack_6530 = uStack_c690;
          uStack_6528 = uStack_c688;
          local_6500 = local_c500;
          uStack_64f8 = uStack_c4f8;
          uStack_64f0 = uStack_c4f0;
          uStack_64e8 = uStack_c4e8;
          local_64e0 = local_c680;
          uStack_64d8 = uStack_c678;
          uStack_64d0 = uStack_c670;
          uStack_64c8 = uStack_c668;
          local_64a0 = local_c4e0;
          uStack_6498 = uStack_c4d8;
          uStack_6490 = uStack_c4d0;
          uStack_6488 = uStack_c4c8;
          local_6480 = local_c660;
          uStack_6478 = uStack_c658;
          uStack_6470 = uStack_c650;
          uStack_6468 = uStack_c648;
          local_6440 = local_c4c0;
          uStack_6438 = uStack_c4b8;
          uStack_6430 = uStack_c4b0;
          uStack_6428 = uStack_c4a8;
          local_6420 = local_c640;
          uStack_6418 = uStack_c638;
          uStack_6410 = uStack_c630;
          uStack_6408 = uStack_c628;
          local_63e0 = local_c4a0;
          uStack_63d8 = uStack_c498;
          uStack_63d0 = uStack_c490;
          uStack_63c8 = uStack_c488;
          local_63c0 = local_c620;
          uStack_63b8 = uStack_c618;
          uStack_63b0 = uStack_c610;
          uStack_63a8 = uStack_c608;
          local_6380 = local_c480;
          uStack_6378 = uStack_c478;
          uStack_6370 = uStack_c470;
          uStack_6368 = uStack_c468;
          local_6360 = local_c600;
          uStack_6358 = uStack_c5f8;
          uStack_6350 = uStack_c5f0;
          uStack_6348 = uStack_c5e8;
          local_6320 = local_c460;
          uStack_6318 = uStack_c458;
          uStack_6310 = uStack_c450;
          uStack_6308 = uStack_c448;
          local_6300 = local_c5e0;
          uStack_62f8 = uStack_c5d8;
          uStack_62f0 = uStack_c5d0;
          uStack_62e8 = uStack_c5c8;
          local_62c0 = local_c440;
          uStack_62b8 = uStack_c438;
          uStack_62b0 = uStack_c430;
          uStack_62a8 = uStack_c428;
          local_62a0 = local_c6e0;
          uStack_6298 = uStack_c6d8;
          uStack_6290 = uStack_c6d0;
          uStack_6288 = uStack_c6c8;
          local_6260 = local_c420;
          uStack_6258 = uStack_c418;
          uStack_6250 = uStack_c410;
          uStack_6248 = uStack_c408;
          local_6240 = local_c6c0;
          uStack_6238 = uStack_c6b8;
          uStack_6230 = uStack_c6b0;
          uStack_6228 = uStack_c6a8;
          local_6200 = local_c400;
          uStack_61f8 = uStack_c3f8;
          uStack_61f0 = uStack_c3f0;
          uStack_61e8 = uStack_c3e8;
          local_61e0 = local_c6a0;
          uStack_61d8 = uStack_c698;
          uStack_61d0 = uStack_c690;
          uStack_61c8 = uStack_c688;
          local_61a0 = local_c3e0;
          uStack_6198 = uStack_c3d8;
          uStack_6190 = uStack_c3d0;
          uStack_6188 = uStack_c3c8;
          local_6180 = local_c680;
          uStack_6178 = uStack_c678;
          uStack_6170 = uStack_c670;
          uStack_6168 = uStack_c668;
          local_6140 = local_c3c0;
          uStack_6138 = uStack_c3b8;
          uStack_6130 = uStack_c3b0;
          uStack_6128 = uStack_c3a8;
          local_6120 = local_c660;
          uStack_6118 = uStack_c658;
          uStack_6110 = uStack_c650;
          uStack_6108 = uStack_c648;
          local_60e0 = local_c3a0;
          uStack_60d8 = uStack_c398;
          uStack_60d0 = uStack_c390;
          uStack_60c8 = uStack_c388;
          local_60c0 = local_c640;
          uStack_60b8 = uStack_c638;
          uStack_60b0 = uStack_c630;
          uStack_60a8 = uStack_c628;
          local_6080 = local_c380;
          uStack_6078 = uStack_c378;
          uStack_6070 = uStack_c370;
          uStack_6068 = uStack_c368;
          local_6060 = local_c620;
          uStack_6058 = uStack_c618;
          uStack_6050 = uStack_c610;
          uStack_6048 = uStack_c608;
          local_6020 = local_c360;
          uStack_6018 = uStack_c358;
          uStack_6010 = uStack_c350;
          uStack_6008 = uStack_c348;
          local_6000 = local_c600;
          uStack_5ff8 = uStack_c5f8;
          uStack_5ff0 = uStack_c5f0;
          uStack_5fe8 = uStack_c5e8;
          local_5fc0 = local_c340;
          uStack_5fb8 = uStack_c338;
          uStack_5fb0 = uStack_c330;
          uStack_5fa8 = uStack_c328;
          local_5fa0 = local_c5e0;
          uStack_5f98 = uStack_c5d8;
          uStack_5f90 = uStack_c5d0;
          uStack_5f88 = uStack_c5c8;
          local_5f80 = local_c340;
          uStack_5f78 = uStack_c338;
          uStack_5f70 = uStack_c330;
          uStack_5f68 = uStack_c328;
          local_5f60 = local_abe0;
          fStack_5f5c = local_abe0;
          fStack_5f58 = local_abe0;
          fStack_5f54 = local_abe0;
          fStack_5f50 = local_abe0;
          fStack_5f4c = local_abe0;
          fStack_5f48 = local_abe0;
          fStack_5f44 = local_abe0;
          local_5f40 = local_c360;
          uStack_5f38 = uStack_c358;
          uStack_5f30 = uStack_c350;
          uStack_5f28 = uStack_c348;
          local_5f20 = local_ac20;
          fStack_5f1c = local_ac20;
          fStack_5f18 = local_ac20;
          fStack_5f14 = local_ac20;
          fStack_5f10 = local_ac20;
          fStack_5f0c = local_ac20;
          fStack_5f08 = local_ac20;
          fStack_5f04 = local_ac20;
          local_5f00 = local_c380;
          uStack_5ef8 = uStack_c378;
          uStack_5ef0 = uStack_c370;
          uStack_5ee8 = uStack_c368;
          local_5ee0 = local_ac60;
          fStack_5edc = local_ac60;
          fStack_5ed8 = local_ac60;
          fStack_5ed4 = local_ac60;
          fStack_5ed0 = local_ac60;
          fStack_5ecc = local_ac60;
          fStack_5ec8 = local_ac60;
          fStack_5ec4 = local_ac60;
          local_5ec0 = local_c3a0;
          uStack_5eb8 = uStack_c398;
          uStack_5eb0 = uStack_c390;
          uStack_5ea8 = uStack_c388;
          local_5ea0 = local_aca0;
          fStack_5e9c = local_aca0;
          fStack_5e98 = local_aca0;
          fStack_5e94 = local_aca0;
          fStack_5e90 = local_aca0;
          fStack_5e8c = local_aca0;
          fStack_5e88 = local_aca0;
          fStack_5e84 = local_aca0;
          local_5e80 = local_c3c0;
          uStack_5e78 = uStack_c3b8;
          uStack_5e70 = uStack_c3b0;
          uStack_5e68 = uStack_c3a8;
          local_5e60 = local_ace0;
          fStack_5e5c = local_ace0;
          fStack_5e58 = local_ace0;
          fStack_5e54 = local_ace0;
          fStack_5e50 = local_ace0;
          fStack_5e4c = local_ace0;
          fStack_5e48 = local_ace0;
          fStack_5e44 = local_ace0;
          local_5e40 = local_c3e0;
          uStack_5e38 = uStack_c3d8;
          uStack_5e30 = uStack_c3d0;
          uStack_5e28 = uStack_c3c8;
          local_5e20 = local_ad20;
          fStack_5e1c = local_ad20;
          fStack_5e18 = local_ad20;
          fStack_5e14 = local_ad20;
          fStack_5e10 = local_ad20;
          fStack_5e0c = local_ad20;
          fStack_5e08 = local_ad20;
          fStack_5e04 = local_ad20;
          local_5e00 = local_c400;
          uStack_5df8 = uStack_c3f8;
          uStack_5df0 = uStack_c3f0;
          uStack_5de8 = uStack_c3e8;
          local_5de0 = local_ad60;
          fStack_5ddc = local_ad60;
          fStack_5dd8 = local_ad60;
          fStack_5dd4 = local_ad60;
          fStack_5dd0 = local_ad60;
          fStack_5dcc = local_ad60;
          fStack_5dc8 = local_ad60;
          fStack_5dc4 = local_ad60;
          local_5dc0 = local_c420;
          uStack_5db8 = uStack_c418;
          uStack_5db0 = uStack_c410;
          uStack_5da8 = uStack_c408;
          local_5da0 = local_ada0;
          fStack_5d9c = local_ada0;
          fStack_5d98 = local_ada0;
          fStack_5d94 = local_ada0;
          fStack_5d90 = local_ada0;
          fStack_5d8c = local_ada0;
          fStack_5d88 = local_ada0;
          fStack_5d84 = local_ada0;
          local_5d80 = local_c440;
          uStack_5d78 = uStack_c438;
          uStack_5d70 = uStack_c430;
          uStack_5d68 = uStack_c428;
          local_5d60 = local_ade0;
          fStack_5d5c = local_ade0;
          fStack_5d58 = local_ade0;
          fStack_5d54 = local_ade0;
          fStack_5d50 = local_ade0;
          fStack_5d4c = local_ade0;
          fStack_5d48 = local_ade0;
          fStack_5d44 = local_ade0;
          local_5d40 = local_c460;
          uStack_5d38 = uStack_c458;
          uStack_5d30 = uStack_c450;
          uStack_5d28 = uStack_c448;
          local_5d20 = local_abe0;
          fStack_5d1c = local_abe0;
          fStack_5d18 = local_abe0;
          fStack_5d14 = local_abe0;
          fStack_5d10 = local_abe0;
          fStack_5d0c = local_abe0;
          fStack_5d08 = local_abe0;
          fStack_5d04 = local_abe0;
          local_5d00 = local_c480;
          uStack_5cf8 = uStack_c478;
          uStack_5cf0 = uStack_c470;
          uStack_5ce8 = uStack_c468;
          local_5ce0 = local_ac20;
          fStack_5cdc = local_ac20;
          fStack_5cd8 = local_ac20;
          fStack_5cd4 = local_ac20;
          fStack_5cd0 = local_ac20;
          fStack_5ccc = local_ac20;
          fStack_5cc8 = local_ac20;
          fStack_5cc4 = local_ac20;
          local_5cc0 = local_c4a0;
          uStack_5cb8 = uStack_c498;
          uStack_5cb0 = uStack_c490;
          uStack_5ca8 = uStack_c488;
          local_5ca0 = local_ac60;
          fStack_5c9c = local_ac60;
          fStack_5c98 = local_ac60;
          fStack_5c94 = local_ac60;
          fStack_5c90 = local_ac60;
          fStack_5c8c = local_ac60;
          fStack_5c88 = local_ac60;
          fStack_5c84 = local_ac60;
          local_5c80 = local_c4c0;
          uStack_5c78 = uStack_c4b8;
          uStack_5c70 = uStack_c4b0;
          uStack_5c68 = uStack_c4a8;
          local_5c60 = local_aca0;
          fStack_5c5c = local_aca0;
          fStack_5c58 = local_aca0;
          fStack_5c54 = local_aca0;
          fStack_5c50 = local_aca0;
          fStack_5c4c = local_aca0;
          fStack_5c48 = local_aca0;
          fStack_5c44 = local_aca0;
          local_5c40 = local_c4e0;
          uStack_5c38 = uStack_c4d8;
          uStack_5c30 = uStack_c4d0;
          uStack_5c28 = uStack_c4c8;
          local_5c20 = local_ace0;
          fStack_5c1c = local_ace0;
          fStack_5c18 = local_ace0;
          fStack_5c14 = local_ace0;
          fStack_5c10 = local_ace0;
          fStack_5c0c = local_ace0;
          fStack_5c08 = local_ace0;
          fStack_5c04 = local_ace0;
          local_5c00 = local_c500;
          uStack_5bf8 = uStack_c4f8;
          uStack_5bf0 = uStack_c4f0;
          uStack_5be8 = uStack_c4e8;
          local_5be0 = local_ad20;
          fStack_5bdc = local_ad20;
          fStack_5bd8 = local_ad20;
          fStack_5bd4 = local_ad20;
          fStack_5bd0 = local_ad20;
          fStack_5bcc = local_ad20;
          fStack_5bc8 = local_ad20;
          fStack_5bc4 = local_ad20;
          local_5bc0 = local_c520;
          uStack_5bb8 = uStack_c518;
          uStack_5bb0 = uStack_c510;
          uStack_5ba8 = uStack_c508;
          local_5ba0 = local_ad60;
          fStack_5b9c = local_ad60;
          fStack_5b98 = local_ad60;
          fStack_5b94 = local_ad60;
          fStack_5b90 = local_ad60;
          fStack_5b8c = local_ad60;
          fStack_5b88 = local_ad60;
          fStack_5b84 = local_ad60;
          local_5b80 = local_c540;
          uStack_5b78 = uStack_c538;
          uStack_5b70 = uStack_c530;
          uStack_5b68 = uStack_c528;
          local_5b60 = local_ada0;
          fStack_5b5c = local_ada0;
          fStack_5b58 = local_ada0;
          fStack_5b54 = local_ada0;
          fStack_5b50 = local_ada0;
          fStack_5b4c = local_ada0;
          fStack_5b48 = local_ada0;
          fStack_5b44 = local_ada0;
          local_5b40 = local_c560;
          uStack_5b38 = uStack_c558;
          uStack_5b30 = uStack_c550;
          uStack_5b28 = uStack_c548;
          local_5b20 = local_ade0;
          fStack_5b1c = local_ade0;
          fStack_5b18 = local_ade0;
          fStack_5b14 = local_ade0;
          fStack_5b10 = local_ade0;
          fStack_5b0c = local_ade0;
          fStack_5b08 = local_ade0;
          fStack_5b04 = local_ade0;
          local_5b00 = local_c340;
          uStack_5af8 = uStack_c338;
          uStack_5af0 = uStack_c330;
          uStack_5ae8 = uStack_c328;
          local_5ae0 = local_ac20;
          fStack_5adc = local_ac20;
          fStack_5ad8 = local_ac20;
          fStack_5ad4 = local_ac20;
          fStack_5ad0 = local_ac20;
          fStack_5acc = local_ac20;
          fStack_5ac8 = local_ac20;
          fStack_5ac4 = local_ac20;
          local_5ac0 = local_c360;
          uStack_5ab8 = uStack_c358;
          uStack_5ab0 = uStack_c350;
          uStack_5aa8 = uStack_c348;
          local_5aa0 = local_ac60;
          fStack_5a9c = local_ac60;
          fStack_5a98 = local_ac60;
          fStack_5a94 = local_ac60;
          fStack_5a90 = local_ac60;
          fStack_5a8c = local_ac60;
          fStack_5a88 = local_ac60;
          fStack_5a84 = local_ac60;
          local_5a80 = local_c380;
          uStack_5a78 = uStack_c378;
          uStack_5a70 = uStack_c370;
          uStack_5a68 = uStack_c368;
          local_5a60 = local_ae20;
          fStack_5a5c = local_ae20;
          fStack_5a58 = local_ae20;
          fStack_5a54 = local_ae20;
          fStack_5a50 = local_ae20;
          fStack_5a4c = local_ae20;
          fStack_5a48 = local_ae20;
          fStack_5a44 = local_ae20;
          local_5a40 = local_c3a0;
          uStack_5a38 = uStack_c398;
          uStack_5a30 = uStack_c390;
          uStack_5a28 = uStack_c388;
          local_5a20 = local_ace0;
          fStack_5a1c = local_ace0;
          fStack_5a18 = local_ace0;
          fStack_5a14 = local_ace0;
          fStack_5a10 = local_ace0;
          fStack_5a0c = local_ace0;
          fStack_5a08 = local_ace0;
          fStack_5a04 = local_ace0;
          local_5a00 = local_c3c0;
          uStack_59f8 = uStack_c3b8;
          uStack_59f0 = uStack_c3b0;
          uStack_59e8 = uStack_c3a8;
          local_59e0 = local_ad20;
          fStack_59dc = local_ad20;
          fStack_59d8 = local_ad20;
          fStack_59d4 = local_ad20;
          fStack_59d0 = local_ad20;
          fStack_59cc = local_ad20;
          fStack_59c8 = local_ad20;
          fStack_59c4 = local_ad20;
          local_59c0 = local_c3e0;
          uStack_59b8 = uStack_c3d8;
          uStack_59b0 = uStack_c3d0;
          uStack_59a8 = uStack_c3c8;
          local_59a0 = local_ae60;
          fStack_599c = local_ae60;
          fStack_5998 = local_ae60;
          fStack_5994 = local_ae60;
          fStack_5990 = local_ae60;
          fStack_598c = local_ae60;
          fStack_5988 = local_ae60;
          fStack_5984 = local_ae60;
          local_5980 = local_c400;
          uStack_5978 = uStack_c3f8;
          uStack_5970 = uStack_c3f0;
          uStack_5968 = uStack_c3e8;
          local_5960 = local_ada0;
          fStack_595c = local_ada0;
          fStack_5958 = local_ada0;
          fStack_5954 = local_ada0;
          fStack_5950 = local_ada0;
          fStack_594c = local_ada0;
          fStack_5948 = local_ada0;
          fStack_5944 = local_ada0;
          local_5940 = local_c420;
          uStack_5938 = uStack_c418;
          uStack_5930 = uStack_c410;
          uStack_5928 = uStack_c408;
          local_5920 = local_ade0;
          fStack_591c = local_ade0;
          fStack_5918 = local_ade0;
          fStack_5914 = local_ade0;
          fStack_5910 = local_ade0;
          fStack_590c = local_ade0;
          fStack_5908 = local_ade0;
          fStack_5904 = local_ade0;
          local_5900 = local_c440;
          uStack_58f8 = uStack_c438;
          uStack_58f0 = uStack_c430;
          uStack_58e8 = uStack_c428;
          local_58e0 = local_aea0;
          fStack_58dc = local_aea0;
          fStack_58d8 = local_aea0;
          fStack_58d4 = local_aea0;
          fStack_58d0 = local_aea0;
          fStack_58cc = local_aea0;
          fStack_58c8 = local_aea0;
          fStack_58c4 = local_aea0;
          local_58c0 = local_c460;
          uStack_58b8 = uStack_c458;
          uStack_58b0 = uStack_c450;
          uStack_58a8 = uStack_c448;
          local_58a0 = local_ac20;
          fStack_589c = local_ac20;
          fStack_5898 = local_ac20;
          fStack_5894 = local_ac20;
          fStack_5890 = local_ac20;
          fStack_588c = local_ac20;
          fStack_5888 = local_ac20;
          fStack_5884 = local_ac20;
          local_5880 = local_c480;
          uStack_5878 = uStack_c478;
          uStack_5870 = uStack_c470;
          uStack_5868 = uStack_c468;
          local_5860 = local_ac60;
          fStack_585c = local_ac60;
          fStack_5858 = local_ac60;
          fStack_5854 = local_ac60;
          fStack_5850 = local_ac60;
          fStack_584c = local_ac60;
          fStack_5848 = local_ac60;
          fStack_5844 = local_ac60;
          local_5840 = local_c4a0;
          uStack_5838 = uStack_c498;
          uStack_5830 = uStack_c490;
          uStack_5828 = uStack_c488;
          local_5820 = local_ae20;
          fStack_581c = local_ae20;
          fStack_5818 = local_ae20;
          fStack_5814 = local_ae20;
          fStack_5810 = local_ae20;
          fStack_580c = local_ae20;
          fStack_5808 = local_ae20;
          fStack_5804 = local_ae20;
          local_5800 = local_c4c0;
          uStack_57f8 = uStack_c4b8;
          uStack_57f0 = uStack_c4b0;
          uStack_57e8 = uStack_c4a8;
          local_57e0 = local_ace0;
          fStack_57dc = local_ace0;
          fStack_57d8 = local_ace0;
          fStack_57d4 = local_ace0;
          fStack_57d0 = local_ace0;
          fStack_57cc = local_ace0;
          fStack_57c8 = local_ace0;
          fStack_57c4 = local_ace0;
          local_57c0 = local_c4e0;
          uStack_57b8 = uStack_c4d8;
          uStack_57b0 = uStack_c4d0;
          uStack_57a8 = uStack_c4c8;
          local_57a0 = local_ad20;
          fStack_579c = local_ad20;
          fStack_5798 = local_ad20;
          fStack_5794 = local_ad20;
          fStack_5790 = local_ad20;
          fStack_578c = local_ad20;
          fStack_5788 = local_ad20;
          fStack_5784 = local_ad20;
          local_5780 = local_c500;
          uStack_5778 = uStack_c4f8;
          uStack_5770 = uStack_c4f0;
          uStack_5768 = uStack_c4e8;
          local_5760 = local_ae60;
          fStack_575c = local_ae60;
          fStack_5758 = local_ae60;
          fStack_5754 = local_ae60;
          fStack_5750 = local_ae60;
          fStack_574c = local_ae60;
          fStack_5748 = local_ae60;
          fStack_5744 = local_ae60;
          local_5740 = local_c520;
          uStack_5738 = uStack_c518;
          uStack_5730 = uStack_c510;
          uStack_5728 = uStack_c508;
          local_5720 = local_ada0;
          fStack_571c = local_ada0;
          fStack_5718 = local_ada0;
          fStack_5714 = local_ada0;
          fStack_5710 = local_ada0;
          fStack_570c = local_ada0;
          fStack_5708 = local_ada0;
          fStack_5704 = local_ada0;
          local_5700 = local_c540;
          uStack_56f8 = uStack_c538;
          uStack_56f0 = uStack_c530;
          uStack_56e8 = uStack_c528;
          local_56e0 = local_ade0;
          fStack_56dc = local_ade0;
          fStack_56d8 = local_ade0;
          fStack_56d4 = local_ade0;
          fStack_56d0 = local_ade0;
          fStack_56cc = local_ade0;
          fStack_56c8 = local_ade0;
          fStack_56c4 = local_ade0;
          local_56c0 = local_c560;
          uStack_56b8 = uStack_c558;
          uStack_56b0 = uStack_c550;
          uStack_56a8 = uStack_c548;
          local_56a0 = local_aea0;
          fStack_569c = local_aea0;
          fStack_5698 = local_aea0;
          fStack_5694 = local_aea0;
          fStack_5690 = local_aea0;
          fStack_568c = local_aea0;
          fStack_5688 = local_aea0;
          fStack_5684 = local_aea0;
          local_5680 = local_c340;
          uStack_5678 = uStack_c338;
          uStack_5670 = uStack_c330;
          uStack_5668 = uStack_c328;
          local_5660 = local_ac60;
          fStack_565c = local_ac60;
          fStack_5658 = local_ac60;
          fStack_5654 = local_ac60;
          fStack_5650 = local_ac60;
          fStack_564c = local_ac60;
          fStack_5648 = local_ac60;
          fStack_5644 = local_ac60;
          local_5640 = local_c360;
          uStack_5638 = uStack_c358;
          uStack_5630 = uStack_c350;
          uStack_5628 = uStack_c348;
          local_5620 = local_ae20;
          fStack_561c = local_ae20;
          fStack_5618 = local_ae20;
          fStack_5614 = local_ae20;
          fStack_5610 = local_ae20;
          fStack_560c = local_ae20;
          fStack_5608 = local_ae20;
          fStack_5604 = local_ae20;
          local_5600 = local_c380;
          uStack_55f8 = uStack_c378;
          uStack_55f0 = uStack_c370;
          uStack_55e8 = uStack_c368;
          local_55e0 = local_aee0;
          fStack_55dc = local_aee0;
          fStack_55d8 = local_aee0;
          fStack_55d4 = local_aee0;
          fStack_55d0 = local_aee0;
          fStack_55cc = local_aee0;
          fStack_55c8 = local_aee0;
          fStack_55c4 = local_aee0;
          local_55c0 = local_c3a0;
          uStack_55b8 = uStack_c398;
          uStack_55b0 = uStack_c390;
          uStack_55a8 = uStack_c388;
          local_55a0 = local_ad20;
          fStack_559c = local_ad20;
          fStack_5598 = local_ad20;
          fStack_5594 = local_ad20;
          fStack_5590 = local_ad20;
          fStack_558c = local_ad20;
          fStack_5588 = local_ad20;
          fStack_5584 = local_ad20;
          local_5580 = local_c3c0;
          uStack_5578 = uStack_c3b8;
          uStack_5570 = uStack_c3b0;
          uStack_5568 = uStack_c3a8;
          local_5560 = local_ae60;
          fStack_555c = local_ae60;
          fStack_5558 = local_ae60;
          fStack_5554 = local_ae60;
          fStack_5550 = local_ae60;
          fStack_554c = local_ae60;
          fStack_5548 = local_ae60;
          fStack_5544 = local_ae60;
          local_5540 = local_c3e0;
          uStack_5538 = uStack_c3d8;
          uStack_5530 = uStack_c3d0;
          uStack_5528 = uStack_c3c8;
          local_5520 = local_af20;
          fStack_551c = local_af20;
          fStack_5518 = local_af20;
          fStack_5514 = local_af20;
          fStack_5510 = local_af20;
          fStack_550c = local_af20;
          fStack_5508 = local_af20;
          fStack_5504 = local_af20;
          local_5500 = local_c400;
          uStack_54f8 = uStack_c3f8;
          uStack_54f0 = uStack_c3f0;
          uStack_54e8 = uStack_c3e8;
          local_54e0 = local_ade0;
          fStack_54dc = local_ade0;
          fStack_54d8 = local_ade0;
          fStack_54d4 = local_ade0;
          fStack_54d0 = local_ade0;
          fStack_54cc = local_ade0;
          fStack_54c8 = local_ade0;
          fStack_54c4 = local_ade0;
          local_54c0 = local_c420;
          uStack_54b8 = uStack_c418;
          uStack_54b0 = uStack_c410;
          uStack_54a8 = uStack_c408;
          local_54a0 = local_aea0;
          fStack_549c = local_aea0;
          fStack_5498 = local_aea0;
          fStack_5494 = local_aea0;
          fStack_5490 = local_aea0;
          fStack_548c = local_aea0;
          fStack_5488 = local_aea0;
          fStack_5484 = local_aea0;
          local_5480 = local_c440;
          uStack_5478 = uStack_c438;
          uStack_5470 = uStack_c430;
          uStack_5468 = uStack_c428;
          local_5460 = local_af60;
          fStack_545c = local_af60;
          fStack_5458 = local_af60;
          fStack_5454 = local_af60;
          fStack_5450 = local_af60;
          fStack_544c = local_af60;
          fStack_5448 = local_af60;
          fStack_5444 = local_af60;
          local_5440 = local_c460;
          uStack_5438 = uStack_c458;
          uStack_5430 = uStack_c450;
          uStack_5428 = uStack_c448;
          local_5420 = local_ac60;
          fStack_541c = local_ac60;
          fStack_5418 = local_ac60;
          fStack_5414 = local_ac60;
          fStack_5410 = local_ac60;
          fStack_540c = local_ac60;
          fStack_5408 = local_ac60;
          fStack_5404 = local_ac60;
          local_5400 = local_c480;
          uStack_53f8 = uStack_c478;
          uStack_53f0 = uStack_c470;
          uStack_53e8 = uStack_c468;
          local_53e0 = local_ae20;
          fStack_53dc = local_ae20;
          fStack_53d8 = local_ae20;
          fStack_53d4 = local_ae20;
          fStack_53d0 = local_ae20;
          fStack_53cc = local_ae20;
          fStack_53c8 = local_ae20;
          fStack_53c4 = local_ae20;
          local_53c0 = local_c4a0;
          uStack_53b8 = uStack_c498;
          uStack_53b0 = uStack_c490;
          uStack_53a8 = uStack_c488;
          local_53a0 = local_aee0;
          fStack_539c = local_aee0;
          fStack_5398 = local_aee0;
          fStack_5394 = local_aee0;
          fStack_5390 = local_aee0;
          fStack_538c = local_aee0;
          fStack_5388 = local_aee0;
          fStack_5384 = local_aee0;
          local_5380 = local_c4c0;
          uStack_5378 = uStack_c4b8;
          uStack_5370 = uStack_c4b0;
          uStack_5368 = uStack_c4a8;
          local_5360 = local_ad20;
          fStack_535c = local_ad20;
          fStack_5358 = local_ad20;
          fStack_5354 = local_ad20;
          fStack_5350 = local_ad20;
          fStack_534c = local_ad20;
          fStack_5348 = local_ad20;
          fStack_5344 = local_ad20;
          local_5340 = local_c4e0;
          uStack_5338 = uStack_c4d8;
          uStack_5330 = uStack_c4d0;
          uStack_5328 = uStack_c4c8;
          local_5320 = local_ae60;
          fStack_531c = local_ae60;
          fStack_5318 = local_ae60;
          fStack_5314 = local_ae60;
          fStack_5310 = local_ae60;
          fStack_530c = local_ae60;
          fStack_5308 = local_ae60;
          fStack_5304 = local_ae60;
          local_5300 = local_c500;
          uStack_52f8 = uStack_c4f8;
          uStack_52f0 = uStack_c4f0;
          uStack_52e8 = uStack_c4e8;
          local_52e0 = local_af20;
          fStack_52dc = local_af20;
          fStack_52d8 = local_af20;
          fStack_52d4 = local_af20;
          fStack_52d0 = local_af20;
          fStack_52cc = local_af20;
          fStack_52c8 = local_af20;
          fStack_52c4 = local_af20;
          local_52c0 = local_c520;
          uStack_52b8 = uStack_c518;
          uStack_52b0 = uStack_c510;
          uStack_52a8 = uStack_c508;
          local_52a0 = local_ade0;
          fStack_529c = local_ade0;
          fStack_5298 = local_ade0;
          fStack_5294 = local_ade0;
          fStack_5290 = local_ade0;
          fStack_528c = local_ade0;
          fStack_5288 = local_ade0;
          fStack_5284 = local_ade0;
          local_5280 = local_c540;
          uStack_5278 = uStack_c538;
          uStack_5270 = uStack_c530;
          uStack_5268 = uStack_c528;
          local_5260 = local_aea0;
          fStack_525c = local_aea0;
          fStack_5258 = local_aea0;
          fStack_5254 = local_aea0;
          fStack_5250 = local_aea0;
          fStack_524c = local_aea0;
          fStack_5248 = local_aea0;
          fStack_5244 = local_aea0;
          local_5240 = local_c560;
          uStack_5238 = uStack_c558;
          uStack_5230 = uStack_c550;
          uStack_5228 = uStack_c548;
          local_5220 = local_af60;
          fStack_521c = local_af60;
          fStack_5218 = local_af60;
          fStack_5214 = local_af60;
          fStack_5210 = local_af60;
          fStack_520c = local_af60;
          fStack_5208 = local_af60;
          fStack_5204 = local_af60;
          local_5200 = local_c340;
          uStack_51f8 = uStack_c338;
          uStack_51f0 = uStack_c330;
          uStack_51e8 = uStack_c328;
          local_51e0 = local_ae20;
          fStack_51dc = local_ae20;
          fStack_51d8 = local_ae20;
          fStack_51d4 = local_ae20;
          fStack_51d0 = local_ae20;
          fStack_51cc = local_ae20;
          fStack_51c8 = local_ae20;
          fStack_51c4 = local_ae20;
          local_51c0 = local_c360;
          uStack_51b8 = uStack_c358;
          uStack_51b0 = uStack_c350;
          uStack_51a8 = uStack_c348;
          local_51a0 = local_aee0;
          fStack_519c = local_aee0;
          fStack_5198 = local_aee0;
          fStack_5194 = local_aee0;
          fStack_5190 = local_aee0;
          fStack_518c = local_aee0;
          fStack_5188 = local_aee0;
          fStack_5184 = local_aee0;
          local_5180 = local_c380;
          uStack_5178 = uStack_c378;
          uStack_5170 = uStack_c370;
          uStack_5168 = uStack_c368;
          local_5160 = local_afa0;
          fStack_515c = local_afa0;
          fStack_5158 = local_afa0;
          fStack_5154 = local_afa0;
          fStack_5150 = local_afa0;
          fStack_514c = local_afa0;
          fStack_5148 = local_afa0;
          fStack_5144 = local_afa0;
          local_5140 = local_c3a0;
          uStack_5138 = uStack_c398;
          uStack_5130 = uStack_c390;
          uStack_5128 = uStack_c388;
          local_5120 = local_ae60;
          fStack_511c = local_ae60;
          fStack_5118 = local_ae60;
          fStack_5114 = local_ae60;
          fStack_5110 = local_ae60;
          fStack_510c = local_ae60;
          fStack_5108 = local_ae60;
          fStack_5104 = local_ae60;
          local_5100 = local_c3c0;
          uStack_50f8 = uStack_c3b8;
          uStack_50f0 = uStack_c3b0;
          uStack_50e8 = uStack_c3a8;
          local_50e0 = local_af20;
          fStack_50dc = local_af20;
          fStack_50d8 = local_af20;
          fStack_50d4 = local_af20;
          fStack_50d0 = local_af20;
          fStack_50cc = local_af20;
          fStack_50c8 = local_af20;
          fStack_50c4 = local_af20;
          local_50c0 = local_c3e0;
          uStack_50b8 = uStack_c3d8;
          uStack_50b0 = uStack_c3d0;
          uStack_50a8 = uStack_c3c8;
          local_50a0 = local_afe0;
          fStack_509c = local_afe0;
          fStack_5098 = local_afe0;
          fStack_5094 = local_afe0;
          fStack_5090 = local_afe0;
          fStack_508c = local_afe0;
          fStack_5088 = local_afe0;
          fStack_5084 = local_afe0;
          local_5080 = local_c400;
          uStack_5078 = uStack_c3f8;
          uStack_5070 = uStack_c3f0;
          uStack_5068 = uStack_c3e8;
          local_5060 = local_aea0;
          fStack_505c = local_aea0;
          fStack_5058 = local_aea0;
          fStack_5054 = local_aea0;
          fStack_5050 = local_aea0;
          fStack_504c = local_aea0;
          fStack_5048 = local_aea0;
          fStack_5044 = local_aea0;
          local_5040 = local_c420;
          uStack_5038 = uStack_c418;
          uStack_5030 = uStack_c410;
          uStack_5028 = uStack_c408;
          local_5020 = local_af60;
          fStack_501c = local_af60;
          fStack_5018 = local_af60;
          fStack_5014 = local_af60;
          fStack_5010 = local_af60;
          fStack_500c = local_af60;
          fStack_5008 = local_af60;
          fStack_5004 = local_af60;
          local_5000 = local_c440;
          uStack_4ff8 = uStack_c438;
          uStack_4ff0 = uStack_c430;
          uStack_4fe8 = uStack_c428;
          local_4fe0 = local_b020;
          fStack_4fdc = local_b020;
          fStack_4fd8 = local_b020;
          fStack_4fd4 = local_b020;
          fStack_4fd0 = local_b020;
          fStack_4fcc = local_b020;
          fStack_4fc8 = local_b020;
          fStack_4fc4 = local_b020;
          local_4fc0 = local_c460;
          uStack_4fb8 = uStack_c458;
          uStack_4fb0 = uStack_c450;
          uStack_4fa8 = uStack_c448;
          local_4fa0 = local_ae20;
          fStack_4f9c = local_ae20;
          fStack_4f98 = local_ae20;
          fStack_4f94 = local_ae20;
          fStack_4f90 = local_ae20;
          fStack_4f8c = local_ae20;
          fStack_4f88 = local_ae20;
          fStack_4f84 = local_ae20;
          local_4f80 = local_c480;
          uStack_4f78 = uStack_c478;
          uStack_4f70 = uStack_c470;
          uStack_4f68 = uStack_c468;
          local_4f60 = local_aee0;
          fStack_4f5c = local_aee0;
          fStack_4f58 = local_aee0;
          fStack_4f54 = local_aee0;
          fStack_4f50 = local_aee0;
          fStack_4f4c = local_aee0;
          fStack_4f48 = local_aee0;
          fStack_4f44 = local_aee0;
          local_4f40 = local_c4a0;
          uStack_4f38 = uStack_c498;
          uStack_4f30 = uStack_c490;
          uStack_4f28 = uStack_c488;
          local_4f20 = local_afa0;
          fStack_4f1c = local_afa0;
          fStack_4f18 = local_afa0;
          fStack_4f14 = local_afa0;
          fStack_4f10 = local_afa0;
          fStack_4f0c = local_afa0;
          fStack_4f08 = local_afa0;
          fStack_4f04 = local_afa0;
          local_4f00 = local_c4c0;
          uStack_4ef8 = uStack_c4b8;
          uStack_4ef0 = uStack_c4b0;
          uStack_4ee8 = uStack_c4a8;
          local_4ee0 = local_ae60;
          fStack_4edc = local_ae60;
          fStack_4ed8 = local_ae60;
          fStack_4ed4 = local_ae60;
          fStack_4ed0 = local_ae60;
          fStack_4ecc = local_ae60;
          fStack_4ec8 = local_ae60;
          fStack_4ec4 = local_ae60;
          local_4ec0 = local_c4e0;
          uStack_4eb8 = uStack_c4d8;
          uStack_4eb0 = uStack_c4d0;
          uStack_4ea8 = uStack_c4c8;
          local_4ea0 = local_af20;
          fStack_4e9c = local_af20;
          fStack_4e98 = local_af20;
          fStack_4e94 = local_af20;
          fStack_4e90 = local_af20;
          fStack_4e8c = local_af20;
          fStack_4e88 = local_af20;
          fStack_4e84 = local_af20;
          local_4e80 = local_c500;
          uStack_4e78 = uStack_c4f8;
          uStack_4e70 = uStack_c4f0;
          uStack_4e68 = uStack_c4e8;
          local_4e60 = local_afe0;
          fStack_4e5c = local_afe0;
          fStack_4e58 = local_afe0;
          fStack_4e54 = local_afe0;
          fStack_4e50 = local_afe0;
          fStack_4e4c = local_afe0;
          fStack_4e48 = local_afe0;
          fStack_4e44 = local_afe0;
          local_4e40 = local_c520;
          uStack_4e38 = uStack_c518;
          uStack_4e30 = uStack_c510;
          uStack_4e28 = uStack_c508;
          local_4e20 = local_aea0;
          fStack_4e1c = local_aea0;
          fStack_4e18 = local_aea0;
          fStack_4e14 = local_aea0;
          fStack_4e10 = local_aea0;
          fStack_4e0c = local_aea0;
          fStack_4e08 = local_aea0;
          fStack_4e04 = local_aea0;
          local_4e00 = local_c540;
          uStack_4df8 = uStack_c538;
          uStack_4df0 = uStack_c530;
          uStack_4de8 = uStack_c528;
          local_4de0 = local_af60;
          fStack_4ddc = local_af60;
          fStack_4dd8 = local_af60;
          fStack_4dd4 = local_af60;
          fStack_4dd0 = local_af60;
          fStack_4dcc = local_af60;
          fStack_4dc8 = local_af60;
          fStack_4dc4 = local_af60;
          local_4dc0 = local_c560;
          uStack_4db8 = uStack_c558;
          uStack_4db0 = uStack_c550;
          uStack_4da8 = uStack_c548;
          local_4da0 = local_b020;
          fStack_4d9c = local_b020;
          fStack_4d98 = local_b020;
          fStack_4d94 = local_b020;
          fStack_4d90 = local_b020;
          fStack_4d8c = local_b020;
          fStack_4d88 = local_b020;
          fStack_4d84 = local_b020;
          local_3040 = local_5fe0;
          uStack_3038 = uStack_5fd8;
          uStack_3030 = uStack_5fd0;
          uStack_3028 = uStack_5fc8;
          fStack_3004 = local_abe0;
          local_3000 = local_6040;
          uStack_2ff8 = uStack_6038;
          uStack_2ff0 = uStack_6030;
          uStack_2fe8 = uStack_6028;
          fStack_2fc4 = local_ac20;
          local_2fc0 = local_60a0;
          uStack_2fb8 = uStack_6098;
          uStack_2fb0 = uStack_6090;
          uStack_2fa8 = uStack_6088;
          fStack_2f84 = local_ac60;
          local_2f80 = local_6100;
          uStack_2f78 = uStack_60f8;
          uStack_2f70 = uStack_60f0;
          uStack_2f68 = uStack_60e8;
          fStack_2f44 = local_aca0;
          local_2f40 = local_6160;
          uStack_2f38 = uStack_6158;
          uStack_2f30 = uStack_6150;
          uStack_2f28 = uStack_6148;
          fStack_2f04 = local_ace0;
          local_2f00 = local_61c0;
          uStack_2ef8 = uStack_61b8;
          uStack_2ef0 = uStack_61b0;
          uStack_2ee8 = uStack_61a8;
          fStack_2ec4 = local_ad20;
          local_2ec0 = local_6220;
          uStack_2eb8 = uStack_6218;
          uStack_2eb0 = uStack_6210;
          uStack_2ea8 = uStack_6208;
          fStack_2e84 = local_ad60;
          local_2e80 = local_6280;
          uStack_2e78 = uStack_6278;
          uStack_2e70 = uStack_6270;
          uStack_2e68 = uStack_6268;
          fStack_2e44 = local_ada0;
          local_2e40 = local_62e0;
          uStack_2e38 = uStack_62d8;
          uStack_2e30 = uStack_62d0;
          uStack_2e28 = uStack_62c8;
          fStack_2e04 = local_ade0;
          local_2e00 = local_6340;
          uStack_2df8 = uStack_6338;
          uStack_2df0 = uStack_6330;
          uStack_2de8 = uStack_6328;
          fStack_2dc4 = local_abe0;
          local_2dc0 = local_63a0;
          uStack_2db8 = uStack_6398;
          uStack_2db0 = uStack_6390;
          uStack_2da8 = uStack_6388;
          fStack_2d84 = local_ac20;
          local_2d80 = local_6400;
          uStack_2d78 = uStack_63f8;
          uStack_2d70 = uStack_63f0;
          uStack_2d68 = uStack_63e8;
          fStack_2d44 = local_ac60;
          local_2d40 = local_6460;
          uStack_2d38 = uStack_6458;
          uStack_2d30 = uStack_6450;
          uStack_2d28 = uStack_6448;
          fStack_2d04 = local_aca0;
          local_2d00 = local_64c0;
          uStack_2cf8 = uStack_64b8;
          uStack_2cf0 = uStack_64b0;
          uStack_2ce8 = uStack_64a8;
          fStack_2cc4 = local_ace0;
          local_2cc0 = local_6520;
          uStack_2cb8 = uStack_6518;
          uStack_2cb0 = uStack_6510;
          uStack_2ca8 = uStack_6508;
          fStack_2c84 = local_ad20;
          local_2c80 = local_6580;
          uStack_2c78 = uStack_6578;
          uStack_2c70 = uStack_6570;
          uStack_2c68 = uStack_6568;
          fStack_2c44 = local_ad60;
          local_2c40 = local_65e0;
          uStack_2c38 = uStack_65d8;
          uStack_2c30 = uStack_65d0;
          uStack_2c28 = uStack_65c8;
          fStack_2c04 = local_ada0;
          local_2c00 = local_6640;
          uStack_2bf8 = uStack_6638;
          uStack_2bf0 = uStack_6630;
          uStack_2be8 = uStack_6628;
          fStack_2bc4 = local_ade0;
          local_2bc0 = local_66a0;
          uStack_2bb8 = uStack_6698;
          uStack_2bb0 = uStack_6690;
          uStack_2ba8 = uStack_6688;
          fStack_2b84 = local_ac20;
          local_2b80 = local_6700;
          uStack_2b78 = uStack_66f8;
          uStack_2b70 = uStack_66f0;
          uStack_2b68 = uStack_66e8;
          fStack_2b44 = local_ac60;
          local_2b40 = local_6760;
          uStack_2b38 = uStack_6758;
          uStack_2b30 = uStack_6750;
          uStack_2b28 = uStack_6748;
          fStack_2b04 = local_ae20;
          local_2b00 = local_67c0;
          uStack_2af8 = uStack_67b8;
          uStack_2af0 = uStack_67b0;
          uStack_2ae8 = uStack_67a8;
          fStack_2ac4 = local_ace0;
          local_2ac0 = local_6820;
          uStack_2ab8 = uStack_6818;
          uStack_2ab0 = uStack_6810;
          uStack_2aa8 = uStack_6808;
          fStack_2a84 = local_ad20;
          local_2a80 = local_6880;
          uStack_2a78 = uStack_6878;
          uStack_2a70 = uStack_6870;
          uStack_2a68 = uStack_6868;
          fStack_2a44 = local_ae60;
          local_2a40 = local_68e0;
          uStack_2a38 = uStack_68d8;
          uStack_2a30 = uStack_68d0;
          uStack_2a28 = uStack_68c8;
          fStack_2a04 = local_ada0;
          local_2a00 = local_6940;
          uStack_29f8 = uStack_6938;
          uStack_29f0 = uStack_6930;
          uStack_29e8 = uStack_6928;
          fStack_29c4 = local_ade0;
          local_29c0 = local_69a0;
          uStack_29b8 = uStack_6998;
          uStack_29b0 = uStack_6990;
          uStack_29a8 = uStack_6988;
          fStack_2984 = local_aea0;
          local_2980 = local_6a00;
          uStack_2978 = uStack_69f8;
          uStack_2970 = uStack_69f0;
          uStack_2968 = uStack_69e8;
          fStack_2944 = local_ac20;
          local_2940 = local_6a60;
          uStack_2938 = uStack_6a58;
          uStack_2930 = uStack_6a50;
          uStack_2928 = uStack_6a48;
          fStack_2904 = local_ac60;
          local_2900 = local_6ac0;
          uStack_28f8 = uStack_6ab8;
          uStack_28f0 = uStack_6ab0;
          uStack_28e8 = uStack_6aa8;
          fStack_28c4 = local_ae20;
          local_28c0 = local_6b20;
          uStack_28b8 = uStack_6b18;
          uStack_28b0 = uStack_6b10;
          uStack_28a8 = uStack_6b08;
          fStack_2884 = local_ace0;
          local_2880 = local_6b80;
          uStack_2878 = uStack_6b78;
          uStack_2870 = uStack_6b70;
          uStack_2868 = uStack_6b68;
          fStack_2844 = local_ad20;
          local_2840 = local_6be0;
          uStack_2838 = uStack_6bd8;
          uStack_2830 = uStack_6bd0;
          uStack_2828 = uStack_6bc8;
          fStack_2804 = local_ae60;
          local_2800 = local_6c40;
          uStack_27f8 = uStack_6c38;
          uStack_27f0 = uStack_6c30;
          uStack_27e8 = uStack_6c28;
          fStack_27c4 = local_ada0;
          local_27c0 = local_6ca0;
          uStack_27b8 = uStack_6c98;
          uStack_27b0 = uStack_6c90;
          uStack_27a8 = uStack_6c88;
          fStack_2784 = local_ade0;
          local_2780 = local_6d00;
          uStack_2778 = uStack_6cf8;
          uStack_2770 = uStack_6cf0;
          uStack_2768 = uStack_6ce8;
          fStack_2744 = local_aea0;
          local_2740 = local_6d60;
          uStack_2738 = uStack_6d58;
          uStack_2730 = uStack_6d50;
          uStack_2728 = uStack_6d48;
          fStack_2704 = local_ac60;
          local_2700 = local_6dc0;
          uStack_26f8 = uStack_6db8;
          uStack_26f0 = uStack_6db0;
          uStack_26e8 = uStack_6da8;
          fStack_26c4 = local_ae20;
          local_26c0 = local_6e20;
          uStack_26b8 = uStack_6e18;
          uStack_26b0 = uStack_6e10;
          uStack_26a8 = uStack_6e08;
          fStack_2684 = local_aee0;
          local_2680 = local_6e80;
          uStack_2678 = uStack_6e78;
          uStack_2670 = uStack_6e70;
          uStack_2668 = uStack_6e68;
          fStack_2644 = local_ad20;
          local_2640 = local_6ee0;
          uStack_2638 = uStack_6ed8;
          uStack_2630 = uStack_6ed0;
          uStack_2628 = uStack_6ec8;
          fStack_2604 = local_ae60;
          local_2600 = local_6f40;
          uStack_25f8 = uStack_6f38;
          uStack_25f0 = uStack_6f30;
          uStack_25e8 = uStack_6f28;
          fStack_25c4 = local_af20;
          local_25c0 = local_6fa0;
          uStack_25b8 = uStack_6f98;
          uStack_25b0 = uStack_6f90;
          uStack_25a8 = uStack_6f88;
          fStack_2584 = local_ade0;
          local_2580 = local_7000;
          uStack_2578 = uStack_6ff8;
          uStack_2570 = uStack_6ff0;
          uStack_2568 = uStack_6fe8;
          fStack_2544 = local_aea0;
          local_2540 = local_7060;
          uStack_2538 = uStack_7058;
          uStack_2530 = uStack_7050;
          uStack_2528 = uStack_7048;
          fStack_2504 = local_af60;
          local_2500 = local_70c0;
          uStack_24f8 = uStack_70b8;
          uStack_24f0 = uStack_70b0;
          uStack_24e8 = uStack_70a8;
          fStack_24c4 = local_ac60;
          local_24c0 = local_7120;
          uStack_24b8 = uStack_7118;
          uStack_24b0 = uStack_7110;
          uStack_24a8 = uStack_7108;
          fStack_2484 = local_ae20;
          local_2480 = local_7180;
          uStack_2478 = uStack_7178;
          uStack_2470 = uStack_7170;
          uStack_2468 = uStack_7168;
          fStack_2444 = local_aee0;
          local_2440 = local_71e0;
          uStack_2438 = uStack_71d8;
          uStack_2430 = uStack_71d0;
          uStack_2428 = uStack_71c8;
          fStack_2404 = local_ad20;
          local_2400 = local_7240;
          uStack_23f8 = uStack_7238;
          uStack_23f0 = uStack_7230;
          uStack_23e8 = uStack_7228;
          fStack_23c4 = local_ae60;
          local_23c0 = local_72a0;
          uStack_23b8 = uStack_7298;
          uStack_23b0 = uStack_7290;
          uStack_23a8 = uStack_7288;
          fStack_2384 = local_af20;
          local_2380 = local_7300;
          uStack_2378 = uStack_72f8;
          uStack_2370 = uStack_72f0;
          uStack_2368 = uStack_72e8;
          fStack_2344 = local_ade0;
          local_2340 = local_7360;
          uStack_2338 = uStack_7358;
          uStack_2330 = uStack_7350;
          uStack_2328 = uStack_7348;
          fStack_2304 = local_aea0;
          local_2300 = local_73c0;
          uStack_22f8 = uStack_73b8;
          uStack_22f0 = uStack_73b0;
          uStack_22e8 = uStack_73a8;
          fStack_22c4 = local_af60;
          local_22c0 = local_7420;
          uStack_22b8 = uStack_7418;
          uStack_22b0 = uStack_7410;
          uStack_22a8 = uStack_7408;
          fStack_2284 = local_ae20;
          local_2280 = local_7480;
          uStack_2278 = uStack_7478;
          uStack_2270 = uStack_7470;
          uStack_2268 = uStack_7468;
          fStack_2244 = local_aee0;
          local_2240 = local_74e0;
          uStack_2238 = uStack_74d8;
          uStack_2230 = uStack_74d0;
          uStack_2228 = uStack_74c8;
          fStack_2204 = local_afa0;
          local_2200 = local_7540;
          uStack_21f8 = uStack_7538;
          uStack_21f0 = uStack_7530;
          uStack_21e8 = uStack_7528;
          fStack_21c4 = local_ae60;
          local_21c0 = local_75a0;
          uStack_21b8 = uStack_7598;
          uStack_21b0 = uStack_7590;
          uStack_21a8 = uStack_7588;
          fStack_2184 = local_af20;
          local_2180 = local_7600;
          uStack_2178 = uStack_75f8;
          uStack_2170 = uStack_75f0;
          uStack_2168 = uStack_75e8;
          fStack_2144 = local_afe0;
          local_2140 = local_7660;
          uStack_2138 = uStack_7658;
          uStack_2130 = uStack_7650;
          uStack_2128 = uStack_7648;
          fStack_2104 = local_aea0;
          local_2100 = local_76c0;
          uStack_20f8 = uStack_76b8;
          uStack_20f0 = uStack_76b0;
          uStack_20e8 = uStack_76a8;
          fStack_20c4 = local_af60;
          local_20c0 = local_7720;
          uStack_20b8 = uStack_7718;
          uStack_20b0 = uStack_7710;
          uStack_20a8 = uStack_7708;
          fStack_2084 = local_b020;
          local_2080 = local_7780;
          uStack_2078 = uStack_7778;
          uStack_2070 = uStack_7770;
          uStack_2068 = uStack_7768;
          fStack_2044 = local_ae20;
          local_2040 = local_77e0;
          uStack_2038 = uStack_77d8;
          uStack_2030 = uStack_77d0;
          uStack_2028 = uStack_77c8;
          fStack_2004 = local_aee0;
          local_2000 = local_7840;
          uStack_1ff8 = uStack_7838;
          uStack_1ff0 = uStack_7830;
          uStack_1fe8 = uStack_7828;
          fStack_1fc4 = local_afa0;
          local_1fc0 = local_78a0;
          uStack_1fb8 = uStack_7898;
          uStack_1fb0 = uStack_7890;
          uStack_1fa8 = uStack_7888;
          fStack_1f84 = local_ae60;
          local_1f80 = local_7900;
          uStack_1f78 = uStack_78f8;
          uStack_1f70 = uStack_78f0;
          uStack_1f68 = uStack_78e8;
          fStack_1f44 = local_af20;
          local_1f40 = local_7960;
          uStack_1f38 = uStack_7958;
          uStack_1f30 = uStack_7950;
          uStack_1f28 = uStack_7948;
          fStack_1f04 = local_afe0;
          local_1f00 = local_79c0;
          uStack_1ef8 = uStack_79b8;
          uStack_1ef0 = uStack_79b0;
          uStack_1ee8 = uStack_79a8;
          fStack_1ec4 = local_aea0;
          local_1ec0 = local_7a20;
          uStack_1eb8 = uStack_7a18;
          uStack_1eb0 = uStack_7a10;
          uStack_1ea8 = uStack_7a08;
          fStack_1e84 = local_af60;
          local_1e80 = local_7a80;
          uStack_1e78 = uStack_7a78;
          uStack_1e70 = uStack_7a70;
          uStack_1e68 = uStack_7a68;
          fStack_1e44 = local_b020;
        }
        for (; local_c568 + 1 < local_c0f8; local_c568 = local_c568 + 2) {
          local_c008 = local_c2b0;
          local_7ae0 = *(undefined8 *)local_c2b0;
          uStack_7ad8 = *(undefined8 *)(local_c2b0 + 2);
          uStack_7ad0 = *(undefined8 *)(local_c2b0 + 4);
          uStack_7ac8 = *(undefined8 *)(local_c2b0 + 6);
          local_c010 = local_c2b8;
          local_7e40 = *(undefined8 *)local_c2b8;
          uStack_7e38 = *(undefined8 *)(local_c2b8 + 2);
          uStack_7e30 = *(undefined8 *)(local_c2b8 + 4);
          uStack_7e28 = *(undefined8 *)(local_c2b8 + 6);
          local_b028 = local_c308;
          local_b060 = *local_c308;
          local_c920 = CONCAT44(local_b060,local_b060);
          uStack_c918 = CONCAT44(local_b060,local_b060);
          uStack_c910 = CONCAT44(local_b060,local_b060);
          uStack_c908 = CONCAT44(local_b060,local_b060);
          local_b068 = local_c308 + 1;
          local_b0a0 = *local_b068;
          local_c940 = CONCAT44(local_b0a0,local_b0a0);
          uStack_c938 = CONCAT44(local_b0a0,local_b0a0);
          uStack_c930 = CONCAT44(local_b0a0,local_b0a0);
          uStack_c928 = CONCAT44(local_b0a0,local_b0a0);
          local_b0a8 = local_c308 + 2;
          local_b0e0 = *local_b0a8;
          local_c960 = CONCAT44(local_b0e0,local_b0e0);
          uStack_c958 = CONCAT44(local_b0e0,local_b0e0);
          uStack_c950 = CONCAT44(local_b0e0,local_b0e0);
          uStack_c948 = CONCAT44(local_b0e0,local_b0e0);
          local_b0e8 = local_c310;
          local_b120 = *local_c310;
          local_c980 = CONCAT44(local_b120,local_b120);
          uStack_c978 = CONCAT44(local_b120,local_b120);
          uStack_c970 = CONCAT44(local_b120,local_b120);
          uStack_c968 = CONCAT44(local_b120,local_b120);
          local_b128 = local_c310 + 1;
          local_b160 = *local_b128;
          local_c9a0 = CONCAT44(local_b160,local_b160);
          uStack_c998 = CONCAT44(local_b160,local_b160);
          uStack_c990 = CONCAT44(local_b160,local_b160);
          uStack_c988 = CONCAT44(local_b160,local_b160);
          local_b168 = local_c310 + 2;
          local_b1a0 = *local_b168;
          local_c9c0 = CONCAT44(local_b1a0,local_b1a0);
          uStack_c9b8 = CONCAT44(local_b1a0,local_b1a0);
          uStack_c9b0 = CONCAT44(local_b1a0,local_b1a0);
          uStack_c9a8 = CONCAT44(local_b1a0,local_b1a0);
          local_b1a8 = local_c318;
          local_b1e0 = *local_c318;
          local_c9e0 = CONCAT44(local_b1e0,local_b1e0);
          uStack_c9d8 = CONCAT44(local_b1e0,local_b1e0);
          uStack_c9d0 = CONCAT44(local_b1e0,local_b1e0);
          uStack_c9c8 = CONCAT44(local_b1e0,local_b1e0);
          local_b1e8 = local_c318 + 1;
          local_b220 = *local_b1e8;
          local_ca00 = CONCAT44(local_b220,local_b220);
          uStack_c9f8 = CONCAT44(local_b220,local_b220);
          uStack_c9f0 = CONCAT44(local_b220,local_b220);
          uStack_c9e8 = CONCAT44(local_b220,local_b220);
          local_b228 = local_c318 + 2;
          local_b260 = *local_b228;
          local_ca20 = CONCAT44(local_b260,local_b260);
          uStack_ca18 = CONCAT44(local_b260,local_b260);
          uStack_ca10 = CONCAT44(local_b260,local_b260);
          uStack_ca08 = CONCAT44(local_b260,local_b260);
          local_1e20 = local_b060 * (float)local_5f80;
          fStack_1e1c = local_b060 * local_5f80._4_4_;
          fStack_1e18 = local_b060 * (float)uStack_5f78;
          fStack_1e14 = local_b060 * uStack_5f78._4_4_;
          fStack_1e10 = local_b060 * (float)uStack_5f70;
          fStack_1e0c = local_b060 * uStack_5f70._4_4_;
          fStack_1e08 = local_b060 * (float)uStack_5f68;
          local_1e40._0_4_ = (float)local_7ae0;
          local_1e40._4_4_ = (float)((ulong)local_7ae0 >> 0x20);
          uStack_1e38._0_4_ = (float)uStack_7ad8;
          uStack_1e38._4_4_ = (float)((ulong)uStack_7ad8 >> 0x20);
          uStack_1e30._0_4_ = (float)uStack_7ad0;
          uStack_1e30._4_4_ = (float)((ulong)uStack_7ad0 >> 0x20);
          uStack_1e28._0_4_ = (float)uStack_7ac8;
          uStack_1e28._4_4_ = (float)((ulong)uStack_7ac8 >> 0x20);
          local_7b40 = CONCAT44(fStack_1e1c + local_1e40._4_4_,local_1e20 + (float)local_1e40);
          uStack_7b38 = CONCAT44(fStack_1e14 + uStack_1e38._4_4_,fStack_1e18 + (float)uStack_1e38);
          uStack_7b30 = CONCAT44(fStack_1e0c + uStack_1e30._4_4_,fStack_1e10 + (float)uStack_1e30);
          uStack_7b28 = CONCAT44(local_b060 + uStack_1e28._4_4_,fStack_1e08 + (float)uStack_1e28);
          local_1de0 = local_b0a0 * (float)local_5f40;
          fStack_1ddc = local_b0a0 * local_5f40._4_4_;
          fStack_1dd8 = local_b0a0 * (float)uStack_5f38;
          fStack_1dd4 = local_b0a0 * uStack_5f38._4_4_;
          fStack_1dd0 = local_b0a0 * (float)uStack_5f30;
          fStack_1dcc = local_b0a0 * uStack_5f30._4_4_;
          fStack_1dc8 = local_b0a0 * (float)uStack_5f28;
          fVar76 = local_1de0 + local_1e20 + (float)local_1e40;
          fVar80 = fStack_1ddc + fStack_1e1c + local_1e40._4_4_;
          fVar81 = fStack_1dd8 + fStack_1e18 + (float)uStack_1e38;
          fVar82 = fStack_1dd4 + fStack_1e14 + uStack_1e38._4_4_;
          fVar83 = fStack_1dd0 + fStack_1e10 + (float)uStack_1e30;
          fVar84 = fStack_1dcc + fStack_1e0c + uStack_1e30._4_4_;
          fVar85 = fStack_1dc8 + fStack_1e08 + (float)uStack_1e28;
          fVar86 = local_b0a0 + local_b060 + uStack_1e28._4_4_;
          local_7ba0 = CONCAT44(fVar80,fVar76);
          uStack_7b98 = CONCAT44(fVar82,fVar81);
          uStack_7b90 = CONCAT44(fVar84,fVar83);
          uStack_7b88 = CONCAT44(fVar86,fVar85);
          local_1da0 = local_b0e0 * (float)local_5f00;
          fStack_1d9c = local_b0e0 * local_5f00._4_4_;
          fStack_1d98 = local_b0e0 * (float)uStack_5ef8;
          fStack_1d94 = local_b0e0 * uStack_5ef8._4_4_;
          fStack_1d90 = local_b0e0 * (float)uStack_5ef0;
          fStack_1d8c = local_b0e0 * uStack_5ef0._4_4_;
          fStack_1d88 = local_b0e0 * (float)uStack_5ee8;
          fVar76 = local_1da0 + fVar76;
          fVar80 = fStack_1d9c + fVar80;
          fVar81 = fStack_1d98 + fVar81;
          fVar82 = fStack_1d94 + fVar82;
          fVar83 = fStack_1d90 + fVar83;
          fVar84 = fStack_1d8c + fVar84;
          fVar85 = fStack_1d88 + fVar85;
          fVar86 = local_b0e0 + fVar86;
          local_7c00 = CONCAT44(fVar80,fVar76);
          uStack_7bf8 = CONCAT44(fVar82,fVar81);
          uStack_7bf0 = CONCAT44(fVar84,fVar83);
          uStack_7be8 = CONCAT44(fVar86,fVar85);
          local_1d60 = local_b120 * (float)local_5ec0;
          fStack_1d5c = local_b120 * local_5ec0._4_4_;
          fStack_1d58 = local_b120 * (float)uStack_5eb8;
          fStack_1d54 = local_b120 * uStack_5eb8._4_4_;
          fStack_1d50 = local_b120 * (float)uStack_5eb0;
          fStack_1d4c = local_b120 * uStack_5eb0._4_4_;
          fStack_1d48 = local_b120 * (float)uStack_5ea8;
          fVar76 = local_1d60 + fVar76;
          fVar80 = fStack_1d5c + fVar80;
          fVar81 = fStack_1d58 + fVar81;
          fVar82 = fStack_1d54 + fVar82;
          fVar83 = fStack_1d50 + fVar83;
          fVar84 = fStack_1d4c + fVar84;
          fVar85 = fStack_1d48 + fVar85;
          fVar86 = local_b120 + fVar86;
          local_7c60 = CONCAT44(fVar80,fVar76);
          uStack_7c58 = CONCAT44(fVar82,fVar81);
          uStack_7c50 = CONCAT44(fVar84,fVar83);
          uStack_7c48 = CONCAT44(fVar86,fVar85);
          local_1d20 = local_b160 * (float)local_5e80;
          fStack_1d1c = local_b160 * local_5e80._4_4_;
          fStack_1d18 = local_b160 * (float)uStack_5e78;
          fStack_1d14 = local_b160 * uStack_5e78._4_4_;
          fStack_1d10 = local_b160 * (float)uStack_5e70;
          fStack_1d0c = local_b160 * uStack_5e70._4_4_;
          fStack_1d08 = local_b160 * (float)uStack_5e68;
          fVar76 = local_1d20 + fVar76;
          fVar80 = fStack_1d1c + fVar80;
          fVar81 = fStack_1d18 + fVar81;
          fVar82 = fStack_1d14 + fVar82;
          fVar83 = fStack_1d10 + fVar83;
          fVar84 = fStack_1d0c + fVar84;
          fVar85 = fStack_1d08 + fVar85;
          fVar86 = local_b160 + fVar86;
          local_7cc0 = CONCAT44(fVar80,fVar76);
          uStack_7cb8 = CONCAT44(fVar82,fVar81);
          uStack_7cb0 = CONCAT44(fVar84,fVar83);
          uStack_7ca8 = CONCAT44(fVar86,fVar85);
          local_1ce0 = local_b1a0 * (float)local_5e40;
          fStack_1cdc = local_b1a0 * local_5e40._4_4_;
          fStack_1cd8 = local_b1a0 * (float)uStack_5e38;
          fStack_1cd4 = local_b1a0 * uStack_5e38._4_4_;
          fStack_1cd0 = local_b1a0 * (float)uStack_5e30;
          fStack_1ccc = local_b1a0 * uStack_5e30._4_4_;
          fStack_1cc8 = local_b1a0 * (float)uStack_5e28;
          fVar76 = local_1ce0 + fVar76;
          fVar80 = fStack_1cdc + fVar80;
          fVar81 = fStack_1cd8 + fVar81;
          fVar82 = fStack_1cd4 + fVar82;
          fVar83 = fStack_1cd0 + fVar83;
          fVar84 = fStack_1ccc + fVar84;
          fVar85 = fStack_1cc8 + fVar85;
          fVar86 = local_b1a0 + fVar86;
          local_7d20 = CONCAT44(fVar80,fVar76);
          uStack_7d18 = CONCAT44(fVar82,fVar81);
          uStack_7d10 = CONCAT44(fVar84,fVar83);
          uStack_7d08 = CONCAT44(fVar86,fVar85);
          local_1ca0 = local_b1e0 * (float)local_5e00;
          fStack_1c9c = local_b1e0 * local_5e00._4_4_;
          fStack_1c98 = local_b1e0 * (float)uStack_5df8;
          fStack_1c94 = local_b1e0 * uStack_5df8._4_4_;
          fStack_1c90 = local_b1e0 * (float)uStack_5df0;
          fStack_1c8c = local_b1e0 * uStack_5df0._4_4_;
          fStack_1c88 = local_b1e0 * (float)uStack_5de8;
          fVar76 = local_1ca0 + fVar76;
          fVar80 = fStack_1c9c + fVar80;
          fVar81 = fStack_1c98 + fVar81;
          fVar82 = fStack_1c94 + fVar82;
          fVar83 = fStack_1c90 + fVar83;
          fVar84 = fStack_1c8c + fVar84;
          fVar85 = fStack_1c88 + fVar85;
          fVar86 = local_b1e0 + fVar86;
          local_7d80 = CONCAT44(fVar80,fVar76);
          uStack_7d78 = CONCAT44(fVar82,fVar81);
          uStack_7d70 = CONCAT44(fVar84,fVar83);
          uStack_7d68 = CONCAT44(fVar86,fVar85);
          local_1c60 = local_b220 * (float)local_5dc0;
          fStack_1c5c = local_b220 * local_5dc0._4_4_;
          fStack_1c58 = local_b220 * (float)uStack_5db8;
          fStack_1c54 = local_b220 * uStack_5db8._4_4_;
          fStack_1c50 = local_b220 * (float)uStack_5db0;
          fStack_1c4c = local_b220 * uStack_5db0._4_4_;
          fStack_1c48 = local_b220 * (float)uStack_5da8;
          fVar76 = local_1c60 + fVar76;
          fVar80 = fStack_1c5c + fVar80;
          fVar81 = fStack_1c58 + fVar81;
          fVar82 = fStack_1c54 + fVar82;
          fVar83 = fStack_1c50 + fVar83;
          fVar84 = fStack_1c4c + fVar84;
          fVar85 = fStack_1c48 + fVar85;
          fVar86 = local_b220 + fVar86;
          local_7de0 = CONCAT44(fVar80,fVar76);
          uStack_7dd8 = CONCAT44(fVar82,fVar81);
          uStack_7dd0 = CONCAT44(fVar84,fVar83);
          uStack_7dc8 = CONCAT44(fVar86,fVar85);
          local_1c20 = local_b260 * (float)local_5d80;
          fStack_1c1c = local_b260 * local_5d80._4_4_;
          fStack_1c18 = local_b260 * (float)uStack_5d78;
          fStack_1c14 = local_b260 * uStack_5d78._4_4_;
          fStack_1c10 = local_b260 * (float)uStack_5d70;
          fStack_1c0c = local_b260 * uStack_5d70._4_4_;
          fStack_1c08 = local_b260 * (float)uStack_5d68;
          local_c8e0 = CONCAT44(fStack_1c1c + fVar80,local_1c20 + fVar76);
          uStack_c8d8 = CONCAT44(fStack_1c14 + fVar82,fStack_1c18 + fVar81);
          uStack_c8d0 = CONCAT44(fStack_1c0c + fVar84,fStack_1c10 + fVar83);
          uStack_c8c8 = CONCAT44(local_b260 + fVar86,fStack_1c08 + fVar85);
          local_1be0 = local_b060 * (float)local_5d40;
          fStack_1bdc = local_b060 * local_5d40._4_4_;
          fStack_1bd8 = local_b060 * (float)uStack_5d38;
          fStack_1bd4 = local_b060 * uStack_5d38._4_4_;
          fStack_1bd0 = local_b060 * (float)uStack_5d30;
          fStack_1bcc = local_b060 * uStack_5d30._4_4_;
          fStack_1bc8 = local_b060 * (float)uStack_5d28;
          local_1c00._0_4_ = (float)local_7e40;
          local_1c00._4_4_ = (float)((ulong)local_7e40 >> 0x20);
          uStack_1bf8._0_4_ = (float)uStack_7e38;
          uStack_1bf8._4_4_ = (float)((ulong)uStack_7e38 >> 0x20);
          uStack_1bf0._0_4_ = (float)uStack_7e30;
          uStack_1bf0._4_4_ = (float)((ulong)uStack_7e30 >> 0x20);
          uStack_1be8._0_4_ = (float)uStack_7e28;
          uStack_1be8._4_4_ = (float)((ulong)uStack_7e28 >> 0x20);
          local_7ea0 = CONCAT44(fStack_1bdc + local_1c00._4_4_,local_1be0 + (float)local_1c00);
          uStack_7e98 = CONCAT44(fStack_1bd4 + uStack_1bf8._4_4_,fStack_1bd8 + (float)uStack_1bf8);
          uStack_7e90 = CONCAT44(fStack_1bcc + uStack_1bf0._4_4_,fStack_1bd0 + (float)uStack_1bf0);
          uStack_7e88 = CONCAT44(local_b060 + uStack_1be8._4_4_,fStack_1bc8 + (float)uStack_1be8);
          local_1ba0 = local_b0a0 * (float)local_5d00;
          fStack_1b9c = local_b0a0 * local_5d00._4_4_;
          fStack_1b98 = local_b0a0 * (float)uStack_5cf8;
          fStack_1b94 = local_b0a0 * uStack_5cf8._4_4_;
          fStack_1b90 = local_b0a0 * (float)uStack_5cf0;
          fStack_1b8c = local_b0a0 * uStack_5cf0._4_4_;
          fStack_1b88 = local_b0a0 * (float)uStack_5ce8;
          fVar76 = local_1ba0 + local_1be0 + (float)local_1c00;
          fVar80 = fStack_1b9c + fStack_1bdc + local_1c00._4_4_;
          fVar81 = fStack_1b98 + fStack_1bd8 + (float)uStack_1bf8;
          fVar82 = fStack_1b94 + fStack_1bd4 + uStack_1bf8._4_4_;
          fVar83 = fStack_1b90 + fStack_1bd0 + (float)uStack_1bf0;
          fVar84 = fStack_1b8c + fStack_1bcc + uStack_1bf0._4_4_;
          fVar85 = fStack_1b88 + fStack_1bc8 + (float)uStack_1be8;
          fVar86 = local_b0a0 + local_b060 + uStack_1be8._4_4_;
          local_7f00 = CONCAT44(fVar80,fVar76);
          uStack_7ef8 = CONCAT44(fVar82,fVar81);
          uStack_7ef0 = CONCAT44(fVar84,fVar83);
          uStack_7ee8 = CONCAT44(fVar86,fVar85);
          local_1b60 = local_b0e0 * (float)local_5cc0;
          fStack_1b5c = local_b0e0 * local_5cc0._4_4_;
          fStack_1b58 = local_b0e0 * (float)uStack_5cb8;
          fStack_1b54 = local_b0e0 * uStack_5cb8._4_4_;
          fStack_1b50 = local_b0e0 * (float)uStack_5cb0;
          fStack_1b4c = local_b0e0 * uStack_5cb0._4_4_;
          fStack_1b48 = local_b0e0 * (float)uStack_5ca8;
          fVar76 = local_1b60 + fVar76;
          fVar80 = fStack_1b5c + fVar80;
          fVar81 = fStack_1b58 + fVar81;
          fVar82 = fStack_1b54 + fVar82;
          fVar83 = fStack_1b50 + fVar83;
          fVar84 = fStack_1b4c + fVar84;
          fVar85 = fStack_1b48 + fVar85;
          fVar86 = local_b0e0 + fVar86;
          local_7f60 = CONCAT44(fVar80,fVar76);
          uStack_7f58 = CONCAT44(fVar82,fVar81);
          uStack_7f50 = CONCAT44(fVar84,fVar83);
          uStack_7f48 = CONCAT44(fVar86,fVar85);
          local_1b20 = local_b120 * (float)local_5c80;
          fStack_1b1c = local_b120 * local_5c80._4_4_;
          fStack_1b18 = local_b120 * (float)uStack_5c78;
          fStack_1b14 = local_b120 * uStack_5c78._4_4_;
          fStack_1b10 = local_b120 * (float)uStack_5c70;
          fStack_1b0c = local_b120 * uStack_5c70._4_4_;
          fStack_1b08 = local_b120 * (float)uStack_5c68;
          fVar76 = local_1b20 + fVar76;
          fVar80 = fStack_1b1c + fVar80;
          fVar81 = fStack_1b18 + fVar81;
          fVar82 = fStack_1b14 + fVar82;
          fVar83 = fStack_1b10 + fVar83;
          fVar84 = fStack_1b0c + fVar84;
          fVar85 = fStack_1b08 + fVar85;
          fVar86 = local_b120 + fVar86;
          local_7fc0 = CONCAT44(fVar80,fVar76);
          uStack_7fb8 = CONCAT44(fVar82,fVar81);
          uStack_7fb0 = CONCAT44(fVar84,fVar83);
          uStack_7fa8 = CONCAT44(fVar86,fVar85);
          local_1ae0 = local_b160 * (float)local_5c40;
          fStack_1adc = local_b160 * local_5c40._4_4_;
          fStack_1ad8 = local_b160 * (float)uStack_5c38;
          fStack_1ad4 = local_b160 * uStack_5c38._4_4_;
          fStack_1ad0 = local_b160 * (float)uStack_5c30;
          fStack_1acc = local_b160 * uStack_5c30._4_4_;
          fStack_1ac8 = local_b160 * (float)uStack_5c28;
          fVar76 = local_1ae0 + fVar76;
          fVar80 = fStack_1adc + fVar80;
          fVar81 = fStack_1ad8 + fVar81;
          fVar82 = fStack_1ad4 + fVar82;
          fVar83 = fStack_1ad0 + fVar83;
          fVar84 = fStack_1acc + fVar84;
          fVar85 = fStack_1ac8 + fVar85;
          fVar86 = local_b160 + fVar86;
          local_8020 = CONCAT44(fVar80,fVar76);
          uStack_8018 = CONCAT44(fVar82,fVar81);
          uStack_8010 = CONCAT44(fVar84,fVar83);
          uStack_8008 = CONCAT44(fVar86,fVar85);
          local_1aa0 = local_b1a0 * (float)local_5c00;
          fStack_1a9c = local_b1a0 * local_5c00._4_4_;
          fStack_1a98 = local_b1a0 * (float)uStack_5bf8;
          fStack_1a94 = local_b1a0 * uStack_5bf8._4_4_;
          fStack_1a90 = local_b1a0 * (float)uStack_5bf0;
          fStack_1a8c = local_b1a0 * uStack_5bf0._4_4_;
          fStack_1a88 = local_b1a0 * (float)uStack_5be8;
          fVar76 = local_1aa0 + fVar76;
          fVar80 = fStack_1a9c + fVar80;
          fVar81 = fStack_1a98 + fVar81;
          fVar82 = fStack_1a94 + fVar82;
          fVar83 = fStack_1a90 + fVar83;
          fVar84 = fStack_1a8c + fVar84;
          fVar85 = fStack_1a88 + fVar85;
          fVar86 = local_b1a0 + fVar86;
          local_8080 = CONCAT44(fVar80,fVar76);
          uStack_8078 = CONCAT44(fVar82,fVar81);
          uStack_8070 = CONCAT44(fVar84,fVar83);
          uStack_8068 = CONCAT44(fVar86,fVar85);
          local_1a60 = local_b1e0 * (float)local_5bc0;
          fStack_1a5c = local_b1e0 * local_5bc0._4_4_;
          fStack_1a58 = local_b1e0 * (float)uStack_5bb8;
          fStack_1a54 = local_b1e0 * uStack_5bb8._4_4_;
          fStack_1a50 = local_b1e0 * (float)uStack_5bb0;
          fStack_1a4c = local_b1e0 * uStack_5bb0._4_4_;
          fStack_1a48 = local_b1e0 * (float)uStack_5ba8;
          fVar76 = local_1a60 + fVar76;
          fVar80 = fStack_1a5c + fVar80;
          fVar81 = fStack_1a58 + fVar81;
          fVar82 = fStack_1a54 + fVar82;
          fVar83 = fStack_1a50 + fVar83;
          fVar84 = fStack_1a4c + fVar84;
          fVar85 = fStack_1a48 + fVar85;
          fVar86 = local_b1e0 + fVar86;
          local_80e0 = CONCAT44(fVar80,fVar76);
          uStack_80d8 = CONCAT44(fVar82,fVar81);
          uStack_80d0 = CONCAT44(fVar84,fVar83);
          uStack_80c8 = CONCAT44(fVar86,fVar85);
          local_1a20 = local_b220 * (float)local_5b80;
          fStack_1a1c = local_b220 * local_5b80._4_4_;
          fStack_1a18 = local_b220 * (float)uStack_5b78;
          fStack_1a14 = local_b220 * uStack_5b78._4_4_;
          fStack_1a10 = local_b220 * (float)uStack_5b70;
          fStack_1a0c = local_b220 * uStack_5b70._4_4_;
          fStack_1a08 = local_b220 * (float)uStack_5b68;
          fVar76 = local_1a20 + fVar76;
          fVar80 = fStack_1a1c + fVar80;
          fVar81 = fStack_1a18 + fVar81;
          fVar82 = fStack_1a14 + fVar82;
          fVar83 = fStack_1a10 + fVar83;
          fVar84 = fStack_1a0c + fVar84;
          fVar85 = fStack_1a08 + fVar85;
          fVar86 = local_b220 + fVar86;
          local_8140 = CONCAT44(fVar80,fVar76);
          uStack_8138 = CONCAT44(fVar82,fVar81);
          uStack_8130 = CONCAT44(fVar84,fVar83);
          uStack_8128 = CONCAT44(fVar86,fVar85);
          local_19e0 = local_b260 * (float)local_5b40;
          fStack_19dc = local_b260 * local_5b40._4_4_;
          fStack_19d8 = local_b260 * (float)uStack_5b38;
          fStack_19d4 = local_b260 * uStack_5b38._4_4_;
          fStack_19d0 = local_b260 * (float)uStack_5b30;
          fStack_19cc = local_b260 * uStack_5b30._4_4_;
          fStack_19c8 = local_b260 * (float)uStack_5b28;
          local_c900 = CONCAT44(fStack_19dc + fVar80,local_19e0 + fVar76);
          uStack_c8f8 = CONCAT44(fStack_19d4 + fVar82,fStack_19d8 + fVar81);
          uStack_c8f0 = CONCAT44(fStack_19cc + fVar84,fStack_19d0 + fVar83);
          uStack_c8e8 = CONCAT44(local_b260 + fVar86,fStack_19c8 + fVar85);
          local_a868 = local_c2b0;
          *(undefined8 *)local_c2b0 = local_c8e0;
          *(undefined8 *)(local_c2b0 + 2) = uStack_c8d8;
          *(undefined8 *)(local_c2b0 + 4) = uStack_c8d0;
          *(undefined8 *)(local_c2b0 + 6) = uStack_c8c8;
          local_a8a8 = local_c2b8;
          *(undefined8 *)local_c2b8 = local_c900;
          *(undefined8 *)(local_c2b8 + 2) = uStack_c8f8;
          *(undefined8 *)(local_c2b8 + 4) = uStack_c8f0;
          *(undefined8 *)(local_c2b8 + 6) = uStack_c8e8;
          local_c018 = local_c2b0 + 8;
          local_81a0 = *(undefined8 *)local_c018;
          uStack_8198 = *(undefined8 *)(local_c2b0 + 10);
          uStack_8190 = *(undefined8 *)(local_c2b0 + 0xc);
          uStack_8188 = *(undefined8 *)(local_c2b0 + 0xe);
          local_c020 = local_c2b8 + 8;
          local_8500 = *(undefined8 *)local_c020;
          uStack_84f8 = *(undefined8 *)(local_c2b8 + 10);
          uStack_84f0 = *(undefined8 *)(local_c2b8 + 0xc);
          uStack_84e8 = *(undefined8 *)(local_c2b8 + 0xe);
          local_b268 = local_c308 + 3;
          local_b2a0 = *local_b268;
          local_ca80 = CONCAT44(local_b2a0,local_b2a0);
          uStack_ca78 = CONCAT44(local_b2a0,local_b2a0);
          uStack_ca70 = CONCAT44(local_b2a0,local_b2a0);
          uStack_ca68 = CONCAT44(local_b2a0,local_b2a0);
          local_b2a8 = local_c310 + 3;
          local_b2e0 = *local_b2a8;
          local_caa0 = CONCAT44(local_b2e0,local_b2e0);
          uStack_ca98 = CONCAT44(local_b2e0,local_b2e0);
          uStack_ca90 = CONCAT44(local_b2e0,local_b2e0);
          uStack_ca88 = CONCAT44(local_b2e0,local_b2e0);
          local_b2e8 = local_c318 + 3;
          local_b320 = *local_b2e8;
          local_cac0 = CONCAT44(local_b320,local_b320);
          uStack_cab8 = CONCAT44(local_b320,local_b320);
          uStack_cab0 = CONCAT44(local_b320,local_b320);
          uStack_caa8 = CONCAT44(local_b320,local_b320);
          local_19a0 = local_b0a0 * (float)local_5f80;
          fStack_199c = local_b0a0 * local_5f80._4_4_;
          fStack_1998 = local_b0a0 * (float)uStack_5f78;
          fStack_1994 = local_b0a0 * uStack_5f78._4_4_;
          fStack_1990 = local_b0a0 * (float)uStack_5f70;
          fStack_198c = local_b0a0 * uStack_5f70._4_4_;
          fStack_1988 = local_b0a0 * (float)uStack_5f68;
          local_19c0._0_4_ = (float)local_81a0;
          local_19c0._4_4_ = (float)((ulong)local_81a0 >> 0x20);
          uStack_19b8._0_4_ = (float)uStack_8198;
          uStack_19b8._4_4_ = (float)((ulong)uStack_8198 >> 0x20);
          uStack_19b0._0_4_ = (float)uStack_8190;
          uStack_19b0._4_4_ = (float)((ulong)uStack_8190 >> 0x20);
          uStack_19a8._0_4_ = (float)uStack_8188;
          uStack_19a8._4_4_ = (float)((ulong)uStack_8188 >> 0x20);
          local_8200 = CONCAT44(fStack_199c + local_19c0._4_4_,local_19a0 + (float)local_19c0);
          uStack_81f8 = CONCAT44(fStack_1994 + uStack_19b8._4_4_,fStack_1998 + (float)uStack_19b8);
          uStack_81f0 = CONCAT44(fStack_198c + uStack_19b0._4_4_,fStack_1990 + (float)uStack_19b0);
          uStack_81e8 = CONCAT44(local_b0a0 + uStack_19a8._4_4_,fStack_1988 + (float)uStack_19a8);
          local_1960 = local_b0e0 * (float)local_5f40;
          fStack_195c = local_b0e0 * local_5f40._4_4_;
          fStack_1958 = local_b0e0 * (float)uStack_5f38;
          fStack_1954 = local_b0e0 * uStack_5f38._4_4_;
          fStack_1950 = local_b0e0 * (float)uStack_5f30;
          fStack_194c = local_b0e0 * uStack_5f30._4_4_;
          fStack_1948 = local_b0e0 * (float)uStack_5f28;
          fVar76 = local_1960 + local_19a0 + (float)local_19c0;
          fVar80 = fStack_195c + fStack_199c + local_19c0._4_4_;
          fVar81 = fStack_1958 + fStack_1998 + (float)uStack_19b8;
          fVar82 = fStack_1954 + fStack_1994 + uStack_19b8._4_4_;
          fVar83 = fStack_1950 + fStack_1990 + (float)uStack_19b0;
          fVar84 = fStack_194c + fStack_198c + uStack_19b0._4_4_;
          fVar85 = fStack_1948 + fStack_1988 + (float)uStack_19a8;
          fVar86 = local_b0e0 + local_b0a0 + uStack_19a8._4_4_;
          local_8260 = CONCAT44(fVar80,fVar76);
          uStack_8258 = CONCAT44(fVar82,fVar81);
          uStack_8250 = CONCAT44(fVar84,fVar83);
          uStack_8248 = CONCAT44(fVar86,fVar85);
          local_1920 = local_b2a0 * (float)local_5f00;
          fStack_191c = local_b2a0 * local_5f00._4_4_;
          fStack_1918 = local_b2a0 * (float)uStack_5ef8;
          fStack_1914 = local_b2a0 * uStack_5ef8._4_4_;
          fStack_1910 = local_b2a0 * (float)uStack_5ef0;
          fStack_190c = local_b2a0 * uStack_5ef0._4_4_;
          fStack_1908 = local_b2a0 * (float)uStack_5ee8;
          fVar76 = local_1920 + fVar76;
          fVar80 = fStack_191c + fVar80;
          fVar81 = fStack_1918 + fVar81;
          fVar82 = fStack_1914 + fVar82;
          fVar83 = fStack_1910 + fVar83;
          fVar84 = fStack_190c + fVar84;
          fVar85 = fStack_1908 + fVar85;
          fVar86 = local_b2a0 + fVar86;
          local_82c0 = CONCAT44(fVar80,fVar76);
          uStack_82b8 = CONCAT44(fVar82,fVar81);
          uStack_82b0 = CONCAT44(fVar84,fVar83);
          uStack_82a8 = CONCAT44(fVar86,fVar85);
          local_18e0 = local_b160 * (float)local_5ec0;
          fStack_18dc = local_b160 * local_5ec0._4_4_;
          fStack_18d8 = local_b160 * (float)uStack_5eb8;
          fStack_18d4 = local_b160 * uStack_5eb8._4_4_;
          fStack_18d0 = local_b160 * (float)uStack_5eb0;
          fStack_18cc = local_b160 * uStack_5eb0._4_4_;
          fStack_18c8 = local_b160 * (float)uStack_5ea8;
          fVar76 = local_18e0 + fVar76;
          fVar80 = fStack_18dc + fVar80;
          fVar81 = fStack_18d8 + fVar81;
          fVar82 = fStack_18d4 + fVar82;
          fVar83 = fStack_18d0 + fVar83;
          fVar84 = fStack_18cc + fVar84;
          fVar85 = fStack_18c8 + fVar85;
          fVar86 = local_b160 + fVar86;
          local_8320 = CONCAT44(fVar80,fVar76);
          uStack_8318 = CONCAT44(fVar82,fVar81);
          uStack_8310 = CONCAT44(fVar84,fVar83);
          uStack_8308 = CONCAT44(fVar86,fVar85);
          local_18a0 = local_b1a0 * (float)local_5e80;
          fStack_189c = local_b1a0 * local_5e80._4_4_;
          fStack_1898 = local_b1a0 * (float)uStack_5e78;
          fStack_1894 = local_b1a0 * uStack_5e78._4_4_;
          fStack_1890 = local_b1a0 * (float)uStack_5e70;
          fStack_188c = local_b1a0 * uStack_5e70._4_4_;
          fStack_1888 = local_b1a0 * (float)uStack_5e68;
          fVar76 = local_18a0 + fVar76;
          fVar80 = fStack_189c + fVar80;
          fVar81 = fStack_1898 + fVar81;
          fVar82 = fStack_1894 + fVar82;
          fVar83 = fStack_1890 + fVar83;
          fVar84 = fStack_188c + fVar84;
          fVar85 = fStack_1888 + fVar85;
          fVar86 = local_b1a0 + fVar86;
          local_8380 = CONCAT44(fVar80,fVar76);
          uStack_8378 = CONCAT44(fVar82,fVar81);
          uStack_8370 = CONCAT44(fVar84,fVar83);
          uStack_8368 = CONCAT44(fVar86,fVar85);
          local_1860 = local_b2e0 * (float)local_5e40;
          fStack_185c = local_b2e0 * local_5e40._4_4_;
          fStack_1858 = local_b2e0 * (float)uStack_5e38;
          fStack_1854 = local_b2e0 * uStack_5e38._4_4_;
          fStack_1850 = local_b2e0 * (float)uStack_5e30;
          fStack_184c = local_b2e0 * uStack_5e30._4_4_;
          fStack_1848 = local_b2e0 * (float)uStack_5e28;
          fVar76 = local_1860 + fVar76;
          fVar80 = fStack_185c + fVar80;
          fVar81 = fStack_1858 + fVar81;
          fVar82 = fStack_1854 + fVar82;
          fVar83 = fStack_1850 + fVar83;
          fVar84 = fStack_184c + fVar84;
          fVar85 = fStack_1848 + fVar85;
          fVar86 = local_b2e0 + fVar86;
          local_83e0 = CONCAT44(fVar80,fVar76);
          uStack_83d8 = CONCAT44(fVar82,fVar81);
          uStack_83d0 = CONCAT44(fVar84,fVar83);
          uStack_83c8 = CONCAT44(fVar86,fVar85);
          local_1820 = local_b220 * (float)local_5e00;
          fStack_181c = local_b220 * local_5e00._4_4_;
          fStack_1818 = local_b220 * (float)uStack_5df8;
          fStack_1814 = local_b220 * uStack_5df8._4_4_;
          fStack_1810 = local_b220 * (float)uStack_5df0;
          fStack_180c = local_b220 * uStack_5df0._4_4_;
          fStack_1808 = local_b220 * (float)uStack_5de8;
          fVar76 = local_1820 + fVar76;
          fVar80 = fStack_181c + fVar80;
          fVar81 = fStack_1818 + fVar81;
          fVar82 = fStack_1814 + fVar82;
          fVar83 = fStack_1810 + fVar83;
          fVar84 = fStack_180c + fVar84;
          fVar85 = fStack_1808 + fVar85;
          fVar86 = local_b220 + fVar86;
          local_8440 = CONCAT44(fVar80,fVar76);
          uStack_8438 = CONCAT44(fVar82,fVar81);
          uStack_8430 = CONCAT44(fVar84,fVar83);
          uStack_8428 = CONCAT44(fVar86,fVar85);
          local_17e0 = local_b260 * (float)local_5dc0;
          fStack_17dc = local_b260 * local_5dc0._4_4_;
          fStack_17d8 = local_b260 * (float)uStack_5db8;
          fStack_17d4 = local_b260 * uStack_5db8._4_4_;
          fStack_17d0 = local_b260 * (float)uStack_5db0;
          fStack_17cc = local_b260 * uStack_5db0._4_4_;
          fStack_17c8 = local_b260 * (float)uStack_5da8;
          fVar76 = local_17e0 + fVar76;
          fVar80 = fStack_17dc + fVar80;
          fVar81 = fStack_17d8 + fVar81;
          fVar82 = fStack_17d4 + fVar82;
          fVar83 = fStack_17d0 + fVar83;
          fVar84 = fStack_17cc + fVar84;
          fVar85 = fStack_17c8 + fVar85;
          fVar86 = local_b260 + fVar86;
          local_84a0 = CONCAT44(fVar80,fVar76);
          uStack_8498 = CONCAT44(fVar82,fVar81);
          uStack_8490 = CONCAT44(fVar84,fVar83);
          uStack_8488 = CONCAT44(fVar86,fVar85);
          local_17a0 = local_b320 * (float)local_5d80;
          fStack_179c = local_b320 * local_5d80._4_4_;
          fStack_1798 = local_b320 * (float)uStack_5d78;
          fStack_1794 = local_b320 * uStack_5d78._4_4_;
          fStack_1790 = local_b320 * (float)uStack_5d70;
          fStack_178c = local_b320 * uStack_5d70._4_4_;
          fStack_1788 = local_b320 * (float)uStack_5d68;
          local_ca40 = CONCAT44(fStack_179c + fVar80,local_17a0 + fVar76);
          uStack_ca38 = CONCAT44(fStack_1794 + fVar82,fStack_1798 + fVar81);
          uStack_ca30 = CONCAT44(fStack_178c + fVar84,fStack_1790 + fVar83);
          uStack_ca28 = CONCAT44(local_b320 + fVar86,fStack_1788 + fVar85);
          local_1760 = local_b0a0 * (float)local_5d40;
          fStack_175c = local_b0a0 * local_5d40._4_4_;
          fStack_1758 = local_b0a0 * (float)uStack_5d38;
          fStack_1754 = local_b0a0 * uStack_5d38._4_4_;
          fStack_1750 = local_b0a0 * (float)uStack_5d30;
          fStack_174c = local_b0a0 * uStack_5d30._4_4_;
          fStack_1748 = local_b0a0 * (float)uStack_5d28;
          local_1780._0_4_ = (float)local_8500;
          local_1780._4_4_ = (float)((ulong)local_8500 >> 0x20);
          uStack_1778._0_4_ = (float)uStack_84f8;
          uStack_1778._4_4_ = (float)((ulong)uStack_84f8 >> 0x20);
          uStack_1770._0_4_ = (float)uStack_84f0;
          uStack_1770._4_4_ = (float)((ulong)uStack_84f0 >> 0x20);
          uStack_1768._0_4_ = (float)uStack_84e8;
          uStack_1768._4_4_ = (float)((ulong)uStack_84e8 >> 0x20);
          local_8560 = CONCAT44(fStack_175c + local_1780._4_4_,local_1760 + (float)local_1780);
          uStack_8558 = CONCAT44(fStack_1754 + uStack_1778._4_4_,fStack_1758 + (float)uStack_1778);
          uStack_8550 = CONCAT44(fStack_174c + uStack_1770._4_4_,fStack_1750 + (float)uStack_1770);
          uStack_8548 = CONCAT44(local_b0a0 + uStack_1768._4_4_,fStack_1748 + (float)uStack_1768);
          local_1720 = local_b0e0 * (float)local_5d00;
          fStack_171c = local_b0e0 * local_5d00._4_4_;
          fStack_1718 = local_b0e0 * (float)uStack_5cf8;
          fStack_1714 = local_b0e0 * uStack_5cf8._4_4_;
          fStack_1710 = local_b0e0 * (float)uStack_5cf0;
          fStack_170c = local_b0e0 * uStack_5cf0._4_4_;
          fStack_1708 = local_b0e0 * (float)uStack_5ce8;
          fVar76 = local_1720 + local_1760 + (float)local_1780;
          fVar80 = fStack_171c + fStack_175c + local_1780._4_4_;
          fVar81 = fStack_1718 + fStack_1758 + (float)uStack_1778;
          fVar82 = fStack_1714 + fStack_1754 + uStack_1778._4_4_;
          fVar83 = fStack_1710 + fStack_1750 + (float)uStack_1770;
          fVar84 = fStack_170c + fStack_174c + uStack_1770._4_4_;
          fVar85 = fStack_1708 + fStack_1748 + (float)uStack_1768;
          fVar86 = local_b0e0 + local_b0a0 + uStack_1768._4_4_;
          local_85c0 = CONCAT44(fVar80,fVar76);
          uStack_85b8 = CONCAT44(fVar82,fVar81);
          uStack_85b0 = CONCAT44(fVar84,fVar83);
          uStack_85a8 = CONCAT44(fVar86,fVar85);
          local_16e0 = local_b2a0 * (float)local_5cc0;
          fStack_16dc = local_b2a0 * local_5cc0._4_4_;
          fStack_16d8 = local_b2a0 * (float)uStack_5cb8;
          fStack_16d4 = local_b2a0 * uStack_5cb8._4_4_;
          fStack_16d0 = local_b2a0 * (float)uStack_5cb0;
          fStack_16cc = local_b2a0 * uStack_5cb0._4_4_;
          fStack_16c8 = local_b2a0 * (float)uStack_5ca8;
          fVar76 = local_16e0 + fVar76;
          fVar80 = fStack_16dc + fVar80;
          fVar81 = fStack_16d8 + fVar81;
          fVar82 = fStack_16d4 + fVar82;
          fVar83 = fStack_16d0 + fVar83;
          fVar84 = fStack_16cc + fVar84;
          fVar85 = fStack_16c8 + fVar85;
          fVar86 = local_b2a0 + fVar86;
          local_8620 = CONCAT44(fVar80,fVar76);
          uStack_8618 = CONCAT44(fVar82,fVar81);
          uStack_8610 = CONCAT44(fVar84,fVar83);
          uStack_8608 = CONCAT44(fVar86,fVar85);
          local_16a0 = local_b160 * (float)local_5c80;
          fStack_169c = local_b160 * local_5c80._4_4_;
          fStack_1698 = local_b160 * (float)uStack_5c78;
          fStack_1694 = local_b160 * uStack_5c78._4_4_;
          fStack_1690 = local_b160 * (float)uStack_5c70;
          fStack_168c = local_b160 * uStack_5c70._4_4_;
          fStack_1688 = local_b160 * (float)uStack_5c68;
          fVar76 = local_16a0 + fVar76;
          fVar80 = fStack_169c + fVar80;
          fVar81 = fStack_1698 + fVar81;
          fVar82 = fStack_1694 + fVar82;
          fVar83 = fStack_1690 + fVar83;
          fVar84 = fStack_168c + fVar84;
          fVar85 = fStack_1688 + fVar85;
          fVar86 = local_b160 + fVar86;
          local_8680 = CONCAT44(fVar80,fVar76);
          uStack_8678 = CONCAT44(fVar82,fVar81);
          uStack_8670 = CONCAT44(fVar84,fVar83);
          uStack_8668 = CONCAT44(fVar86,fVar85);
          local_1660 = local_b1a0 * (float)local_5c40;
          fStack_165c = local_b1a0 * local_5c40._4_4_;
          fStack_1658 = local_b1a0 * (float)uStack_5c38;
          fStack_1654 = local_b1a0 * uStack_5c38._4_4_;
          fStack_1650 = local_b1a0 * (float)uStack_5c30;
          fStack_164c = local_b1a0 * uStack_5c30._4_4_;
          fStack_1648 = local_b1a0 * (float)uStack_5c28;
          fVar76 = local_1660 + fVar76;
          fVar80 = fStack_165c + fVar80;
          fVar81 = fStack_1658 + fVar81;
          fVar82 = fStack_1654 + fVar82;
          fVar83 = fStack_1650 + fVar83;
          fVar84 = fStack_164c + fVar84;
          fVar85 = fStack_1648 + fVar85;
          fVar86 = local_b1a0 + fVar86;
          local_86e0 = CONCAT44(fVar80,fVar76);
          uStack_86d8 = CONCAT44(fVar82,fVar81);
          uStack_86d0 = CONCAT44(fVar84,fVar83);
          uStack_86c8 = CONCAT44(fVar86,fVar85);
          local_1620 = local_b2e0 * (float)local_5c00;
          fStack_161c = local_b2e0 * local_5c00._4_4_;
          fStack_1618 = local_b2e0 * (float)uStack_5bf8;
          fStack_1614 = local_b2e0 * uStack_5bf8._4_4_;
          fStack_1610 = local_b2e0 * (float)uStack_5bf0;
          fStack_160c = local_b2e0 * uStack_5bf0._4_4_;
          fStack_1608 = local_b2e0 * (float)uStack_5be8;
          fVar76 = local_1620 + fVar76;
          fVar80 = fStack_161c + fVar80;
          fVar81 = fStack_1618 + fVar81;
          fVar82 = fStack_1614 + fVar82;
          fVar83 = fStack_1610 + fVar83;
          fVar84 = fStack_160c + fVar84;
          fVar85 = fStack_1608 + fVar85;
          fVar86 = local_b2e0 + fVar86;
          local_8740 = CONCAT44(fVar80,fVar76);
          uStack_8738 = CONCAT44(fVar82,fVar81);
          uStack_8730 = CONCAT44(fVar84,fVar83);
          uStack_8728 = CONCAT44(fVar86,fVar85);
          local_15e0 = local_b220 * (float)local_5bc0;
          fStack_15dc = local_b220 * local_5bc0._4_4_;
          fStack_15d8 = local_b220 * (float)uStack_5bb8;
          fStack_15d4 = local_b220 * uStack_5bb8._4_4_;
          fStack_15d0 = local_b220 * (float)uStack_5bb0;
          fStack_15cc = local_b220 * uStack_5bb0._4_4_;
          fStack_15c8 = local_b220 * (float)uStack_5ba8;
          fVar76 = local_15e0 + fVar76;
          fVar80 = fStack_15dc + fVar80;
          fVar81 = fStack_15d8 + fVar81;
          fVar82 = fStack_15d4 + fVar82;
          fVar83 = fStack_15d0 + fVar83;
          fVar84 = fStack_15cc + fVar84;
          fVar85 = fStack_15c8 + fVar85;
          fVar86 = local_b220 + fVar86;
          local_87a0 = CONCAT44(fVar80,fVar76);
          uStack_8798 = CONCAT44(fVar82,fVar81);
          uStack_8790 = CONCAT44(fVar84,fVar83);
          uStack_8788 = CONCAT44(fVar86,fVar85);
          local_15a0 = local_b260 * (float)local_5b80;
          fStack_159c = local_b260 * local_5b80._4_4_;
          fStack_1598 = local_b260 * (float)uStack_5b78;
          fStack_1594 = local_b260 * uStack_5b78._4_4_;
          fStack_1590 = local_b260 * (float)uStack_5b70;
          fStack_158c = local_b260 * uStack_5b70._4_4_;
          fStack_1588 = local_b260 * (float)uStack_5b68;
          fVar76 = local_15a0 + fVar76;
          fVar80 = fStack_159c + fVar80;
          fVar81 = fStack_1598 + fVar81;
          fVar82 = fStack_1594 + fVar82;
          fVar83 = fStack_1590 + fVar83;
          fVar84 = fStack_158c + fVar84;
          fVar85 = fStack_1588 + fVar85;
          fVar86 = local_b260 + fVar86;
          local_8800 = CONCAT44(fVar80,fVar76);
          uStack_87f8 = CONCAT44(fVar82,fVar81);
          uStack_87f0 = CONCAT44(fVar84,fVar83);
          uStack_87e8 = CONCAT44(fVar86,fVar85);
          local_1560 = local_b320 * (float)local_5b40;
          fStack_155c = local_b320 * local_5b40._4_4_;
          fStack_1558 = local_b320 * (float)uStack_5b38;
          fStack_1554 = local_b320 * uStack_5b38._4_4_;
          fStack_1550 = local_b320 * (float)uStack_5b30;
          fStack_154c = local_b320 * uStack_5b30._4_4_;
          fStack_1548 = local_b320 * (float)uStack_5b28;
          local_ca60 = CONCAT44(fStack_155c + fVar80,local_1560 + fVar76);
          uStack_ca58 = CONCAT44(fStack_1554 + fVar82,fStack_1558 + fVar81);
          uStack_ca50 = CONCAT44(fStack_154c + fVar84,fStack_1550 + fVar83);
          uStack_ca48 = CONCAT44(local_b320 + fVar86,fStack_1548 + fVar85);
          local_a8e8 = local_c2b0 + 8;
          *(undefined8 *)local_a8e8 = local_ca40;
          *(undefined8 *)(local_c2b0 + 10) = uStack_ca38;
          *(undefined8 *)(local_c2b0 + 0xc) = uStack_ca30;
          *(undefined8 *)(local_c2b0 + 0xe) = uStack_ca28;
          local_a928 = local_c2b8 + 8;
          *(undefined8 *)local_a928 = local_ca60;
          *(undefined8 *)(local_c2b8 + 10) = uStack_ca58;
          *(undefined8 *)(local_c2b8 + 0xc) = uStack_ca50;
          *(undefined8 *)(local_c2b8 + 0xe) = uStack_ca48;
          local_c308 = local_c308 + 2;
          local_c310 = local_c310 + 2;
          local_c318 = local_c318 + 2;
          local_c2b0 = local_c2b0 + 0x10;
          local_c2b8 = local_c2b8 + 0x10;
          fStack_b31c = local_b320;
          fStack_b318 = local_b320;
          fStack_b314 = local_b320;
          fStack_b310 = local_b320;
          fStack_b30c = local_b320;
          fStack_b308 = local_b320;
          fStack_b304 = local_b320;
          local_b2ec = local_b320;
          fStack_b2dc = local_b2e0;
          fStack_b2d8 = local_b2e0;
          fStack_b2d4 = local_b2e0;
          fStack_b2d0 = local_b2e0;
          fStack_b2cc = local_b2e0;
          fStack_b2c8 = local_b2e0;
          fStack_b2c4 = local_b2e0;
          local_b2ac = local_b2e0;
          fStack_b29c = local_b2a0;
          fStack_b298 = local_b2a0;
          fStack_b294 = local_b2a0;
          fStack_b290 = local_b2a0;
          fStack_b28c = local_b2a0;
          fStack_b288 = local_b2a0;
          fStack_b284 = local_b2a0;
          local_b26c = local_b2a0;
          fStack_b25c = local_b260;
          fStack_b258 = local_b260;
          fStack_b254 = local_b260;
          fStack_b250 = local_b260;
          fStack_b24c = local_b260;
          fStack_b248 = local_b260;
          fStack_b244 = local_b260;
          local_b22c = local_b260;
          fStack_b21c = local_b220;
          fStack_b218 = local_b220;
          fStack_b214 = local_b220;
          fStack_b210 = local_b220;
          fStack_b20c = local_b220;
          fStack_b208 = local_b220;
          fStack_b204 = local_b220;
          local_b1ec = local_b220;
          fStack_b1dc = local_b1e0;
          fStack_b1d8 = local_b1e0;
          fStack_b1d4 = local_b1e0;
          fStack_b1d0 = local_b1e0;
          fStack_b1cc = local_b1e0;
          fStack_b1c8 = local_b1e0;
          fStack_b1c4 = local_b1e0;
          local_b1ac = local_b1e0;
          fStack_b19c = local_b1a0;
          fStack_b198 = local_b1a0;
          fStack_b194 = local_b1a0;
          fStack_b190 = local_b1a0;
          fStack_b18c = local_b1a0;
          fStack_b188 = local_b1a0;
          fStack_b184 = local_b1a0;
          local_b16c = local_b1a0;
          fStack_b15c = local_b160;
          fStack_b158 = local_b160;
          fStack_b154 = local_b160;
          fStack_b150 = local_b160;
          fStack_b14c = local_b160;
          fStack_b148 = local_b160;
          fStack_b144 = local_b160;
          local_b12c = local_b160;
          fStack_b11c = local_b120;
          fStack_b118 = local_b120;
          fStack_b114 = local_b120;
          fStack_b110 = local_b120;
          fStack_b10c = local_b120;
          fStack_b108 = local_b120;
          fStack_b104 = local_b120;
          local_b0ec = local_b120;
          fStack_b0dc = local_b0e0;
          fStack_b0d8 = local_b0e0;
          fStack_b0d4 = local_b0e0;
          fStack_b0d0 = local_b0e0;
          fStack_b0cc = local_b0e0;
          fStack_b0c8 = local_b0e0;
          fStack_b0c4 = local_b0e0;
          local_b0ac = local_b0e0;
          fStack_b09c = local_b0a0;
          fStack_b098 = local_b0a0;
          fStack_b094 = local_b0a0;
          fStack_b090 = local_b0a0;
          fStack_b08c = local_b0a0;
          fStack_b088 = local_b0a0;
          fStack_b084 = local_b0a0;
          local_b06c = local_b0a0;
          fStack_b05c = local_b060;
          fStack_b058 = local_b060;
          fStack_b054 = local_b060;
          fStack_b050 = local_b060;
          fStack_b04c = local_b060;
          fStack_b048 = local_b060;
          fStack_b044 = local_b060;
          local_b02c = local_b060;
          local_a960 = local_ca60;
          uStack_a958 = uStack_ca58;
          uStack_a950 = uStack_ca50;
          uStack_a948 = uStack_ca48;
          local_a920 = local_ca40;
          uStack_a918 = uStack_ca38;
          uStack_a910 = uStack_ca30;
          uStack_a908 = uStack_ca28;
          local_a8e0 = local_c900;
          uStack_a8d8 = uStack_c8f8;
          uStack_a8d0 = uStack_c8f0;
          uStack_a8c8 = uStack_c8e8;
          local_a8a0 = local_c8e0;
          uStack_a898 = uStack_c8d8;
          uStack_a890 = uStack_c8d0;
          uStack_a888 = uStack_c8c8;
          local_87e0 = local_c560;
          uStack_87d8 = uStack_c558;
          uStack_87d0 = uStack_c550;
          uStack_87c8 = uStack_c548;
          local_87c0 = local_cac0;
          uStack_87b8 = uStack_cab8;
          uStack_87b0 = uStack_cab0;
          uStack_87a8 = uStack_caa8;
          local_8780 = local_c540;
          uStack_8778 = uStack_c538;
          uStack_8770 = uStack_c530;
          uStack_8768 = uStack_c528;
          local_8760 = local_ca20;
          uStack_8758 = uStack_ca18;
          uStack_8750 = uStack_ca10;
          uStack_8748 = uStack_ca08;
          local_8720 = local_c520;
          uStack_8718 = uStack_c518;
          uStack_8710 = uStack_c510;
          uStack_8708 = uStack_c508;
          local_8700 = local_ca00;
          uStack_86f8 = uStack_c9f8;
          uStack_86f0 = uStack_c9f0;
          uStack_86e8 = uStack_c9e8;
          local_86c0 = local_c500;
          uStack_86b8 = uStack_c4f8;
          uStack_86b0 = uStack_c4f0;
          uStack_86a8 = uStack_c4e8;
          local_86a0 = local_caa0;
          uStack_8698 = uStack_ca98;
          uStack_8690 = uStack_ca90;
          uStack_8688 = uStack_ca88;
          local_8660 = local_c4e0;
          uStack_8658 = uStack_c4d8;
          uStack_8650 = uStack_c4d0;
          uStack_8648 = uStack_c4c8;
          local_8640 = local_c9c0;
          uStack_8638 = uStack_c9b8;
          uStack_8630 = uStack_c9b0;
          uStack_8628 = uStack_c9a8;
          local_8600 = local_c4c0;
          uStack_85f8 = uStack_c4b8;
          uStack_85f0 = uStack_c4b0;
          uStack_85e8 = uStack_c4a8;
          local_85e0 = local_c9a0;
          uStack_85d8 = uStack_c998;
          uStack_85d0 = uStack_c990;
          uStack_85c8 = uStack_c988;
          local_85a0 = local_c4a0;
          uStack_8598 = uStack_c498;
          uStack_8590 = uStack_c490;
          uStack_8588 = uStack_c488;
          local_8580 = local_ca80;
          uStack_8578 = uStack_ca78;
          uStack_8570 = uStack_ca70;
          uStack_8568 = uStack_ca68;
          local_8540 = local_c480;
          uStack_8538 = uStack_c478;
          uStack_8530 = uStack_c470;
          uStack_8528 = uStack_c468;
          local_8520 = local_c960;
          uStack_8518 = uStack_c958;
          uStack_8510 = uStack_c950;
          uStack_8508 = uStack_c948;
          local_84e0 = local_c460;
          uStack_84d8 = uStack_c458;
          uStack_84d0 = uStack_c450;
          uStack_84c8 = uStack_c448;
          local_84c0 = local_c940;
          uStack_84b8 = uStack_c938;
          uStack_84b0 = uStack_c930;
          uStack_84a8 = uStack_c928;
          local_8480 = local_c440;
          uStack_8478 = uStack_c438;
          uStack_8470 = uStack_c430;
          uStack_8468 = uStack_c428;
          local_8460 = local_cac0;
          uStack_8458 = uStack_cab8;
          uStack_8450 = uStack_cab0;
          uStack_8448 = uStack_caa8;
          local_8420 = local_c420;
          uStack_8418 = uStack_c418;
          uStack_8410 = uStack_c410;
          uStack_8408 = uStack_c408;
          local_8400 = local_ca20;
          uStack_83f8 = uStack_ca18;
          uStack_83f0 = uStack_ca10;
          uStack_83e8 = uStack_ca08;
          local_83c0 = local_c400;
          uStack_83b8 = uStack_c3f8;
          uStack_83b0 = uStack_c3f0;
          uStack_83a8 = uStack_c3e8;
          local_83a0 = local_ca00;
          uStack_8398 = uStack_c9f8;
          uStack_8390 = uStack_c9f0;
          uStack_8388 = uStack_c9e8;
          local_8360 = local_c3e0;
          uStack_8358 = uStack_c3d8;
          uStack_8350 = uStack_c3d0;
          uStack_8348 = uStack_c3c8;
          local_8340 = local_caa0;
          uStack_8338 = uStack_ca98;
          uStack_8330 = uStack_ca90;
          uStack_8328 = uStack_ca88;
          local_8300 = local_c3c0;
          uStack_82f8 = uStack_c3b8;
          uStack_82f0 = uStack_c3b0;
          uStack_82e8 = uStack_c3a8;
          local_82e0 = local_c9c0;
          uStack_82d8 = uStack_c9b8;
          uStack_82d0 = uStack_c9b0;
          uStack_82c8 = uStack_c9a8;
          local_82a0 = local_c3a0;
          uStack_8298 = uStack_c398;
          uStack_8290 = uStack_c390;
          uStack_8288 = uStack_c388;
          local_8280 = local_c9a0;
          uStack_8278 = uStack_c998;
          uStack_8270 = uStack_c990;
          uStack_8268 = uStack_c988;
          local_8240 = local_c380;
          uStack_8238 = uStack_c378;
          uStack_8230 = uStack_c370;
          uStack_8228 = uStack_c368;
          local_8220 = local_ca80;
          uStack_8218 = uStack_ca78;
          uStack_8210 = uStack_ca70;
          uStack_8208 = uStack_ca68;
          local_81e0 = local_c360;
          uStack_81d8 = uStack_c358;
          uStack_81d0 = uStack_c350;
          uStack_81c8 = uStack_c348;
          local_81c0 = local_c960;
          uStack_81b8 = uStack_c958;
          uStack_81b0 = uStack_c950;
          uStack_81a8 = uStack_c948;
          local_8180 = local_c340;
          uStack_8178 = uStack_c338;
          uStack_8170 = uStack_c330;
          uStack_8168 = uStack_c328;
          local_8160 = local_c940;
          uStack_8158 = uStack_c938;
          uStack_8150 = uStack_c930;
          uStack_8148 = uStack_c928;
          local_8120 = local_c560;
          uStack_8118 = uStack_c558;
          uStack_8110 = uStack_c550;
          uStack_8108 = uStack_c548;
          local_8100 = local_ca20;
          uStack_80f8 = uStack_ca18;
          uStack_80f0 = uStack_ca10;
          uStack_80e8 = uStack_ca08;
          local_80c0 = local_c540;
          uStack_80b8 = uStack_c538;
          uStack_80b0 = uStack_c530;
          uStack_80a8 = uStack_c528;
          local_80a0 = local_ca00;
          uStack_8098 = uStack_c9f8;
          uStack_8090 = uStack_c9f0;
          uStack_8088 = uStack_c9e8;
          local_8060 = local_c520;
          uStack_8058 = uStack_c518;
          uStack_8050 = uStack_c510;
          uStack_8048 = uStack_c508;
          local_8040 = local_c9e0;
          uStack_8038 = uStack_c9d8;
          uStack_8030 = uStack_c9d0;
          uStack_8028 = uStack_c9c8;
          local_8000 = local_c500;
          uStack_7ff8 = uStack_c4f8;
          uStack_7ff0 = uStack_c4f0;
          uStack_7fe8 = uStack_c4e8;
          local_7fe0 = local_c9c0;
          uStack_7fd8 = uStack_c9b8;
          uStack_7fd0 = uStack_c9b0;
          uStack_7fc8 = uStack_c9a8;
          local_7fa0 = local_c4e0;
          uStack_7f98 = uStack_c4d8;
          uStack_7f90 = uStack_c4d0;
          uStack_7f88 = uStack_c4c8;
          local_7f80 = local_c9a0;
          uStack_7f78 = uStack_c998;
          uStack_7f70 = uStack_c990;
          uStack_7f68 = uStack_c988;
          local_7f40 = local_c4c0;
          uStack_7f38 = uStack_c4b8;
          uStack_7f30 = uStack_c4b0;
          uStack_7f28 = uStack_c4a8;
          local_7f20 = local_c980;
          uStack_7f18 = uStack_c978;
          uStack_7f10 = uStack_c970;
          uStack_7f08 = uStack_c968;
          local_7ee0 = local_c4a0;
          uStack_7ed8 = uStack_c498;
          uStack_7ed0 = uStack_c490;
          uStack_7ec8 = uStack_c488;
          local_7ec0 = local_c960;
          uStack_7eb8 = uStack_c958;
          uStack_7eb0 = uStack_c950;
          uStack_7ea8 = uStack_c948;
          local_7e80 = local_c480;
          uStack_7e78 = uStack_c478;
          uStack_7e70 = uStack_c470;
          uStack_7e68 = uStack_c468;
          local_7e60 = local_c940;
          uStack_7e58 = uStack_c938;
          uStack_7e50 = uStack_c930;
          uStack_7e48 = uStack_c928;
          local_7e20 = local_c460;
          uStack_7e18 = uStack_c458;
          uStack_7e10 = uStack_c450;
          uStack_7e08 = uStack_c448;
          local_7e00 = local_c920;
          uStack_7df8 = uStack_c918;
          uStack_7df0 = uStack_c910;
          uStack_7de8 = uStack_c908;
          local_7dc0 = local_c440;
          uStack_7db8 = uStack_c438;
          uStack_7db0 = uStack_c430;
          uStack_7da8 = uStack_c428;
          local_7da0 = local_ca20;
          uStack_7d98 = uStack_ca18;
          uStack_7d90 = uStack_ca10;
          uStack_7d88 = uStack_ca08;
          local_7d60 = local_c420;
          uStack_7d58 = uStack_c418;
          uStack_7d50 = uStack_c410;
          uStack_7d48 = uStack_c408;
          local_7d40 = local_ca00;
          uStack_7d38 = uStack_c9f8;
          uStack_7d30 = uStack_c9f0;
          uStack_7d28 = uStack_c9e8;
          local_7d00 = local_c400;
          uStack_7cf8 = uStack_c3f8;
          uStack_7cf0 = uStack_c3f0;
          uStack_7ce8 = uStack_c3e8;
          local_7ce0 = local_c9e0;
          uStack_7cd8 = uStack_c9d8;
          uStack_7cd0 = uStack_c9d0;
          uStack_7cc8 = uStack_c9c8;
          local_7ca0 = local_c3e0;
          uStack_7c98 = uStack_c3d8;
          uStack_7c90 = uStack_c3d0;
          uStack_7c88 = uStack_c3c8;
          local_7c80 = local_c9c0;
          uStack_7c78 = uStack_c9b8;
          uStack_7c70 = uStack_c9b0;
          uStack_7c68 = uStack_c9a8;
          local_7c40 = local_c3c0;
          uStack_7c38 = uStack_c3b8;
          uStack_7c30 = uStack_c3b0;
          uStack_7c28 = uStack_c3a8;
          local_7c20 = local_c9a0;
          uStack_7c18 = uStack_c998;
          uStack_7c10 = uStack_c990;
          uStack_7c08 = uStack_c988;
          local_7be0 = local_c3a0;
          uStack_7bd8 = uStack_c398;
          uStack_7bd0 = uStack_c390;
          uStack_7bc8 = uStack_c388;
          local_7bc0 = local_c980;
          uStack_7bb8 = uStack_c978;
          uStack_7bb0 = uStack_c970;
          uStack_7ba8 = uStack_c968;
          local_7b80 = local_c380;
          uStack_7b78 = uStack_c378;
          uStack_7b70 = uStack_c370;
          uStack_7b68 = uStack_c368;
          local_7b60 = local_c960;
          uStack_7b58 = uStack_c958;
          uStack_7b50 = uStack_c950;
          uStack_7b48 = uStack_c948;
          local_7b20 = local_c360;
          uStack_7b18 = uStack_c358;
          uStack_7b10 = uStack_c350;
          uStack_7b08 = uStack_c348;
          local_7b00 = local_c940;
          uStack_7af8 = uStack_c938;
          uStack_7af0 = uStack_c930;
          uStack_7ae8 = uStack_c928;
          local_7ac0 = local_c340;
          uStack_7ab8 = uStack_c338;
          uStack_7ab0 = uStack_c330;
          uStack_7aa8 = uStack_c328;
          local_7aa0 = local_c920;
          uStack_7a98 = uStack_c918;
          uStack_7a90 = uStack_c910;
          uStack_7a88 = uStack_c908;
          local_4d80 = local_c340;
          uStack_4d78 = uStack_c338;
          uStack_4d70 = uStack_c330;
          uStack_4d68 = uStack_c328;
          local_4d60 = local_b060;
          fStack_4d5c = local_b060;
          fStack_4d58 = local_b060;
          fStack_4d54 = local_b060;
          fStack_4d50 = local_b060;
          fStack_4d4c = local_b060;
          fStack_4d48 = local_b060;
          fStack_4d44 = local_b060;
          local_4d40 = local_c360;
          uStack_4d38 = uStack_c358;
          uStack_4d30 = uStack_c350;
          uStack_4d28 = uStack_c348;
          local_4d20 = local_b0a0;
          fStack_4d1c = local_b0a0;
          fStack_4d18 = local_b0a0;
          fStack_4d14 = local_b0a0;
          fStack_4d10 = local_b0a0;
          fStack_4d0c = local_b0a0;
          fStack_4d08 = local_b0a0;
          fStack_4d04 = local_b0a0;
          local_4d00 = local_c380;
          uStack_4cf8 = uStack_c378;
          uStack_4cf0 = uStack_c370;
          uStack_4ce8 = uStack_c368;
          local_4ce0 = local_b0e0;
          fStack_4cdc = local_b0e0;
          fStack_4cd8 = local_b0e0;
          fStack_4cd4 = local_b0e0;
          fStack_4cd0 = local_b0e0;
          fStack_4ccc = local_b0e0;
          fStack_4cc8 = local_b0e0;
          fStack_4cc4 = local_b0e0;
          local_4cc0 = local_c3a0;
          uStack_4cb8 = uStack_c398;
          uStack_4cb0 = uStack_c390;
          uStack_4ca8 = uStack_c388;
          local_4ca0 = local_b120;
          fStack_4c9c = local_b120;
          fStack_4c98 = local_b120;
          fStack_4c94 = local_b120;
          fStack_4c90 = local_b120;
          fStack_4c8c = local_b120;
          fStack_4c88 = local_b120;
          fStack_4c84 = local_b120;
          local_4c80 = local_c3c0;
          uStack_4c78 = uStack_c3b8;
          uStack_4c70 = uStack_c3b0;
          uStack_4c68 = uStack_c3a8;
          local_4c60 = local_b160;
          fStack_4c5c = local_b160;
          fStack_4c58 = local_b160;
          fStack_4c54 = local_b160;
          fStack_4c50 = local_b160;
          fStack_4c4c = local_b160;
          fStack_4c48 = local_b160;
          fStack_4c44 = local_b160;
          local_4c40 = local_c3e0;
          uStack_4c38 = uStack_c3d8;
          uStack_4c30 = uStack_c3d0;
          uStack_4c28 = uStack_c3c8;
          local_4c20 = local_b1a0;
          fStack_4c1c = local_b1a0;
          fStack_4c18 = local_b1a0;
          fStack_4c14 = local_b1a0;
          fStack_4c10 = local_b1a0;
          fStack_4c0c = local_b1a0;
          fStack_4c08 = local_b1a0;
          fStack_4c04 = local_b1a0;
          local_4c00 = local_c400;
          uStack_4bf8 = uStack_c3f8;
          uStack_4bf0 = uStack_c3f0;
          uStack_4be8 = uStack_c3e8;
          local_4be0 = local_b1e0;
          fStack_4bdc = local_b1e0;
          fStack_4bd8 = local_b1e0;
          fStack_4bd4 = local_b1e0;
          fStack_4bd0 = local_b1e0;
          fStack_4bcc = local_b1e0;
          fStack_4bc8 = local_b1e0;
          fStack_4bc4 = local_b1e0;
          local_4bc0 = local_c420;
          uStack_4bb8 = uStack_c418;
          uStack_4bb0 = uStack_c410;
          uStack_4ba8 = uStack_c408;
          local_4ba0 = local_b220;
          fStack_4b9c = local_b220;
          fStack_4b98 = local_b220;
          fStack_4b94 = local_b220;
          fStack_4b90 = local_b220;
          fStack_4b8c = local_b220;
          fStack_4b88 = local_b220;
          fStack_4b84 = local_b220;
          local_4b80 = local_c440;
          uStack_4b78 = uStack_c438;
          uStack_4b70 = uStack_c430;
          uStack_4b68 = uStack_c428;
          local_4b60 = local_b260;
          fStack_4b5c = local_b260;
          fStack_4b58 = local_b260;
          fStack_4b54 = local_b260;
          fStack_4b50 = local_b260;
          fStack_4b4c = local_b260;
          fStack_4b48 = local_b260;
          fStack_4b44 = local_b260;
          local_4b40 = local_c460;
          uStack_4b38 = uStack_c458;
          uStack_4b30 = uStack_c450;
          uStack_4b28 = uStack_c448;
          local_4b20 = local_b060;
          fStack_4b1c = local_b060;
          fStack_4b18 = local_b060;
          fStack_4b14 = local_b060;
          fStack_4b10 = local_b060;
          fStack_4b0c = local_b060;
          fStack_4b08 = local_b060;
          fStack_4b04 = local_b060;
          local_4b00 = local_c480;
          uStack_4af8 = uStack_c478;
          uStack_4af0 = uStack_c470;
          uStack_4ae8 = uStack_c468;
          local_4ae0 = local_b0a0;
          fStack_4adc = local_b0a0;
          fStack_4ad8 = local_b0a0;
          fStack_4ad4 = local_b0a0;
          fStack_4ad0 = local_b0a0;
          fStack_4acc = local_b0a0;
          fStack_4ac8 = local_b0a0;
          fStack_4ac4 = local_b0a0;
          local_4ac0 = local_c4a0;
          uStack_4ab8 = uStack_c498;
          uStack_4ab0 = uStack_c490;
          uStack_4aa8 = uStack_c488;
          local_4aa0 = local_b0e0;
          fStack_4a9c = local_b0e0;
          fStack_4a98 = local_b0e0;
          fStack_4a94 = local_b0e0;
          fStack_4a90 = local_b0e0;
          fStack_4a8c = local_b0e0;
          fStack_4a88 = local_b0e0;
          fStack_4a84 = local_b0e0;
          local_4a80 = local_c4c0;
          uStack_4a78 = uStack_c4b8;
          uStack_4a70 = uStack_c4b0;
          uStack_4a68 = uStack_c4a8;
          local_4a60 = local_b120;
          fStack_4a5c = local_b120;
          fStack_4a58 = local_b120;
          fStack_4a54 = local_b120;
          fStack_4a50 = local_b120;
          fStack_4a4c = local_b120;
          fStack_4a48 = local_b120;
          fStack_4a44 = local_b120;
          local_4a40 = local_c4e0;
          uStack_4a38 = uStack_c4d8;
          uStack_4a30 = uStack_c4d0;
          uStack_4a28 = uStack_c4c8;
          local_4a20 = local_b160;
          fStack_4a1c = local_b160;
          fStack_4a18 = local_b160;
          fStack_4a14 = local_b160;
          fStack_4a10 = local_b160;
          fStack_4a0c = local_b160;
          fStack_4a08 = local_b160;
          fStack_4a04 = local_b160;
          local_4a00 = local_c500;
          uStack_49f8 = uStack_c4f8;
          uStack_49f0 = uStack_c4f0;
          uStack_49e8 = uStack_c4e8;
          local_49e0 = local_b1a0;
          fStack_49dc = local_b1a0;
          fStack_49d8 = local_b1a0;
          fStack_49d4 = local_b1a0;
          fStack_49d0 = local_b1a0;
          fStack_49cc = local_b1a0;
          fStack_49c8 = local_b1a0;
          fStack_49c4 = local_b1a0;
          local_49c0 = local_c520;
          uStack_49b8 = uStack_c518;
          uStack_49b0 = uStack_c510;
          uStack_49a8 = uStack_c508;
          local_49a0 = local_b1e0;
          fStack_499c = local_b1e0;
          fStack_4998 = local_b1e0;
          fStack_4994 = local_b1e0;
          fStack_4990 = local_b1e0;
          fStack_498c = local_b1e0;
          fStack_4988 = local_b1e0;
          fStack_4984 = local_b1e0;
          local_4980 = local_c540;
          uStack_4978 = uStack_c538;
          uStack_4970 = uStack_c530;
          uStack_4968 = uStack_c528;
          local_4960 = local_b220;
          fStack_495c = local_b220;
          fStack_4958 = local_b220;
          fStack_4954 = local_b220;
          fStack_4950 = local_b220;
          fStack_494c = local_b220;
          fStack_4948 = local_b220;
          fStack_4944 = local_b220;
          local_4940 = local_c560;
          uStack_4938 = uStack_c558;
          uStack_4930 = uStack_c550;
          uStack_4928 = uStack_c548;
          local_4920 = local_b260;
          fStack_491c = local_b260;
          fStack_4918 = local_b260;
          fStack_4914 = local_b260;
          fStack_4910 = local_b260;
          fStack_490c = local_b260;
          fStack_4908 = local_b260;
          fStack_4904 = local_b260;
          local_4900 = local_c340;
          uStack_48f8 = uStack_c338;
          uStack_48f0 = uStack_c330;
          uStack_48e8 = uStack_c328;
          local_48e0 = local_b0a0;
          fStack_48dc = local_b0a0;
          fStack_48d8 = local_b0a0;
          fStack_48d4 = local_b0a0;
          fStack_48d0 = local_b0a0;
          fStack_48cc = local_b0a0;
          fStack_48c8 = local_b0a0;
          fStack_48c4 = local_b0a0;
          local_48c0 = local_c360;
          uStack_48b8 = uStack_c358;
          uStack_48b0 = uStack_c350;
          uStack_48a8 = uStack_c348;
          local_48a0 = local_b0e0;
          fStack_489c = local_b0e0;
          fStack_4898 = local_b0e0;
          fStack_4894 = local_b0e0;
          fStack_4890 = local_b0e0;
          fStack_488c = local_b0e0;
          fStack_4888 = local_b0e0;
          fStack_4884 = local_b0e0;
          local_4880 = local_c380;
          uStack_4878 = uStack_c378;
          uStack_4870 = uStack_c370;
          uStack_4868 = uStack_c368;
          local_4860 = local_b2a0;
          fStack_485c = local_b2a0;
          fStack_4858 = local_b2a0;
          fStack_4854 = local_b2a0;
          fStack_4850 = local_b2a0;
          fStack_484c = local_b2a0;
          fStack_4848 = local_b2a0;
          fStack_4844 = local_b2a0;
          local_4840 = local_c3a0;
          uStack_4838 = uStack_c398;
          uStack_4830 = uStack_c390;
          uStack_4828 = uStack_c388;
          local_4820 = local_b160;
          fStack_481c = local_b160;
          fStack_4818 = local_b160;
          fStack_4814 = local_b160;
          fStack_4810 = local_b160;
          fStack_480c = local_b160;
          fStack_4808 = local_b160;
          fStack_4804 = local_b160;
          local_4800 = local_c3c0;
          uStack_47f8 = uStack_c3b8;
          uStack_47f0 = uStack_c3b0;
          uStack_47e8 = uStack_c3a8;
          local_47e0 = local_b1a0;
          fStack_47dc = local_b1a0;
          fStack_47d8 = local_b1a0;
          fStack_47d4 = local_b1a0;
          fStack_47d0 = local_b1a0;
          fStack_47cc = local_b1a0;
          fStack_47c8 = local_b1a0;
          fStack_47c4 = local_b1a0;
          local_47c0 = local_c3e0;
          uStack_47b8 = uStack_c3d8;
          uStack_47b0 = uStack_c3d0;
          uStack_47a8 = uStack_c3c8;
          local_47a0 = local_b2e0;
          fStack_479c = local_b2e0;
          fStack_4798 = local_b2e0;
          fStack_4794 = local_b2e0;
          fStack_4790 = local_b2e0;
          fStack_478c = local_b2e0;
          fStack_4788 = local_b2e0;
          fStack_4784 = local_b2e0;
          local_4780 = local_c400;
          uStack_4778 = uStack_c3f8;
          uStack_4770 = uStack_c3f0;
          uStack_4768 = uStack_c3e8;
          local_4760 = local_b220;
          fStack_475c = local_b220;
          fStack_4758 = local_b220;
          fStack_4754 = local_b220;
          fStack_4750 = local_b220;
          fStack_474c = local_b220;
          fStack_4748 = local_b220;
          fStack_4744 = local_b220;
          local_4740 = local_c420;
          uStack_4738 = uStack_c418;
          uStack_4730 = uStack_c410;
          uStack_4728 = uStack_c408;
          local_4720 = local_b260;
          fStack_471c = local_b260;
          fStack_4718 = local_b260;
          fStack_4714 = local_b260;
          fStack_4710 = local_b260;
          fStack_470c = local_b260;
          fStack_4708 = local_b260;
          fStack_4704 = local_b260;
          local_4700 = local_c440;
          uStack_46f8 = uStack_c438;
          uStack_46f0 = uStack_c430;
          uStack_46e8 = uStack_c428;
          local_46e0 = local_b320;
          fStack_46dc = local_b320;
          fStack_46d8 = local_b320;
          fStack_46d4 = local_b320;
          fStack_46d0 = local_b320;
          fStack_46cc = local_b320;
          fStack_46c8 = local_b320;
          fStack_46c4 = local_b320;
          local_46c0 = local_c460;
          uStack_46b8 = uStack_c458;
          uStack_46b0 = uStack_c450;
          uStack_46a8 = uStack_c448;
          local_46a0 = local_b0a0;
          fStack_469c = local_b0a0;
          fStack_4698 = local_b0a0;
          fStack_4694 = local_b0a0;
          fStack_4690 = local_b0a0;
          fStack_468c = local_b0a0;
          fStack_4688 = local_b0a0;
          fStack_4684 = local_b0a0;
          local_4680 = local_c480;
          uStack_4678 = uStack_c478;
          uStack_4670 = uStack_c470;
          uStack_4668 = uStack_c468;
          local_4660 = local_b0e0;
          fStack_465c = local_b0e0;
          fStack_4658 = local_b0e0;
          fStack_4654 = local_b0e0;
          fStack_4650 = local_b0e0;
          fStack_464c = local_b0e0;
          fStack_4648 = local_b0e0;
          fStack_4644 = local_b0e0;
          local_4640 = local_c4a0;
          uStack_4638 = uStack_c498;
          uStack_4630 = uStack_c490;
          uStack_4628 = uStack_c488;
          local_4620 = local_b2a0;
          fStack_461c = local_b2a0;
          fStack_4618 = local_b2a0;
          fStack_4614 = local_b2a0;
          fStack_4610 = local_b2a0;
          fStack_460c = local_b2a0;
          fStack_4608 = local_b2a0;
          fStack_4604 = local_b2a0;
          local_4600 = local_c4c0;
          uStack_45f8 = uStack_c4b8;
          uStack_45f0 = uStack_c4b0;
          uStack_45e8 = uStack_c4a8;
          local_45e0 = local_b160;
          fStack_45dc = local_b160;
          fStack_45d8 = local_b160;
          fStack_45d4 = local_b160;
          fStack_45d0 = local_b160;
          fStack_45cc = local_b160;
          fStack_45c8 = local_b160;
          fStack_45c4 = local_b160;
          local_45c0 = local_c4e0;
          uStack_45b8 = uStack_c4d8;
          uStack_45b0 = uStack_c4d0;
          uStack_45a8 = uStack_c4c8;
          local_45a0 = local_b1a0;
          fStack_459c = local_b1a0;
          fStack_4598 = local_b1a0;
          fStack_4594 = local_b1a0;
          fStack_4590 = local_b1a0;
          fStack_458c = local_b1a0;
          fStack_4588 = local_b1a0;
          fStack_4584 = local_b1a0;
          local_4580 = local_c500;
          uStack_4578 = uStack_c4f8;
          uStack_4570 = uStack_c4f0;
          uStack_4568 = uStack_c4e8;
          local_4560 = local_b2e0;
          fStack_455c = local_b2e0;
          fStack_4558 = local_b2e0;
          fStack_4554 = local_b2e0;
          fStack_4550 = local_b2e0;
          fStack_454c = local_b2e0;
          fStack_4548 = local_b2e0;
          fStack_4544 = local_b2e0;
          local_4540 = local_c520;
          uStack_4538 = uStack_c518;
          uStack_4530 = uStack_c510;
          uStack_4528 = uStack_c508;
          local_4520 = local_b220;
          fStack_451c = local_b220;
          fStack_4518 = local_b220;
          fStack_4514 = local_b220;
          fStack_4510 = local_b220;
          fStack_450c = local_b220;
          fStack_4508 = local_b220;
          fStack_4504 = local_b220;
          local_4500 = local_c540;
          uStack_44f8 = uStack_c538;
          uStack_44f0 = uStack_c530;
          uStack_44e8 = uStack_c528;
          local_44e0 = local_b260;
          fStack_44dc = local_b260;
          fStack_44d8 = local_b260;
          fStack_44d4 = local_b260;
          fStack_44d0 = local_b260;
          fStack_44cc = local_b260;
          fStack_44c8 = local_b260;
          fStack_44c4 = local_b260;
          local_44c0 = local_c560;
          uStack_44b8 = uStack_c558;
          uStack_44b0 = uStack_c550;
          uStack_44a8 = uStack_c548;
          local_44a0 = local_b320;
          fStack_449c = local_b320;
          fStack_4498 = local_b320;
          fStack_4494 = local_b320;
          fStack_4490 = local_b320;
          fStack_448c = local_b320;
          fStack_4488 = local_b320;
          fStack_4484 = local_b320;
          local_1e40 = local_7ae0;
          uStack_1e38 = uStack_7ad8;
          uStack_1e30 = uStack_7ad0;
          uStack_1e28 = uStack_7ac8;
          fStack_1e04 = local_b060;
          local_1e00 = local_7b40;
          uStack_1df8 = uStack_7b38;
          uStack_1df0 = uStack_7b30;
          uStack_1de8 = uStack_7b28;
          fStack_1dc4 = local_b0a0;
          local_1dc0 = local_7ba0;
          uStack_1db8 = uStack_7b98;
          uStack_1db0 = uStack_7b90;
          uStack_1da8 = uStack_7b88;
          fStack_1d84 = local_b0e0;
          local_1d80 = local_7c00;
          uStack_1d78 = uStack_7bf8;
          uStack_1d70 = uStack_7bf0;
          uStack_1d68 = uStack_7be8;
          fStack_1d44 = local_b120;
          local_1d40 = local_7c60;
          uStack_1d38 = uStack_7c58;
          uStack_1d30 = uStack_7c50;
          uStack_1d28 = uStack_7c48;
          fStack_1d04 = local_b160;
          local_1d00 = local_7cc0;
          uStack_1cf8 = uStack_7cb8;
          uStack_1cf0 = uStack_7cb0;
          uStack_1ce8 = uStack_7ca8;
          fStack_1cc4 = local_b1a0;
          local_1cc0 = local_7d20;
          uStack_1cb8 = uStack_7d18;
          uStack_1cb0 = uStack_7d10;
          uStack_1ca8 = uStack_7d08;
          fStack_1c84 = local_b1e0;
          local_1c80 = local_7d80;
          uStack_1c78 = uStack_7d78;
          uStack_1c70 = uStack_7d70;
          uStack_1c68 = uStack_7d68;
          fStack_1c44 = local_b220;
          local_1c40 = local_7de0;
          uStack_1c38 = uStack_7dd8;
          uStack_1c30 = uStack_7dd0;
          uStack_1c28 = uStack_7dc8;
          fStack_1c04 = local_b260;
          local_1c00 = local_7e40;
          uStack_1bf8 = uStack_7e38;
          uStack_1bf0 = uStack_7e30;
          uStack_1be8 = uStack_7e28;
          fStack_1bc4 = local_b060;
          local_1bc0 = local_7ea0;
          uStack_1bb8 = uStack_7e98;
          uStack_1bb0 = uStack_7e90;
          uStack_1ba8 = uStack_7e88;
          fStack_1b84 = local_b0a0;
          local_1b80 = local_7f00;
          uStack_1b78 = uStack_7ef8;
          uStack_1b70 = uStack_7ef0;
          uStack_1b68 = uStack_7ee8;
          fStack_1b44 = local_b0e0;
          local_1b40 = local_7f60;
          uStack_1b38 = uStack_7f58;
          uStack_1b30 = uStack_7f50;
          uStack_1b28 = uStack_7f48;
          fStack_1b04 = local_b120;
          local_1b00 = local_7fc0;
          uStack_1af8 = uStack_7fb8;
          uStack_1af0 = uStack_7fb0;
          uStack_1ae8 = uStack_7fa8;
          fStack_1ac4 = local_b160;
          local_1ac0 = local_8020;
          uStack_1ab8 = uStack_8018;
          uStack_1ab0 = uStack_8010;
          uStack_1aa8 = uStack_8008;
          fStack_1a84 = local_b1a0;
          local_1a80 = local_8080;
          uStack_1a78 = uStack_8078;
          uStack_1a70 = uStack_8070;
          uStack_1a68 = uStack_8068;
          fStack_1a44 = local_b1e0;
          local_1a40 = local_80e0;
          uStack_1a38 = uStack_80d8;
          uStack_1a30 = uStack_80d0;
          uStack_1a28 = uStack_80c8;
          fStack_1a04 = local_b220;
          local_1a00 = local_8140;
          uStack_19f8 = uStack_8138;
          uStack_19f0 = uStack_8130;
          uStack_19e8 = uStack_8128;
          fStack_19c4 = local_b260;
          local_19c0 = local_81a0;
          uStack_19b8 = uStack_8198;
          uStack_19b0 = uStack_8190;
          uStack_19a8 = uStack_8188;
          fStack_1984 = local_b0a0;
          local_1980 = local_8200;
          uStack_1978 = uStack_81f8;
          uStack_1970 = uStack_81f0;
          uStack_1968 = uStack_81e8;
          fStack_1944 = local_b0e0;
          local_1940 = local_8260;
          uStack_1938 = uStack_8258;
          uStack_1930 = uStack_8250;
          uStack_1928 = uStack_8248;
          fStack_1904 = local_b2a0;
          local_1900 = local_82c0;
          uStack_18f8 = uStack_82b8;
          uStack_18f0 = uStack_82b0;
          uStack_18e8 = uStack_82a8;
          fStack_18c4 = local_b160;
          local_18c0 = local_8320;
          uStack_18b8 = uStack_8318;
          uStack_18b0 = uStack_8310;
          uStack_18a8 = uStack_8308;
          fStack_1884 = local_b1a0;
          local_1880 = local_8380;
          uStack_1878 = uStack_8378;
          uStack_1870 = uStack_8370;
          uStack_1868 = uStack_8368;
          fStack_1844 = local_b2e0;
          local_1840 = local_83e0;
          uStack_1838 = uStack_83d8;
          uStack_1830 = uStack_83d0;
          uStack_1828 = uStack_83c8;
          fStack_1804 = local_b220;
          local_1800 = local_8440;
          uStack_17f8 = uStack_8438;
          uStack_17f0 = uStack_8430;
          uStack_17e8 = uStack_8428;
          fStack_17c4 = local_b260;
          local_17c0 = local_84a0;
          uStack_17b8 = uStack_8498;
          uStack_17b0 = uStack_8490;
          uStack_17a8 = uStack_8488;
          fStack_1784 = local_b320;
          local_1780 = local_8500;
          uStack_1778 = uStack_84f8;
          uStack_1770 = uStack_84f0;
          uStack_1768 = uStack_84e8;
          fStack_1744 = local_b0a0;
          local_1740 = local_8560;
          uStack_1738 = uStack_8558;
          uStack_1730 = uStack_8550;
          uStack_1728 = uStack_8548;
          fStack_1704 = local_b0e0;
          local_1700 = local_85c0;
          uStack_16f8 = uStack_85b8;
          uStack_16f0 = uStack_85b0;
          uStack_16e8 = uStack_85a8;
          fStack_16c4 = local_b2a0;
          local_16c0 = local_8620;
          uStack_16b8 = uStack_8618;
          uStack_16b0 = uStack_8610;
          uStack_16a8 = uStack_8608;
          fStack_1684 = local_b160;
          local_1680 = local_8680;
          uStack_1678 = uStack_8678;
          uStack_1670 = uStack_8670;
          uStack_1668 = uStack_8668;
          fStack_1644 = local_b1a0;
          local_1640 = local_86e0;
          uStack_1638 = uStack_86d8;
          uStack_1630 = uStack_86d0;
          uStack_1628 = uStack_86c8;
          fStack_1604 = local_b2e0;
          local_1600 = local_8740;
          uStack_15f8 = uStack_8738;
          uStack_15f0 = uStack_8730;
          uStack_15e8 = uStack_8728;
          fStack_15c4 = local_b220;
          local_15c0 = local_87a0;
          uStack_15b8 = uStack_8798;
          uStack_15b0 = uStack_8790;
          uStack_15a8 = uStack_8788;
          fStack_1584 = local_b260;
          local_1580 = local_8800;
          uStack_1578 = uStack_87f8;
          uStack_1570 = uStack_87f0;
          uStack_1568 = uStack_87e8;
          fStack_1544 = local_b320;
        }
        for (; local_c568 < local_c0f8; local_c568 = local_c568 + 1) {
          local_c028 = local_c2b0;
          local_8860 = *(undefined8 *)local_c2b0;
          uStack_8858 = *(undefined8 *)(local_c2b0 + 2);
          uStack_8850 = *(undefined8 *)(local_c2b0 + 4);
          uStack_8848 = *(undefined8 *)(local_c2b0 + 6);
          local_c030 = local_c2b8;
          local_8bc0 = *(undefined8 *)local_c2b8;
          uStack_8bb8 = *(undefined8 *)(local_c2b8 + 2);
          uStack_8bb0 = *(undefined8 *)(local_c2b8 + 4);
          uStack_8ba8 = *(undefined8 *)(local_c2b8 + 6);
          local_b328 = local_c308;
          local_b360 = *local_c308;
          local_cb20 = CONCAT44(local_b360,local_b360);
          uStack_cb18 = CONCAT44(local_b360,local_b360);
          uStack_cb10 = CONCAT44(local_b360,local_b360);
          uStack_cb08 = CONCAT44(local_b360,local_b360);
          local_b368 = local_c308 + 1;
          local_b3a0 = *local_b368;
          local_cb40 = CONCAT44(local_b3a0,local_b3a0);
          uStack_cb38 = CONCAT44(local_b3a0,local_b3a0);
          uStack_cb30 = CONCAT44(local_b3a0,local_b3a0);
          uStack_cb28 = CONCAT44(local_b3a0,local_b3a0);
          local_b3a8 = local_c308 + 2;
          local_b3e0 = *local_b3a8;
          local_cb60 = CONCAT44(local_b3e0,local_b3e0);
          uStack_cb58 = CONCAT44(local_b3e0,local_b3e0);
          uStack_cb50 = CONCAT44(local_b3e0,local_b3e0);
          uStack_cb48 = CONCAT44(local_b3e0,local_b3e0);
          local_b3e8 = local_c310;
          local_b420 = *local_c310;
          local_cb80 = CONCAT44(local_b420,local_b420);
          uStack_cb78 = CONCAT44(local_b420,local_b420);
          uStack_cb70 = CONCAT44(local_b420,local_b420);
          uStack_cb68 = CONCAT44(local_b420,local_b420);
          local_b428 = local_c310 + 1;
          local_b460 = *local_b428;
          local_cba0 = CONCAT44(local_b460,local_b460);
          uStack_cb98 = CONCAT44(local_b460,local_b460);
          uStack_cb90 = CONCAT44(local_b460,local_b460);
          uStack_cb88 = CONCAT44(local_b460,local_b460);
          local_b468 = local_c310 + 2;
          local_b4a0 = *local_b468;
          local_cbc0 = CONCAT44(local_b4a0,local_b4a0);
          uStack_cbb8 = CONCAT44(local_b4a0,local_b4a0);
          uStack_cbb0 = CONCAT44(local_b4a0,local_b4a0);
          uStack_cba8 = CONCAT44(local_b4a0,local_b4a0);
          local_b4a8 = local_c318;
          local_b4e0 = *local_c318;
          local_cbe0 = CONCAT44(local_b4e0,local_b4e0);
          uStack_cbd8 = CONCAT44(local_b4e0,local_b4e0);
          uStack_cbd0 = CONCAT44(local_b4e0,local_b4e0);
          uStack_cbc8 = CONCAT44(local_b4e0,local_b4e0);
          local_b4e8 = local_c318 + 1;
          local_b520 = *local_b4e8;
          local_cc00 = CONCAT44(local_b520,local_b520);
          uStack_cbf8 = CONCAT44(local_b520,local_b520);
          uStack_cbf0 = CONCAT44(local_b520,local_b520);
          uStack_cbe8 = CONCAT44(local_b520,local_b520);
          local_b528 = local_c318 + 2;
          local_b560 = *local_b528;
          local_cc20 = CONCAT44(local_b560,local_b560);
          uStack_cc18 = CONCAT44(local_b560,local_b560);
          uStack_cc10 = CONCAT44(local_b560,local_b560);
          uStack_cc08 = CONCAT44(local_b560,local_b560);
          local_1520 = local_b360 * (float)local_5f80;
          fStack_151c = local_b360 * local_5f80._4_4_;
          fStack_1518 = local_b360 * (float)uStack_5f78;
          fStack_1514 = local_b360 * uStack_5f78._4_4_;
          fStack_1510 = local_b360 * (float)uStack_5f70;
          fStack_150c = local_b360 * uStack_5f70._4_4_;
          fStack_1508 = local_b360 * (float)uStack_5f68;
          local_1540._0_4_ = (float)local_8860;
          local_1540._4_4_ = (float)((ulong)local_8860 >> 0x20);
          uStack_1538._0_4_ = (float)uStack_8858;
          uStack_1538._4_4_ = (float)((ulong)uStack_8858 >> 0x20);
          uStack_1530._0_4_ = (float)uStack_8850;
          uStack_1530._4_4_ = (float)((ulong)uStack_8850 >> 0x20);
          uStack_1528._0_4_ = (float)uStack_8848;
          uStack_1528._4_4_ = (float)((ulong)uStack_8848 >> 0x20);
          local_88c0 = CONCAT44(fStack_151c + local_1540._4_4_,local_1520 + (float)local_1540);
          uStack_88b8 = CONCAT44(fStack_1514 + uStack_1538._4_4_,fStack_1518 + (float)uStack_1538);
          uStack_88b0 = CONCAT44(fStack_150c + uStack_1530._4_4_,fStack_1510 + (float)uStack_1530);
          uStack_88a8 = CONCAT44(local_b360 + uStack_1528._4_4_,fStack_1508 + (float)uStack_1528);
          local_14e0 = local_b3a0 * (float)local_5f40;
          fStack_14dc = local_b3a0 * local_5f40._4_4_;
          fStack_14d8 = local_b3a0 * (float)uStack_5f38;
          fStack_14d4 = local_b3a0 * uStack_5f38._4_4_;
          fStack_14d0 = local_b3a0 * (float)uStack_5f30;
          fStack_14cc = local_b3a0 * uStack_5f30._4_4_;
          fStack_14c8 = local_b3a0 * (float)uStack_5f28;
          fVar76 = local_14e0 + local_1520 + (float)local_1540;
          fVar80 = fStack_14dc + fStack_151c + local_1540._4_4_;
          fVar81 = fStack_14d8 + fStack_1518 + (float)uStack_1538;
          fVar82 = fStack_14d4 + fStack_1514 + uStack_1538._4_4_;
          fVar83 = fStack_14d0 + fStack_1510 + (float)uStack_1530;
          fVar84 = fStack_14cc + fStack_150c + uStack_1530._4_4_;
          fVar85 = fStack_14c8 + fStack_1508 + (float)uStack_1528;
          fVar86 = local_b3a0 + local_b360 + uStack_1528._4_4_;
          local_8920 = CONCAT44(fVar80,fVar76);
          uStack_8918 = CONCAT44(fVar82,fVar81);
          uStack_8910 = CONCAT44(fVar84,fVar83);
          uStack_8908 = CONCAT44(fVar86,fVar85);
          local_14a0 = local_b3e0 * (float)local_5f00;
          fStack_149c = local_b3e0 * local_5f00._4_4_;
          fStack_1498 = local_b3e0 * (float)uStack_5ef8;
          fStack_1494 = local_b3e0 * uStack_5ef8._4_4_;
          fStack_1490 = local_b3e0 * (float)uStack_5ef0;
          fStack_148c = local_b3e0 * uStack_5ef0._4_4_;
          fStack_1488 = local_b3e0 * (float)uStack_5ee8;
          fVar76 = local_14a0 + fVar76;
          fVar80 = fStack_149c + fVar80;
          fVar81 = fStack_1498 + fVar81;
          fVar82 = fStack_1494 + fVar82;
          fVar83 = fStack_1490 + fVar83;
          fVar84 = fStack_148c + fVar84;
          fVar85 = fStack_1488 + fVar85;
          fVar86 = local_b3e0 + fVar86;
          local_8980 = CONCAT44(fVar80,fVar76);
          uStack_8978 = CONCAT44(fVar82,fVar81);
          uStack_8970 = CONCAT44(fVar84,fVar83);
          uStack_8968 = CONCAT44(fVar86,fVar85);
          local_1460 = local_b420 * (float)local_5ec0;
          fStack_145c = local_b420 * local_5ec0._4_4_;
          fStack_1458 = local_b420 * (float)uStack_5eb8;
          fStack_1454 = local_b420 * uStack_5eb8._4_4_;
          fStack_1450 = local_b420 * (float)uStack_5eb0;
          fStack_144c = local_b420 * uStack_5eb0._4_4_;
          fStack_1448 = local_b420 * (float)uStack_5ea8;
          fVar76 = local_1460 + fVar76;
          fVar80 = fStack_145c + fVar80;
          fVar81 = fStack_1458 + fVar81;
          fVar82 = fStack_1454 + fVar82;
          fVar83 = fStack_1450 + fVar83;
          fVar84 = fStack_144c + fVar84;
          fVar85 = fStack_1448 + fVar85;
          fVar86 = local_b420 + fVar86;
          local_89e0 = CONCAT44(fVar80,fVar76);
          uStack_89d8 = CONCAT44(fVar82,fVar81);
          uStack_89d0 = CONCAT44(fVar84,fVar83);
          uStack_89c8 = CONCAT44(fVar86,fVar85);
          local_1420 = local_b460 * (float)local_5e80;
          fStack_141c = local_b460 * local_5e80._4_4_;
          fStack_1418 = local_b460 * (float)uStack_5e78;
          fStack_1414 = local_b460 * uStack_5e78._4_4_;
          fStack_1410 = local_b460 * (float)uStack_5e70;
          fStack_140c = local_b460 * uStack_5e70._4_4_;
          fStack_1408 = local_b460 * (float)uStack_5e68;
          fVar76 = local_1420 + fVar76;
          fVar80 = fStack_141c + fVar80;
          fVar81 = fStack_1418 + fVar81;
          fVar82 = fStack_1414 + fVar82;
          fVar83 = fStack_1410 + fVar83;
          fVar84 = fStack_140c + fVar84;
          fVar85 = fStack_1408 + fVar85;
          fVar86 = local_b460 + fVar86;
          local_8a40 = CONCAT44(fVar80,fVar76);
          uStack_8a38 = CONCAT44(fVar82,fVar81);
          uStack_8a30 = CONCAT44(fVar84,fVar83);
          uStack_8a28 = CONCAT44(fVar86,fVar85);
          local_13e0 = local_b4a0 * (float)local_5e40;
          fStack_13dc = local_b4a0 * local_5e40._4_4_;
          fStack_13d8 = local_b4a0 * (float)uStack_5e38;
          fStack_13d4 = local_b4a0 * uStack_5e38._4_4_;
          fStack_13d0 = local_b4a0 * (float)uStack_5e30;
          fStack_13cc = local_b4a0 * uStack_5e30._4_4_;
          fStack_13c8 = local_b4a0 * (float)uStack_5e28;
          fVar76 = local_13e0 + fVar76;
          fVar80 = fStack_13dc + fVar80;
          fVar81 = fStack_13d8 + fVar81;
          fVar82 = fStack_13d4 + fVar82;
          fVar83 = fStack_13d0 + fVar83;
          fVar84 = fStack_13cc + fVar84;
          fVar85 = fStack_13c8 + fVar85;
          fVar86 = local_b4a0 + fVar86;
          local_8aa0 = CONCAT44(fVar80,fVar76);
          uStack_8a98 = CONCAT44(fVar82,fVar81);
          uStack_8a90 = CONCAT44(fVar84,fVar83);
          uStack_8a88 = CONCAT44(fVar86,fVar85);
          local_13a0 = local_b4e0 * (float)local_5e00;
          fStack_139c = local_b4e0 * local_5e00._4_4_;
          fStack_1398 = local_b4e0 * (float)uStack_5df8;
          fStack_1394 = local_b4e0 * uStack_5df8._4_4_;
          fStack_1390 = local_b4e0 * (float)uStack_5df0;
          fStack_138c = local_b4e0 * uStack_5df0._4_4_;
          fStack_1388 = local_b4e0 * (float)uStack_5de8;
          fVar76 = local_13a0 + fVar76;
          fVar80 = fStack_139c + fVar80;
          fVar81 = fStack_1398 + fVar81;
          fVar82 = fStack_1394 + fVar82;
          fVar83 = fStack_1390 + fVar83;
          fVar84 = fStack_138c + fVar84;
          fVar85 = fStack_1388 + fVar85;
          fVar86 = local_b4e0 + fVar86;
          local_8b00 = CONCAT44(fVar80,fVar76);
          uStack_8af8 = CONCAT44(fVar82,fVar81);
          uStack_8af0 = CONCAT44(fVar84,fVar83);
          uStack_8ae8 = CONCAT44(fVar86,fVar85);
          local_1360 = local_b520 * (float)local_5dc0;
          fStack_135c = local_b520 * local_5dc0._4_4_;
          fStack_1358 = local_b520 * (float)uStack_5db8;
          fStack_1354 = local_b520 * uStack_5db8._4_4_;
          fStack_1350 = local_b520 * (float)uStack_5db0;
          fStack_134c = local_b520 * uStack_5db0._4_4_;
          fStack_1348 = local_b520 * (float)uStack_5da8;
          fVar76 = local_1360 + fVar76;
          fVar80 = fStack_135c + fVar80;
          fVar81 = fStack_1358 + fVar81;
          fVar82 = fStack_1354 + fVar82;
          fVar83 = fStack_1350 + fVar83;
          fVar84 = fStack_134c + fVar84;
          fVar85 = fStack_1348 + fVar85;
          fVar86 = local_b520 + fVar86;
          local_8b60 = CONCAT44(fVar80,fVar76);
          uStack_8b58 = CONCAT44(fVar82,fVar81);
          uStack_8b50 = CONCAT44(fVar84,fVar83);
          uStack_8b48 = CONCAT44(fVar86,fVar85);
          local_1320 = local_b560 * (float)local_5d80;
          fStack_131c = local_b560 * local_5d80._4_4_;
          fStack_1318 = local_b560 * (float)uStack_5d78;
          fStack_1314 = local_b560 * uStack_5d78._4_4_;
          fStack_1310 = local_b560 * (float)uStack_5d70;
          fStack_130c = local_b560 * uStack_5d70._4_4_;
          fStack_1308 = local_b560 * (float)uStack_5d68;
          local_cae0 = CONCAT44(fStack_131c + fVar80,local_1320 + fVar76);
          uStack_cad8 = CONCAT44(fStack_1314 + fVar82,fStack_1318 + fVar81);
          uStack_cad0 = CONCAT44(fStack_130c + fVar84,fStack_1310 + fVar83);
          uStack_cac8 = CONCAT44(local_b560 + fVar86,fStack_1308 + fVar85);
          local_12e0 = local_b360 * (float)local_5d40;
          fStack_12dc = local_b360 * local_5d40._4_4_;
          fStack_12d8 = local_b360 * (float)uStack_5d38;
          fStack_12d4 = local_b360 * uStack_5d38._4_4_;
          fStack_12d0 = local_b360 * (float)uStack_5d30;
          fStack_12cc = local_b360 * uStack_5d30._4_4_;
          fStack_12c8 = local_b360 * (float)uStack_5d28;
          local_1300._0_4_ = (float)local_8bc0;
          local_1300._4_4_ = (float)((ulong)local_8bc0 >> 0x20);
          uStack_12f8._0_4_ = (float)uStack_8bb8;
          uStack_12f8._4_4_ = (float)((ulong)uStack_8bb8 >> 0x20);
          uStack_12f0._0_4_ = (float)uStack_8bb0;
          uStack_12f0._4_4_ = (float)((ulong)uStack_8bb0 >> 0x20);
          uStack_12e8._0_4_ = (float)uStack_8ba8;
          uStack_12e8._4_4_ = (float)((ulong)uStack_8ba8 >> 0x20);
          local_8c20 = CONCAT44(fStack_12dc + local_1300._4_4_,local_12e0 + (float)local_1300);
          uStack_8c18 = CONCAT44(fStack_12d4 + uStack_12f8._4_4_,fStack_12d8 + (float)uStack_12f8);
          uStack_8c10 = CONCAT44(fStack_12cc + uStack_12f0._4_4_,fStack_12d0 + (float)uStack_12f0);
          uStack_8c08 = CONCAT44(local_b360 + uStack_12e8._4_4_,fStack_12c8 + (float)uStack_12e8);
          local_12a0 = local_b3a0 * (float)local_5d00;
          fStack_129c = local_b3a0 * local_5d00._4_4_;
          fStack_1298 = local_b3a0 * (float)uStack_5cf8;
          fStack_1294 = local_b3a0 * uStack_5cf8._4_4_;
          fStack_1290 = local_b3a0 * (float)uStack_5cf0;
          fStack_128c = local_b3a0 * uStack_5cf0._4_4_;
          fStack_1288 = local_b3a0 * (float)uStack_5ce8;
          fVar76 = local_12a0 + local_12e0 + (float)local_1300;
          fVar80 = fStack_129c + fStack_12dc + local_1300._4_4_;
          fVar81 = fStack_1298 + fStack_12d8 + (float)uStack_12f8;
          fVar82 = fStack_1294 + fStack_12d4 + uStack_12f8._4_4_;
          fVar83 = fStack_1290 + fStack_12d0 + (float)uStack_12f0;
          fVar84 = fStack_128c + fStack_12cc + uStack_12f0._4_4_;
          fVar85 = fStack_1288 + fStack_12c8 + (float)uStack_12e8;
          fVar86 = local_b3a0 + local_b360 + uStack_12e8._4_4_;
          local_8c80 = CONCAT44(fVar80,fVar76);
          uStack_8c78 = CONCAT44(fVar82,fVar81);
          uStack_8c70 = CONCAT44(fVar84,fVar83);
          uStack_8c68 = CONCAT44(fVar86,fVar85);
          local_1260 = local_b3e0 * (float)local_5cc0;
          fStack_125c = local_b3e0 * local_5cc0._4_4_;
          fStack_1258 = local_b3e0 * (float)uStack_5cb8;
          fStack_1254 = local_b3e0 * uStack_5cb8._4_4_;
          fStack_1250 = local_b3e0 * (float)uStack_5cb0;
          fStack_124c = local_b3e0 * uStack_5cb0._4_4_;
          fStack_1248 = local_b3e0 * (float)uStack_5ca8;
          fVar76 = local_1260 + fVar76;
          fVar80 = fStack_125c + fVar80;
          fVar81 = fStack_1258 + fVar81;
          fVar82 = fStack_1254 + fVar82;
          fVar83 = fStack_1250 + fVar83;
          fVar84 = fStack_124c + fVar84;
          fVar85 = fStack_1248 + fVar85;
          fVar86 = local_b3e0 + fVar86;
          local_8ce0 = CONCAT44(fVar80,fVar76);
          uStack_8cd8 = CONCAT44(fVar82,fVar81);
          uStack_8cd0 = CONCAT44(fVar84,fVar83);
          uStack_8cc8 = CONCAT44(fVar86,fVar85);
          local_1220 = local_b420 * (float)local_5c80;
          fStack_121c = local_b420 * local_5c80._4_4_;
          fStack_1218 = local_b420 * (float)uStack_5c78;
          fStack_1214 = local_b420 * uStack_5c78._4_4_;
          fStack_1210 = local_b420 * (float)uStack_5c70;
          fStack_120c = local_b420 * uStack_5c70._4_4_;
          fStack_1208 = local_b420 * (float)uStack_5c68;
          fVar76 = local_1220 + fVar76;
          fVar80 = fStack_121c + fVar80;
          fVar81 = fStack_1218 + fVar81;
          fVar82 = fStack_1214 + fVar82;
          fVar83 = fStack_1210 + fVar83;
          fVar84 = fStack_120c + fVar84;
          fVar85 = fStack_1208 + fVar85;
          fVar86 = local_b420 + fVar86;
          local_8d40 = CONCAT44(fVar80,fVar76);
          uStack_8d38 = CONCAT44(fVar82,fVar81);
          uStack_8d30 = CONCAT44(fVar84,fVar83);
          uStack_8d28 = CONCAT44(fVar86,fVar85);
          local_11e0 = local_b460 * (float)local_5c40;
          fStack_11dc = local_b460 * local_5c40._4_4_;
          fStack_11d8 = local_b460 * (float)uStack_5c38;
          fStack_11d4 = local_b460 * uStack_5c38._4_4_;
          fStack_11d0 = local_b460 * (float)uStack_5c30;
          fStack_11cc = local_b460 * uStack_5c30._4_4_;
          fStack_11c8 = local_b460 * (float)uStack_5c28;
          fVar76 = local_11e0 + fVar76;
          fVar80 = fStack_11dc + fVar80;
          fVar81 = fStack_11d8 + fVar81;
          fVar82 = fStack_11d4 + fVar82;
          fVar83 = fStack_11d0 + fVar83;
          fVar84 = fStack_11cc + fVar84;
          fVar85 = fStack_11c8 + fVar85;
          fVar86 = local_b460 + fVar86;
          local_8da0 = CONCAT44(fVar80,fVar76);
          uStack_8d98 = CONCAT44(fVar82,fVar81);
          uStack_8d90 = CONCAT44(fVar84,fVar83);
          uStack_8d88 = CONCAT44(fVar86,fVar85);
          local_11a0 = local_b4a0 * (float)local_5c00;
          fStack_119c = local_b4a0 * local_5c00._4_4_;
          fStack_1198 = local_b4a0 * (float)uStack_5bf8;
          fStack_1194 = local_b4a0 * uStack_5bf8._4_4_;
          fStack_1190 = local_b4a0 * (float)uStack_5bf0;
          fStack_118c = local_b4a0 * uStack_5bf0._4_4_;
          fStack_1188 = local_b4a0 * (float)uStack_5be8;
          fVar76 = local_11a0 + fVar76;
          fVar80 = fStack_119c + fVar80;
          fVar81 = fStack_1198 + fVar81;
          fVar82 = fStack_1194 + fVar82;
          fVar83 = fStack_1190 + fVar83;
          fVar84 = fStack_118c + fVar84;
          fVar85 = fStack_1188 + fVar85;
          fVar86 = local_b4a0 + fVar86;
          local_8e00 = CONCAT44(fVar80,fVar76);
          uStack_8df8 = CONCAT44(fVar82,fVar81);
          uStack_8df0 = CONCAT44(fVar84,fVar83);
          uStack_8de8 = CONCAT44(fVar86,fVar85);
          local_1160 = local_b4e0 * (float)local_5bc0;
          fStack_115c = local_b4e0 * local_5bc0._4_4_;
          fStack_1158 = local_b4e0 * (float)uStack_5bb8;
          fStack_1154 = local_b4e0 * uStack_5bb8._4_4_;
          fStack_1150 = local_b4e0 * (float)uStack_5bb0;
          fStack_114c = local_b4e0 * uStack_5bb0._4_4_;
          fStack_1148 = local_b4e0 * (float)uStack_5ba8;
          fVar76 = local_1160 + fVar76;
          fVar80 = fStack_115c + fVar80;
          fVar81 = fStack_1158 + fVar81;
          fVar82 = fStack_1154 + fVar82;
          fVar83 = fStack_1150 + fVar83;
          fVar84 = fStack_114c + fVar84;
          fVar85 = fStack_1148 + fVar85;
          fVar86 = local_b4e0 + fVar86;
          local_8e60 = CONCAT44(fVar80,fVar76);
          uStack_8e58 = CONCAT44(fVar82,fVar81);
          uStack_8e50 = CONCAT44(fVar84,fVar83);
          uStack_8e48 = CONCAT44(fVar86,fVar85);
          local_1120 = local_b520 * (float)local_5b80;
          fStack_111c = local_b520 * local_5b80._4_4_;
          fStack_1118 = local_b520 * (float)uStack_5b78;
          fStack_1114 = local_b520 * uStack_5b78._4_4_;
          fStack_1110 = local_b520 * (float)uStack_5b70;
          fStack_110c = local_b520 * uStack_5b70._4_4_;
          fStack_1108 = local_b520 * (float)uStack_5b68;
          fVar76 = local_1120 + fVar76;
          fVar80 = fStack_111c + fVar80;
          fVar81 = fStack_1118 + fVar81;
          fVar82 = fStack_1114 + fVar82;
          fVar83 = fStack_1110 + fVar83;
          fVar84 = fStack_110c + fVar84;
          fVar85 = fStack_1108 + fVar85;
          fVar86 = local_b520 + fVar86;
          local_8ec0 = CONCAT44(fVar80,fVar76);
          uStack_8eb8 = CONCAT44(fVar82,fVar81);
          uStack_8eb0 = CONCAT44(fVar84,fVar83);
          uStack_8ea8 = CONCAT44(fVar86,fVar85);
          local_10e0 = local_b560 * (float)local_5b40;
          fStack_10dc = local_b560 * local_5b40._4_4_;
          fStack_10d8 = local_b560 * (float)uStack_5b38;
          fStack_10d4 = local_b560 * uStack_5b38._4_4_;
          fStack_10d0 = local_b560 * (float)uStack_5b30;
          fStack_10cc = local_b560 * uStack_5b30._4_4_;
          fStack_10c8 = local_b560 * (float)uStack_5b28;
          local_cb00 = CONCAT44(fStack_10dc + fVar80,local_10e0 + fVar76);
          uStack_caf8 = CONCAT44(fStack_10d4 + fVar82,fStack_10d8 + fVar81);
          uStack_caf0 = CONCAT44(fStack_10cc + fVar84,fStack_10d0 + fVar83);
          uStack_cae8 = CONCAT44(local_b560 + fVar86,fStack_10c8 + fVar85);
          local_a968 = local_c2b0;
          *(undefined8 *)local_c2b0 = local_cae0;
          *(undefined8 *)(local_c2b0 + 2) = uStack_cad8;
          *(undefined8 *)(local_c2b0 + 4) = uStack_cad0;
          *(undefined8 *)(local_c2b0 + 6) = uStack_cac8;
          local_a9a8 = local_c2b8;
          *(undefined8 *)local_c2b8 = local_cb00;
          *(undefined8 *)(local_c2b8 + 2) = uStack_caf8;
          *(undefined8 *)(local_c2b8 + 4) = uStack_caf0;
          *(undefined8 *)(local_c2b8 + 6) = uStack_cae8;
          local_c308 = local_c308 + 1;
          local_c310 = local_c310 + 1;
          local_c318 = local_c318 + 1;
          local_c2b0 = local_c2b0 + 8;
          local_c2b8 = local_c2b8 + 8;
          fStack_b55c = local_b560;
          fStack_b558 = local_b560;
          fStack_b554 = local_b560;
          fStack_b550 = local_b560;
          fStack_b54c = local_b560;
          fStack_b548 = local_b560;
          fStack_b544 = local_b560;
          local_b52c = local_b560;
          fStack_b51c = local_b520;
          fStack_b518 = local_b520;
          fStack_b514 = local_b520;
          fStack_b510 = local_b520;
          fStack_b50c = local_b520;
          fStack_b508 = local_b520;
          fStack_b504 = local_b520;
          local_b4ec = local_b520;
          fStack_b4dc = local_b4e0;
          fStack_b4d8 = local_b4e0;
          fStack_b4d4 = local_b4e0;
          fStack_b4d0 = local_b4e0;
          fStack_b4cc = local_b4e0;
          fStack_b4c8 = local_b4e0;
          fStack_b4c4 = local_b4e0;
          local_b4ac = local_b4e0;
          fStack_b49c = local_b4a0;
          fStack_b498 = local_b4a0;
          fStack_b494 = local_b4a0;
          fStack_b490 = local_b4a0;
          fStack_b48c = local_b4a0;
          fStack_b488 = local_b4a0;
          fStack_b484 = local_b4a0;
          local_b46c = local_b4a0;
          fStack_b45c = local_b460;
          fStack_b458 = local_b460;
          fStack_b454 = local_b460;
          fStack_b450 = local_b460;
          fStack_b44c = local_b460;
          fStack_b448 = local_b460;
          fStack_b444 = local_b460;
          local_b42c = local_b460;
          fStack_b41c = local_b420;
          fStack_b418 = local_b420;
          fStack_b414 = local_b420;
          fStack_b410 = local_b420;
          fStack_b40c = local_b420;
          fStack_b408 = local_b420;
          fStack_b404 = local_b420;
          local_b3ec = local_b420;
          fStack_b3dc = local_b3e0;
          fStack_b3d8 = local_b3e0;
          fStack_b3d4 = local_b3e0;
          fStack_b3d0 = local_b3e0;
          fStack_b3cc = local_b3e0;
          fStack_b3c8 = local_b3e0;
          fStack_b3c4 = local_b3e0;
          local_b3ac = local_b3e0;
          fStack_b39c = local_b3a0;
          fStack_b398 = local_b3a0;
          fStack_b394 = local_b3a0;
          fStack_b390 = local_b3a0;
          fStack_b38c = local_b3a0;
          fStack_b388 = local_b3a0;
          fStack_b384 = local_b3a0;
          local_b36c = local_b3a0;
          fStack_b35c = local_b360;
          fStack_b358 = local_b360;
          fStack_b354 = local_b360;
          fStack_b350 = local_b360;
          fStack_b34c = local_b360;
          fStack_b348 = local_b360;
          fStack_b344 = local_b360;
          local_b32c = local_b360;
          local_a9e0 = local_cb00;
          uStack_a9d8 = uStack_caf8;
          uStack_a9d0 = uStack_caf0;
          uStack_a9c8 = uStack_cae8;
          local_a9a0 = local_cae0;
          uStack_a998 = uStack_cad8;
          uStack_a990 = uStack_cad0;
          uStack_a988 = uStack_cac8;
          local_8ea0 = local_c560;
          uStack_8e98 = uStack_c558;
          uStack_8e90 = uStack_c550;
          uStack_8e88 = uStack_c548;
          local_8e80 = local_cc20;
          uStack_8e78 = uStack_cc18;
          uStack_8e70 = uStack_cc10;
          uStack_8e68 = uStack_cc08;
          local_8e40 = local_c540;
          uStack_8e38 = uStack_c538;
          uStack_8e30 = uStack_c530;
          uStack_8e28 = uStack_c528;
          local_8e20 = local_cc00;
          uStack_8e18 = uStack_cbf8;
          uStack_8e10 = uStack_cbf0;
          uStack_8e08 = uStack_cbe8;
          local_8de0 = local_c520;
          uStack_8dd8 = uStack_c518;
          uStack_8dd0 = uStack_c510;
          uStack_8dc8 = uStack_c508;
          local_8dc0 = local_cbe0;
          uStack_8db8 = uStack_cbd8;
          uStack_8db0 = uStack_cbd0;
          uStack_8da8 = uStack_cbc8;
          local_8d80 = local_c500;
          uStack_8d78 = uStack_c4f8;
          uStack_8d70 = uStack_c4f0;
          uStack_8d68 = uStack_c4e8;
          local_8d60 = local_cbc0;
          uStack_8d58 = uStack_cbb8;
          uStack_8d50 = uStack_cbb0;
          uStack_8d48 = uStack_cba8;
          local_8d20 = local_c4e0;
          uStack_8d18 = uStack_c4d8;
          uStack_8d10 = uStack_c4d0;
          uStack_8d08 = uStack_c4c8;
          local_8d00 = local_cba0;
          uStack_8cf8 = uStack_cb98;
          uStack_8cf0 = uStack_cb90;
          uStack_8ce8 = uStack_cb88;
          local_8cc0 = local_c4c0;
          uStack_8cb8 = uStack_c4b8;
          uStack_8cb0 = uStack_c4b0;
          uStack_8ca8 = uStack_c4a8;
          local_8ca0 = local_cb80;
          uStack_8c98 = uStack_cb78;
          uStack_8c90 = uStack_cb70;
          uStack_8c88 = uStack_cb68;
          local_8c60 = local_c4a0;
          uStack_8c58 = uStack_c498;
          uStack_8c50 = uStack_c490;
          uStack_8c48 = uStack_c488;
          local_8c40 = local_cb60;
          uStack_8c38 = uStack_cb58;
          uStack_8c30 = uStack_cb50;
          uStack_8c28 = uStack_cb48;
          local_8c00 = local_c480;
          uStack_8bf8 = uStack_c478;
          uStack_8bf0 = uStack_c470;
          uStack_8be8 = uStack_c468;
          local_8be0 = local_cb40;
          uStack_8bd8 = uStack_cb38;
          uStack_8bd0 = uStack_cb30;
          uStack_8bc8 = uStack_cb28;
          local_8ba0 = local_c460;
          uStack_8b98 = uStack_c458;
          uStack_8b90 = uStack_c450;
          uStack_8b88 = uStack_c448;
          local_8b80 = local_cb20;
          uStack_8b78 = uStack_cb18;
          uStack_8b70 = uStack_cb10;
          uStack_8b68 = uStack_cb08;
          local_8b40 = local_c440;
          uStack_8b38 = uStack_c438;
          uStack_8b30 = uStack_c430;
          uStack_8b28 = uStack_c428;
          local_8b20 = local_cc20;
          uStack_8b18 = uStack_cc18;
          uStack_8b10 = uStack_cc10;
          uStack_8b08 = uStack_cc08;
          local_8ae0 = local_c420;
          uStack_8ad8 = uStack_c418;
          uStack_8ad0 = uStack_c410;
          uStack_8ac8 = uStack_c408;
          local_8ac0 = local_cc00;
          uStack_8ab8 = uStack_cbf8;
          uStack_8ab0 = uStack_cbf0;
          uStack_8aa8 = uStack_cbe8;
          local_8a80 = local_c400;
          uStack_8a78 = uStack_c3f8;
          uStack_8a70 = uStack_c3f0;
          uStack_8a68 = uStack_c3e8;
          local_8a60 = local_cbe0;
          uStack_8a58 = uStack_cbd8;
          uStack_8a50 = uStack_cbd0;
          uStack_8a48 = uStack_cbc8;
          local_8a20 = local_c3e0;
          uStack_8a18 = uStack_c3d8;
          uStack_8a10 = uStack_c3d0;
          uStack_8a08 = uStack_c3c8;
          local_8a00 = local_cbc0;
          uStack_89f8 = uStack_cbb8;
          uStack_89f0 = uStack_cbb0;
          uStack_89e8 = uStack_cba8;
          local_89c0 = local_c3c0;
          uStack_89b8 = uStack_c3b8;
          uStack_89b0 = uStack_c3b0;
          uStack_89a8 = uStack_c3a8;
          local_89a0 = local_cba0;
          uStack_8998 = uStack_cb98;
          uStack_8990 = uStack_cb90;
          uStack_8988 = uStack_cb88;
          local_8960 = local_c3a0;
          uStack_8958 = uStack_c398;
          uStack_8950 = uStack_c390;
          uStack_8948 = uStack_c388;
          local_8940 = local_cb80;
          uStack_8938 = uStack_cb78;
          uStack_8930 = uStack_cb70;
          uStack_8928 = uStack_cb68;
          local_8900 = local_c380;
          uStack_88f8 = uStack_c378;
          uStack_88f0 = uStack_c370;
          uStack_88e8 = uStack_c368;
          local_88e0 = local_cb60;
          uStack_88d8 = uStack_cb58;
          uStack_88d0 = uStack_cb50;
          uStack_88c8 = uStack_cb48;
          local_88a0 = local_c360;
          uStack_8898 = uStack_c358;
          uStack_8890 = uStack_c350;
          uStack_8888 = uStack_c348;
          local_8880 = local_cb40;
          uStack_8878 = uStack_cb38;
          uStack_8870 = uStack_cb30;
          uStack_8868 = uStack_cb28;
          local_8840 = local_c340;
          uStack_8838 = uStack_c338;
          uStack_8830 = uStack_c330;
          uStack_8828 = uStack_c328;
          local_8820 = local_cb20;
          uStack_8818 = uStack_cb18;
          uStack_8810 = uStack_cb10;
          uStack_8808 = uStack_cb08;
          local_4480 = local_c340;
          uStack_4478 = uStack_c338;
          uStack_4470 = uStack_c330;
          uStack_4468 = uStack_c328;
          local_4460 = local_b360;
          fStack_445c = local_b360;
          fStack_4458 = local_b360;
          fStack_4454 = local_b360;
          fStack_4450 = local_b360;
          fStack_444c = local_b360;
          fStack_4448 = local_b360;
          fStack_4444 = local_b360;
          local_4440 = local_c360;
          uStack_4438 = uStack_c358;
          uStack_4430 = uStack_c350;
          uStack_4428 = uStack_c348;
          local_4420 = local_b3a0;
          fStack_441c = local_b3a0;
          fStack_4418 = local_b3a0;
          fStack_4414 = local_b3a0;
          fStack_4410 = local_b3a0;
          fStack_440c = local_b3a0;
          fStack_4408 = local_b3a0;
          fStack_4404 = local_b3a0;
          local_4400 = local_c380;
          uStack_43f8 = uStack_c378;
          uStack_43f0 = uStack_c370;
          uStack_43e8 = uStack_c368;
          local_43e0 = local_b3e0;
          fStack_43dc = local_b3e0;
          fStack_43d8 = local_b3e0;
          fStack_43d4 = local_b3e0;
          fStack_43d0 = local_b3e0;
          fStack_43cc = local_b3e0;
          fStack_43c8 = local_b3e0;
          fStack_43c4 = local_b3e0;
          local_43c0 = local_c3a0;
          uStack_43b8 = uStack_c398;
          uStack_43b0 = uStack_c390;
          uStack_43a8 = uStack_c388;
          local_43a0 = local_b420;
          fStack_439c = local_b420;
          fStack_4398 = local_b420;
          fStack_4394 = local_b420;
          fStack_4390 = local_b420;
          fStack_438c = local_b420;
          fStack_4388 = local_b420;
          fStack_4384 = local_b420;
          local_4380 = local_c3c0;
          uStack_4378 = uStack_c3b8;
          uStack_4370 = uStack_c3b0;
          uStack_4368 = uStack_c3a8;
          local_4360 = local_b460;
          fStack_435c = local_b460;
          fStack_4358 = local_b460;
          fStack_4354 = local_b460;
          fStack_4350 = local_b460;
          fStack_434c = local_b460;
          fStack_4348 = local_b460;
          fStack_4344 = local_b460;
          local_4340 = local_c3e0;
          uStack_4338 = uStack_c3d8;
          uStack_4330 = uStack_c3d0;
          uStack_4328 = uStack_c3c8;
          local_4320 = local_b4a0;
          fStack_431c = local_b4a0;
          fStack_4318 = local_b4a0;
          fStack_4314 = local_b4a0;
          fStack_4310 = local_b4a0;
          fStack_430c = local_b4a0;
          fStack_4308 = local_b4a0;
          fStack_4304 = local_b4a0;
          local_4300 = local_c400;
          uStack_42f8 = uStack_c3f8;
          uStack_42f0 = uStack_c3f0;
          uStack_42e8 = uStack_c3e8;
          local_42e0 = local_b4e0;
          fStack_42dc = local_b4e0;
          fStack_42d8 = local_b4e0;
          fStack_42d4 = local_b4e0;
          fStack_42d0 = local_b4e0;
          fStack_42cc = local_b4e0;
          fStack_42c8 = local_b4e0;
          fStack_42c4 = local_b4e0;
          local_42c0 = local_c420;
          uStack_42b8 = uStack_c418;
          uStack_42b0 = uStack_c410;
          uStack_42a8 = uStack_c408;
          local_42a0 = local_b520;
          fStack_429c = local_b520;
          fStack_4298 = local_b520;
          fStack_4294 = local_b520;
          fStack_4290 = local_b520;
          fStack_428c = local_b520;
          fStack_4288 = local_b520;
          fStack_4284 = local_b520;
          local_4280 = local_c440;
          uStack_4278 = uStack_c438;
          uStack_4270 = uStack_c430;
          uStack_4268 = uStack_c428;
          local_4260 = local_b560;
          fStack_425c = local_b560;
          fStack_4258 = local_b560;
          fStack_4254 = local_b560;
          fStack_4250 = local_b560;
          fStack_424c = local_b560;
          fStack_4248 = local_b560;
          fStack_4244 = local_b560;
          local_4240 = local_c460;
          uStack_4238 = uStack_c458;
          uStack_4230 = uStack_c450;
          uStack_4228 = uStack_c448;
          local_4220 = local_b360;
          fStack_421c = local_b360;
          fStack_4218 = local_b360;
          fStack_4214 = local_b360;
          fStack_4210 = local_b360;
          fStack_420c = local_b360;
          fStack_4208 = local_b360;
          fStack_4204 = local_b360;
          local_4200 = local_c480;
          uStack_41f8 = uStack_c478;
          uStack_41f0 = uStack_c470;
          uStack_41e8 = uStack_c468;
          local_41e0 = local_b3a0;
          fStack_41dc = local_b3a0;
          fStack_41d8 = local_b3a0;
          fStack_41d4 = local_b3a0;
          fStack_41d0 = local_b3a0;
          fStack_41cc = local_b3a0;
          fStack_41c8 = local_b3a0;
          fStack_41c4 = local_b3a0;
          local_41c0 = local_c4a0;
          uStack_41b8 = uStack_c498;
          uStack_41b0 = uStack_c490;
          uStack_41a8 = uStack_c488;
          local_41a0 = local_b3e0;
          fStack_419c = local_b3e0;
          fStack_4198 = local_b3e0;
          fStack_4194 = local_b3e0;
          fStack_4190 = local_b3e0;
          fStack_418c = local_b3e0;
          fStack_4188 = local_b3e0;
          fStack_4184 = local_b3e0;
          local_4180 = local_c4c0;
          uStack_4178 = uStack_c4b8;
          uStack_4170 = uStack_c4b0;
          uStack_4168 = uStack_c4a8;
          local_4160 = local_b420;
          fStack_415c = local_b420;
          fStack_4158 = local_b420;
          fStack_4154 = local_b420;
          fStack_4150 = local_b420;
          fStack_414c = local_b420;
          fStack_4148 = local_b420;
          fStack_4144 = local_b420;
          local_4140 = local_c4e0;
          uStack_4138 = uStack_c4d8;
          uStack_4130 = uStack_c4d0;
          uStack_4128 = uStack_c4c8;
          local_4120 = local_b460;
          fStack_411c = local_b460;
          fStack_4118 = local_b460;
          fStack_4114 = local_b460;
          fStack_4110 = local_b460;
          fStack_410c = local_b460;
          fStack_4108 = local_b460;
          fStack_4104 = local_b460;
          local_4100 = local_c500;
          uStack_40f8 = uStack_c4f8;
          uStack_40f0 = uStack_c4f0;
          uStack_40e8 = uStack_c4e8;
          local_40e0 = local_b4a0;
          fStack_40dc = local_b4a0;
          fStack_40d8 = local_b4a0;
          fStack_40d4 = local_b4a0;
          fStack_40d0 = local_b4a0;
          fStack_40cc = local_b4a0;
          fStack_40c8 = local_b4a0;
          fStack_40c4 = local_b4a0;
          local_40c0 = local_c520;
          uStack_40b8 = uStack_c518;
          uStack_40b0 = uStack_c510;
          uStack_40a8 = uStack_c508;
          local_40a0 = local_b4e0;
          fStack_409c = local_b4e0;
          fStack_4098 = local_b4e0;
          fStack_4094 = local_b4e0;
          fStack_4090 = local_b4e0;
          fStack_408c = local_b4e0;
          fStack_4088 = local_b4e0;
          fStack_4084 = local_b4e0;
          local_4080 = local_c540;
          uStack_4078 = uStack_c538;
          uStack_4070 = uStack_c530;
          uStack_4068 = uStack_c528;
          local_4060 = local_b520;
          fStack_405c = local_b520;
          fStack_4058 = local_b520;
          fStack_4054 = local_b520;
          fStack_4050 = local_b520;
          fStack_404c = local_b520;
          fStack_4048 = local_b520;
          fStack_4044 = local_b520;
          local_4040 = local_c560;
          uStack_4038 = uStack_c558;
          uStack_4030 = uStack_c550;
          uStack_4028 = uStack_c548;
          local_4020 = local_b560;
          fStack_401c = local_b560;
          fStack_4018 = local_b560;
          fStack_4014 = local_b560;
          fStack_4010 = local_b560;
          fStack_400c = local_b560;
          fStack_4008 = local_b560;
          fStack_4004 = local_b560;
          local_1540 = local_8860;
          uStack_1538 = uStack_8858;
          uStack_1530 = uStack_8850;
          uStack_1528 = uStack_8848;
          fStack_1504 = local_b360;
          local_1500 = local_88c0;
          uStack_14f8 = uStack_88b8;
          uStack_14f0 = uStack_88b0;
          uStack_14e8 = uStack_88a8;
          fStack_14c4 = local_b3a0;
          local_14c0 = local_8920;
          uStack_14b8 = uStack_8918;
          uStack_14b0 = uStack_8910;
          uStack_14a8 = uStack_8908;
          fStack_1484 = local_b3e0;
          local_1480 = local_8980;
          uStack_1478 = uStack_8978;
          uStack_1470 = uStack_8970;
          uStack_1468 = uStack_8968;
          fStack_1444 = local_b420;
          local_1440 = local_89e0;
          uStack_1438 = uStack_89d8;
          uStack_1430 = uStack_89d0;
          uStack_1428 = uStack_89c8;
          fStack_1404 = local_b460;
          local_1400 = local_8a40;
          uStack_13f8 = uStack_8a38;
          uStack_13f0 = uStack_8a30;
          uStack_13e8 = uStack_8a28;
          fStack_13c4 = local_b4a0;
          local_13c0 = local_8aa0;
          uStack_13b8 = uStack_8a98;
          uStack_13b0 = uStack_8a90;
          uStack_13a8 = uStack_8a88;
          fStack_1384 = local_b4e0;
          local_1380 = local_8b00;
          uStack_1378 = uStack_8af8;
          uStack_1370 = uStack_8af0;
          uStack_1368 = uStack_8ae8;
          fStack_1344 = local_b520;
          local_1340 = local_8b60;
          uStack_1338 = uStack_8b58;
          uStack_1330 = uStack_8b50;
          uStack_1328 = uStack_8b48;
          fStack_1304 = local_b560;
          local_1300 = local_8bc0;
          uStack_12f8 = uStack_8bb8;
          uStack_12f0 = uStack_8bb0;
          uStack_12e8 = uStack_8ba8;
          fStack_12c4 = local_b360;
          local_12c0 = local_8c20;
          uStack_12b8 = uStack_8c18;
          uStack_12b0 = uStack_8c10;
          uStack_12a8 = uStack_8c08;
          fStack_1284 = local_b3a0;
          local_1280 = local_8c80;
          uStack_1278 = uStack_8c78;
          uStack_1270 = uStack_8c70;
          uStack_1268 = uStack_8c68;
          fStack_1244 = local_b3e0;
          local_1240 = local_8ce0;
          uStack_1238 = uStack_8cd8;
          uStack_1230 = uStack_8cd0;
          uStack_1228 = uStack_8cc8;
          fStack_1204 = local_b420;
          local_1200 = local_8d40;
          uStack_11f8 = uStack_8d38;
          uStack_11f0 = uStack_8d30;
          uStack_11e8 = uStack_8d28;
          fStack_11c4 = local_b460;
          local_11c0 = local_8da0;
          uStack_11b8 = uStack_8d98;
          uStack_11b0 = uStack_8d90;
          uStack_11a8 = uStack_8d88;
          fStack_1184 = local_b4a0;
          local_1180 = local_8e00;
          uStack_1178 = uStack_8df8;
          uStack_1170 = uStack_8df0;
          uStack_1168 = uStack_8de8;
          fStack_1144 = local_b4e0;
          local_1140 = local_8e60;
          uStack_1138 = uStack_8e58;
          uStack_1130 = uStack_8e50;
          uStack_1128 = uStack_8e48;
          fStack_1104 = local_b520;
          local_1100 = local_8ec0;
          uStack_10f8 = uStack_8eb8;
          uStack_10f0 = uStack_8eb0;
          uStack_10e8 = uStack_8ea8;
          fStack_10c4 = local_b560;
        }
        local_c308 = local_c308 + 2;
        local_c310 = local_c310 + 2;
        local_c318 = local_c318 + 2;
        local_5f80 = uVar3;
        uStack_5f78 = uVar4;
        uStack_5f70 = uVar5;
        uStack_5f68 = uVar6;
        local_5f40 = uVar7;
        uStack_5f38 = uVar8;
        uStack_5f30 = uVar9;
        uStack_5f28 = uVar10;
        local_5f00 = uVar11;
        uStack_5ef8 = uVar12;
        uStack_5ef0 = uVar13;
        uStack_5ee8 = uVar14;
        local_5ec0 = uVar15;
        uStack_5eb8 = uVar16;
        uStack_5eb0 = uVar17;
        uStack_5ea8 = uVar18;
        local_5e80 = uVar19;
        uStack_5e78 = uVar20;
        uStack_5e70 = uVar21;
        uStack_5e68 = uVar22;
        local_5e40 = uVar23;
        uStack_5e38 = uVar24;
        uStack_5e30 = uVar25;
        uStack_5e28 = uVar26;
        local_5e00 = uVar27;
        uStack_5df8 = uVar28;
        uStack_5df0 = uVar29;
        uStack_5de8 = uVar30;
        local_5dc0 = uVar31;
        uStack_5db8 = uVar32;
        uStack_5db0 = uVar33;
        uStack_5da8 = uVar34;
        local_5d80 = uVar35;
        uStack_5d78 = uVar36;
        uStack_5d70 = uVar37;
        uStack_5d68 = uVar38;
        local_5d40 = uVar39;
        uStack_5d38 = uVar40;
        uStack_5d30 = uVar41;
        uStack_5d28 = uVar42;
        local_5d00 = uVar43;
        uStack_5cf8 = uVar44;
        uStack_5cf0 = uVar45;
        uStack_5ce8 = uVar46;
        local_5cc0 = uVar47;
        uStack_5cb8 = uVar48;
        uStack_5cb0 = uVar49;
        uStack_5ca8 = uVar50;
        local_5c80 = uVar51;
        uStack_5c78 = uVar52;
        uStack_5c70 = uVar53;
        uStack_5c68 = uVar54;
        local_5c40 = uVar55;
        uStack_5c38 = uVar56;
        uStack_5c30 = uVar57;
        uStack_5c28 = uVar58;
        local_5c00 = uVar59;
        uStack_5bf8 = uVar60;
        uStack_5bf0 = uVar61;
        uStack_5be8 = uVar62;
        local_5bc0 = uVar63;
        uStack_5bb8 = uVar64;
        uStack_5bb0 = uVar65;
        uStack_5ba8 = uVar66;
        local_5b80 = uVar67;
        uStack_5b78 = uVar68;
        uStack_5b70 = uVar69;
        uStack_5b68 = uVar70;
        local_5b40 = uVar71;
        uStack_5b38 = uVar72;
        uStack_5b30 = uVar73;
        uStack_5b28 = uVar74;
      }
      local_c208 = local_c208 + 0x48;
      local_c258 = local_c258 + 0x48;
      Mat::~Mat((Mat *)0x31a735);
    }
    Mat::~Mat((Mat *)0x31a758);
    Mat::~Mat((Mat *)0x31a765);
  }
  for (local_cc24 = local_c110; local_cc24 < local_c100; local_cc24 = local_cc24 + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffff12f4,in_stack_ffffffffffff12f0),
                 (int)in_stack_ffffffffffff12ec);
    if (local_c108 == (float *)0x0) {
      local_c0c4 = 0;
      local_34 = 0;
      local_38 = 0;
      local_3c = 0;
      local_40 = 0;
      local_44 = 0;
      local_48 = 0;
      local_4c = 0;
      local_50 = 0;
      auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
      auVar79._16_16_ = auVar1;
      auVar79._0_16_ = auVar2;
      local_80._0_8_ = auVar2._0_8_;
      local_80._8_8_ = auVar2._8_8_;
      local_80._16_8_ = auVar1._0_8_;
      local_80._24_8_ = auVar1._8_8_;
      local_e520 = local_80._0_8_;
      uStack_e518 = local_80._8_8_;
      uStack_e510 = local_80._16_8_;
      uStack_e508 = local_80._24_8_;
      local_80 = auVar79;
    }
    else {
      local_c038 = local_c108 + (local_cc24 << 3);
      local_e520 = *(undefined8 *)local_c038;
      uStack_e518 = *(undefined8 *)(local_c038 + 2);
      uStack_e510 = *(undefined8 *)(local_c038 + 4);
      uStack_e508 = *(undefined8 *)(local_c038 + 6);
    }
    local_cca0 = local_e520;
    uStack_cc98 = uStack_e518;
    uStack_cc90 = uStack_e510;
    uStack_cc88 = uStack_e508;
    _v_01[1] = in_stack_ffffffffffff12dc;
    _v_01[0] = in_stack_ffffffffffff12d8;
    _v_01[2] = in_stack_ffffffffffff12e0;
    _v_01[3] = in_stack_ffffffffffff12e4;
    _v_01[4] = in_stack_ffffffffffff12e8;
    _v_01[5] = in_stack_ffffffffffff12ec;
    _v_01[6] = in_stack_ffffffffffff12f0;
    _v_01[7] = in_stack_ffffffffffff12f4;
    Mat::fill((Mat *)CONCAT44(in_stack_ffffffffffff1314,in_stack_ffffffffffff1310),_v_01);
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffff12f4,in_stack_ffffffffffff12f0),
                 (int)in_stack_ffffffffffff12ec);
    pfVar75 = Mat::operator_cast_to_float_(&local_ccf0);
    Mat::~Mat((Mat *)0x31a99d);
    local_cca8 = pfVar75;
    for (local_ccf4 = 0; local_ccf4 < local_c0f4; local_ccf4 = local_ccf4 + 1) {
      local_cd00 = Mat::row(&local_cc70,0);
      Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffff12f4,in_stack_ffffffffffff12f0),
                   (int)in_stack_ffffffffffff12ec);
      local_cd50 = Mat::row(&local_cd48,0);
      local_cd58 = Mat::row(&local_cd48,1);
      local_cd60 = Mat::row(&local_cd48,2);
      local_c040 = local_cca8;
      uVar3 = *(undefined8 *)local_cca8;
      uVar4 = *(undefined8 *)(local_cca8 + 2);
      uVar5 = *(undefined8 *)(local_cca8 + 4);
      uVar6 = *(undefined8 *)(local_cca8 + 6);
      local_c048 = local_cca8 + 8;
      uVar7 = *(undefined8 *)local_c048;
      uVar8 = *(undefined8 *)(local_cca8 + 10);
      uVar9 = *(undefined8 *)(local_cca8 + 0xc);
      uVar10 = *(undefined8 *)(local_cca8 + 0xe);
      local_c050 = local_cca8 + 0x10;
      uVar11 = *(undefined8 *)local_c050;
      uVar12 = *(undefined8 *)(local_cca8 + 0x12);
      uVar13 = *(undefined8 *)(local_cca8 + 0x14);
      uVar14 = *(undefined8 *)(local_cca8 + 0x16);
      local_c058 = local_cca8 + 0x18;
      uVar15 = *(undefined8 *)local_c058;
      uVar16 = *(undefined8 *)(local_cca8 + 0x1a);
      uVar17 = *(undefined8 *)(local_cca8 + 0x1c);
      uVar18 = *(undefined8 *)(local_cca8 + 0x1e);
      local_c060 = local_cca8 + 0x20;
      uVar19 = *(undefined8 *)local_c060;
      uVar20 = *(undefined8 *)(local_cca8 + 0x22);
      uVar21 = *(undefined8 *)(local_cca8 + 0x24);
      uVar22 = *(undefined8 *)(local_cca8 + 0x26);
      local_c068 = local_cca8 + 0x28;
      uVar23 = *(undefined8 *)local_c068;
      uVar24 = *(undefined8 *)(local_cca8 + 0x2a);
      uVar25 = *(undefined8 *)(local_cca8 + 0x2c);
      uVar26 = *(undefined8 *)(local_cca8 + 0x2e);
      local_c070 = local_cca8 + 0x30;
      uVar27 = *(undefined8 *)local_c070;
      uVar28 = *(undefined8 *)(local_cca8 + 0x32);
      uVar29 = *(undefined8 *)(local_cca8 + 0x34);
      uVar30 = *(undefined8 *)(local_cca8 + 0x36);
      local_c078 = local_cca8 + 0x38;
      uVar31 = *(undefined8 *)local_c078;
      uVar32 = *(undefined8 *)(local_cca8 + 0x3a);
      uVar33 = *(undefined8 *)(local_cca8 + 0x3c);
      uVar34 = *(undefined8 *)(local_cca8 + 0x3e);
      local_c080 = local_cca8 + 0x40;
      uVar35 = *(undefined8 *)local_c080;
      uVar36 = *(undefined8 *)(local_cca8 + 0x42);
      uVar37 = *(undefined8 *)(local_cca8 + 0x44);
      uVar38 = *(undefined8 *)(local_cca8 + 0x46);
      for (local_ce84 = 0; local_ce84 < local_c0fc; local_ce84 = local_ce84 + 1) {
        local_ce88 = 0;
        while( true ) {
          uVar74 = uStack_3de8;
          uVar73 = uStack_3df0;
          uVar72 = uStack_3df8;
          uVar71 = local_3e00;
          uVar70 = uStack_3e28;
          uVar69 = uStack_3e30;
          uVar68 = uStack_3e38;
          uVar67 = local_3e40;
          uVar66 = uStack_3e68;
          uVar65 = uStack_3e70;
          uVar64 = uStack_3e78;
          uVar63 = local_3e80;
          uVar62 = uStack_3ea8;
          uVar61 = uStack_3eb0;
          uVar60 = uStack_3eb8;
          uVar59 = local_3ec0;
          uVar58 = uStack_3ee8;
          uVar57 = uStack_3ef0;
          uVar56 = uStack_3ef8;
          uVar55 = local_3f00;
          uVar54 = uStack_3f28;
          uVar53 = uStack_3f30;
          uVar52 = uStack_3f38;
          uVar51 = local_3f40;
          uVar50 = uStack_3f68;
          uVar49 = uStack_3f70;
          uVar48 = uStack_3f78;
          uVar47 = local_3f80;
          uVar46 = uStack_3fa8;
          uVar45 = uStack_3fb0;
          uVar44 = uStack_3fb8;
          uVar43 = local_3fc0;
          uVar42 = uStack_3fe8;
          uVar41 = uStack_3ff0;
          uVar40 = uStack_3ff8;
          uVar39 = local_4000;
          local_4000._0_4_ = (float)uVar3;
          local_4000._4_4_ = (float)((ulong)uVar3 >> 0x20);
          uStack_3ff8._0_4_ = (float)uVar4;
          uStack_3ff8._4_4_ = (float)((ulong)uVar4 >> 0x20);
          uStack_3ff0._0_4_ = (float)uVar5;
          uStack_3ff0._4_4_ = (float)((ulong)uVar5 >> 0x20);
          local_3fc0._0_4_ = (float)uVar7;
          local_3fc0._4_4_ = (float)((ulong)uVar7 >> 0x20);
          uStack_3fb8._0_4_ = (float)uVar8;
          uStack_3fb8._4_4_ = (float)((ulong)uVar8 >> 0x20);
          uStack_3fb0._0_4_ = (float)uVar9;
          uStack_3fb0._4_4_ = (float)((ulong)uVar9 >> 0x20);
          local_3f80._0_4_ = (float)uVar11;
          local_3f80._4_4_ = (float)((ulong)uVar11 >> 0x20);
          uStack_3f78._0_4_ = (float)uVar12;
          uStack_3f78._4_4_ = (float)((ulong)uVar12 >> 0x20);
          uStack_3f70._0_4_ = (float)uVar13;
          uStack_3f70._4_4_ = (float)((ulong)uVar13 >> 0x20);
          local_3f40._0_4_ = (float)uVar15;
          local_3f40._4_4_ = (float)((ulong)uVar15 >> 0x20);
          uStack_3f38._0_4_ = (float)uVar16;
          uStack_3f38._4_4_ = (float)((ulong)uVar16 >> 0x20);
          uStack_3f30._0_4_ = (float)uVar17;
          uStack_3f30._4_4_ = (float)((ulong)uVar17 >> 0x20);
          local_3f00._0_4_ = (float)uVar19;
          local_3f00._4_4_ = (float)((ulong)uVar19 >> 0x20);
          uStack_3ef8._0_4_ = (float)uVar20;
          uStack_3ef8._4_4_ = (float)((ulong)uVar20 >> 0x20);
          uStack_3ef0._0_4_ = (float)uVar21;
          uStack_3ef0._4_4_ = (float)((ulong)uVar21 >> 0x20);
          local_3ec0._0_4_ = (float)uVar23;
          local_3ec0._4_4_ = (float)((ulong)uVar23 >> 0x20);
          uStack_3eb8._0_4_ = (float)uVar24;
          uStack_3eb8._4_4_ = (float)((ulong)uVar24 >> 0x20);
          uStack_3eb0._0_4_ = (float)uVar25;
          uStack_3eb0._4_4_ = (float)((ulong)uVar25 >> 0x20);
          local_3e80._0_4_ = (float)uVar27;
          local_3e80._4_4_ = (float)((ulong)uVar27 >> 0x20);
          uStack_3e78._0_4_ = (float)uVar28;
          uStack_3e78._4_4_ = (float)((ulong)uVar28 >> 0x20);
          uStack_3e70._0_4_ = (float)uVar29;
          uStack_3e70._4_4_ = (float)((ulong)uVar29 >> 0x20);
          local_3e40._0_4_ = (float)uVar31;
          local_3e40._4_4_ = (float)((ulong)uVar31 >> 0x20);
          uStack_3e38._0_4_ = (float)uVar32;
          uStack_3e38._4_4_ = (float)((ulong)uVar32 >> 0x20);
          uStack_3e30._0_4_ = (float)uVar33;
          uStack_3e30._4_4_ = (float)((ulong)uVar33 >> 0x20);
          local_3e00._0_4_ = (float)uVar35;
          local_3e00._4_4_ = (float)((ulong)uVar35 >> 0x20);
          uStack_3df8._0_4_ = (float)uVar36;
          uStack_3df8._4_4_ = (float)((ulong)uVar36 >> 0x20);
          uStack_3df0._0_4_ = (float)uVar37;
          uStack_3df0._4_4_ = (float)((ulong)uVar37 >> 0x20);
          uStack_3fe8._0_4_ = (float)uVar6;
          uStack_3fa8._0_4_ = (float)uVar10;
          uStack_3f68._0_4_ = (float)uVar14;
          uStack_3f28._0_4_ = (float)uVar18;
          uStack_3ee8._0_4_ = (float)uVar22;
          uStack_3ea8._0_4_ = (float)uVar26;
          uStack_3e68._0_4_ = (float)uVar30;
          uStack_3e28._0_4_ = (float)uVar34;
          uStack_3de8._0_4_ = (float)uVar38;
          if (local_c0f8 <= local_ce88 + 3) break;
          local_c088 = local_cd00;
          local_8f20 = *(undefined8 *)local_cd00;
          uStack_8f18 = *(undefined8 *)(local_cd00 + 2);
          uStack_8f10 = *(undefined8 *)(local_cd00 + 4);
          uStack_8f08 = *(undefined8 *)(local_cd00 + 6);
          local_b568 = local_cd50;
          local_b5a0 = *local_cd50;
          local_8ee0 = CONCAT44(local_b5a0,local_b5a0);
          uStack_8ed8 = CONCAT44(local_b5a0,local_b5a0);
          uStack_8ed0 = CONCAT44(local_b5a0,local_b5a0);
          uStack_8ec8 = CONCAT44(local_b5a0,local_b5a0);
          local_b5a8 = local_cd50 + 1;
          local_b5e0 = *local_b5a8;
          local_9240 = CONCAT44(local_b5e0,local_b5e0);
          uStack_9238 = CONCAT44(local_b5e0,local_b5e0);
          uStack_9230 = CONCAT44(local_b5e0,local_b5e0);
          uStack_9228 = CONCAT44(local_b5e0,local_b5e0);
          local_b5e8 = local_cd50 + 2;
          local_b620 = *local_b5e8;
          local_95a0 = CONCAT44(local_b620,local_b620);
          uStack_9598 = CONCAT44(local_b620,local_b620);
          uStack_9590 = CONCAT44(local_b620,local_b620);
          uStack_9588 = CONCAT44(local_b620,local_b620);
          local_b628 = local_cd58;
          local_b660 = *local_cd58;
          local_9000 = CONCAT44(local_b660,local_b660);
          uStack_8ff8 = CONCAT44(local_b660,local_b660);
          uStack_8ff0 = CONCAT44(local_b660,local_b660);
          uStack_8fe8 = CONCAT44(local_b660,local_b660);
          local_b668 = local_cd58 + 1;
          local_b6a0 = *local_b668;
          local_9360 = CONCAT44(local_b6a0,local_b6a0);
          uStack_9358 = CONCAT44(local_b6a0,local_b6a0);
          uStack_9350 = CONCAT44(local_b6a0,local_b6a0);
          uStack_9348 = CONCAT44(local_b6a0,local_b6a0);
          local_b6a8 = local_cd58 + 2;
          local_b6e0 = *local_b6a8;
          local_96c0 = CONCAT44(local_b6e0,local_b6e0);
          uStack_96b8 = CONCAT44(local_b6e0,local_b6e0);
          uStack_96b0 = CONCAT44(local_b6e0,local_b6e0);
          uStack_96a8 = CONCAT44(local_b6e0,local_b6e0);
          local_b6e8 = local_cd60;
          local_b720 = *local_cd60;
          local_9120 = CONCAT44(local_b720,local_b720);
          uStack_9118 = CONCAT44(local_b720,local_b720);
          uStack_9110 = CONCAT44(local_b720,local_b720);
          uStack_9108 = CONCAT44(local_b720,local_b720);
          local_b728 = local_cd60 + 1;
          local_b760 = *local_b728;
          local_9480 = CONCAT44(local_b760,local_b760);
          uStack_9478 = CONCAT44(local_b760,local_b760);
          uStack_9470 = CONCAT44(local_b760,local_b760);
          uStack_9468 = CONCAT44(local_b760,local_b760);
          local_b768 = local_cd60 + 2;
          local_b7a0 = *local_b768;
          local_97e0 = CONCAT44(local_b7a0,local_b7a0);
          uStack_97d8 = CONCAT44(local_b7a0,local_b7a0);
          uStack_97d0 = CONCAT44(local_b7a0,local_b7a0);
          uStack_97c8 = CONCAT44(local_b7a0,local_b7a0);
          local_10a0 = local_b5a0 * (float)local_4000;
          fStack_109c = local_b5a0 * local_4000._4_4_;
          fStack_1098 = local_b5a0 * (float)uStack_3ff8;
          fStack_1094 = local_b5a0 * uStack_3ff8._4_4_;
          fStack_1090 = local_b5a0 * (float)uStack_3ff0;
          fStack_108c = local_b5a0 * uStack_3ff0._4_4_;
          fStack_1088 = local_b5a0 * (float)uStack_3fe8;
          local_10c0._0_4_ = (float)local_8f20;
          local_10c0._4_4_ = (float)((ulong)local_8f20 >> 0x20);
          uStack_10b8._0_4_ = (float)uStack_8f18;
          uStack_10b8._4_4_ = (float)((ulong)uStack_8f18 >> 0x20);
          uStack_10b0._0_4_ = (float)uStack_8f10;
          uStack_10b0._4_4_ = (float)((ulong)uStack_8f10 >> 0x20);
          uStack_10a8._0_4_ = (float)uStack_8f08;
          uStack_10a8._4_4_ = (float)((ulong)uStack_8f08 >> 0x20);
          local_8f80 = CONCAT44(fStack_109c + local_10c0._4_4_,local_10a0 + (float)local_10c0);
          uStack_8f78 = CONCAT44(fStack_1094 + uStack_10b8._4_4_,fStack_1098 + (float)uStack_10b8);
          uStack_8f70 = CONCAT44(fStack_108c + uStack_10b0._4_4_,fStack_1090 + (float)uStack_10b0);
          uStack_8f68 = CONCAT44(local_b5a0 + uStack_10a8._4_4_,fStack_1088 + (float)uStack_10a8);
          local_1060 = local_b5e0 * (float)local_3fc0;
          fStack_105c = local_b5e0 * local_3fc0._4_4_;
          fStack_1058 = local_b5e0 * (float)uStack_3fb8;
          fStack_1054 = local_b5e0 * uStack_3fb8._4_4_;
          fStack_1050 = local_b5e0 * (float)uStack_3fb0;
          fStack_104c = local_b5e0 * uStack_3fb0._4_4_;
          fStack_1048 = local_b5e0 * (float)uStack_3fa8;
          fVar76 = local_1060 + local_10a0 + (float)local_10c0;
          fVar80 = fStack_105c + fStack_109c + local_10c0._4_4_;
          fVar81 = fStack_1058 + fStack_1098 + (float)uStack_10b8;
          fVar82 = fStack_1054 + fStack_1094 + uStack_10b8._4_4_;
          fVar83 = fStack_1050 + fStack_1090 + (float)uStack_10b0;
          fVar84 = fStack_104c + fStack_108c + uStack_10b0._4_4_;
          fVar85 = fStack_1048 + fStack_1088 + (float)uStack_10a8;
          fVar86 = local_b5e0 + local_b5a0 + uStack_10a8._4_4_;
          local_8fe0 = CONCAT44(fVar80,fVar76);
          uStack_8fd8 = CONCAT44(fVar82,fVar81);
          uStack_8fd0 = CONCAT44(fVar84,fVar83);
          uStack_8fc8 = CONCAT44(fVar86,fVar85);
          local_1020 = local_b620 * (float)local_3f80;
          fStack_101c = local_b620 * local_3f80._4_4_;
          fStack_1018 = local_b620 * (float)uStack_3f78;
          fStack_1014 = local_b620 * uStack_3f78._4_4_;
          fStack_1010 = local_b620 * (float)uStack_3f70;
          fStack_100c = local_b620 * uStack_3f70._4_4_;
          fStack_1008 = local_b620 * (float)uStack_3f68;
          fVar76 = local_1020 + fVar76;
          fVar80 = fStack_101c + fVar80;
          fVar81 = fStack_1018 + fVar81;
          fVar82 = fStack_1014 + fVar82;
          fVar83 = fStack_1010 + fVar83;
          fVar84 = fStack_100c + fVar84;
          fVar85 = fStack_1008 + fVar85;
          fVar86 = local_b620 + fVar86;
          local_9040 = CONCAT44(fVar80,fVar76);
          uStack_9038 = CONCAT44(fVar82,fVar81);
          uStack_9030 = CONCAT44(fVar84,fVar83);
          uStack_9028 = CONCAT44(fVar86,fVar85);
          local_fe0 = local_b660 * (float)local_3f40;
          fStack_fdc = local_b660 * local_3f40._4_4_;
          fStack_fd8 = local_b660 * (float)uStack_3f38;
          fStack_fd4 = local_b660 * uStack_3f38._4_4_;
          fStack_fd0 = local_b660 * (float)uStack_3f30;
          fStack_fcc = local_b660 * uStack_3f30._4_4_;
          fStack_fc8 = local_b660 * (float)uStack_3f28;
          fVar76 = local_fe0 + fVar76;
          fVar80 = fStack_fdc + fVar80;
          fVar81 = fStack_fd8 + fVar81;
          fVar82 = fStack_fd4 + fVar82;
          fVar83 = fStack_fd0 + fVar83;
          fVar84 = fStack_fcc + fVar84;
          fVar85 = fStack_fc8 + fVar85;
          fVar86 = local_b660 + fVar86;
          local_90a0 = CONCAT44(fVar80,fVar76);
          uStack_9098 = CONCAT44(fVar82,fVar81);
          uStack_9090 = CONCAT44(fVar84,fVar83);
          uStack_9088 = CONCAT44(fVar86,fVar85);
          local_fa0 = local_b6a0 * (float)local_3f00;
          fStack_f9c = local_b6a0 * local_3f00._4_4_;
          fStack_f98 = local_b6a0 * (float)uStack_3ef8;
          fStack_f94 = local_b6a0 * uStack_3ef8._4_4_;
          fStack_f90 = local_b6a0 * (float)uStack_3ef0;
          fStack_f8c = local_b6a0 * uStack_3ef0._4_4_;
          fStack_f88 = local_b6a0 * (float)uStack_3ee8;
          fVar76 = local_fa0 + fVar76;
          fVar80 = fStack_f9c + fVar80;
          fVar81 = fStack_f98 + fVar81;
          fVar82 = fStack_f94 + fVar82;
          fVar83 = fStack_f90 + fVar83;
          fVar84 = fStack_f8c + fVar84;
          fVar85 = fStack_f88 + fVar85;
          fVar86 = local_b6a0 + fVar86;
          local_9100 = CONCAT44(fVar80,fVar76);
          uStack_90f8 = CONCAT44(fVar82,fVar81);
          uStack_90f0 = CONCAT44(fVar84,fVar83);
          uStack_90e8 = CONCAT44(fVar86,fVar85);
          local_f60 = local_b6e0 * (float)local_3ec0;
          fStack_f5c = local_b6e0 * local_3ec0._4_4_;
          fStack_f58 = local_b6e0 * (float)uStack_3eb8;
          fStack_f54 = local_b6e0 * uStack_3eb8._4_4_;
          fStack_f50 = local_b6e0 * (float)uStack_3eb0;
          fStack_f4c = local_b6e0 * uStack_3eb0._4_4_;
          fStack_f48 = local_b6e0 * (float)uStack_3ea8;
          fVar76 = local_f60 + fVar76;
          fVar80 = fStack_f5c + fVar80;
          fVar81 = fStack_f58 + fVar81;
          fVar82 = fStack_f54 + fVar82;
          fVar83 = fStack_f50 + fVar83;
          fVar84 = fStack_f4c + fVar84;
          fVar85 = fStack_f48 + fVar85;
          fVar86 = local_b6e0 + fVar86;
          local_9160 = CONCAT44(fVar80,fVar76);
          uStack_9158 = CONCAT44(fVar82,fVar81);
          uStack_9150 = CONCAT44(fVar84,fVar83);
          uStack_9148 = CONCAT44(fVar86,fVar85);
          local_f20 = local_b720 * (float)local_3e80;
          fStack_f1c = local_b720 * local_3e80._4_4_;
          fStack_f18 = local_b720 * (float)uStack_3e78;
          fStack_f14 = local_b720 * uStack_3e78._4_4_;
          fStack_f10 = local_b720 * (float)uStack_3e70;
          fStack_f0c = local_b720 * uStack_3e70._4_4_;
          fStack_f08 = local_b720 * (float)uStack_3e68;
          fVar76 = local_f20 + fVar76;
          fVar80 = fStack_f1c + fVar80;
          fVar81 = fStack_f18 + fVar81;
          fVar82 = fStack_f14 + fVar82;
          fVar83 = fStack_f10 + fVar83;
          fVar84 = fStack_f0c + fVar84;
          fVar85 = fStack_f08 + fVar85;
          fVar86 = local_b720 + fVar86;
          local_91c0 = CONCAT44(fVar80,fVar76);
          uStack_91b8 = CONCAT44(fVar82,fVar81);
          uStack_91b0 = CONCAT44(fVar84,fVar83);
          uStack_91a8 = CONCAT44(fVar86,fVar85);
          local_ee0 = local_b760 * (float)local_3e40;
          fStack_edc = local_b760 * local_3e40._4_4_;
          fStack_ed8 = local_b760 * (float)uStack_3e38;
          fStack_ed4 = local_b760 * uStack_3e38._4_4_;
          fStack_ed0 = local_b760 * (float)uStack_3e30;
          fStack_ecc = local_b760 * uStack_3e30._4_4_;
          fStack_ec8 = local_b760 * (float)uStack_3e28;
          fVar76 = local_ee0 + fVar76;
          fVar80 = fStack_edc + fVar80;
          fVar81 = fStack_ed8 + fVar81;
          fVar82 = fStack_ed4 + fVar82;
          fVar83 = fStack_ed0 + fVar83;
          fVar84 = fStack_ecc + fVar84;
          fVar85 = fStack_ec8 + fVar85;
          fVar86 = local_b760 + fVar86;
          local_9220 = CONCAT44(fVar80,fVar76);
          uStack_9218 = CONCAT44(fVar82,fVar81);
          uStack_9210 = CONCAT44(fVar84,fVar83);
          uStack_9208 = CONCAT44(fVar86,fVar85);
          local_ea0 = local_b7a0 * (float)local_3e00;
          fStack_e9c = local_b7a0 * local_3e00._4_4_;
          fStack_e98 = local_b7a0 * (float)uStack_3df8;
          fStack_e94 = local_b7a0 * uStack_3df8._4_4_;
          fStack_e90 = local_b7a0 * (float)uStack_3df0;
          fStack_e8c = local_b7a0 * uStack_3df0._4_4_;
          fStack_e88 = local_b7a0 * (float)uStack_3de8;
          local_aa20 = CONCAT44(fStack_e9c + fVar80,local_ea0 + fVar76);
          uStack_aa18 = CONCAT44(fStack_e94 + fVar82,fStack_e98 + fVar81);
          uStack_aa10 = CONCAT44(fStack_e8c + fVar84,fStack_e90 + fVar83);
          uStack_aa08 = CONCAT44(local_b7a0 + fVar86,fStack_e88 + fVar85);
          local_c090 = local_cd00 + 8;
          local_9280 = *(undefined8 *)local_c090;
          uStack_9278 = *(undefined8 *)(local_cd00 + 10);
          uStack_9270 = *(undefined8 *)(local_cd00 + 0xc);
          uStack_9268 = *(undefined8 *)(local_cd00 + 0xe);
          local_b7a8 = local_cd50 + 3;
          local_b7e0 = *local_b7a8;
          local_9900 = CONCAT44(local_b7e0,local_b7e0);
          uStack_98f8 = CONCAT44(local_b7e0,local_b7e0);
          uStack_98f0 = CONCAT44(local_b7e0,local_b7e0);
          uStack_98e8 = CONCAT44(local_b7e0,local_b7e0);
          local_b7e8 = local_cd58 + 3;
          local_b820 = *local_b7e8;
          local_9a20 = CONCAT44(local_b820,local_b820);
          uStack_9a18 = CONCAT44(local_b820,local_b820);
          uStack_9a10 = CONCAT44(local_b820,local_b820);
          uStack_9a08 = CONCAT44(local_b820,local_b820);
          local_b828 = local_cd60 + 3;
          local_b860 = *local_b828;
          local_9b40 = CONCAT44(local_b860,local_b860);
          uStack_9b38 = CONCAT44(local_b860,local_b860);
          uStack_9b30 = CONCAT44(local_b860,local_b860);
          uStack_9b28 = CONCAT44(local_b860,local_b860);
          local_a9e8 = local_cd00;
          *(undefined8 *)local_cd00 = local_aa20;
          *(undefined8 *)(local_cd00 + 2) = uStack_aa18;
          *(undefined8 *)(local_cd00 + 4) = uStack_aa10;
          *(undefined8 *)(local_cd00 + 6) = uStack_aa08;
          local_e60 = local_b5e0 * (float)local_4000;
          fStack_e5c = local_b5e0 * local_4000._4_4_;
          fStack_e58 = local_b5e0 * (float)uStack_3ff8;
          fStack_e54 = local_b5e0 * uStack_3ff8._4_4_;
          fStack_e50 = local_b5e0 * (float)uStack_3ff0;
          fStack_e4c = local_b5e0 * uStack_3ff0._4_4_;
          fStack_e48 = local_b5e0 * (float)uStack_3fe8;
          local_e80._0_4_ = (float)local_9280;
          local_e80._4_4_ = (float)((ulong)local_9280 >> 0x20);
          uStack_e78._0_4_ = (float)uStack_9278;
          uStack_e78._4_4_ = (float)((ulong)uStack_9278 >> 0x20);
          uStack_e70._0_4_ = (float)uStack_9270;
          uStack_e70._4_4_ = (float)((ulong)uStack_9270 >> 0x20);
          uStack_e68._0_4_ = (float)uStack_9268;
          uStack_e68._4_4_ = (float)((ulong)uStack_9268 >> 0x20);
          local_92e0 = CONCAT44(fStack_e5c + local_e80._4_4_,local_e60 + (float)local_e80);
          uStack_92d8 = CONCAT44(fStack_e54 + uStack_e78._4_4_,fStack_e58 + (float)uStack_e78);
          uStack_92d0 = CONCAT44(fStack_e4c + uStack_e70._4_4_,fStack_e50 + (float)uStack_e70);
          uStack_92c8 = CONCAT44(local_b5e0 + uStack_e68._4_4_,fStack_e48 + (float)uStack_e68);
          local_e20 = local_b620 * (float)local_3fc0;
          fStack_e1c = local_b620 * local_3fc0._4_4_;
          fStack_e18 = local_b620 * (float)uStack_3fb8;
          fStack_e14 = local_b620 * uStack_3fb8._4_4_;
          fStack_e10 = local_b620 * (float)uStack_3fb0;
          fStack_e0c = local_b620 * uStack_3fb0._4_4_;
          fStack_e08 = local_b620 * (float)uStack_3fa8;
          fVar76 = local_e20 + local_e60 + (float)local_e80;
          fVar80 = fStack_e1c + fStack_e5c + local_e80._4_4_;
          fVar81 = fStack_e18 + fStack_e58 + (float)uStack_e78;
          fVar82 = fStack_e14 + fStack_e54 + uStack_e78._4_4_;
          fVar83 = fStack_e10 + fStack_e50 + (float)uStack_e70;
          fVar84 = fStack_e0c + fStack_e4c + uStack_e70._4_4_;
          fVar85 = fStack_e08 + fStack_e48 + (float)uStack_e68;
          fVar86 = local_b620 + local_b5e0 + uStack_e68._4_4_;
          local_9340 = CONCAT44(fVar80,fVar76);
          uStack_9338 = CONCAT44(fVar82,fVar81);
          uStack_9330 = CONCAT44(fVar84,fVar83);
          uStack_9328 = CONCAT44(fVar86,fVar85);
          local_de0 = local_b7e0 * (float)local_3f80;
          fStack_ddc = local_b7e0 * local_3f80._4_4_;
          fStack_dd8 = local_b7e0 * (float)uStack_3f78;
          fStack_dd4 = local_b7e0 * uStack_3f78._4_4_;
          fStack_dd0 = local_b7e0 * (float)uStack_3f70;
          fStack_dcc = local_b7e0 * uStack_3f70._4_4_;
          fStack_dc8 = local_b7e0 * (float)uStack_3f68;
          fVar76 = local_de0 + fVar76;
          fVar80 = fStack_ddc + fVar80;
          fVar81 = fStack_dd8 + fVar81;
          fVar82 = fStack_dd4 + fVar82;
          fVar83 = fStack_dd0 + fVar83;
          fVar84 = fStack_dcc + fVar84;
          fVar85 = fStack_dc8 + fVar85;
          fVar86 = local_b7e0 + fVar86;
          local_93a0 = CONCAT44(fVar80,fVar76);
          uStack_9398 = CONCAT44(fVar82,fVar81);
          uStack_9390 = CONCAT44(fVar84,fVar83);
          uStack_9388 = CONCAT44(fVar86,fVar85);
          local_da0 = local_b6a0 * (float)local_3f40;
          fStack_d9c = local_b6a0 * local_3f40._4_4_;
          fStack_d98 = local_b6a0 * (float)uStack_3f38;
          fStack_d94 = local_b6a0 * uStack_3f38._4_4_;
          fStack_d90 = local_b6a0 * (float)uStack_3f30;
          fStack_d8c = local_b6a0 * uStack_3f30._4_4_;
          fStack_d88 = local_b6a0 * (float)uStack_3f28;
          fVar76 = local_da0 + fVar76;
          fVar80 = fStack_d9c + fVar80;
          fVar81 = fStack_d98 + fVar81;
          fVar82 = fStack_d94 + fVar82;
          fVar83 = fStack_d90 + fVar83;
          fVar84 = fStack_d8c + fVar84;
          fVar85 = fStack_d88 + fVar85;
          fVar86 = local_b6a0 + fVar86;
          local_9400 = CONCAT44(fVar80,fVar76);
          uStack_93f8 = CONCAT44(fVar82,fVar81);
          uStack_93f0 = CONCAT44(fVar84,fVar83);
          uStack_93e8 = CONCAT44(fVar86,fVar85);
          local_d60 = local_b6e0 * (float)local_3f00;
          fStack_d5c = local_b6e0 * local_3f00._4_4_;
          fStack_d58 = local_b6e0 * (float)uStack_3ef8;
          fStack_d54 = local_b6e0 * uStack_3ef8._4_4_;
          fStack_d50 = local_b6e0 * (float)uStack_3ef0;
          fStack_d4c = local_b6e0 * uStack_3ef0._4_4_;
          fStack_d48 = local_b6e0 * (float)uStack_3ee8;
          fVar76 = local_d60 + fVar76;
          fVar80 = fStack_d5c + fVar80;
          fVar81 = fStack_d58 + fVar81;
          fVar82 = fStack_d54 + fVar82;
          fVar83 = fStack_d50 + fVar83;
          fVar84 = fStack_d4c + fVar84;
          fVar85 = fStack_d48 + fVar85;
          fVar86 = local_b6e0 + fVar86;
          local_9460 = CONCAT44(fVar80,fVar76);
          uStack_9458 = CONCAT44(fVar82,fVar81);
          uStack_9450 = CONCAT44(fVar84,fVar83);
          uStack_9448 = CONCAT44(fVar86,fVar85);
          local_d20 = local_b820 * (float)local_3ec0;
          fStack_d1c = local_b820 * local_3ec0._4_4_;
          fStack_d18 = local_b820 * (float)uStack_3eb8;
          fStack_d14 = local_b820 * uStack_3eb8._4_4_;
          fStack_d10 = local_b820 * (float)uStack_3eb0;
          fStack_d0c = local_b820 * uStack_3eb0._4_4_;
          fStack_d08 = local_b820 * (float)uStack_3ea8;
          fVar76 = local_d20 + fVar76;
          fVar80 = fStack_d1c + fVar80;
          fVar81 = fStack_d18 + fVar81;
          fVar82 = fStack_d14 + fVar82;
          fVar83 = fStack_d10 + fVar83;
          fVar84 = fStack_d0c + fVar84;
          fVar85 = fStack_d08 + fVar85;
          fVar86 = local_b820 + fVar86;
          local_94c0 = CONCAT44(fVar80,fVar76);
          uStack_94b8 = CONCAT44(fVar82,fVar81);
          uStack_94b0 = CONCAT44(fVar84,fVar83);
          uStack_94a8 = CONCAT44(fVar86,fVar85);
          local_ce0 = local_b760 * (float)local_3e80;
          fStack_cdc = local_b760 * local_3e80._4_4_;
          fStack_cd8 = local_b760 * (float)uStack_3e78;
          fStack_cd4 = local_b760 * uStack_3e78._4_4_;
          fStack_cd0 = local_b760 * (float)uStack_3e70;
          fStack_ccc = local_b760 * uStack_3e70._4_4_;
          fStack_cc8 = local_b760 * (float)uStack_3e68;
          fVar76 = local_ce0 + fVar76;
          fVar80 = fStack_cdc + fVar80;
          fVar81 = fStack_cd8 + fVar81;
          fVar82 = fStack_cd4 + fVar82;
          fVar83 = fStack_cd0 + fVar83;
          fVar84 = fStack_ccc + fVar84;
          fVar85 = fStack_cc8 + fVar85;
          fVar86 = local_b760 + fVar86;
          local_9520 = CONCAT44(fVar80,fVar76);
          uStack_9518 = CONCAT44(fVar82,fVar81);
          uStack_9510 = CONCAT44(fVar84,fVar83);
          uStack_9508 = CONCAT44(fVar86,fVar85);
          local_ca0 = local_b7a0 * (float)local_3e40;
          fStack_c9c = local_b7a0 * local_3e40._4_4_;
          fStack_c98 = local_b7a0 * (float)uStack_3e38;
          fStack_c94 = local_b7a0 * uStack_3e38._4_4_;
          fStack_c90 = local_b7a0 * (float)uStack_3e30;
          fStack_c8c = local_b7a0 * uStack_3e30._4_4_;
          fStack_c88 = local_b7a0 * (float)uStack_3e28;
          fVar76 = local_ca0 + fVar76;
          fVar80 = fStack_c9c + fVar80;
          fVar81 = fStack_c98 + fVar81;
          fVar82 = fStack_c94 + fVar82;
          fVar83 = fStack_c90 + fVar83;
          fVar84 = fStack_c8c + fVar84;
          fVar85 = fStack_c88 + fVar85;
          fVar86 = local_b7a0 + fVar86;
          local_9580 = CONCAT44(fVar80,fVar76);
          uStack_9578 = CONCAT44(fVar82,fVar81);
          uStack_9570 = CONCAT44(fVar84,fVar83);
          uStack_9568 = CONCAT44(fVar86,fVar85);
          local_c60 = local_b860 * (float)local_3e00;
          fStack_c5c = local_b860 * local_3e00._4_4_;
          fStack_c58 = local_b860 * (float)uStack_3df8;
          fStack_c54 = local_b860 * uStack_3df8._4_4_;
          fStack_c50 = local_b860 * (float)uStack_3df0;
          fStack_c4c = local_b860 * uStack_3df0._4_4_;
          fStack_c48 = local_b860 * (float)uStack_3de8;
          local_aa60 = CONCAT44(fStack_c5c + fVar80,local_c60 + fVar76);
          uStack_aa58 = CONCAT44(fStack_c54 + fVar82,fStack_c58 + fVar81);
          uStack_aa50 = CONCAT44(fStack_c4c + fVar84,fStack_c50 + fVar83);
          uStack_aa48 = CONCAT44(local_b860 + fVar86,fStack_c48 + fVar85);
          local_c098 = local_cd00 + 0x10;
          local_95e0 = *(undefined8 *)local_c098;
          uStack_95d8 = *(undefined8 *)(local_cd00 + 0x12);
          uStack_95d0 = *(undefined8 *)(local_cd00 + 0x14);
          uStack_95c8 = *(undefined8 *)(local_cd00 + 0x16);
          local_b868 = local_cd50 + 4;
          local_b8a0 = *local_b868;
          local_9960 = CONCAT44(local_b8a0,local_b8a0);
          uStack_9958 = CONCAT44(local_b8a0,local_b8a0);
          uStack_9950 = CONCAT44(local_b8a0,local_b8a0);
          uStack_9948 = CONCAT44(local_b8a0,local_b8a0);
          local_b8a8 = local_cd58 + 4;
          local_b8e0 = *local_b8a8;
          local_9a80 = CONCAT44(local_b8e0,local_b8e0);
          uStack_9a78 = CONCAT44(local_b8e0,local_b8e0);
          uStack_9a70 = CONCAT44(local_b8e0,local_b8e0);
          uStack_9a68 = CONCAT44(local_b8e0,local_b8e0);
          local_b8e8 = local_cd60 + 4;
          local_b920 = *local_b8e8;
          local_9ba0 = CONCAT44(local_b920,local_b920);
          uStack_9b98 = CONCAT44(local_b920,local_b920);
          uStack_9b90 = CONCAT44(local_b920,local_b920);
          uStack_9b88 = CONCAT44(local_b920,local_b920);
          local_aa28 = local_cd00 + 8;
          *(undefined8 *)local_aa28 = local_aa60;
          *(undefined8 *)(local_cd00 + 10) = uStack_aa58;
          *(undefined8 *)(local_cd00 + 0xc) = uStack_aa50;
          *(undefined8 *)(local_cd00 + 0xe) = uStack_aa48;
          local_c20 = local_b620 * (float)local_4000;
          fStack_c1c = local_b620 * local_4000._4_4_;
          fStack_c18 = local_b620 * (float)uStack_3ff8;
          fStack_c14 = local_b620 * uStack_3ff8._4_4_;
          fStack_c10 = local_b620 * (float)uStack_3ff0;
          fStack_c0c = local_b620 * uStack_3ff0._4_4_;
          fStack_c08 = local_b620 * (float)uStack_3fe8;
          local_c40._0_4_ = (float)local_95e0;
          local_c40._4_4_ = (float)((ulong)local_95e0 >> 0x20);
          uStack_c38._0_4_ = (float)uStack_95d8;
          uStack_c38._4_4_ = (float)((ulong)uStack_95d8 >> 0x20);
          uStack_c30._0_4_ = (float)uStack_95d0;
          uStack_c30._4_4_ = (float)((ulong)uStack_95d0 >> 0x20);
          uStack_c28._0_4_ = (float)uStack_95c8;
          uStack_c28._4_4_ = (float)((ulong)uStack_95c8 >> 0x20);
          local_9640 = CONCAT44(fStack_c1c + local_c40._4_4_,local_c20 + (float)local_c40);
          uStack_9638 = CONCAT44(fStack_c14 + uStack_c38._4_4_,fStack_c18 + (float)uStack_c38);
          uStack_9630 = CONCAT44(fStack_c0c + uStack_c30._4_4_,fStack_c10 + (float)uStack_c30);
          uStack_9628 = CONCAT44(local_b620 + uStack_c28._4_4_,fStack_c08 + (float)uStack_c28);
          local_be0 = local_b7e0 * (float)local_3fc0;
          fStack_bdc = local_b7e0 * local_3fc0._4_4_;
          fStack_bd8 = local_b7e0 * (float)uStack_3fb8;
          fStack_bd4 = local_b7e0 * uStack_3fb8._4_4_;
          fStack_bd0 = local_b7e0 * (float)uStack_3fb0;
          fStack_bcc = local_b7e0 * uStack_3fb0._4_4_;
          fStack_bc8 = local_b7e0 * (float)uStack_3fa8;
          fVar76 = local_be0 + local_c20 + (float)local_c40;
          fVar80 = fStack_bdc + fStack_c1c + local_c40._4_4_;
          fVar81 = fStack_bd8 + fStack_c18 + (float)uStack_c38;
          fVar82 = fStack_bd4 + fStack_c14 + uStack_c38._4_4_;
          fVar83 = fStack_bd0 + fStack_c10 + (float)uStack_c30;
          fVar84 = fStack_bcc + fStack_c0c + uStack_c30._4_4_;
          fVar85 = fStack_bc8 + fStack_c08 + (float)uStack_c28;
          fVar86 = local_b7e0 + local_b620 + uStack_c28._4_4_;
          local_96a0 = CONCAT44(fVar80,fVar76);
          uStack_9698 = CONCAT44(fVar82,fVar81);
          uStack_9690 = CONCAT44(fVar84,fVar83);
          uStack_9688 = CONCAT44(fVar86,fVar85);
          local_ba0 = local_b8a0 * (float)local_3f80;
          fStack_b9c = local_b8a0 * local_3f80._4_4_;
          fStack_b98 = local_b8a0 * (float)uStack_3f78;
          fStack_b94 = local_b8a0 * uStack_3f78._4_4_;
          fStack_b90 = local_b8a0 * (float)uStack_3f70;
          fStack_b8c = local_b8a0 * uStack_3f70._4_4_;
          fStack_b88 = local_b8a0 * (float)uStack_3f68;
          fVar76 = local_ba0 + fVar76;
          fVar80 = fStack_b9c + fVar80;
          fVar81 = fStack_b98 + fVar81;
          fVar82 = fStack_b94 + fVar82;
          fVar83 = fStack_b90 + fVar83;
          fVar84 = fStack_b8c + fVar84;
          fVar85 = fStack_b88 + fVar85;
          fVar86 = local_b8a0 + fVar86;
          local_9700 = CONCAT44(fVar80,fVar76);
          uStack_96f8 = CONCAT44(fVar82,fVar81);
          uStack_96f0 = CONCAT44(fVar84,fVar83);
          uStack_96e8 = CONCAT44(fVar86,fVar85);
          local_b60 = local_b6e0 * (float)local_3f40;
          fStack_b5c = local_b6e0 * local_3f40._4_4_;
          fStack_b58 = local_b6e0 * (float)uStack_3f38;
          fStack_b54 = local_b6e0 * uStack_3f38._4_4_;
          fStack_b50 = local_b6e0 * (float)uStack_3f30;
          fStack_b4c = local_b6e0 * uStack_3f30._4_4_;
          fStack_b48 = local_b6e0 * (float)uStack_3f28;
          fVar76 = local_b60 + fVar76;
          fVar80 = fStack_b5c + fVar80;
          fVar81 = fStack_b58 + fVar81;
          fVar82 = fStack_b54 + fVar82;
          fVar83 = fStack_b50 + fVar83;
          fVar84 = fStack_b4c + fVar84;
          fVar85 = fStack_b48 + fVar85;
          fVar86 = local_b6e0 + fVar86;
          local_9760 = CONCAT44(fVar80,fVar76);
          uStack_9758 = CONCAT44(fVar82,fVar81);
          uStack_9750 = CONCAT44(fVar84,fVar83);
          uStack_9748 = CONCAT44(fVar86,fVar85);
          local_b20 = local_b820 * (float)local_3f00;
          fStack_b1c = local_b820 * local_3f00._4_4_;
          fStack_b18 = local_b820 * (float)uStack_3ef8;
          fStack_b14 = local_b820 * uStack_3ef8._4_4_;
          fStack_b10 = local_b820 * (float)uStack_3ef0;
          fStack_b0c = local_b820 * uStack_3ef0._4_4_;
          fStack_b08 = local_b820 * (float)uStack_3ee8;
          fVar76 = local_b20 + fVar76;
          fVar80 = fStack_b1c + fVar80;
          fVar81 = fStack_b18 + fVar81;
          fVar82 = fStack_b14 + fVar82;
          fVar83 = fStack_b10 + fVar83;
          fVar84 = fStack_b0c + fVar84;
          fVar85 = fStack_b08 + fVar85;
          fVar86 = local_b820 + fVar86;
          local_97c0 = CONCAT44(fVar80,fVar76);
          uStack_97b8 = CONCAT44(fVar82,fVar81);
          uStack_97b0 = CONCAT44(fVar84,fVar83);
          uStack_97a8 = CONCAT44(fVar86,fVar85);
          local_ae0 = local_b8e0 * (float)local_3ec0;
          fStack_adc = local_b8e0 * local_3ec0._4_4_;
          fStack_ad8 = local_b8e0 * (float)uStack_3eb8;
          fStack_ad4 = local_b8e0 * uStack_3eb8._4_4_;
          fStack_ad0 = local_b8e0 * (float)uStack_3eb0;
          fStack_acc = local_b8e0 * uStack_3eb0._4_4_;
          fStack_ac8 = local_b8e0 * (float)uStack_3ea8;
          fVar76 = local_ae0 + fVar76;
          fVar80 = fStack_adc + fVar80;
          fVar81 = fStack_ad8 + fVar81;
          fVar82 = fStack_ad4 + fVar82;
          fVar83 = fStack_ad0 + fVar83;
          fVar84 = fStack_acc + fVar84;
          fVar85 = fStack_ac8 + fVar85;
          fVar86 = local_b8e0 + fVar86;
          local_9820 = CONCAT44(fVar80,fVar76);
          uStack_9818 = CONCAT44(fVar82,fVar81);
          uStack_9810 = CONCAT44(fVar84,fVar83);
          uStack_9808 = CONCAT44(fVar86,fVar85);
          local_aa0 = local_b7a0 * (float)local_3e80;
          fStack_a9c = local_b7a0 * local_3e80._4_4_;
          fStack_a98 = local_b7a0 * (float)uStack_3e78;
          fStack_a94 = local_b7a0 * uStack_3e78._4_4_;
          fStack_a90 = local_b7a0 * (float)uStack_3e70;
          fStack_a8c = local_b7a0 * uStack_3e70._4_4_;
          fStack_a88 = local_b7a0 * (float)uStack_3e68;
          fVar76 = local_aa0 + fVar76;
          fVar80 = fStack_a9c + fVar80;
          fVar81 = fStack_a98 + fVar81;
          fVar82 = fStack_a94 + fVar82;
          fVar83 = fStack_a90 + fVar83;
          fVar84 = fStack_a8c + fVar84;
          fVar85 = fStack_a88 + fVar85;
          fVar86 = local_b7a0 + fVar86;
          local_9880 = CONCAT44(fVar80,fVar76);
          uStack_9878 = CONCAT44(fVar82,fVar81);
          uStack_9870 = CONCAT44(fVar84,fVar83);
          uStack_9868 = CONCAT44(fVar86,fVar85);
          local_a60 = local_b860 * (float)local_3e40;
          fStack_a5c = local_b860 * local_3e40._4_4_;
          fStack_a58 = local_b860 * (float)uStack_3e38;
          fStack_a54 = local_b860 * uStack_3e38._4_4_;
          fStack_a50 = local_b860 * (float)uStack_3e30;
          fStack_a4c = local_b860 * uStack_3e30._4_4_;
          fStack_a48 = local_b860 * (float)uStack_3e28;
          fVar76 = local_a60 + fVar76;
          fVar80 = fStack_a5c + fVar80;
          fVar81 = fStack_a58 + fVar81;
          fVar82 = fStack_a54 + fVar82;
          fVar83 = fStack_a50 + fVar83;
          fVar84 = fStack_a4c + fVar84;
          fVar85 = fStack_a48 + fVar85;
          fVar86 = local_b860 + fVar86;
          local_98e0 = CONCAT44(fVar80,fVar76);
          uStack_98d8 = CONCAT44(fVar82,fVar81);
          uStack_98d0 = CONCAT44(fVar84,fVar83);
          uStack_98c8 = CONCAT44(fVar86,fVar85);
          local_a20 = local_b920 * (float)local_3e00;
          fStack_a1c = local_b920 * local_3e00._4_4_;
          fStack_a18 = local_b920 * (float)uStack_3df8;
          fStack_a14 = local_b920 * uStack_3df8._4_4_;
          fStack_a10 = local_b920 * (float)uStack_3df0;
          fStack_a0c = local_b920 * uStack_3df0._4_4_;
          fStack_a08 = local_b920 * (float)uStack_3de8;
          local_aaa0 = CONCAT44(fStack_a1c + fVar80,local_a20 + fVar76);
          uStack_aa98 = CONCAT44(fStack_a14 + fVar82,fStack_a18 + fVar81);
          uStack_aa90 = CONCAT44(fStack_a0c + fVar84,fStack_a10 + fVar83);
          uStack_aa88 = CONCAT44(local_b920 + fVar86,fStack_a08 + fVar85);
          local_c0a0 = local_cd00 + 0x18;
          local_9940 = *(undefined8 *)local_c0a0;
          uStack_9938 = *(undefined8 *)(local_cd00 + 0x1a);
          uStack_9930 = *(undefined8 *)(local_cd00 + 0x1c);
          uStack_9928 = *(undefined8 *)(local_cd00 + 0x1e);
          local_b928 = local_cd50 + 5;
          local_b960 = *local_b928;
          local_99c0 = CONCAT44(local_b960,local_b960);
          uStack_99b8 = CONCAT44(local_b960,local_b960);
          uStack_99b0 = CONCAT44(local_b960,local_b960);
          uStack_99a8 = CONCAT44(local_b960,local_b960);
          local_b968 = local_cd58 + 5;
          local_b9a0 = *local_b968;
          local_9ae0 = CONCAT44(local_b9a0,local_b9a0);
          uStack_9ad8 = CONCAT44(local_b9a0,local_b9a0);
          uStack_9ad0 = CONCAT44(local_b9a0,local_b9a0);
          uStack_9ac8 = CONCAT44(local_b9a0,local_b9a0);
          local_b9a8 = local_cd60 + 5;
          local_b9e0 = *local_b9a8;
          local_9c00 = CONCAT44(local_b9e0,local_b9e0);
          uStack_9bf8 = CONCAT44(local_b9e0,local_b9e0);
          uStack_9bf0 = CONCAT44(local_b9e0,local_b9e0);
          uStack_9be8 = CONCAT44(local_b9e0,local_b9e0);
          local_aa68 = local_cd00 + 0x10;
          *(undefined8 *)local_aa68 = local_aaa0;
          *(undefined8 *)(local_cd00 + 0x12) = uStack_aa98;
          *(undefined8 *)(local_cd00 + 0x14) = uStack_aa90;
          *(undefined8 *)(local_cd00 + 0x16) = uStack_aa88;
          local_9e0 = local_b7e0 * (float)local_4000;
          fStack_9dc = local_b7e0 * local_4000._4_4_;
          fStack_9d8 = local_b7e0 * (float)uStack_3ff8;
          fStack_9d4 = local_b7e0 * uStack_3ff8._4_4_;
          fStack_9d0 = local_b7e0 * (float)uStack_3ff0;
          fStack_9cc = local_b7e0 * uStack_3ff0._4_4_;
          fStack_9c8 = local_b7e0 * (float)uStack_3fe8;
          local_a00._0_4_ = (float)local_9940;
          local_a00._4_4_ = (float)((ulong)local_9940 >> 0x20);
          uStack_9f8._0_4_ = (float)uStack_9938;
          uStack_9f8._4_4_ = (float)((ulong)uStack_9938 >> 0x20);
          uStack_9f0._0_4_ = (float)uStack_9930;
          uStack_9f0._4_4_ = (float)((ulong)uStack_9930 >> 0x20);
          uStack_9e8._0_4_ = (float)uStack_9928;
          uStack_9e8._4_4_ = (float)((ulong)uStack_9928 >> 0x20);
          local_99a0 = CONCAT44(fStack_9dc + local_a00._4_4_,local_9e0 + (float)local_a00);
          uStack_9998 = CONCAT44(fStack_9d4 + uStack_9f8._4_4_,fStack_9d8 + (float)uStack_9f8);
          uStack_9990 = CONCAT44(fStack_9cc + uStack_9f0._4_4_,fStack_9d0 + (float)uStack_9f0);
          uStack_9988 = CONCAT44(local_b7e0 + uStack_9e8._4_4_,fStack_9c8 + (float)uStack_9e8);
          local_9a0 = local_b8a0 * (float)local_3fc0;
          fStack_99c = local_b8a0 * local_3fc0._4_4_;
          fStack_998 = local_b8a0 * (float)uStack_3fb8;
          fStack_994 = local_b8a0 * uStack_3fb8._4_4_;
          fStack_990 = local_b8a0 * (float)uStack_3fb0;
          fStack_98c = local_b8a0 * uStack_3fb0._4_4_;
          fStack_988 = local_b8a0 * (float)uStack_3fa8;
          fVar76 = local_9a0 + local_9e0 + (float)local_a00;
          fVar80 = fStack_99c + fStack_9dc + local_a00._4_4_;
          fVar81 = fStack_998 + fStack_9d8 + (float)uStack_9f8;
          fVar82 = fStack_994 + fStack_9d4 + uStack_9f8._4_4_;
          fVar83 = fStack_990 + fStack_9d0 + (float)uStack_9f0;
          fVar84 = fStack_98c + fStack_9cc + uStack_9f0._4_4_;
          fVar85 = fStack_988 + fStack_9c8 + (float)uStack_9e8;
          fVar86 = local_b8a0 + local_b7e0 + uStack_9e8._4_4_;
          local_9a00 = CONCAT44(fVar80,fVar76);
          uStack_99f8 = CONCAT44(fVar82,fVar81);
          uStack_99f0 = CONCAT44(fVar84,fVar83);
          uStack_99e8 = CONCAT44(fVar86,fVar85);
          local_960 = local_b960 * (float)local_3f80;
          fStack_95c = local_b960 * local_3f80._4_4_;
          fStack_958 = local_b960 * (float)uStack_3f78;
          fStack_954 = local_b960 * uStack_3f78._4_4_;
          fStack_950 = local_b960 * (float)uStack_3f70;
          fStack_94c = local_b960 * uStack_3f70._4_4_;
          fStack_948 = local_b960 * (float)uStack_3f68;
          fVar76 = local_960 + fVar76;
          fVar80 = fStack_95c + fVar80;
          fVar81 = fStack_958 + fVar81;
          fVar82 = fStack_954 + fVar82;
          fVar83 = fStack_950 + fVar83;
          fVar84 = fStack_94c + fVar84;
          fVar85 = fStack_948 + fVar85;
          fVar86 = local_b960 + fVar86;
          local_9a60 = CONCAT44(fVar80,fVar76);
          uStack_9a58 = CONCAT44(fVar82,fVar81);
          uStack_9a50 = CONCAT44(fVar84,fVar83);
          uStack_9a48 = CONCAT44(fVar86,fVar85);
          local_920 = local_b820 * (float)local_3f40;
          fStack_91c = local_b820 * local_3f40._4_4_;
          fStack_918 = local_b820 * (float)uStack_3f38;
          fStack_914 = local_b820 * uStack_3f38._4_4_;
          fStack_910 = local_b820 * (float)uStack_3f30;
          fStack_90c = local_b820 * uStack_3f30._4_4_;
          fStack_908 = local_b820 * (float)uStack_3f28;
          fVar76 = local_920 + fVar76;
          fVar80 = fStack_91c + fVar80;
          fVar81 = fStack_918 + fVar81;
          fVar82 = fStack_914 + fVar82;
          fVar83 = fStack_910 + fVar83;
          fVar84 = fStack_90c + fVar84;
          fVar85 = fStack_908 + fVar85;
          fVar86 = local_b820 + fVar86;
          local_9ac0 = CONCAT44(fVar80,fVar76);
          uStack_9ab8 = CONCAT44(fVar82,fVar81);
          uStack_9ab0 = CONCAT44(fVar84,fVar83);
          uStack_9aa8 = CONCAT44(fVar86,fVar85);
          local_8e0 = local_b8e0 * (float)local_3f00;
          fStack_8dc = local_b8e0 * local_3f00._4_4_;
          fStack_8d8 = local_b8e0 * (float)uStack_3ef8;
          fStack_8d4 = local_b8e0 * uStack_3ef8._4_4_;
          fStack_8d0 = local_b8e0 * (float)uStack_3ef0;
          fStack_8cc = local_b8e0 * uStack_3ef0._4_4_;
          fStack_8c8 = local_b8e0 * (float)uStack_3ee8;
          fVar76 = local_8e0 + fVar76;
          fVar80 = fStack_8dc + fVar80;
          fVar81 = fStack_8d8 + fVar81;
          fVar82 = fStack_8d4 + fVar82;
          fVar83 = fStack_8d0 + fVar83;
          fVar84 = fStack_8cc + fVar84;
          fVar85 = fStack_8c8 + fVar85;
          fVar86 = local_b8e0 + fVar86;
          local_9b20 = CONCAT44(fVar80,fVar76);
          uStack_9b18 = CONCAT44(fVar82,fVar81);
          uStack_9b10 = CONCAT44(fVar84,fVar83);
          uStack_9b08 = CONCAT44(fVar86,fVar85);
          local_8a0 = local_b9a0 * (float)local_3ec0;
          fStack_89c = local_b9a0 * local_3ec0._4_4_;
          fStack_898 = local_b9a0 * (float)uStack_3eb8;
          fStack_894 = local_b9a0 * uStack_3eb8._4_4_;
          fStack_890 = local_b9a0 * (float)uStack_3eb0;
          fStack_88c = local_b9a0 * uStack_3eb0._4_4_;
          fStack_888 = local_b9a0 * (float)uStack_3ea8;
          fVar76 = local_8a0 + fVar76;
          fVar80 = fStack_89c + fVar80;
          fVar81 = fStack_898 + fVar81;
          fVar82 = fStack_894 + fVar82;
          fVar83 = fStack_890 + fVar83;
          fVar84 = fStack_88c + fVar84;
          fVar85 = fStack_888 + fVar85;
          fVar86 = local_b9a0 + fVar86;
          local_9b80 = CONCAT44(fVar80,fVar76);
          uStack_9b78 = CONCAT44(fVar82,fVar81);
          uStack_9b70 = CONCAT44(fVar84,fVar83);
          uStack_9b68 = CONCAT44(fVar86,fVar85);
          local_860 = local_b860 * (float)local_3e80;
          fStack_85c = local_b860 * local_3e80._4_4_;
          fStack_858 = local_b860 * (float)uStack_3e78;
          fStack_854 = local_b860 * uStack_3e78._4_4_;
          fStack_850 = local_b860 * (float)uStack_3e70;
          fStack_84c = local_b860 * uStack_3e70._4_4_;
          fStack_848 = local_b860 * (float)uStack_3e68;
          fVar76 = local_860 + fVar76;
          fVar80 = fStack_85c + fVar80;
          fVar81 = fStack_858 + fVar81;
          fVar82 = fStack_854 + fVar82;
          fVar83 = fStack_850 + fVar83;
          fVar84 = fStack_84c + fVar84;
          fVar85 = fStack_848 + fVar85;
          fVar86 = local_b860 + fVar86;
          local_9be0 = CONCAT44(fVar80,fVar76);
          uStack_9bd8 = CONCAT44(fVar82,fVar81);
          uStack_9bd0 = CONCAT44(fVar84,fVar83);
          uStack_9bc8 = CONCAT44(fVar86,fVar85);
          local_820 = local_b920 * (float)local_3e40;
          fStack_81c = local_b920 * local_3e40._4_4_;
          fStack_818 = local_b920 * (float)uStack_3e38;
          fStack_814 = local_b920 * uStack_3e38._4_4_;
          fStack_810 = local_b920 * (float)uStack_3e30;
          fStack_80c = local_b920 * uStack_3e30._4_4_;
          fStack_808 = local_b920 * (float)uStack_3e28;
          fVar76 = local_820 + fVar76;
          fVar80 = fStack_81c + fVar80;
          fVar81 = fStack_818 + fVar81;
          fVar82 = fStack_814 + fVar82;
          fVar83 = fStack_810 + fVar83;
          fVar84 = fStack_80c + fVar84;
          fVar85 = fStack_808 + fVar85;
          fVar86 = local_b920 + fVar86;
          local_9c40 = CONCAT44(fVar80,fVar76);
          uStack_9c38 = CONCAT44(fVar82,fVar81);
          uStack_9c30 = CONCAT44(fVar84,fVar83);
          uStack_9c28 = CONCAT44(fVar86,fVar85);
          local_7e0 = local_b9e0 * (float)local_3e00;
          fStack_7dc = local_b9e0 * local_3e00._4_4_;
          fStack_7d8 = local_b9e0 * (float)uStack_3df8;
          fStack_7d4 = local_b9e0 * uStack_3df8._4_4_;
          fStack_7d0 = local_b9e0 * (float)uStack_3df0;
          fStack_7cc = local_b9e0 * uStack_3df0._4_4_;
          fStack_7c8 = local_b9e0 * (float)uStack_3de8;
          local_aae0 = CONCAT44(fStack_7dc + fVar80,local_7e0 + fVar76);
          uStack_aad8 = CONCAT44(fStack_7d4 + fVar82,fStack_7d8 + fVar81);
          uStack_aad0 = CONCAT44(fStack_7cc + fVar84,fStack_7d0 + fVar83);
          uStack_aac8 = CONCAT44(local_b9e0 + fVar86,fStack_7c8 + fVar85);
          local_aaa8 = local_cd00 + 0x18;
          *(undefined8 *)local_aaa8 = local_aae0;
          *(undefined8 *)(local_cd00 + 0x1a) = uStack_aad8;
          *(undefined8 *)(local_cd00 + 0x1c) = uStack_aad0;
          *(undefined8 *)(local_cd00 + 0x1e) = uStack_aac8;
          local_cd50 = local_cd50 + 4;
          local_cd58 = local_cd58 + 4;
          local_cd60 = local_cd60 + 4;
          local_cd00 = local_cd00 + 0x20;
          local_ce88 = local_ce88 + 4;
          fStack_b9dc = local_b9e0;
          fStack_b9d8 = local_b9e0;
          fStack_b9d4 = local_b9e0;
          fStack_b9d0 = local_b9e0;
          fStack_b9cc = local_b9e0;
          fStack_b9c8 = local_b9e0;
          fStack_b9c4 = local_b9e0;
          local_b9ac = local_b9e0;
          fStack_b99c = local_b9a0;
          fStack_b998 = local_b9a0;
          fStack_b994 = local_b9a0;
          fStack_b990 = local_b9a0;
          fStack_b98c = local_b9a0;
          fStack_b988 = local_b9a0;
          fStack_b984 = local_b9a0;
          local_b96c = local_b9a0;
          fStack_b95c = local_b960;
          fStack_b958 = local_b960;
          fStack_b954 = local_b960;
          fStack_b950 = local_b960;
          fStack_b94c = local_b960;
          fStack_b948 = local_b960;
          fStack_b944 = local_b960;
          local_b92c = local_b960;
          fStack_b91c = local_b920;
          fStack_b918 = local_b920;
          fStack_b914 = local_b920;
          fStack_b910 = local_b920;
          fStack_b90c = local_b920;
          fStack_b908 = local_b920;
          fStack_b904 = local_b920;
          local_b8ec = local_b920;
          fStack_b8dc = local_b8e0;
          fStack_b8d8 = local_b8e0;
          fStack_b8d4 = local_b8e0;
          fStack_b8d0 = local_b8e0;
          fStack_b8cc = local_b8e0;
          fStack_b8c8 = local_b8e0;
          fStack_b8c4 = local_b8e0;
          local_b8ac = local_b8e0;
          fStack_b89c = local_b8a0;
          fStack_b898 = local_b8a0;
          fStack_b894 = local_b8a0;
          fStack_b890 = local_b8a0;
          fStack_b88c = local_b8a0;
          fStack_b888 = local_b8a0;
          fStack_b884 = local_b8a0;
          local_b86c = local_b8a0;
          fStack_b85c = local_b860;
          fStack_b858 = local_b860;
          fStack_b854 = local_b860;
          fStack_b850 = local_b860;
          fStack_b84c = local_b860;
          fStack_b848 = local_b860;
          fStack_b844 = local_b860;
          local_b82c = local_b860;
          fStack_b81c = local_b820;
          fStack_b818 = local_b820;
          fStack_b814 = local_b820;
          fStack_b810 = local_b820;
          fStack_b80c = local_b820;
          fStack_b808 = local_b820;
          fStack_b804 = local_b820;
          local_b7ec = local_b820;
          fStack_b7dc = local_b7e0;
          fStack_b7d8 = local_b7e0;
          fStack_b7d4 = local_b7e0;
          fStack_b7d0 = local_b7e0;
          fStack_b7cc = local_b7e0;
          fStack_b7c8 = local_b7e0;
          fStack_b7c4 = local_b7e0;
          local_b7ac = local_b7e0;
          fStack_b79c = local_b7a0;
          fStack_b798 = local_b7a0;
          fStack_b794 = local_b7a0;
          fStack_b790 = local_b7a0;
          fStack_b78c = local_b7a0;
          fStack_b788 = local_b7a0;
          fStack_b784 = local_b7a0;
          local_b76c = local_b7a0;
          fStack_b75c = local_b760;
          fStack_b758 = local_b760;
          fStack_b754 = local_b760;
          fStack_b750 = local_b760;
          fStack_b74c = local_b760;
          fStack_b748 = local_b760;
          fStack_b744 = local_b760;
          local_b72c = local_b760;
          fStack_b71c = local_b720;
          fStack_b718 = local_b720;
          fStack_b714 = local_b720;
          fStack_b710 = local_b720;
          fStack_b70c = local_b720;
          fStack_b708 = local_b720;
          fStack_b704 = local_b720;
          local_b6ec = local_b720;
          fStack_b6dc = local_b6e0;
          fStack_b6d8 = local_b6e0;
          fStack_b6d4 = local_b6e0;
          fStack_b6d0 = local_b6e0;
          fStack_b6cc = local_b6e0;
          fStack_b6c8 = local_b6e0;
          fStack_b6c4 = local_b6e0;
          local_b6ac = local_b6e0;
          fStack_b69c = local_b6a0;
          fStack_b698 = local_b6a0;
          fStack_b694 = local_b6a0;
          fStack_b690 = local_b6a0;
          fStack_b68c = local_b6a0;
          fStack_b688 = local_b6a0;
          fStack_b684 = local_b6a0;
          local_b66c = local_b6a0;
          fStack_b65c = local_b660;
          fStack_b658 = local_b660;
          fStack_b654 = local_b660;
          fStack_b650 = local_b660;
          fStack_b64c = local_b660;
          fStack_b648 = local_b660;
          fStack_b644 = local_b660;
          local_b62c = local_b660;
          fStack_b61c = local_b620;
          fStack_b618 = local_b620;
          fStack_b614 = local_b620;
          fStack_b610 = local_b620;
          fStack_b60c = local_b620;
          fStack_b608 = local_b620;
          fStack_b604 = local_b620;
          local_b5ec = local_b620;
          fStack_b5dc = local_b5e0;
          fStack_b5d8 = local_b5e0;
          fStack_b5d4 = local_b5e0;
          fStack_b5d0 = local_b5e0;
          fStack_b5cc = local_b5e0;
          fStack_b5c8 = local_b5e0;
          fStack_b5c4 = local_b5e0;
          local_b5ac = local_b5e0;
          fStack_b59c = local_b5a0;
          fStack_b598 = local_b5a0;
          fStack_b594 = local_b5a0;
          fStack_b590 = local_b5a0;
          fStack_b58c = local_b5a0;
          fStack_b588 = local_b5a0;
          fStack_b584 = local_b5a0;
          local_b56c = local_b5a0;
          local_9c20 = uVar35;
          uStack_9c18 = uVar36;
          uStack_9c10 = uVar37;
          uStack_9c08 = uVar38;
          local_9bc0 = uVar31;
          uStack_9bb8 = uVar32;
          uStack_9bb0 = uVar33;
          uStack_9ba8 = uVar34;
          local_9b60 = uVar27;
          uStack_9b58 = uVar28;
          uStack_9b50 = uVar29;
          uStack_9b48 = uVar30;
          local_9b00 = uVar23;
          uStack_9af8 = uVar24;
          uStack_9af0 = uVar25;
          uStack_9ae8 = uVar26;
          local_9aa0 = uVar19;
          uStack_9a98 = uVar20;
          uStack_9a90 = uVar21;
          uStack_9a88 = uVar22;
          local_9a40 = uVar15;
          uStack_9a38 = uVar16;
          uStack_9a30 = uVar17;
          uStack_9a28 = uVar18;
          local_99e0 = uVar11;
          uStack_99d8 = uVar12;
          uStack_99d0 = uVar13;
          uStack_99c8 = uVar14;
          local_9980 = uVar7;
          uStack_9978 = uVar8;
          uStack_9970 = uVar9;
          uStack_9968 = uVar10;
          local_9920 = uVar3;
          uStack_9918 = uVar4;
          uStack_9910 = uVar5;
          uStack_9908 = uVar6;
          local_98c0 = uVar35;
          uStack_98b8 = uVar36;
          uStack_98b0 = uVar37;
          uStack_98a8 = uVar38;
          local_98a0 = local_9ba0;
          uStack_9898 = uStack_9b98;
          uStack_9890 = uStack_9b90;
          uStack_9888 = uStack_9b88;
          local_9860 = uVar31;
          uStack_9858 = uVar32;
          uStack_9850 = uVar33;
          uStack_9848 = uVar34;
          local_9840 = local_9b40;
          uStack_9838 = uStack_9b38;
          uStack_9830 = uStack_9b30;
          uStack_9828 = uStack_9b28;
          local_9800 = uVar27;
          uStack_97f8 = uVar28;
          uStack_97f0 = uVar29;
          uStack_97e8 = uVar30;
          local_97a0 = uVar23;
          uStack_9798 = uVar24;
          uStack_9790 = uVar25;
          uStack_9788 = uVar26;
          local_9780 = local_9a80;
          uStack_9778 = uStack_9a78;
          uStack_9770 = uStack_9a70;
          uStack_9768 = uStack_9a68;
          local_9740 = uVar19;
          uStack_9738 = uVar20;
          uStack_9730 = uVar21;
          uStack_9728 = uVar22;
          local_9720 = local_9a20;
          uStack_9718 = uStack_9a18;
          uStack_9710 = uStack_9a10;
          uStack_9708 = uStack_9a08;
          local_96e0 = uVar15;
          uStack_96d8 = uVar16;
          uStack_96d0 = uVar17;
          uStack_96c8 = uVar18;
          local_9680 = uVar11;
          uStack_9678 = uVar12;
          uStack_9670 = uVar13;
          uStack_9668 = uVar14;
          local_9660 = local_9960;
          uStack_9658 = uStack_9958;
          uStack_9650 = uStack_9950;
          uStack_9648 = uStack_9948;
          local_9620 = uVar7;
          uStack_9618 = uVar8;
          uStack_9610 = uVar9;
          uStack_9608 = uVar10;
          local_9600 = local_9900;
          uStack_95f8 = uStack_98f8;
          uStack_95f0 = uStack_98f0;
          uStack_95e8 = uStack_98e8;
          local_95c0 = uVar3;
          uStack_95b8 = uVar4;
          uStack_95b0 = uVar5;
          uStack_95a8 = uVar6;
          local_9560 = uVar35;
          uStack_9558 = uVar36;
          uStack_9550 = uVar37;
          uStack_9548 = uVar38;
          local_9540 = local_9b40;
          uStack_9538 = uStack_9b38;
          uStack_9530 = uStack_9b30;
          uStack_9528 = uStack_9b28;
          local_9500 = uVar31;
          uStack_94f8 = uVar32;
          uStack_94f0 = uVar33;
          uStack_94e8 = uVar34;
          local_94e0 = local_97e0;
          uStack_94d8 = uStack_97d8;
          uStack_94d0 = uStack_97d0;
          uStack_94c8 = uStack_97c8;
          local_94a0 = uVar27;
          uStack_9498 = uVar28;
          uStack_9490 = uVar29;
          uStack_9488 = uVar30;
          local_9440 = uVar23;
          uStack_9438 = uVar24;
          uStack_9430 = uVar25;
          uStack_9428 = uVar26;
          local_9420 = local_9a20;
          uStack_9418 = uStack_9a18;
          uStack_9410 = uStack_9a10;
          uStack_9408 = uStack_9a08;
          local_93e0 = uVar19;
          uStack_93d8 = uVar20;
          uStack_93d0 = uVar21;
          uStack_93c8 = uVar22;
          local_93c0 = local_96c0;
          uStack_93b8 = uStack_96b8;
          uStack_93b0 = uStack_96b0;
          uStack_93a8 = uStack_96a8;
          local_9380 = uVar15;
          uStack_9378 = uVar16;
          uStack_9370 = uVar17;
          uStack_9368 = uVar18;
          local_9320 = uVar11;
          uStack_9318 = uVar12;
          uStack_9310 = uVar13;
          uStack_9308 = uVar14;
          local_9300 = local_9900;
          uStack_92f8 = uStack_98f8;
          uStack_92f0 = uStack_98f0;
          uStack_92e8 = uStack_98e8;
          local_92c0 = uVar7;
          uStack_92b8 = uVar8;
          uStack_92b0 = uVar9;
          uStack_92a8 = uVar10;
          local_92a0 = local_95a0;
          uStack_9298 = uStack_9598;
          uStack_9290 = uStack_9590;
          uStack_9288 = uStack_9588;
          local_9260 = uVar3;
          uStack_9258 = uVar4;
          uStack_9250 = uVar5;
          uStack_9248 = uVar6;
          local_9200 = uVar35;
          uStack_91f8 = uVar36;
          uStack_91f0 = uVar37;
          uStack_91e8 = uVar38;
          local_91e0 = local_97e0;
          uStack_91d8 = uStack_97d8;
          uStack_91d0 = uStack_97d0;
          uStack_91c8 = uStack_97c8;
          local_91a0 = uVar31;
          uStack_9198 = uVar32;
          uStack_9190 = uVar33;
          uStack_9188 = uVar34;
          local_9180 = local_9480;
          uStack_9178 = uStack_9478;
          uStack_9170 = uStack_9470;
          uStack_9168 = uStack_9468;
          local_9140 = uVar27;
          uStack_9138 = uVar28;
          uStack_9130 = uVar29;
          uStack_9128 = uVar30;
          local_90e0 = uVar23;
          uStack_90d8 = uVar24;
          uStack_90d0 = uVar25;
          uStack_90c8 = uVar26;
          local_90c0 = local_96c0;
          uStack_90b8 = uStack_96b8;
          uStack_90b0 = uStack_96b0;
          uStack_90a8 = uStack_96a8;
          local_9080 = uVar19;
          uStack_9078 = uVar20;
          uStack_9070 = uVar21;
          uStack_9068 = uVar22;
          local_9060 = local_9360;
          uStack_9058 = uStack_9358;
          uStack_9050 = uStack_9350;
          uStack_9048 = uStack_9348;
          local_9020 = uVar15;
          uStack_9018 = uVar16;
          uStack_9010 = uVar17;
          uStack_9008 = uVar18;
          local_8fc0 = uVar11;
          uStack_8fb8 = uVar12;
          uStack_8fb0 = uVar13;
          uStack_8fa8 = uVar14;
          local_8fa0 = local_95a0;
          uStack_8f98 = uStack_9598;
          uStack_8f90 = uStack_9590;
          uStack_8f88 = uStack_9588;
          local_8f60 = uVar7;
          uStack_8f58 = uVar8;
          uStack_8f50 = uVar9;
          uStack_8f48 = uVar10;
          local_8f40 = local_9240;
          uStack_8f38 = uStack_9238;
          uStack_8f30 = uStack_9230;
          uStack_8f28 = uStack_9228;
          local_8f00 = uVar3;
          uStack_8ef8 = uVar4;
          uStack_8ef0 = uVar5;
          uStack_8ee8 = uVar6;
          local_4000 = uVar3;
          uStack_3ff8 = uVar4;
          uStack_3ff0 = uVar5;
          uStack_3fe8 = uVar6;
          local_3fe0 = local_b5a0;
          fStack_3fdc = local_b5a0;
          fStack_3fd8 = local_b5a0;
          fStack_3fd4 = local_b5a0;
          fStack_3fd0 = local_b5a0;
          fStack_3fcc = local_b5a0;
          fStack_3fc8 = local_b5a0;
          fStack_3fc4 = local_b5a0;
          local_3fc0 = uVar7;
          uStack_3fb8 = uVar8;
          uStack_3fb0 = uVar9;
          uStack_3fa8 = uVar10;
          local_3fa0 = local_b5e0;
          fStack_3f9c = local_b5e0;
          fStack_3f98 = local_b5e0;
          fStack_3f94 = local_b5e0;
          fStack_3f90 = local_b5e0;
          fStack_3f8c = local_b5e0;
          fStack_3f88 = local_b5e0;
          fStack_3f84 = local_b5e0;
          local_3f80 = uVar11;
          uStack_3f78 = uVar12;
          uStack_3f70 = uVar13;
          uStack_3f68 = uVar14;
          local_3f60 = local_b620;
          fStack_3f5c = local_b620;
          fStack_3f58 = local_b620;
          fStack_3f54 = local_b620;
          fStack_3f50 = local_b620;
          fStack_3f4c = local_b620;
          fStack_3f48 = local_b620;
          fStack_3f44 = local_b620;
          local_3f40 = uVar15;
          uStack_3f38 = uVar16;
          uStack_3f30 = uVar17;
          uStack_3f28 = uVar18;
          local_3f20 = local_b660;
          fStack_3f1c = local_b660;
          fStack_3f18 = local_b660;
          fStack_3f14 = local_b660;
          fStack_3f10 = local_b660;
          fStack_3f0c = local_b660;
          fStack_3f08 = local_b660;
          fStack_3f04 = local_b660;
          local_3f00 = uVar19;
          uStack_3ef8 = uVar20;
          uStack_3ef0 = uVar21;
          uStack_3ee8 = uVar22;
          local_3ee0 = local_b6a0;
          fStack_3edc = local_b6a0;
          fStack_3ed8 = local_b6a0;
          fStack_3ed4 = local_b6a0;
          fStack_3ed0 = local_b6a0;
          fStack_3ecc = local_b6a0;
          fStack_3ec8 = local_b6a0;
          fStack_3ec4 = local_b6a0;
          local_3ec0 = uVar23;
          uStack_3eb8 = uVar24;
          uStack_3eb0 = uVar25;
          uStack_3ea8 = uVar26;
          local_3ea0 = local_b6e0;
          fStack_3e9c = local_b6e0;
          fStack_3e98 = local_b6e0;
          fStack_3e94 = local_b6e0;
          fStack_3e90 = local_b6e0;
          fStack_3e8c = local_b6e0;
          fStack_3e88 = local_b6e0;
          fStack_3e84 = local_b6e0;
          local_3e80 = uVar27;
          uStack_3e78 = uVar28;
          uStack_3e70 = uVar29;
          uStack_3e68 = uVar30;
          local_3e60 = local_b720;
          fStack_3e5c = local_b720;
          fStack_3e58 = local_b720;
          fStack_3e54 = local_b720;
          fStack_3e50 = local_b720;
          fStack_3e4c = local_b720;
          fStack_3e48 = local_b720;
          fStack_3e44 = local_b720;
          local_3e40 = uVar31;
          uStack_3e38 = uVar32;
          uStack_3e30 = uVar33;
          uStack_3e28 = uVar34;
          local_3e20 = local_b760;
          fStack_3e1c = local_b760;
          fStack_3e18 = local_b760;
          fStack_3e14 = local_b760;
          fStack_3e10 = local_b760;
          fStack_3e0c = local_b760;
          fStack_3e08 = local_b760;
          fStack_3e04 = local_b760;
          local_3e00 = uVar35;
          uStack_3df8 = uVar36;
          uStack_3df0 = uVar37;
          uStack_3de8 = uVar38;
          local_3de0 = local_b7a0;
          fStack_3ddc = local_b7a0;
          fStack_3dd8 = local_b7a0;
          fStack_3dd4 = local_b7a0;
          fStack_3dd0 = local_b7a0;
          fStack_3dcc = local_b7a0;
          fStack_3dc8 = local_b7a0;
          fStack_3dc4 = local_b7a0;
          local_3dc0 = uVar3;
          uStack_3db8 = uVar4;
          uStack_3db0 = uVar5;
          uStack_3da8 = uVar6;
          local_3da0 = local_b5e0;
          fStack_3d9c = local_b5e0;
          fStack_3d98 = local_b5e0;
          fStack_3d94 = local_b5e0;
          fStack_3d90 = local_b5e0;
          fStack_3d8c = local_b5e0;
          fStack_3d88 = local_b5e0;
          fStack_3d84 = local_b5e0;
          local_3d80 = uVar7;
          uStack_3d78 = uVar8;
          uStack_3d70 = uVar9;
          uStack_3d68 = uVar10;
          local_3d60 = local_b620;
          fStack_3d5c = local_b620;
          fStack_3d58 = local_b620;
          fStack_3d54 = local_b620;
          fStack_3d50 = local_b620;
          fStack_3d4c = local_b620;
          fStack_3d48 = local_b620;
          fStack_3d44 = local_b620;
          local_3d40 = uVar11;
          uStack_3d38 = uVar12;
          uStack_3d30 = uVar13;
          uStack_3d28 = uVar14;
          local_3d20 = local_b7e0;
          fStack_3d1c = local_b7e0;
          fStack_3d18 = local_b7e0;
          fStack_3d14 = local_b7e0;
          fStack_3d10 = local_b7e0;
          fStack_3d0c = local_b7e0;
          fStack_3d08 = local_b7e0;
          fStack_3d04 = local_b7e0;
          local_3d00 = uVar15;
          uStack_3cf8 = uVar16;
          uStack_3cf0 = uVar17;
          uStack_3ce8 = uVar18;
          local_3ce0 = local_b6a0;
          fStack_3cdc = local_b6a0;
          fStack_3cd8 = local_b6a0;
          fStack_3cd4 = local_b6a0;
          fStack_3cd0 = local_b6a0;
          fStack_3ccc = local_b6a0;
          fStack_3cc8 = local_b6a0;
          fStack_3cc4 = local_b6a0;
          local_3cc0 = uVar19;
          uStack_3cb8 = uVar20;
          uStack_3cb0 = uVar21;
          uStack_3ca8 = uVar22;
          local_3ca0 = local_b6e0;
          fStack_3c9c = local_b6e0;
          fStack_3c98 = local_b6e0;
          fStack_3c94 = local_b6e0;
          fStack_3c90 = local_b6e0;
          fStack_3c8c = local_b6e0;
          fStack_3c88 = local_b6e0;
          fStack_3c84 = local_b6e0;
          local_3c80 = uVar23;
          uStack_3c78 = uVar24;
          uStack_3c70 = uVar25;
          uStack_3c68 = uVar26;
          local_3c60 = local_b820;
          fStack_3c5c = local_b820;
          fStack_3c58 = local_b820;
          fStack_3c54 = local_b820;
          fStack_3c50 = local_b820;
          fStack_3c4c = local_b820;
          fStack_3c48 = local_b820;
          fStack_3c44 = local_b820;
          local_3c40 = uVar27;
          uStack_3c38 = uVar28;
          uStack_3c30 = uVar29;
          uStack_3c28 = uVar30;
          local_3c20 = local_b760;
          fStack_3c1c = local_b760;
          fStack_3c18 = local_b760;
          fStack_3c14 = local_b760;
          fStack_3c10 = local_b760;
          fStack_3c0c = local_b760;
          fStack_3c08 = local_b760;
          fStack_3c04 = local_b760;
          local_3c00 = uVar31;
          uStack_3bf8 = uVar32;
          uStack_3bf0 = uVar33;
          uStack_3be8 = uVar34;
          local_3be0 = local_b7a0;
          fStack_3bdc = local_b7a0;
          fStack_3bd8 = local_b7a0;
          fStack_3bd4 = local_b7a0;
          fStack_3bd0 = local_b7a0;
          fStack_3bcc = local_b7a0;
          fStack_3bc8 = local_b7a0;
          fStack_3bc4 = local_b7a0;
          local_3bc0 = uVar35;
          uStack_3bb8 = uVar36;
          uStack_3bb0 = uVar37;
          uStack_3ba8 = uVar38;
          local_3ba0 = local_b860;
          fStack_3b9c = local_b860;
          fStack_3b98 = local_b860;
          fStack_3b94 = local_b860;
          fStack_3b90 = local_b860;
          fStack_3b8c = local_b860;
          fStack_3b88 = local_b860;
          fStack_3b84 = local_b860;
          local_3b80 = uVar3;
          uStack_3b78 = uVar4;
          uStack_3b70 = uVar5;
          uStack_3b68 = uVar6;
          local_3b60 = local_b620;
          fStack_3b5c = local_b620;
          fStack_3b58 = local_b620;
          fStack_3b54 = local_b620;
          fStack_3b50 = local_b620;
          fStack_3b4c = local_b620;
          fStack_3b48 = local_b620;
          fStack_3b44 = local_b620;
          local_3b40 = uVar7;
          uStack_3b38 = uVar8;
          uStack_3b30 = uVar9;
          uStack_3b28 = uVar10;
          local_3b20 = local_b7e0;
          fStack_3b1c = local_b7e0;
          fStack_3b18 = local_b7e0;
          fStack_3b14 = local_b7e0;
          fStack_3b10 = local_b7e0;
          fStack_3b0c = local_b7e0;
          fStack_3b08 = local_b7e0;
          fStack_3b04 = local_b7e0;
          local_3b00 = uVar11;
          uStack_3af8 = uVar12;
          uStack_3af0 = uVar13;
          uStack_3ae8 = uVar14;
          local_3ae0 = local_b8a0;
          fStack_3adc = local_b8a0;
          fStack_3ad8 = local_b8a0;
          fStack_3ad4 = local_b8a0;
          fStack_3ad0 = local_b8a0;
          fStack_3acc = local_b8a0;
          fStack_3ac8 = local_b8a0;
          fStack_3ac4 = local_b8a0;
          local_3ac0 = uVar15;
          uStack_3ab8 = uVar16;
          uStack_3ab0 = uVar17;
          uStack_3aa8 = uVar18;
          local_3aa0 = local_b6e0;
          fStack_3a9c = local_b6e0;
          fStack_3a98 = local_b6e0;
          fStack_3a94 = local_b6e0;
          fStack_3a90 = local_b6e0;
          fStack_3a8c = local_b6e0;
          fStack_3a88 = local_b6e0;
          fStack_3a84 = local_b6e0;
          local_3a80 = uVar19;
          uStack_3a78 = uVar20;
          uStack_3a70 = uVar21;
          uStack_3a68 = uVar22;
          local_3a60 = local_b820;
          fStack_3a5c = local_b820;
          fStack_3a58 = local_b820;
          fStack_3a54 = local_b820;
          fStack_3a50 = local_b820;
          fStack_3a4c = local_b820;
          fStack_3a48 = local_b820;
          fStack_3a44 = local_b820;
          local_3a40 = uVar23;
          uStack_3a38 = uVar24;
          uStack_3a30 = uVar25;
          uStack_3a28 = uVar26;
          local_3a20 = local_b8e0;
          fStack_3a1c = local_b8e0;
          fStack_3a18 = local_b8e0;
          fStack_3a14 = local_b8e0;
          fStack_3a10 = local_b8e0;
          fStack_3a0c = local_b8e0;
          fStack_3a08 = local_b8e0;
          fStack_3a04 = local_b8e0;
          local_3a00 = uVar27;
          uStack_39f8 = uVar28;
          uStack_39f0 = uVar29;
          uStack_39e8 = uVar30;
          local_39e0 = local_b7a0;
          fStack_39dc = local_b7a0;
          fStack_39d8 = local_b7a0;
          fStack_39d4 = local_b7a0;
          fStack_39d0 = local_b7a0;
          fStack_39cc = local_b7a0;
          fStack_39c8 = local_b7a0;
          fStack_39c4 = local_b7a0;
          local_39c0 = uVar31;
          uStack_39b8 = uVar32;
          uStack_39b0 = uVar33;
          uStack_39a8 = uVar34;
          local_39a0 = local_b860;
          fStack_399c = local_b860;
          fStack_3998 = local_b860;
          fStack_3994 = local_b860;
          fStack_3990 = local_b860;
          fStack_398c = local_b860;
          fStack_3988 = local_b860;
          fStack_3984 = local_b860;
          local_3980 = uVar35;
          uStack_3978 = uVar36;
          uStack_3970 = uVar37;
          uStack_3968 = uVar38;
          local_3960 = local_b920;
          fStack_395c = local_b920;
          fStack_3958 = local_b920;
          fStack_3954 = local_b920;
          fStack_3950 = local_b920;
          fStack_394c = local_b920;
          fStack_3948 = local_b920;
          fStack_3944 = local_b920;
          local_3940 = uVar3;
          uStack_3938 = uVar4;
          uStack_3930 = uVar5;
          uStack_3928 = uVar6;
          local_3920 = local_b7e0;
          fStack_391c = local_b7e0;
          fStack_3918 = local_b7e0;
          fStack_3914 = local_b7e0;
          fStack_3910 = local_b7e0;
          fStack_390c = local_b7e0;
          fStack_3908 = local_b7e0;
          fStack_3904 = local_b7e0;
          local_3900 = uVar7;
          uStack_38f8 = uVar8;
          uStack_38f0 = uVar9;
          uStack_38e8 = uVar10;
          local_38e0 = local_b8a0;
          fStack_38dc = local_b8a0;
          fStack_38d8 = local_b8a0;
          fStack_38d4 = local_b8a0;
          fStack_38d0 = local_b8a0;
          fStack_38cc = local_b8a0;
          fStack_38c8 = local_b8a0;
          fStack_38c4 = local_b8a0;
          local_38c0 = uVar11;
          uStack_38b8 = uVar12;
          uStack_38b0 = uVar13;
          uStack_38a8 = uVar14;
          local_38a0 = local_b960;
          fStack_389c = local_b960;
          fStack_3898 = local_b960;
          fStack_3894 = local_b960;
          fStack_3890 = local_b960;
          fStack_388c = local_b960;
          fStack_3888 = local_b960;
          fStack_3884 = local_b960;
          local_3880 = uVar15;
          uStack_3878 = uVar16;
          uStack_3870 = uVar17;
          uStack_3868 = uVar18;
          local_3860 = local_b820;
          fStack_385c = local_b820;
          fStack_3858 = local_b820;
          fStack_3854 = local_b820;
          fStack_3850 = local_b820;
          fStack_384c = local_b820;
          fStack_3848 = local_b820;
          fStack_3844 = local_b820;
          local_3840 = uVar19;
          uStack_3838 = uVar20;
          uStack_3830 = uVar21;
          uStack_3828 = uVar22;
          local_3820 = local_b8e0;
          fStack_381c = local_b8e0;
          fStack_3818 = local_b8e0;
          fStack_3814 = local_b8e0;
          fStack_3810 = local_b8e0;
          fStack_380c = local_b8e0;
          fStack_3808 = local_b8e0;
          fStack_3804 = local_b8e0;
          local_3800 = uVar23;
          uStack_37f8 = uVar24;
          uStack_37f0 = uVar25;
          uStack_37e8 = uVar26;
          local_37e0 = local_b9a0;
          fStack_37dc = local_b9a0;
          fStack_37d8 = local_b9a0;
          fStack_37d4 = local_b9a0;
          fStack_37d0 = local_b9a0;
          fStack_37cc = local_b9a0;
          fStack_37c8 = local_b9a0;
          fStack_37c4 = local_b9a0;
          local_37c0 = uVar27;
          uStack_37b8 = uVar28;
          uStack_37b0 = uVar29;
          uStack_37a8 = uVar30;
          local_37a0 = local_b860;
          fStack_379c = local_b860;
          fStack_3798 = local_b860;
          fStack_3794 = local_b860;
          fStack_3790 = local_b860;
          fStack_378c = local_b860;
          fStack_3788 = local_b860;
          fStack_3784 = local_b860;
          local_3780 = uVar31;
          uStack_3778 = uVar32;
          uStack_3770 = uVar33;
          uStack_3768 = uVar34;
          local_3760 = local_b920;
          fStack_375c = local_b920;
          fStack_3758 = local_b920;
          fStack_3754 = local_b920;
          fStack_3750 = local_b920;
          fStack_374c = local_b920;
          fStack_3748 = local_b920;
          fStack_3744 = local_b920;
          local_3740 = uVar35;
          uStack_3738 = uVar36;
          uStack_3730 = uVar37;
          uStack_3728 = uVar38;
          local_3720 = local_b9e0;
          fStack_371c = local_b9e0;
          fStack_3718 = local_b9e0;
          fStack_3714 = local_b9e0;
          fStack_3710 = local_b9e0;
          fStack_370c = local_b9e0;
          fStack_3708 = local_b9e0;
          fStack_3704 = local_b9e0;
          local_10c0 = local_8f20;
          uStack_10b8 = uStack_8f18;
          uStack_10b0 = uStack_8f10;
          uStack_10a8 = uStack_8f08;
          fStack_1084 = local_b5a0;
          local_1080 = local_8f80;
          uStack_1078 = uStack_8f78;
          uStack_1070 = uStack_8f70;
          uStack_1068 = uStack_8f68;
          fStack_1044 = local_b5e0;
          local_1040 = local_8fe0;
          uStack_1038 = uStack_8fd8;
          uStack_1030 = uStack_8fd0;
          uStack_1028 = uStack_8fc8;
          fStack_1004 = local_b620;
          local_1000 = local_9040;
          uStack_ff8 = uStack_9038;
          uStack_ff0 = uStack_9030;
          uStack_fe8 = uStack_9028;
          fStack_fc4 = local_b660;
          local_fc0 = local_90a0;
          uStack_fb8 = uStack_9098;
          uStack_fb0 = uStack_9090;
          uStack_fa8 = uStack_9088;
          fStack_f84 = local_b6a0;
          local_f80 = local_9100;
          uStack_f78 = uStack_90f8;
          uStack_f70 = uStack_90f0;
          uStack_f68 = uStack_90e8;
          fStack_f44 = local_b6e0;
          local_f40 = local_9160;
          uStack_f38 = uStack_9158;
          uStack_f30 = uStack_9150;
          uStack_f28 = uStack_9148;
          fStack_f04 = local_b720;
          local_f00 = local_91c0;
          uStack_ef8 = uStack_91b8;
          uStack_ef0 = uStack_91b0;
          uStack_ee8 = uStack_91a8;
          fStack_ec4 = local_b760;
          local_ec0 = local_9220;
          uStack_eb8 = uStack_9218;
          uStack_eb0 = uStack_9210;
          uStack_ea8 = uStack_9208;
          fStack_e84 = local_b7a0;
          local_e80 = local_9280;
          uStack_e78 = uStack_9278;
          uStack_e70 = uStack_9270;
          uStack_e68 = uStack_9268;
          fStack_e44 = local_b5e0;
          local_e40 = local_92e0;
          uStack_e38 = uStack_92d8;
          uStack_e30 = uStack_92d0;
          uStack_e28 = uStack_92c8;
          fStack_e04 = local_b620;
          local_e00 = local_9340;
          uStack_df8 = uStack_9338;
          uStack_df0 = uStack_9330;
          uStack_de8 = uStack_9328;
          fStack_dc4 = local_b7e0;
          local_dc0 = local_93a0;
          uStack_db8 = uStack_9398;
          uStack_db0 = uStack_9390;
          uStack_da8 = uStack_9388;
          fStack_d84 = local_b6a0;
          local_d80 = local_9400;
          uStack_d78 = uStack_93f8;
          uStack_d70 = uStack_93f0;
          uStack_d68 = uStack_93e8;
          fStack_d44 = local_b6e0;
          local_d40 = local_9460;
          uStack_d38 = uStack_9458;
          uStack_d30 = uStack_9450;
          uStack_d28 = uStack_9448;
          fStack_d04 = local_b820;
          local_d00 = local_94c0;
          uStack_cf8 = uStack_94b8;
          uStack_cf0 = uStack_94b0;
          uStack_ce8 = uStack_94a8;
          fStack_cc4 = local_b760;
          local_cc0 = local_9520;
          uStack_cb8 = uStack_9518;
          uStack_cb0 = uStack_9510;
          uStack_ca8 = uStack_9508;
          fStack_c84 = local_b7a0;
          local_c80 = local_9580;
          uStack_c78 = uStack_9578;
          uStack_c70 = uStack_9570;
          uStack_c68 = uStack_9568;
          fStack_c44 = local_b860;
          local_c40 = local_95e0;
          uStack_c38 = uStack_95d8;
          uStack_c30 = uStack_95d0;
          uStack_c28 = uStack_95c8;
          fStack_c04 = local_b620;
          local_c00 = local_9640;
          uStack_bf8 = uStack_9638;
          uStack_bf0 = uStack_9630;
          uStack_be8 = uStack_9628;
          fStack_bc4 = local_b7e0;
          local_bc0 = local_96a0;
          uStack_bb8 = uStack_9698;
          uStack_bb0 = uStack_9690;
          uStack_ba8 = uStack_9688;
          fStack_b84 = local_b8a0;
          local_b80 = local_9700;
          uStack_b78 = uStack_96f8;
          uStack_b70 = uStack_96f0;
          uStack_b68 = uStack_96e8;
          fStack_b44 = local_b6e0;
          local_b40 = local_9760;
          uStack_b38 = uStack_9758;
          uStack_b30 = uStack_9750;
          uStack_b28 = uStack_9748;
          fStack_b04 = local_b820;
          local_b00 = local_97c0;
          uStack_af8 = uStack_97b8;
          uStack_af0 = uStack_97b0;
          uStack_ae8 = uStack_97a8;
          fStack_ac4 = local_b8e0;
          local_ac0 = local_9820;
          uStack_ab8 = uStack_9818;
          uStack_ab0 = uStack_9810;
          uStack_aa8 = uStack_9808;
          fStack_a84 = local_b7a0;
          local_a80 = local_9880;
          uStack_a78 = uStack_9878;
          uStack_a70 = uStack_9870;
          uStack_a68 = uStack_9868;
          fStack_a44 = local_b860;
          local_a40 = local_98e0;
          uStack_a38 = uStack_98d8;
          uStack_a30 = uStack_98d0;
          uStack_a28 = uStack_98c8;
          fStack_a04 = local_b920;
          local_a00 = local_9940;
          uStack_9f8 = uStack_9938;
          uStack_9f0 = uStack_9930;
          uStack_9e8 = uStack_9928;
          fStack_9c4 = local_b7e0;
          local_9c0 = local_99a0;
          uStack_9b8 = uStack_9998;
          uStack_9b0 = uStack_9990;
          uStack_9a8 = uStack_9988;
          fStack_984 = local_b8a0;
          local_980 = local_9a00;
          uStack_978 = uStack_99f8;
          uStack_970 = uStack_99f0;
          uStack_968 = uStack_99e8;
          fStack_944 = local_b960;
          local_940 = local_9a60;
          uStack_938 = uStack_9a58;
          uStack_930 = uStack_9a50;
          uStack_928 = uStack_9a48;
          fStack_904 = local_b820;
          local_900 = local_9ac0;
          uStack_8f8 = uStack_9ab8;
          uStack_8f0 = uStack_9ab0;
          uStack_8e8 = uStack_9aa8;
          fStack_8c4 = local_b8e0;
          local_8c0 = local_9b20;
          uStack_8b8 = uStack_9b18;
          uStack_8b0 = uStack_9b10;
          uStack_8a8 = uStack_9b08;
          fStack_884 = local_b9a0;
          local_880 = local_9b80;
          uStack_878 = uStack_9b78;
          uStack_870 = uStack_9b70;
          uStack_868 = uStack_9b68;
          fStack_844 = local_b860;
          local_840 = local_9be0;
          uStack_838 = uStack_9bd8;
          uStack_830 = uStack_9bd0;
          uStack_828 = uStack_9bc8;
          fStack_804 = local_b920;
          local_800 = local_9c40;
          uStack_7f8 = uStack_9c38;
          uStack_7f0 = uStack_9c30;
          uStack_7e8 = uStack_9c28;
          fStack_7c4 = local_b9e0;
        }
        for (; local_ce88 + 1 < local_c0f8; local_ce88 = local_ce88 + 2) {
          local_c0a8 = local_cd00;
          local_9ca0 = *(undefined8 *)local_cd00;
          uStack_9c98 = *(undefined8 *)(local_cd00 + 2);
          uStack_9c90 = *(undefined8 *)(local_cd00 + 4);
          uStack_9c88 = *(undefined8 *)(local_cd00 + 6);
          local_b9e8 = local_cd50;
          local_ba20 = *local_cd50;
          local_9c60 = CONCAT44(local_ba20,local_ba20);
          uStack_9c58 = CONCAT44(local_ba20,local_ba20);
          uStack_9c50 = CONCAT44(local_ba20,local_ba20);
          uStack_9c48 = CONCAT44(local_ba20,local_ba20);
          local_ba28 = local_cd50 + 1;
          local_ba60 = *local_ba28;
          local_9fc0 = CONCAT44(local_ba60,local_ba60);
          uStack_9fb8 = CONCAT44(local_ba60,local_ba60);
          uStack_9fb0 = CONCAT44(local_ba60,local_ba60);
          uStack_9fa8 = CONCAT44(local_ba60,local_ba60);
          local_ba68 = local_cd50 + 2;
          local_baa0 = *local_ba68;
          local_a020 = CONCAT44(local_baa0,local_baa0);
          uStack_a018 = CONCAT44(local_baa0,local_baa0);
          uStack_a010 = CONCAT44(local_baa0,local_baa0);
          uStack_a008 = CONCAT44(local_baa0,local_baa0);
          local_baa8 = local_cd58;
          local_bae0 = *local_cd58;
          local_9d80 = CONCAT44(local_bae0,local_bae0);
          uStack_9d78 = CONCAT44(local_bae0,local_bae0);
          uStack_9d70 = CONCAT44(local_bae0,local_bae0);
          uStack_9d68 = CONCAT44(local_bae0,local_bae0);
          local_bae8 = local_cd58 + 1;
          local_bb20 = *local_bae8;
          local_a0e0 = CONCAT44(local_bb20,local_bb20);
          uStack_a0d8 = CONCAT44(local_bb20,local_bb20);
          uStack_a0d0 = CONCAT44(local_bb20,local_bb20);
          uStack_a0c8 = CONCAT44(local_bb20,local_bb20);
          local_bb28 = local_cd58 + 2;
          local_bb60 = *local_bb28;
          local_a140 = CONCAT44(local_bb60,local_bb60);
          uStack_a138 = CONCAT44(local_bb60,local_bb60);
          uStack_a130 = CONCAT44(local_bb60,local_bb60);
          uStack_a128 = CONCAT44(local_bb60,local_bb60);
          local_bb68 = local_cd60;
          local_bba0 = *local_cd60;
          local_9ea0 = CONCAT44(local_bba0,local_bba0);
          uStack_9e98 = CONCAT44(local_bba0,local_bba0);
          uStack_9e90 = CONCAT44(local_bba0,local_bba0);
          uStack_9e88 = CONCAT44(local_bba0,local_bba0);
          local_bba8 = local_cd60 + 1;
          local_bbe0 = *local_bba8;
          local_a200 = CONCAT44(local_bbe0,local_bbe0);
          uStack_a1f8 = CONCAT44(local_bbe0,local_bbe0);
          uStack_a1f0 = CONCAT44(local_bbe0,local_bbe0);
          uStack_a1e8 = CONCAT44(local_bbe0,local_bbe0);
          local_bbe8 = local_cd60 + 2;
          local_bc20 = *local_bbe8;
          local_a260 = CONCAT44(local_bc20,local_bc20);
          uStack_a258 = CONCAT44(local_bc20,local_bc20);
          uStack_a250 = CONCAT44(local_bc20,local_bc20);
          uStack_a248 = CONCAT44(local_bc20,local_bc20);
          local_7a0 = local_ba20 * (float)local_4000;
          fStack_79c = local_ba20 * local_4000._4_4_;
          fStack_798 = local_ba20 * (float)uStack_3ff8;
          fStack_794 = local_ba20 * uStack_3ff8._4_4_;
          fStack_790 = local_ba20 * (float)uStack_3ff0;
          fStack_78c = local_ba20 * uStack_3ff0._4_4_;
          fStack_788 = local_ba20 * (float)uStack_3fe8;
          local_7c0._0_4_ = (float)local_9ca0;
          local_7c0._4_4_ = (float)((ulong)local_9ca0 >> 0x20);
          uStack_7b8._0_4_ = (float)uStack_9c98;
          uStack_7b8._4_4_ = (float)((ulong)uStack_9c98 >> 0x20);
          uStack_7b0._0_4_ = (float)uStack_9c90;
          uStack_7b0._4_4_ = (float)((ulong)uStack_9c90 >> 0x20);
          uStack_7a8._0_4_ = (float)uStack_9c88;
          uStack_7a8._4_4_ = (float)((ulong)uStack_9c88 >> 0x20);
          local_9d00 = CONCAT44(fStack_79c + local_7c0._4_4_,local_7a0 + (float)local_7c0);
          uStack_9cf8 = CONCAT44(fStack_794 + uStack_7b8._4_4_,fStack_798 + (float)uStack_7b8);
          uStack_9cf0 = CONCAT44(fStack_78c + uStack_7b0._4_4_,fStack_790 + (float)uStack_7b0);
          uStack_9ce8 = CONCAT44(local_ba20 + uStack_7a8._4_4_,fStack_788 + (float)uStack_7a8);
          local_760 = local_ba60 * (float)local_3fc0;
          fStack_75c = local_ba60 * local_3fc0._4_4_;
          fStack_758 = local_ba60 * (float)uStack_3fb8;
          fStack_754 = local_ba60 * uStack_3fb8._4_4_;
          fStack_750 = local_ba60 * (float)uStack_3fb0;
          fStack_74c = local_ba60 * uStack_3fb0._4_4_;
          fStack_748 = local_ba60 * (float)uStack_3fa8;
          fVar76 = local_760 + local_7a0 + (float)local_7c0;
          fVar80 = fStack_75c + fStack_79c + local_7c0._4_4_;
          fVar81 = fStack_758 + fStack_798 + (float)uStack_7b8;
          fVar82 = fStack_754 + fStack_794 + uStack_7b8._4_4_;
          fVar83 = fStack_750 + fStack_790 + (float)uStack_7b0;
          fVar84 = fStack_74c + fStack_78c + uStack_7b0._4_4_;
          fVar85 = fStack_748 + fStack_788 + (float)uStack_7a8;
          fVar86 = local_ba60 + local_ba20 + uStack_7a8._4_4_;
          local_9d60 = CONCAT44(fVar80,fVar76);
          uStack_9d58 = CONCAT44(fVar82,fVar81);
          uStack_9d50 = CONCAT44(fVar84,fVar83);
          uStack_9d48 = CONCAT44(fVar86,fVar85);
          local_720 = local_baa0 * (float)local_3f80;
          fStack_71c = local_baa0 * local_3f80._4_4_;
          fStack_718 = local_baa0 * (float)uStack_3f78;
          fStack_714 = local_baa0 * uStack_3f78._4_4_;
          fStack_710 = local_baa0 * (float)uStack_3f70;
          fStack_70c = local_baa0 * uStack_3f70._4_4_;
          fStack_708 = local_baa0 * (float)uStack_3f68;
          fVar76 = local_720 + fVar76;
          fVar80 = fStack_71c + fVar80;
          fVar81 = fStack_718 + fVar81;
          fVar82 = fStack_714 + fVar82;
          fVar83 = fStack_710 + fVar83;
          fVar84 = fStack_70c + fVar84;
          fVar85 = fStack_708 + fVar85;
          fVar86 = local_baa0 + fVar86;
          local_9dc0 = CONCAT44(fVar80,fVar76);
          uStack_9db8 = CONCAT44(fVar82,fVar81);
          uStack_9db0 = CONCAT44(fVar84,fVar83);
          uStack_9da8 = CONCAT44(fVar86,fVar85);
          local_6e0 = local_bae0 * (float)local_3f40;
          fStack_6dc = local_bae0 * local_3f40._4_4_;
          fStack_6d8 = local_bae0 * (float)uStack_3f38;
          fStack_6d4 = local_bae0 * uStack_3f38._4_4_;
          fStack_6d0 = local_bae0 * (float)uStack_3f30;
          fStack_6cc = local_bae0 * uStack_3f30._4_4_;
          fStack_6c8 = local_bae0 * (float)uStack_3f28;
          fVar76 = local_6e0 + fVar76;
          fVar80 = fStack_6dc + fVar80;
          fVar81 = fStack_6d8 + fVar81;
          fVar82 = fStack_6d4 + fVar82;
          fVar83 = fStack_6d0 + fVar83;
          fVar84 = fStack_6cc + fVar84;
          fVar85 = fStack_6c8 + fVar85;
          fVar86 = local_bae0 + fVar86;
          local_9e20 = CONCAT44(fVar80,fVar76);
          uStack_9e18 = CONCAT44(fVar82,fVar81);
          uStack_9e10 = CONCAT44(fVar84,fVar83);
          uStack_9e08 = CONCAT44(fVar86,fVar85);
          local_6a0 = local_bb20 * (float)local_3f00;
          fStack_69c = local_bb20 * local_3f00._4_4_;
          fStack_698 = local_bb20 * (float)uStack_3ef8;
          fStack_694 = local_bb20 * uStack_3ef8._4_4_;
          fStack_690 = local_bb20 * (float)uStack_3ef0;
          fStack_68c = local_bb20 * uStack_3ef0._4_4_;
          fStack_688 = local_bb20 * (float)uStack_3ee8;
          fVar76 = local_6a0 + fVar76;
          fVar80 = fStack_69c + fVar80;
          fVar81 = fStack_698 + fVar81;
          fVar82 = fStack_694 + fVar82;
          fVar83 = fStack_690 + fVar83;
          fVar84 = fStack_68c + fVar84;
          fVar85 = fStack_688 + fVar85;
          fVar86 = local_bb20 + fVar86;
          local_9e80 = CONCAT44(fVar80,fVar76);
          uStack_9e78 = CONCAT44(fVar82,fVar81);
          uStack_9e70 = CONCAT44(fVar84,fVar83);
          uStack_9e68 = CONCAT44(fVar86,fVar85);
          local_660 = local_bb60 * (float)local_3ec0;
          fStack_65c = local_bb60 * local_3ec0._4_4_;
          fStack_658 = local_bb60 * (float)uStack_3eb8;
          fStack_654 = local_bb60 * uStack_3eb8._4_4_;
          fStack_650 = local_bb60 * (float)uStack_3eb0;
          fStack_64c = local_bb60 * uStack_3eb0._4_4_;
          fStack_648 = local_bb60 * (float)uStack_3ea8;
          fVar76 = local_660 + fVar76;
          fVar80 = fStack_65c + fVar80;
          fVar81 = fStack_658 + fVar81;
          fVar82 = fStack_654 + fVar82;
          fVar83 = fStack_650 + fVar83;
          fVar84 = fStack_64c + fVar84;
          fVar85 = fStack_648 + fVar85;
          fVar86 = local_bb60 + fVar86;
          local_9ee0 = CONCAT44(fVar80,fVar76);
          uStack_9ed8 = CONCAT44(fVar82,fVar81);
          uStack_9ed0 = CONCAT44(fVar84,fVar83);
          uStack_9ec8 = CONCAT44(fVar86,fVar85);
          local_620 = local_bba0 * (float)local_3e80;
          fStack_61c = local_bba0 * local_3e80._4_4_;
          fStack_618 = local_bba0 * (float)uStack_3e78;
          fStack_614 = local_bba0 * uStack_3e78._4_4_;
          fStack_610 = local_bba0 * (float)uStack_3e70;
          fStack_60c = local_bba0 * uStack_3e70._4_4_;
          fStack_608 = local_bba0 * (float)uStack_3e68;
          fVar76 = local_620 + fVar76;
          fVar80 = fStack_61c + fVar80;
          fVar81 = fStack_618 + fVar81;
          fVar82 = fStack_614 + fVar82;
          fVar83 = fStack_610 + fVar83;
          fVar84 = fStack_60c + fVar84;
          fVar85 = fStack_608 + fVar85;
          fVar86 = local_bba0 + fVar86;
          local_9f40 = CONCAT44(fVar80,fVar76);
          uStack_9f38 = CONCAT44(fVar82,fVar81);
          uStack_9f30 = CONCAT44(fVar84,fVar83);
          uStack_9f28 = CONCAT44(fVar86,fVar85);
          local_5e0 = local_bbe0 * (float)local_3e40;
          fStack_5dc = local_bbe0 * local_3e40._4_4_;
          fStack_5d8 = local_bbe0 * (float)uStack_3e38;
          fStack_5d4 = local_bbe0 * uStack_3e38._4_4_;
          fStack_5d0 = local_bbe0 * (float)uStack_3e30;
          fStack_5cc = local_bbe0 * uStack_3e30._4_4_;
          fStack_5c8 = local_bbe0 * (float)uStack_3e28;
          fVar76 = local_5e0 + fVar76;
          fVar80 = fStack_5dc + fVar80;
          fVar81 = fStack_5d8 + fVar81;
          fVar82 = fStack_5d4 + fVar82;
          fVar83 = fStack_5d0 + fVar83;
          fVar84 = fStack_5cc + fVar84;
          fVar85 = fStack_5c8 + fVar85;
          fVar86 = local_bbe0 + fVar86;
          local_9fa0 = CONCAT44(fVar80,fVar76);
          uStack_9f98 = CONCAT44(fVar82,fVar81);
          uStack_9f90 = CONCAT44(fVar84,fVar83);
          uStack_9f88 = CONCAT44(fVar86,fVar85);
          local_5a0 = local_bc20 * (float)local_3e00;
          fStack_59c = local_bc20 * local_3e00._4_4_;
          fStack_598 = local_bc20 * (float)uStack_3df8;
          fStack_594 = local_bc20 * uStack_3df8._4_4_;
          fStack_590 = local_bc20 * (float)uStack_3df0;
          fStack_58c = local_bc20 * uStack_3df0._4_4_;
          fStack_588 = local_bc20 * (float)uStack_3de8;
          local_ab20 = CONCAT44(fStack_59c + fVar80,local_5a0 + fVar76);
          uStack_ab18 = CONCAT44(fStack_594 + fVar82,fStack_598 + fVar81);
          uStack_ab10 = CONCAT44(fStack_58c + fVar84,fStack_590 + fVar83);
          uStack_ab08 = CONCAT44(local_bc20 + fVar86,fStack_588 + fVar85);
          local_c0b0 = local_cd00 + 8;
          local_a000 = *(undefined8 *)local_c0b0;
          uStack_9ff8 = *(undefined8 *)(local_cd00 + 10);
          uStack_9ff0 = *(undefined8 *)(local_cd00 + 0xc);
          uStack_9fe8 = *(undefined8 *)(local_cd00 + 0xe);
          local_bc28 = local_cd50 + 3;
          local_bc60 = *local_bc28;
          local_a080 = CONCAT44(local_bc60,local_bc60);
          uStack_a078 = CONCAT44(local_bc60,local_bc60);
          uStack_a070 = CONCAT44(local_bc60,local_bc60);
          uStack_a068 = CONCAT44(local_bc60,local_bc60);
          local_bc68 = local_cd58 + 3;
          local_bca0 = *local_bc68;
          local_a1a0 = CONCAT44(local_bca0,local_bca0);
          uStack_a198 = CONCAT44(local_bca0,local_bca0);
          uStack_a190 = CONCAT44(local_bca0,local_bca0);
          uStack_a188 = CONCAT44(local_bca0,local_bca0);
          local_bca8 = local_cd60 + 3;
          local_bce0 = *local_bca8;
          local_a2c0 = CONCAT44(local_bce0,local_bce0);
          uStack_a2b8 = CONCAT44(local_bce0,local_bce0);
          uStack_a2b0 = CONCAT44(local_bce0,local_bce0);
          uStack_a2a8 = CONCAT44(local_bce0,local_bce0);
          local_aae8 = local_cd00;
          *(undefined8 *)local_cd00 = local_ab20;
          *(undefined8 *)(local_cd00 + 2) = uStack_ab18;
          *(undefined8 *)(local_cd00 + 4) = uStack_ab10;
          *(undefined8 *)(local_cd00 + 6) = uStack_ab08;
          local_560 = local_ba60 * (float)local_4000;
          fStack_55c = local_ba60 * local_4000._4_4_;
          fStack_558 = local_ba60 * (float)uStack_3ff8;
          fStack_554 = local_ba60 * uStack_3ff8._4_4_;
          fStack_550 = local_ba60 * (float)uStack_3ff0;
          fStack_54c = local_ba60 * uStack_3ff0._4_4_;
          fStack_548 = local_ba60 * (float)uStack_3fe8;
          local_580._0_4_ = (float)local_a000;
          local_580._4_4_ = (float)((ulong)local_a000 >> 0x20);
          uStack_578._0_4_ = (float)uStack_9ff8;
          uStack_578._4_4_ = (float)((ulong)uStack_9ff8 >> 0x20);
          uStack_570._0_4_ = (float)uStack_9ff0;
          uStack_570._4_4_ = (float)((ulong)uStack_9ff0 >> 0x20);
          uStack_568._0_4_ = (float)uStack_9fe8;
          uStack_568._4_4_ = (float)((ulong)uStack_9fe8 >> 0x20);
          local_a060 = CONCAT44(fStack_55c + local_580._4_4_,local_560 + (float)local_580);
          uStack_a058 = CONCAT44(fStack_554 + uStack_578._4_4_,fStack_558 + (float)uStack_578);
          uStack_a050 = CONCAT44(fStack_54c + uStack_570._4_4_,fStack_550 + (float)uStack_570);
          uStack_a048 = CONCAT44(local_ba60 + uStack_568._4_4_,fStack_548 + (float)uStack_568);
          local_520 = local_baa0 * (float)local_3fc0;
          fStack_51c = local_baa0 * local_3fc0._4_4_;
          fStack_518 = local_baa0 * (float)uStack_3fb8;
          fStack_514 = local_baa0 * uStack_3fb8._4_4_;
          fStack_510 = local_baa0 * (float)uStack_3fb0;
          fStack_50c = local_baa0 * uStack_3fb0._4_4_;
          fStack_508 = local_baa0 * (float)uStack_3fa8;
          fVar76 = local_520 + local_560 + (float)local_580;
          fVar80 = fStack_51c + fStack_55c + local_580._4_4_;
          fVar81 = fStack_518 + fStack_558 + (float)uStack_578;
          fVar82 = fStack_514 + fStack_554 + uStack_578._4_4_;
          fVar83 = fStack_510 + fStack_550 + (float)uStack_570;
          fVar84 = fStack_50c + fStack_54c + uStack_570._4_4_;
          fVar85 = fStack_508 + fStack_548 + (float)uStack_568;
          fVar86 = local_baa0 + local_ba60 + uStack_568._4_4_;
          local_a0c0 = CONCAT44(fVar80,fVar76);
          uStack_a0b8 = CONCAT44(fVar82,fVar81);
          uStack_a0b0 = CONCAT44(fVar84,fVar83);
          uStack_a0a8 = CONCAT44(fVar86,fVar85);
          local_4e0 = local_bc60 * (float)local_3f80;
          fStack_4dc = local_bc60 * local_3f80._4_4_;
          fStack_4d8 = local_bc60 * (float)uStack_3f78;
          fStack_4d4 = local_bc60 * uStack_3f78._4_4_;
          fStack_4d0 = local_bc60 * (float)uStack_3f70;
          fStack_4cc = local_bc60 * uStack_3f70._4_4_;
          fStack_4c8 = local_bc60 * (float)uStack_3f68;
          fVar76 = local_4e0 + fVar76;
          fVar80 = fStack_4dc + fVar80;
          fVar81 = fStack_4d8 + fVar81;
          fVar82 = fStack_4d4 + fVar82;
          fVar83 = fStack_4d0 + fVar83;
          fVar84 = fStack_4cc + fVar84;
          fVar85 = fStack_4c8 + fVar85;
          fVar86 = local_bc60 + fVar86;
          local_a120 = CONCAT44(fVar80,fVar76);
          uStack_a118 = CONCAT44(fVar82,fVar81);
          uStack_a110 = CONCAT44(fVar84,fVar83);
          uStack_a108 = CONCAT44(fVar86,fVar85);
          local_4a0 = local_bb20 * (float)local_3f40;
          fStack_49c = local_bb20 * local_3f40._4_4_;
          fStack_498 = local_bb20 * (float)uStack_3f38;
          fStack_494 = local_bb20 * uStack_3f38._4_4_;
          fStack_490 = local_bb20 * (float)uStack_3f30;
          fStack_48c = local_bb20 * uStack_3f30._4_4_;
          fStack_488 = local_bb20 * (float)uStack_3f28;
          fVar76 = local_4a0 + fVar76;
          fVar80 = fStack_49c + fVar80;
          fVar81 = fStack_498 + fVar81;
          fVar82 = fStack_494 + fVar82;
          fVar83 = fStack_490 + fVar83;
          fVar84 = fStack_48c + fVar84;
          fVar85 = fStack_488 + fVar85;
          fVar86 = local_bb20 + fVar86;
          local_a180 = CONCAT44(fVar80,fVar76);
          uStack_a178 = CONCAT44(fVar82,fVar81);
          uStack_a170 = CONCAT44(fVar84,fVar83);
          uStack_a168 = CONCAT44(fVar86,fVar85);
          local_460 = local_bb60 * (float)local_3f00;
          fStack_45c = local_bb60 * local_3f00._4_4_;
          fStack_458 = local_bb60 * (float)uStack_3ef8;
          fStack_454 = local_bb60 * uStack_3ef8._4_4_;
          fStack_450 = local_bb60 * (float)uStack_3ef0;
          fStack_44c = local_bb60 * uStack_3ef0._4_4_;
          fStack_448 = local_bb60 * (float)uStack_3ee8;
          fVar76 = local_460 + fVar76;
          fVar80 = fStack_45c + fVar80;
          fVar81 = fStack_458 + fVar81;
          fVar82 = fStack_454 + fVar82;
          fVar83 = fStack_450 + fVar83;
          fVar84 = fStack_44c + fVar84;
          fVar85 = fStack_448 + fVar85;
          fVar86 = local_bb60 + fVar86;
          local_a1e0 = CONCAT44(fVar80,fVar76);
          uStack_a1d8 = CONCAT44(fVar82,fVar81);
          uStack_a1d0 = CONCAT44(fVar84,fVar83);
          uStack_a1c8 = CONCAT44(fVar86,fVar85);
          local_420 = local_bca0 * (float)local_3ec0;
          fStack_41c = local_bca0 * local_3ec0._4_4_;
          fStack_418 = local_bca0 * (float)uStack_3eb8;
          fStack_414 = local_bca0 * uStack_3eb8._4_4_;
          fStack_410 = local_bca0 * (float)uStack_3eb0;
          fStack_40c = local_bca0 * uStack_3eb0._4_4_;
          fStack_408 = local_bca0 * (float)uStack_3ea8;
          fVar76 = local_420 + fVar76;
          fVar80 = fStack_41c + fVar80;
          fVar81 = fStack_418 + fVar81;
          fVar82 = fStack_414 + fVar82;
          fVar83 = fStack_410 + fVar83;
          fVar84 = fStack_40c + fVar84;
          fVar85 = fStack_408 + fVar85;
          fVar86 = local_bca0 + fVar86;
          local_a240 = CONCAT44(fVar80,fVar76);
          uStack_a238 = CONCAT44(fVar82,fVar81);
          uStack_a230 = CONCAT44(fVar84,fVar83);
          uStack_a228 = CONCAT44(fVar86,fVar85);
          local_3e0 = local_bbe0 * (float)local_3e80;
          fStack_3dc = local_bbe0 * local_3e80._4_4_;
          fStack_3d8 = local_bbe0 * (float)uStack_3e78;
          fStack_3d4 = local_bbe0 * uStack_3e78._4_4_;
          fStack_3d0 = local_bbe0 * (float)uStack_3e70;
          fStack_3cc = local_bbe0 * uStack_3e70._4_4_;
          fStack_3c8 = local_bbe0 * (float)uStack_3e68;
          fVar76 = local_3e0 + fVar76;
          fVar80 = fStack_3dc + fVar80;
          fVar81 = fStack_3d8 + fVar81;
          fVar82 = fStack_3d4 + fVar82;
          fVar83 = fStack_3d0 + fVar83;
          fVar84 = fStack_3cc + fVar84;
          fVar85 = fStack_3c8 + fVar85;
          fVar86 = local_bbe0 + fVar86;
          local_a2a0 = CONCAT44(fVar80,fVar76);
          uStack_a298 = CONCAT44(fVar82,fVar81);
          uStack_a290 = CONCAT44(fVar84,fVar83);
          uStack_a288 = CONCAT44(fVar86,fVar85);
          local_3a0 = local_bc20 * (float)local_3e40;
          fStack_39c = local_bc20 * local_3e40._4_4_;
          fStack_398 = local_bc20 * (float)uStack_3e38;
          fStack_394 = local_bc20 * uStack_3e38._4_4_;
          fStack_390 = local_bc20 * (float)uStack_3e30;
          fStack_38c = local_bc20 * uStack_3e30._4_4_;
          fStack_388 = local_bc20 * (float)uStack_3e28;
          fVar76 = local_3a0 + fVar76;
          fVar80 = fStack_39c + fVar80;
          fVar81 = fStack_398 + fVar81;
          fVar82 = fStack_394 + fVar82;
          fVar83 = fStack_390 + fVar83;
          fVar84 = fStack_38c + fVar84;
          fVar85 = fStack_388 + fVar85;
          fVar86 = local_bc20 + fVar86;
          local_a300 = CONCAT44(fVar80,fVar76);
          uStack_a2f8 = CONCAT44(fVar82,fVar81);
          uStack_a2f0 = CONCAT44(fVar84,fVar83);
          uStack_a2e8 = CONCAT44(fVar86,fVar85);
          local_360 = local_bce0 * (float)local_3e00;
          fStack_35c = local_bce0 * local_3e00._4_4_;
          fStack_358 = local_bce0 * (float)uStack_3df8;
          fStack_354 = local_bce0 * uStack_3df8._4_4_;
          fStack_350 = local_bce0 * (float)uStack_3df0;
          fStack_34c = local_bce0 * uStack_3df0._4_4_;
          fStack_348 = local_bce0 * (float)uStack_3de8;
          local_ab60 = CONCAT44(fStack_35c + fVar80,local_360 + fVar76);
          uStack_ab58 = CONCAT44(fStack_354 + fVar82,fStack_358 + fVar81);
          uStack_ab50 = CONCAT44(fStack_34c + fVar84,fStack_350 + fVar83);
          uStack_ab48 = CONCAT44(local_bce0 + fVar86,fStack_348 + fVar85);
          local_ab28 = local_cd00 + 8;
          *(undefined8 *)local_ab28 = local_ab60;
          *(undefined8 *)(local_cd00 + 10) = uStack_ab58;
          *(undefined8 *)(local_cd00 + 0xc) = uStack_ab50;
          *(undefined8 *)(local_cd00 + 0xe) = uStack_ab48;
          local_cd50 = local_cd50 + 2;
          local_cd58 = local_cd58 + 2;
          local_cd60 = local_cd60 + 2;
          local_cd00 = local_cd00 + 0x10;
          fStack_bcdc = local_bce0;
          fStack_bcd8 = local_bce0;
          fStack_bcd4 = local_bce0;
          fStack_bcd0 = local_bce0;
          fStack_bccc = local_bce0;
          fStack_bcc8 = local_bce0;
          fStack_bcc4 = local_bce0;
          local_bcac = local_bce0;
          fStack_bc9c = local_bca0;
          fStack_bc98 = local_bca0;
          fStack_bc94 = local_bca0;
          fStack_bc90 = local_bca0;
          fStack_bc8c = local_bca0;
          fStack_bc88 = local_bca0;
          fStack_bc84 = local_bca0;
          local_bc6c = local_bca0;
          fStack_bc5c = local_bc60;
          fStack_bc58 = local_bc60;
          fStack_bc54 = local_bc60;
          fStack_bc50 = local_bc60;
          fStack_bc4c = local_bc60;
          fStack_bc48 = local_bc60;
          fStack_bc44 = local_bc60;
          local_bc2c = local_bc60;
          fStack_bc1c = local_bc20;
          fStack_bc18 = local_bc20;
          fStack_bc14 = local_bc20;
          fStack_bc10 = local_bc20;
          fStack_bc0c = local_bc20;
          fStack_bc08 = local_bc20;
          fStack_bc04 = local_bc20;
          local_bbec = local_bc20;
          fStack_bbdc = local_bbe0;
          fStack_bbd8 = local_bbe0;
          fStack_bbd4 = local_bbe0;
          fStack_bbd0 = local_bbe0;
          fStack_bbcc = local_bbe0;
          fStack_bbc8 = local_bbe0;
          fStack_bbc4 = local_bbe0;
          local_bbac = local_bbe0;
          fStack_bb9c = local_bba0;
          fStack_bb98 = local_bba0;
          fStack_bb94 = local_bba0;
          fStack_bb90 = local_bba0;
          fStack_bb8c = local_bba0;
          fStack_bb88 = local_bba0;
          fStack_bb84 = local_bba0;
          local_bb6c = local_bba0;
          fStack_bb5c = local_bb60;
          fStack_bb58 = local_bb60;
          fStack_bb54 = local_bb60;
          fStack_bb50 = local_bb60;
          fStack_bb4c = local_bb60;
          fStack_bb48 = local_bb60;
          fStack_bb44 = local_bb60;
          local_bb2c = local_bb60;
          fStack_bb1c = local_bb20;
          fStack_bb18 = local_bb20;
          fStack_bb14 = local_bb20;
          fStack_bb10 = local_bb20;
          fStack_bb0c = local_bb20;
          fStack_bb08 = local_bb20;
          fStack_bb04 = local_bb20;
          local_baec = local_bb20;
          fStack_badc = local_bae0;
          fStack_bad8 = local_bae0;
          fStack_bad4 = local_bae0;
          fStack_bad0 = local_bae0;
          fStack_bacc = local_bae0;
          fStack_bac8 = local_bae0;
          fStack_bac4 = local_bae0;
          local_baac = local_bae0;
          fStack_ba9c = local_baa0;
          fStack_ba98 = local_baa0;
          fStack_ba94 = local_baa0;
          fStack_ba90 = local_baa0;
          fStack_ba8c = local_baa0;
          fStack_ba88 = local_baa0;
          fStack_ba84 = local_baa0;
          local_ba6c = local_baa0;
          fStack_ba5c = local_ba60;
          fStack_ba58 = local_ba60;
          fStack_ba54 = local_ba60;
          fStack_ba50 = local_ba60;
          fStack_ba4c = local_ba60;
          fStack_ba48 = local_ba60;
          fStack_ba44 = local_ba60;
          local_ba2c = local_ba60;
          fStack_ba1c = local_ba20;
          fStack_ba18 = local_ba20;
          fStack_ba14 = local_ba20;
          fStack_ba10 = local_ba20;
          fStack_ba0c = local_ba20;
          fStack_ba08 = local_ba20;
          fStack_ba04 = local_ba20;
          local_b9ec = local_ba20;
          local_a2e0 = uVar35;
          uStack_a2d8 = uVar36;
          uStack_a2d0 = uVar37;
          uStack_a2c8 = uVar38;
          local_a280 = uVar31;
          uStack_a278 = uVar32;
          uStack_a270 = uVar33;
          uStack_a268 = uVar34;
          local_a220 = uVar27;
          uStack_a218 = uVar28;
          uStack_a210 = uVar29;
          uStack_a208 = uVar30;
          local_a1c0 = uVar23;
          uStack_a1b8 = uVar24;
          uStack_a1b0 = uVar25;
          uStack_a1a8 = uVar26;
          local_a160 = uVar19;
          uStack_a158 = uVar20;
          uStack_a150 = uVar21;
          uStack_a148 = uVar22;
          local_a100 = uVar15;
          uStack_a0f8 = uVar16;
          uStack_a0f0 = uVar17;
          uStack_a0e8 = uVar18;
          local_a0a0 = uVar11;
          uStack_a098 = uVar12;
          uStack_a090 = uVar13;
          uStack_a088 = uVar14;
          local_a040 = uVar7;
          uStack_a038 = uVar8;
          uStack_a030 = uVar9;
          uStack_a028 = uVar10;
          local_9fe0 = uVar3;
          uStack_9fd8 = uVar4;
          uStack_9fd0 = uVar5;
          uStack_9fc8 = uVar6;
          local_9f80 = uVar35;
          uStack_9f78 = uVar36;
          uStack_9f70 = uVar37;
          uStack_9f68 = uVar38;
          local_9f60 = local_a260;
          uStack_9f58 = uStack_a258;
          uStack_9f50 = uStack_a250;
          uStack_9f48 = uStack_a248;
          local_9f20 = uVar31;
          uStack_9f18 = uVar32;
          uStack_9f10 = uVar33;
          uStack_9f08 = uVar34;
          local_9f00 = local_a200;
          uStack_9ef8 = uStack_a1f8;
          uStack_9ef0 = uStack_a1f0;
          uStack_9ee8 = uStack_a1e8;
          local_9ec0 = uVar27;
          uStack_9eb8 = uVar28;
          uStack_9eb0 = uVar29;
          uStack_9ea8 = uVar30;
          local_9e60 = uVar23;
          uStack_9e58 = uVar24;
          uStack_9e50 = uVar25;
          uStack_9e48 = uVar26;
          local_9e40 = local_a140;
          uStack_9e38 = uStack_a138;
          uStack_9e30 = uStack_a130;
          uStack_9e28 = uStack_a128;
          local_9e00 = uVar19;
          uStack_9df8 = uVar20;
          uStack_9df0 = uVar21;
          uStack_9de8 = uVar22;
          local_9de0 = local_a0e0;
          uStack_9dd8 = uStack_a0d8;
          uStack_9dd0 = uStack_a0d0;
          uStack_9dc8 = uStack_a0c8;
          local_9da0 = uVar15;
          uStack_9d98 = uVar16;
          uStack_9d90 = uVar17;
          uStack_9d88 = uVar18;
          local_9d40 = uVar11;
          uStack_9d38 = uVar12;
          uStack_9d30 = uVar13;
          uStack_9d28 = uVar14;
          local_9d20 = local_a020;
          uStack_9d18 = uStack_a018;
          uStack_9d10 = uStack_a010;
          uStack_9d08 = uStack_a008;
          local_9ce0 = uVar7;
          uStack_9cd8 = uVar8;
          uStack_9cd0 = uVar9;
          uStack_9cc8 = uVar10;
          local_9cc0 = local_9fc0;
          uStack_9cb8 = uStack_9fb8;
          uStack_9cb0 = uStack_9fb0;
          uStack_9ca8 = uStack_9fa8;
          local_9c80 = uVar3;
          uStack_9c78 = uVar4;
          uStack_9c70 = uVar5;
          uStack_9c68 = uVar6;
          local_3700 = uVar3;
          uStack_36f8 = uVar4;
          uStack_36f0 = uVar5;
          uStack_36e8 = uVar6;
          local_36e0 = local_ba20;
          fStack_36dc = local_ba20;
          fStack_36d8 = local_ba20;
          fStack_36d4 = local_ba20;
          fStack_36d0 = local_ba20;
          fStack_36cc = local_ba20;
          fStack_36c8 = local_ba20;
          fStack_36c4 = local_ba20;
          local_36c0 = uVar7;
          uStack_36b8 = uVar8;
          uStack_36b0 = uVar9;
          uStack_36a8 = uVar10;
          local_36a0 = local_ba60;
          fStack_369c = local_ba60;
          fStack_3698 = local_ba60;
          fStack_3694 = local_ba60;
          fStack_3690 = local_ba60;
          fStack_368c = local_ba60;
          fStack_3688 = local_ba60;
          fStack_3684 = local_ba60;
          local_3680 = uVar11;
          uStack_3678 = uVar12;
          uStack_3670 = uVar13;
          uStack_3668 = uVar14;
          local_3660 = local_baa0;
          fStack_365c = local_baa0;
          fStack_3658 = local_baa0;
          fStack_3654 = local_baa0;
          fStack_3650 = local_baa0;
          fStack_364c = local_baa0;
          fStack_3648 = local_baa0;
          fStack_3644 = local_baa0;
          local_3640 = uVar15;
          uStack_3638 = uVar16;
          uStack_3630 = uVar17;
          uStack_3628 = uVar18;
          local_3620 = local_bae0;
          fStack_361c = local_bae0;
          fStack_3618 = local_bae0;
          fStack_3614 = local_bae0;
          fStack_3610 = local_bae0;
          fStack_360c = local_bae0;
          fStack_3608 = local_bae0;
          fStack_3604 = local_bae0;
          local_3600 = uVar19;
          uStack_35f8 = uVar20;
          uStack_35f0 = uVar21;
          uStack_35e8 = uVar22;
          local_35e0 = local_bb20;
          fStack_35dc = local_bb20;
          fStack_35d8 = local_bb20;
          fStack_35d4 = local_bb20;
          fStack_35d0 = local_bb20;
          fStack_35cc = local_bb20;
          fStack_35c8 = local_bb20;
          fStack_35c4 = local_bb20;
          local_35c0 = uVar23;
          uStack_35b8 = uVar24;
          uStack_35b0 = uVar25;
          uStack_35a8 = uVar26;
          local_35a0 = local_bb60;
          fStack_359c = local_bb60;
          fStack_3598 = local_bb60;
          fStack_3594 = local_bb60;
          fStack_3590 = local_bb60;
          fStack_358c = local_bb60;
          fStack_3588 = local_bb60;
          fStack_3584 = local_bb60;
          local_3580 = uVar27;
          uStack_3578 = uVar28;
          uStack_3570 = uVar29;
          uStack_3568 = uVar30;
          local_3560 = local_bba0;
          fStack_355c = local_bba0;
          fStack_3558 = local_bba0;
          fStack_3554 = local_bba0;
          fStack_3550 = local_bba0;
          fStack_354c = local_bba0;
          fStack_3548 = local_bba0;
          fStack_3544 = local_bba0;
          local_3540 = uVar31;
          uStack_3538 = uVar32;
          uStack_3530 = uVar33;
          uStack_3528 = uVar34;
          local_3520 = local_bbe0;
          fStack_351c = local_bbe0;
          fStack_3518 = local_bbe0;
          fStack_3514 = local_bbe0;
          fStack_3510 = local_bbe0;
          fStack_350c = local_bbe0;
          fStack_3508 = local_bbe0;
          fStack_3504 = local_bbe0;
          local_3500 = uVar35;
          uStack_34f8 = uVar36;
          uStack_34f0 = uVar37;
          uStack_34e8 = uVar38;
          local_34e0 = local_bc20;
          fStack_34dc = local_bc20;
          fStack_34d8 = local_bc20;
          fStack_34d4 = local_bc20;
          fStack_34d0 = local_bc20;
          fStack_34cc = local_bc20;
          fStack_34c8 = local_bc20;
          fStack_34c4 = local_bc20;
          local_34c0 = uVar3;
          uStack_34b8 = uVar4;
          uStack_34b0 = uVar5;
          uStack_34a8 = uVar6;
          local_34a0 = local_ba60;
          fStack_349c = local_ba60;
          fStack_3498 = local_ba60;
          fStack_3494 = local_ba60;
          fStack_3490 = local_ba60;
          fStack_348c = local_ba60;
          fStack_3488 = local_ba60;
          fStack_3484 = local_ba60;
          local_3480 = uVar7;
          uStack_3478 = uVar8;
          uStack_3470 = uVar9;
          uStack_3468 = uVar10;
          local_3460 = local_baa0;
          fStack_345c = local_baa0;
          fStack_3458 = local_baa0;
          fStack_3454 = local_baa0;
          fStack_3450 = local_baa0;
          fStack_344c = local_baa0;
          fStack_3448 = local_baa0;
          fStack_3444 = local_baa0;
          local_3440 = uVar11;
          uStack_3438 = uVar12;
          uStack_3430 = uVar13;
          uStack_3428 = uVar14;
          local_3420 = local_bc60;
          fStack_341c = local_bc60;
          fStack_3418 = local_bc60;
          fStack_3414 = local_bc60;
          fStack_3410 = local_bc60;
          fStack_340c = local_bc60;
          fStack_3408 = local_bc60;
          fStack_3404 = local_bc60;
          local_3400 = uVar15;
          uStack_33f8 = uVar16;
          uStack_33f0 = uVar17;
          uStack_33e8 = uVar18;
          local_33e0 = local_bb20;
          fStack_33dc = local_bb20;
          fStack_33d8 = local_bb20;
          fStack_33d4 = local_bb20;
          fStack_33d0 = local_bb20;
          fStack_33cc = local_bb20;
          fStack_33c8 = local_bb20;
          fStack_33c4 = local_bb20;
          local_33c0 = uVar19;
          uStack_33b8 = uVar20;
          uStack_33b0 = uVar21;
          uStack_33a8 = uVar22;
          local_33a0 = local_bb60;
          fStack_339c = local_bb60;
          fStack_3398 = local_bb60;
          fStack_3394 = local_bb60;
          fStack_3390 = local_bb60;
          fStack_338c = local_bb60;
          fStack_3388 = local_bb60;
          fStack_3384 = local_bb60;
          local_3380 = uVar23;
          uStack_3378 = uVar24;
          uStack_3370 = uVar25;
          uStack_3368 = uVar26;
          local_3360 = local_bca0;
          fStack_335c = local_bca0;
          fStack_3358 = local_bca0;
          fStack_3354 = local_bca0;
          fStack_3350 = local_bca0;
          fStack_334c = local_bca0;
          fStack_3348 = local_bca0;
          fStack_3344 = local_bca0;
          local_3340 = uVar27;
          uStack_3338 = uVar28;
          uStack_3330 = uVar29;
          uStack_3328 = uVar30;
          local_3320 = local_bbe0;
          fStack_331c = local_bbe0;
          fStack_3318 = local_bbe0;
          fStack_3314 = local_bbe0;
          fStack_3310 = local_bbe0;
          fStack_330c = local_bbe0;
          fStack_3308 = local_bbe0;
          fStack_3304 = local_bbe0;
          local_3300 = uVar31;
          uStack_32f8 = uVar32;
          uStack_32f0 = uVar33;
          uStack_32e8 = uVar34;
          local_32e0 = local_bc20;
          fStack_32dc = local_bc20;
          fStack_32d8 = local_bc20;
          fStack_32d4 = local_bc20;
          fStack_32d0 = local_bc20;
          fStack_32cc = local_bc20;
          fStack_32c8 = local_bc20;
          fStack_32c4 = local_bc20;
          local_32c0 = uVar35;
          uStack_32b8 = uVar36;
          uStack_32b0 = uVar37;
          uStack_32a8 = uVar38;
          local_32a0 = local_bce0;
          fStack_329c = local_bce0;
          fStack_3298 = local_bce0;
          fStack_3294 = local_bce0;
          fStack_3290 = local_bce0;
          fStack_328c = local_bce0;
          fStack_3288 = local_bce0;
          fStack_3284 = local_bce0;
          local_7c0 = local_9ca0;
          uStack_7b8 = uStack_9c98;
          uStack_7b0 = uStack_9c90;
          uStack_7a8 = uStack_9c88;
          fStack_784 = local_ba20;
          local_780 = local_9d00;
          uStack_778 = uStack_9cf8;
          uStack_770 = uStack_9cf0;
          uStack_768 = uStack_9ce8;
          fStack_744 = local_ba60;
          local_740 = local_9d60;
          uStack_738 = uStack_9d58;
          uStack_730 = uStack_9d50;
          uStack_728 = uStack_9d48;
          fStack_704 = local_baa0;
          local_700 = local_9dc0;
          uStack_6f8 = uStack_9db8;
          uStack_6f0 = uStack_9db0;
          uStack_6e8 = uStack_9da8;
          fStack_6c4 = local_bae0;
          local_6c0 = local_9e20;
          uStack_6b8 = uStack_9e18;
          uStack_6b0 = uStack_9e10;
          uStack_6a8 = uStack_9e08;
          fStack_684 = local_bb20;
          local_680 = local_9e80;
          uStack_678 = uStack_9e78;
          uStack_670 = uStack_9e70;
          uStack_668 = uStack_9e68;
          fStack_644 = local_bb60;
          local_640 = local_9ee0;
          uStack_638 = uStack_9ed8;
          uStack_630 = uStack_9ed0;
          uStack_628 = uStack_9ec8;
          fStack_604 = local_bba0;
          local_600 = local_9f40;
          uStack_5f8 = uStack_9f38;
          uStack_5f0 = uStack_9f30;
          uStack_5e8 = uStack_9f28;
          fStack_5c4 = local_bbe0;
          local_5c0 = local_9fa0;
          uStack_5b8 = uStack_9f98;
          uStack_5b0 = uStack_9f90;
          uStack_5a8 = uStack_9f88;
          fStack_584 = local_bc20;
          local_580 = local_a000;
          uStack_578 = uStack_9ff8;
          uStack_570 = uStack_9ff0;
          uStack_568 = uStack_9fe8;
          fStack_544 = local_ba60;
          local_540 = local_a060;
          uStack_538 = uStack_a058;
          uStack_530 = uStack_a050;
          uStack_528 = uStack_a048;
          fStack_504 = local_baa0;
          local_500 = local_a0c0;
          uStack_4f8 = uStack_a0b8;
          uStack_4f0 = uStack_a0b0;
          uStack_4e8 = uStack_a0a8;
          fStack_4c4 = local_bc60;
          local_4c0 = local_a120;
          uStack_4b8 = uStack_a118;
          uStack_4b0 = uStack_a110;
          uStack_4a8 = uStack_a108;
          fStack_484 = local_bb20;
          local_480 = local_a180;
          uStack_478 = uStack_a178;
          uStack_470 = uStack_a170;
          uStack_468 = uStack_a168;
          fStack_444 = local_bb60;
          local_440 = local_a1e0;
          uStack_438 = uStack_a1d8;
          uStack_430 = uStack_a1d0;
          uStack_428 = uStack_a1c8;
          fStack_404 = local_bca0;
          local_400 = local_a240;
          uStack_3f8 = uStack_a238;
          uStack_3f0 = uStack_a230;
          uStack_3e8 = uStack_a228;
          fStack_3c4 = local_bbe0;
          local_3c0 = local_a2a0;
          uStack_3b8 = uStack_a298;
          uStack_3b0 = uStack_a290;
          uStack_3a8 = uStack_a288;
          fStack_384 = local_bc20;
          local_380 = local_a300;
          uStack_378 = uStack_a2f8;
          uStack_370 = uStack_a2f0;
          uStack_368 = uStack_a2e8;
          fStack_344 = local_bce0;
        }
        for (; local_ce88 < local_c0f8; local_ce88 = local_ce88 + 1) {
          local_c0b8 = local_cd00;
          local_a360 = *(undefined8 *)local_cd00;
          uStack_a358 = *(undefined8 *)(local_cd00 + 2);
          uStack_a350 = *(undefined8 *)(local_cd00 + 4);
          uStack_a348 = *(undefined8 *)(local_cd00 + 6);
          local_bce8 = local_cd50;
          local_bd20 = *local_cd50;
          local_a320 = CONCAT44(local_bd20,local_bd20);
          uStack_a318 = CONCAT44(local_bd20,local_bd20);
          uStack_a310 = CONCAT44(local_bd20,local_bd20);
          uStack_a308 = CONCAT44(local_bd20,local_bd20);
          local_bd28 = local_cd50 + 1;
          local_bd60 = *local_bd28;
          local_a380 = CONCAT44(local_bd60,local_bd60);
          uStack_a378 = CONCAT44(local_bd60,local_bd60);
          uStack_a370 = CONCAT44(local_bd60,local_bd60);
          uStack_a368 = CONCAT44(local_bd60,local_bd60);
          local_bd68 = local_cd50 + 2;
          local_bda0 = *local_bd68;
          local_a3e0 = CONCAT44(local_bda0,local_bda0);
          uStack_a3d8 = CONCAT44(local_bda0,local_bda0);
          uStack_a3d0 = CONCAT44(local_bda0,local_bda0);
          uStack_a3c8 = CONCAT44(local_bda0,local_bda0);
          local_bda8 = local_cd58;
          local_bde0 = *local_cd58;
          local_a440 = CONCAT44(local_bde0,local_bde0);
          uStack_a438 = CONCAT44(local_bde0,local_bde0);
          uStack_a430 = CONCAT44(local_bde0,local_bde0);
          uStack_a428 = CONCAT44(local_bde0,local_bde0);
          local_bde8 = local_cd58 + 1;
          local_be20 = *local_bde8;
          local_a4a0 = CONCAT44(local_be20,local_be20);
          uStack_a498 = CONCAT44(local_be20,local_be20);
          uStack_a490 = CONCAT44(local_be20,local_be20);
          uStack_a488 = CONCAT44(local_be20,local_be20);
          local_be28 = local_cd58 + 2;
          local_be60 = *local_be28;
          local_a500 = CONCAT44(local_be60,local_be60);
          uStack_a4f8 = CONCAT44(local_be60,local_be60);
          uStack_a4f0 = CONCAT44(local_be60,local_be60);
          uStack_a4e8 = CONCAT44(local_be60,local_be60);
          local_be68 = local_cd60;
          local_bea0 = *local_cd60;
          local_a560 = CONCAT44(local_bea0,local_bea0);
          uStack_a558 = CONCAT44(local_bea0,local_bea0);
          uStack_a550 = CONCAT44(local_bea0,local_bea0);
          uStack_a548 = CONCAT44(local_bea0,local_bea0);
          local_bea8 = local_cd60 + 1;
          local_bee0 = *local_bea8;
          local_a5c0 = CONCAT44(local_bee0,local_bee0);
          uStack_a5b8 = CONCAT44(local_bee0,local_bee0);
          uStack_a5b0 = CONCAT44(local_bee0,local_bee0);
          uStack_a5a8 = CONCAT44(local_bee0,local_bee0);
          local_bee8 = local_cd60 + 2;
          local_bf20 = *local_bee8;
          local_a620 = CONCAT44(local_bf20,local_bf20);
          uStack_a618 = CONCAT44(local_bf20,local_bf20);
          uStack_a610 = CONCAT44(local_bf20,local_bf20);
          uStack_a608 = CONCAT44(local_bf20,local_bf20);
          local_320 = local_bd20 * (float)local_4000;
          fStack_31c = local_bd20 * local_4000._4_4_;
          fStack_318 = local_bd20 * (float)uStack_3ff8;
          fStack_314 = local_bd20 * uStack_3ff8._4_4_;
          fStack_310 = local_bd20 * (float)uStack_3ff0;
          fStack_30c = local_bd20 * uStack_3ff0._4_4_;
          fStack_308 = local_bd20 * (float)uStack_3fe8;
          local_340._0_4_ = (float)local_a360;
          local_340._4_4_ = (float)((ulong)local_a360 >> 0x20);
          uStack_338._0_4_ = (float)uStack_a358;
          uStack_338._4_4_ = (float)((ulong)uStack_a358 >> 0x20);
          uStack_330._0_4_ = (float)uStack_a350;
          uStack_330._4_4_ = (float)((ulong)uStack_a350 >> 0x20);
          uStack_328._0_4_ = (float)uStack_a348;
          uStack_328._4_4_ = (float)((ulong)uStack_a348 >> 0x20);
          local_a3c0 = CONCAT44(fStack_31c + local_340._4_4_,local_320 + (float)local_340);
          uStack_a3b8 = CONCAT44(fStack_314 + uStack_338._4_4_,fStack_318 + (float)uStack_338);
          uStack_a3b0 = CONCAT44(fStack_30c + uStack_330._4_4_,fStack_310 + (float)uStack_330);
          uStack_a3a8 = CONCAT44(local_bd20 + uStack_328._4_4_,fStack_308 + (float)uStack_328);
          local_2e0 = local_bd60 * (float)local_3fc0;
          fStack_2dc = local_bd60 * local_3fc0._4_4_;
          fStack_2d8 = local_bd60 * (float)uStack_3fb8;
          fStack_2d4 = local_bd60 * uStack_3fb8._4_4_;
          fStack_2d0 = local_bd60 * (float)uStack_3fb0;
          fStack_2cc = local_bd60 * uStack_3fb0._4_4_;
          fStack_2c8 = local_bd60 * (float)uStack_3fa8;
          in_stack_ffffffffffff12e0 = local_2e0 + local_320 + (float)local_340;
          in_stack_ffffffffffff12e4 = fStack_2dc + fStack_31c + local_340._4_4_;
          in_stack_ffffffffffff12e8 = fStack_2d8 + fStack_318 + (float)uStack_338;
          in_stack_ffffffffffff12ec = fStack_2d4 + fStack_314 + uStack_338._4_4_;
          in_stack_ffffffffffff1310 = fStack_2d0 + fStack_310 + (float)uStack_330;
          in_stack_ffffffffffff1314 = fStack_2cc + fStack_30c + uStack_330._4_4_;
          in_stack_ffffffffffff12d8 = fStack_2c8 + fStack_308 + (float)uStack_328;
          in_stack_ffffffffffff12dc = local_bd60 + local_bd20 + uStack_328._4_4_;
          local_a420 = CONCAT44(in_stack_ffffffffffff12e4,in_stack_ffffffffffff12e0);
          uStack_a418 = CONCAT44(in_stack_ffffffffffff12ec,in_stack_ffffffffffff12e8);
          uStack_a410 = CONCAT44(in_stack_ffffffffffff1314,in_stack_ffffffffffff1310);
          uStack_a408 = CONCAT44(in_stack_ffffffffffff12dc,in_stack_ffffffffffff12d8);
          local_2a0 = local_bda0 * (float)local_3f80;
          fStack_29c = local_bda0 * local_3f80._4_4_;
          fStack_298 = local_bda0 * (float)uStack_3f78;
          fStack_294 = local_bda0 * uStack_3f78._4_4_;
          fStack_290 = local_bda0 * (float)uStack_3f70;
          fStack_28c = local_bda0 * uStack_3f70._4_4_;
          fStack_288 = local_bda0 * (float)uStack_3f68;
          in_stack_ffffffffffff12e0 = local_2a0 + in_stack_ffffffffffff12e0;
          in_stack_ffffffffffff12e4 = fStack_29c + in_stack_ffffffffffff12e4;
          in_stack_ffffffffffff12e8 = fStack_298 + in_stack_ffffffffffff12e8;
          in_stack_ffffffffffff12ec = fStack_294 + in_stack_ffffffffffff12ec;
          in_stack_ffffffffffff1310 = fStack_290 + in_stack_ffffffffffff1310;
          in_stack_ffffffffffff1314 = fStack_28c + in_stack_ffffffffffff1314;
          in_stack_ffffffffffff12d8 = fStack_288 + in_stack_ffffffffffff12d8;
          in_stack_ffffffffffff12dc = local_bda0 + in_stack_ffffffffffff12dc;
          local_a480 = CONCAT44(in_stack_ffffffffffff12e4,in_stack_ffffffffffff12e0);
          uStack_a478 = CONCAT44(in_stack_ffffffffffff12ec,in_stack_ffffffffffff12e8);
          uStack_a470 = CONCAT44(in_stack_ffffffffffff1314,in_stack_ffffffffffff1310);
          uStack_a468 = CONCAT44(in_stack_ffffffffffff12dc,in_stack_ffffffffffff12d8);
          local_260 = local_bde0 * (float)local_3f40;
          fStack_25c = local_bde0 * local_3f40._4_4_;
          fStack_258 = local_bde0 * (float)uStack_3f38;
          fStack_254 = local_bde0 * uStack_3f38._4_4_;
          fStack_250 = local_bde0 * (float)uStack_3f30;
          fStack_24c = local_bde0 * uStack_3f30._4_4_;
          fStack_248 = local_bde0 * (float)uStack_3f28;
          in_stack_ffffffffffff12e0 = local_260 + in_stack_ffffffffffff12e0;
          in_stack_ffffffffffff12e4 = fStack_25c + in_stack_ffffffffffff12e4;
          in_stack_ffffffffffff12e8 = fStack_258 + in_stack_ffffffffffff12e8;
          in_stack_ffffffffffff12ec = fStack_254 + in_stack_ffffffffffff12ec;
          in_stack_ffffffffffff1310 = fStack_250 + in_stack_ffffffffffff1310;
          in_stack_ffffffffffff1314 = fStack_24c + in_stack_ffffffffffff1314;
          in_stack_ffffffffffff12d8 = fStack_248 + in_stack_ffffffffffff12d8;
          in_stack_ffffffffffff12dc = local_bde0 + in_stack_ffffffffffff12dc;
          local_a4e0 = CONCAT44(in_stack_ffffffffffff12e4,in_stack_ffffffffffff12e0);
          uStack_a4d8 = CONCAT44(in_stack_ffffffffffff12ec,in_stack_ffffffffffff12e8);
          uStack_a4d0 = CONCAT44(in_stack_ffffffffffff1314,in_stack_ffffffffffff1310);
          uStack_a4c8 = CONCAT44(in_stack_ffffffffffff12dc,in_stack_ffffffffffff12d8);
          local_220 = local_be20 * (float)local_3f00;
          fStack_21c = local_be20 * local_3f00._4_4_;
          fStack_218 = local_be20 * (float)uStack_3ef8;
          fStack_214 = local_be20 * uStack_3ef8._4_4_;
          fStack_210 = local_be20 * (float)uStack_3ef0;
          fStack_20c = local_be20 * uStack_3ef0._4_4_;
          fStack_208 = local_be20 * (float)uStack_3ee8;
          in_stack_ffffffffffff12e0 = local_220 + in_stack_ffffffffffff12e0;
          in_stack_ffffffffffff12e4 = fStack_21c + in_stack_ffffffffffff12e4;
          in_stack_ffffffffffff12e8 = fStack_218 + in_stack_ffffffffffff12e8;
          in_stack_ffffffffffff12ec = fStack_214 + in_stack_ffffffffffff12ec;
          in_stack_ffffffffffff1310 = fStack_210 + in_stack_ffffffffffff1310;
          in_stack_ffffffffffff1314 = fStack_20c + in_stack_ffffffffffff1314;
          in_stack_ffffffffffff12d8 = fStack_208 + in_stack_ffffffffffff12d8;
          in_stack_ffffffffffff12dc = local_be20 + in_stack_ffffffffffff12dc;
          local_a540 = CONCAT44(in_stack_ffffffffffff12e4,in_stack_ffffffffffff12e0);
          uStack_a538 = CONCAT44(in_stack_ffffffffffff12ec,in_stack_ffffffffffff12e8);
          uStack_a530 = CONCAT44(in_stack_ffffffffffff1314,in_stack_ffffffffffff1310);
          uStack_a528 = CONCAT44(in_stack_ffffffffffff12dc,in_stack_ffffffffffff12d8);
          local_1e0 = local_be60 * (float)local_3ec0;
          fStack_1dc = local_be60 * local_3ec0._4_4_;
          fStack_1d8 = local_be60 * (float)uStack_3eb8;
          fStack_1d4 = local_be60 * uStack_3eb8._4_4_;
          fStack_1d0 = local_be60 * (float)uStack_3eb0;
          fStack_1cc = local_be60 * uStack_3eb0._4_4_;
          fStack_1c8 = local_be60 * (float)uStack_3ea8;
          in_stack_ffffffffffff12e0 = local_1e0 + in_stack_ffffffffffff12e0;
          in_stack_ffffffffffff12e4 = fStack_1dc + in_stack_ffffffffffff12e4;
          in_stack_ffffffffffff12e8 = fStack_1d8 + in_stack_ffffffffffff12e8;
          in_stack_ffffffffffff12ec = fStack_1d4 + in_stack_ffffffffffff12ec;
          in_stack_ffffffffffff1310 = fStack_1d0 + in_stack_ffffffffffff1310;
          in_stack_ffffffffffff1314 = fStack_1cc + in_stack_ffffffffffff1314;
          in_stack_ffffffffffff12d8 = fStack_1c8 + in_stack_ffffffffffff12d8;
          in_stack_ffffffffffff12dc = local_be60 + in_stack_ffffffffffff12dc;
          local_a5a0 = CONCAT44(in_stack_ffffffffffff12e4,in_stack_ffffffffffff12e0);
          uStack_a598 = CONCAT44(in_stack_ffffffffffff12ec,in_stack_ffffffffffff12e8);
          uStack_a590 = CONCAT44(in_stack_ffffffffffff1314,in_stack_ffffffffffff1310);
          uStack_a588 = CONCAT44(in_stack_ffffffffffff12dc,in_stack_ffffffffffff12d8);
          local_1a0 = local_bea0 * (float)local_3e80;
          fStack_19c = local_bea0 * local_3e80._4_4_;
          fStack_198 = local_bea0 * (float)uStack_3e78;
          fStack_194 = local_bea0 * uStack_3e78._4_4_;
          fStack_190 = local_bea0 * (float)uStack_3e70;
          fStack_18c = local_bea0 * uStack_3e70._4_4_;
          fStack_188 = local_bea0 * (float)uStack_3e68;
          in_stack_ffffffffffff12e0 = local_1a0 + in_stack_ffffffffffff12e0;
          in_stack_ffffffffffff12e4 = fStack_19c + in_stack_ffffffffffff12e4;
          in_stack_ffffffffffff12e8 = fStack_198 + in_stack_ffffffffffff12e8;
          in_stack_ffffffffffff12ec = fStack_194 + in_stack_ffffffffffff12ec;
          in_stack_ffffffffffff1310 = fStack_190 + in_stack_ffffffffffff1310;
          in_stack_ffffffffffff1314 = fStack_18c + in_stack_ffffffffffff1314;
          in_stack_ffffffffffff12d8 = fStack_188 + in_stack_ffffffffffff12d8;
          in_stack_ffffffffffff12dc = local_bea0 + in_stack_ffffffffffff12dc;
          local_a600 = CONCAT44(in_stack_ffffffffffff12e4,in_stack_ffffffffffff12e0);
          uStack_a5f8 = CONCAT44(in_stack_ffffffffffff12ec,in_stack_ffffffffffff12e8);
          uStack_a5f0 = CONCAT44(in_stack_ffffffffffff1314,in_stack_ffffffffffff1310);
          uStack_a5e8 = CONCAT44(in_stack_ffffffffffff12dc,in_stack_ffffffffffff12d8);
          local_160 = local_bee0 * (float)local_3e40;
          fStack_15c = local_bee0 * local_3e40._4_4_;
          fStack_158 = local_bee0 * (float)uStack_3e38;
          fStack_154 = local_bee0 * uStack_3e38._4_4_;
          fStack_150 = local_bee0 * (float)uStack_3e30;
          fStack_14c = local_bee0 * uStack_3e30._4_4_;
          fStack_148 = local_bee0 * (float)uStack_3e28;
          in_stack_ffffffffffff12e0 = local_160 + in_stack_ffffffffffff12e0;
          in_stack_ffffffffffff12e4 = fStack_15c + in_stack_ffffffffffff12e4;
          in_stack_ffffffffffff12e8 = fStack_158 + in_stack_ffffffffffff12e8;
          in_stack_ffffffffffff12ec = fStack_154 + in_stack_ffffffffffff12ec;
          in_stack_ffffffffffff12f0 = fStack_150 + in_stack_ffffffffffff1310;
          in_stack_ffffffffffff12f4 = fStack_14c + in_stack_ffffffffffff1314;
          in_stack_ffffffffffff12d8 = fStack_148 + in_stack_ffffffffffff12d8;
          in_stack_ffffffffffff12dc = local_bee0 + in_stack_ffffffffffff12dc;
          local_a660 = CONCAT44(in_stack_ffffffffffff12e4,in_stack_ffffffffffff12e0);
          uStack_a658 = CONCAT44(in_stack_ffffffffffff12ec,in_stack_ffffffffffff12e8);
          uStack_a650 = CONCAT44(in_stack_ffffffffffff12f4,in_stack_ffffffffffff12f0);
          uStack_a648 = CONCAT44(in_stack_ffffffffffff12dc,in_stack_ffffffffffff12d8);
          local_120 = local_bf20 * (float)local_3e00;
          fStack_11c = local_bf20 * local_3e00._4_4_;
          fStack_118 = local_bf20 * (float)uStack_3df8;
          fStack_114 = local_bf20 * uStack_3df8._4_4_;
          fStack_110 = local_bf20 * (float)uStack_3df0;
          fStack_10c = local_bf20 * uStack_3df0._4_4_;
          fStack_108 = local_bf20 * (float)uStack_3de8;
          in_stack_ffffffffffff12d8 = fStack_108 + in_stack_ffffffffffff12d8;
          in_stack_ffffffffffff12dc = local_bf20 + in_stack_ffffffffffff12dc;
          local_aba0 = CONCAT44(fStack_11c + in_stack_ffffffffffff12e4,
                                local_120 + in_stack_ffffffffffff12e0);
          uStack_ab98 = CONCAT44(fStack_114 + in_stack_ffffffffffff12ec,
                                 fStack_118 + in_stack_ffffffffffff12e8);
          uStack_ab90 = CONCAT44(fStack_10c + in_stack_ffffffffffff12f4,
                                 fStack_110 + in_stack_ffffffffffff12f0);
          uStack_ab88 = CONCAT44(in_stack_ffffffffffff12dc,in_stack_ffffffffffff12d8);
          local_ab68 = local_cd00;
          *(undefined8 *)local_cd00 = local_aba0;
          *(undefined8 *)(local_cd00 + 2) = uStack_ab98;
          *(undefined8 *)(local_cd00 + 4) = uStack_ab90;
          *(undefined8 *)(local_cd00 + 6) = uStack_ab88;
          local_cd50 = local_cd50 + 1;
          local_cd58 = local_cd58 + 1;
          local_cd60 = local_cd60 + 1;
          local_cd00 = local_cd00 + 8;
          fStack_bf1c = local_bf20;
          fStack_bf18 = local_bf20;
          fStack_bf14 = local_bf20;
          fStack_bf10 = local_bf20;
          fStack_bf0c = local_bf20;
          fStack_bf08 = local_bf20;
          fStack_bf04 = local_bf20;
          local_beec = local_bf20;
          fStack_bedc = local_bee0;
          fStack_bed8 = local_bee0;
          fStack_bed4 = local_bee0;
          fStack_bed0 = local_bee0;
          fStack_becc = local_bee0;
          fStack_bec8 = local_bee0;
          fStack_bec4 = local_bee0;
          local_beac = local_bee0;
          fStack_be9c = local_bea0;
          fStack_be98 = local_bea0;
          fStack_be94 = local_bea0;
          fStack_be90 = local_bea0;
          fStack_be8c = local_bea0;
          fStack_be88 = local_bea0;
          fStack_be84 = local_bea0;
          local_be6c = local_bea0;
          fStack_be5c = local_be60;
          fStack_be58 = local_be60;
          fStack_be54 = local_be60;
          fStack_be50 = local_be60;
          fStack_be4c = local_be60;
          fStack_be48 = local_be60;
          fStack_be44 = local_be60;
          local_be2c = local_be60;
          fStack_be1c = local_be20;
          fStack_be18 = local_be20;
          fStack_be14 = local_be20;
          fStack_be10 = local_be20;
          fStack_be0c = local_be20;
          fStack_be08 = local_be20;
          fStack_be04 = local_be20;
          local_bdec = local_be20;
          fStack_bddc = local_bde0;
          fStack_bdd8 = local_bde0;
          fStack_bdd4 = local_bde0;
          fStack_bdd0 = local_bde0;
          fStack_bdcc = local_bde0;
          fStack_bdc8 = local_bde0;
          fStack_bdc4 = local_bde0;
          local_bdac = local_bde0;
          fStack_bd9c = local_bda0;
          fStack_bd98 = local_bda0;
          fStack_bd94 = local_bda0;
          fStack_bd90 = local_bda0;
          fStack_bd8c = local_bda0;
          fStack_bd88 = local_bda0;
          fStack_bd84 = local_bda0;
          local_bd6c = local_bda0;
          fStack_bd5c = local_bd60;
          fStack_bd58 = local_bd60;
          fStack_bd54 = local_bd60;
          fStack_bd50 = local_bd60;
          fStack_bd4c = local_bd60;
          fStack_bd48 = local_bd60;
          fStack_bd44 = local_bd60;
          local_bd2c = local_bd60;
          fStack_bd1c = local_bd20;
          fStack_bd18 = local_bd20;
          fStack_bd14 = local_bd20;
          fStack_bd10 = local_bd20;
          fStack_bd0c = local_bd20;
          fStack_bd08 = local_bd20;
          fStack_bd04 = local_bd20;
          local_bcec = local_bd20;
          local_a640 = uVar35;
          uStack_a638 = uVar36;
          uStack_a630 = uVar37;
          uStack_a628 = uVar38;
          local_a5e0 = uVar31;
          uStack_a5d8 = uVar32;
          uStack_a5d0 = uVar33;
          uStack_a5c8 = uVar34;
          local_a580 = uVar27;
          uStack_a578 = uVar28;
          uStack_a570 = uVar29;
          uStack_a568 = uVar30;
          local_a520 = uVar23;
          uStack_a518 = uVar24;
          uStack_a510 = uVar25;
          uStack_a508 = uVar26;
          local_a4c0 = uVar19;
          uStack_a4b8 = uVar20;
          uStack_a4b0 = uVar21;
          uStack_a4a8 = uVar22;
          local_a460 = uVar15;
          uStack_a458 = uVar16;
          uStack_a450 = uVar17;
          uStack_a448 = uVar18;
          local_a400 = uVar11;
          uStack_a3f8 = uVar12;
          uStack_a3f0 = uVar13;
          uStack_a3e8 = uVar14;
          local_a3a0 = uVar7;
          uStack_a398 = uVar8;
          uStack_a390 = uVar9;
          uStack_a388 = uVar10;
          local_a340 = uVar3;
          uStack_a338 = uVar4;
          uStack_a330 = uVar5;
          uStack_a328 = uVar6;
          local_3280 = uVar3;
          uStack_3278 = uVar4;
          uStack_3270 = uVar5;
          uStack_3268 = uVar6;
          local_3260 = local_bd20;
          fStack_325c = local_bd20;
          fStack_3258 = local_bd20;
          fStack_3254 = local_bd20;
          fStack_3250 = local_bd20;
          fStack_324c = local_bd20;
          fStack_3248 = local_bd20;
          fStack_3244 = local_bd20;
          local_3240 = uVar7;
          uStack_3238 = uVar8;
          uStack_3230 = uVar9;
          uStack_3228 = uVar10;
          local_3220 = local_bd60;
          fStack_321c = local_bd60;
          fStack_3218 = local_bd60;
          fStack_3214 = local_bd60;
          fStack_3210 = local_bd60;
          fStack_320c = local_bd60;
          fStack_3208 = local_bd60;
          fStack_3204 = local_bd60;
          local_3200 = uVar11;
          uStack_31f8 = uVar12;
          uStack_31f0 = uVar13;
          uStack_31e8 = uVar14;
          local_31e0 = local_bda0;
          fStack_31dc = local_bda0;
          fStack_31d8 = local_bda0;
          fStack_31d4 = local_bda0;
          fStack_31d0 = local_bda0;
          fStack_31cc = local_bda0;
          fStack_31c8 = local_bda0;
          fStack_31c4 = local_bda0;
          local_31c0 = uVar15;
          uStack_31b8 = uVar16;
          uStack_31b0 = uVar17;
          uStack_31a8 = uVar18;
          local_31a0 = local_bde0;
          fStack_319c = local_bde0;
          fStack_3198 = local_bde0;
          fStack_3194 = local_bde0;
          fStack_3190 = local_bde0;
          fStack_318c = local_bde0;
          fStack_3188 = local_bde0;
          fStack_3184 = local_bde0;
          local_3180 = uVar19;
          uStack_3178 = uVar20;
          uStack_3170 = uVar21;
          uStack_3168 = uVar22;
          local_3160 = local_be20;
          fStack_315c = local_be20;
          fStack_3158 = local_be20;
          fStack_3154 = local_be20;
          fStack_3150 = local_be20;
          fStack_314c = local_be20;
          fStack_3148 = local_be20;
          fStack_3144 = local_be20;
          local_3140 = uVar23;
          uStack_3138 = uVar24;
          uStack_3130 = uVar25;
          uStack_3128 = uVar26;
          local_3120 = local_be60;
          fStack_311c = local_be60;
          fStack_3118 = local_be60;
          fStack_3114 = local_be60;
          fStack_3110 = local_be60;
          fStack_310c = local_be60;
          fStack_3108 = local_be60;
          fStack_3104 = local_be60;
          local_3100 = uVar27;
          uStack_30f8 = uVar28;
          uStack_30f0 = uVar29;
          uStack_30e8 = uVar30;
          local_30e0 = local_bea0;
          fStack_30dc = local_bea0;
          fStack_30d8 = local_bea0;
          fStack_30d4 = local_bea0;
          fStack_30d0 = local_bea0;
          fStack_30cc = local_bea0;
          fStack_30c8 = local_bea0;
          fStack_30c4 = local_bea0;
          local_30c0 = uVar31;
          uStack_30b8 = uVar32;
          uStack_30b0 = uVar33;
          uStack_30a8 = uVar34;
          local_30a0 = local_bee0;
          fStack_309c = local_bee0;
          fStack_3098 = local_bee0;
          fStack_3094 = local_bee0;
          fStack_3090 = local_bee0;
          fStack_308c = local_bee0;
          fStack_3088 = local_bee0;
          fStack_3084 = local_bee0;
          local_3080 = uVar35;
          uStack_3078 = uVar36;
          uStack_3070 = uVar37;
          uStack_3068 = uVar38;
          local_3060 = local_bf20;
          fStack_305c = local_bf20;
          fStack_3058 = local_bf20;
          fStack_3054 = local_bf20;
          fStack_3050 = local_bf20;
          fStack_304c = local_bf20;
          fStack_3048 = local_bf20;
          fStack_3044 = local_bf20;
          local_340 = local_a360;
          uStack_338 = uStack_a358;
          uStack_330 = uStack_a350;
          uStack_328 = uStack_a348;
          fStack_304 = local_bd20;
          local_300 = local_a3c0;
          uStack_2f8 = uStack_a3b8;
          uStack_2f0 = uStack_a3b0;
          uStack_2e8 = uStack_a3a8;
          fStack_2c4 = local_bd60;
          local_2c0 = local_a420;
          uStack_2b8 = uStack_a418;
          uStack_2b0 = uStack_a410;
          uStack_2a8 = uStack_a408;
          fStack_284 = local_bda0;
          local_280 = local_a480;
          uStack_278 = uStack_a478;
          uStack_270 = uStack_a470;
          uStack_268 = uStack_a468;
          fStack_244 = local_bde0;
          local_240 = local_a4e0;
          uStack_238 = uStack_a4d8;
          uStack_230 = uStack_a4d0;
          uStack_228 = uStack_a4c8;
          fStack_204 = local_be20;
          local_200 = local_a540;
          uStack_1f8 = uStack_a538;
          uStack_1f0 = uStack_a530;
          uStack_1e8 = uStack_a528;
          fStack_1c4 = local_be60;
          local_1c0 = local_a5a0;
          uStack_1b8 = uStack_a598;
          uStack_1b0 = uStack_a590;
          uStack_1a8 = uStack_a588;
          fStack_184 = local_bea0;
          local_180 = local_a600;
          uStack_178 = uStack_a5f8;
          uStack_170 = uStack_a5f0;
          uStack_168 = uStack_a5e8;
          fStack_144 = local_bee0;
          local_140 = local_a660;
          uStack_138 = uStack_a658;
          uStack_130 = uStack_a650;
          uStack_128 = uStack_a648;
          fStack_104 = local_bf20;
        }
        local_cd50 = local_cd50 + 2;
        local_cd58 = local_cd58 + 2;
        local_cd60 = local_cd60 + 2;
        local_4000 = uVar39;
        uStack_3ff8 = uVar40;
        uStack_3ff0 = uVar41;
        uStack_3fe8 = uVar42;
        local_3fc0 = uVar43;
        uStack_3fb8 = uVar44;
        uStack_3fb0 = uVar45;
        uStack_3fa8 = uVar46;
        local_3f80 = uVar47;
        uStack_3f78 = uVar48;
        uStack_3f70 = uVar49;
        uStack_3f68 = uVar50;
        local_3f40 = uVar51;
        uStack_3f38 = uVar52;
        uStack_3f30 = uVar53;
        uStack_3f28 = uVar54;
        local_3f00 = uVar55;
        uStack_3ef8 = uVar56;
        uStack_3ef0 = uVar57;
        uStack_3ee8 = uVar58;
        local_3ec0 = uVar59;
        uStack_3eb8 = uVar60;
        uStack_3eb0 = uVar61;
        uStack_3ea8 = uVar62;
        local_3e80 = uVar63;
        uStack_3e78 = uVar64;
        uStack_3e70 = uVar65;
        uStack_3e68 = uVar66;
        local_3e40 = uVar67;
        uStack_3e38 = uVar68;
        uStack_3e30 = uVar69;
        uStack_3e28 = uVar70;
        local_3e00 = uVar71;
        uStack_3df8 = uVar72;
        uStack_3df0 = uVar73;
        uStack_3de8 = uVar74;
      }
      local_cca8 = local_cca8 + 0x48;
      Mat::~Mat((Mat *)0x31e8b2);
    }
    Mat::~Mat((Mat *)0x31e8d5);
  }
  return;
}

Assistant:

static void conv3x3s1_pack1to8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;
    const float* bias = _bias;

    int nn_outch = outch >> 1;
    int remain_outch_start = nn_outch << 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 2;

        Mat out0 = top_blob.channel(p);
        Mat out1 = top_blob.channel(p + 1);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + p * 8) : _mm256_set1_ps(0.f);
        __m256 _bias1 = bias ? _mm256_loadu_ps((const float*)bias + (p + 1) * 8) : _mm256_set1_ps(0.f);
        out0.fill(_bias0);
        out1.fill(_bias1);

        const float* k0 = kernel.channel(p);
        const float* k1 = kernel.channel(p + 1);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0;
            float* outptr1 = out1;

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);
            const float* r2 = img0.row(2);

            __m256 _k00_0 = _mm256_loadu_ps(k0);
            __m256 _k01_0 = _mm256_loadu_ps(k0 + 8);
            __m256 _k02_0 = _mm256_loadu_ps(k0 + 16);
            __m256 _k10_0 = _mm256_loadu_ps(k0 + 24);
            __m256 _k11_0 = _mm256_loadu_ps(k0 + 32);
            __m256 _k12_0 = _mm256_loadu_ps(k0 + 40);
            __m256 _k20_0 = _mm256_loadu_ps(k0 + 48);
            __m256 _k21_0 = _mm256_loadu_ps(k0 + 56);
            __m256 _k22_0 = _mm256_loadu_ps(k0 + 64);

            __m256 _k00_1 = _mm256_loadu_ps(k1);
            __m256 _k01_1 = _mm256_loadu_ps(k1 + 8);
            __m256 _k02_1 = _mm256_loadu_ps(k1 + 16);
            __m256 _k10_1 = _mm256_loadu_ps(k1 + 24);
            __m256 _k11_1 = _mm256_loadu_ps(k1 + 32);
            __m256 _k12_1 = _mm256_loadu_ps(k1 + 40);
            __m256 _k20_1 = _mm256_loadu_ps(k1 + 48);
            __m256 _k21_1 = _mm256_loadu_ps(k1 + 56);
            __m256 _k22_1 = _mm256_loadu_ps(k1 + 64);

            int i = 0;

            for (; i < outh; i++)
            {
                int j = 0;
                for (; j + 3 < outw; j += 4)
                {
                    __m256 _sum00 = _mm256_loadu_ps(outptr0);
                    __m256 _sum10 = _mm256_loadu_ps(outptr1);

                    __m256 _r01 = _mm256_broadcast_ss(r0);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r11 = _mm256_broadcast_ss(r1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r21 = _mm256_broadcast_ss(r2);
                    __m256 _r22 = _mm256_broadcast_ss(r2 + 1);
                    __m256 _r23 = _mm256_broadcast_ss(r2 + 2);

                    _sum00 = _mm256_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm256_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm256_storeu_ps(outptr0, _sum00);
                    _mm256_storeu_ps(outptr1, _sum10);

                    __m256 _sum01 = _mm256_loadu_ps(outptr0 + 8);
                    __m256 _sum11 = _mm256_loadu_ps(outptr1 + 8);

                    __m256 _r04 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r24 = _mm256_broadcast_ss(r2 + 3);

                    _sum01 = _mm256_comp_fmadd_ps(_r02, _k00_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r03, _k01_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r04, _k02_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r12, _k10_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r13, _k11_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r14, _k12_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r22, _k20_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r23, _k21_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r24, _k22_0, _sum01);

                    _sum11 = _mm256_comp_fmadd_ps(_r02, _k00_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r03, _k01_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r04, _k02_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r12, _k10_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r13, _k11_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r14, _k12_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r22, _k20_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r23, _k21_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r24, _k22_1, _sum11);

                    _mm256_storeu_ps(outptr0 + 8, _sum01);
                    _mm256_storeu_ps(outptr1 + 8, _sum11);

                    __m256 _sum02 = _mm256_loadu_ps(outptr0 + 16);
                    __m256 _sum12 = _mm256_loadu_ps(outptr1 + 16);

                    __m256 _r05 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r25 = _mm256_broadcast_ss(r2 + 4);

                    _sum02 = _mm256_comp_fmadd_ps(_r03, _k00_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r04, _k01_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r05, _k02_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r13, _k10_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r14, _k11_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r15, _k12_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r23, _k20_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r24, _k21_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r25, _k22_0, _sum02);

                    _sum12 = _mm256_comp_fmadd_ps(_r03, _k00_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r04, _k01_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r05, _k02_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r13, _k10_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r14, _k11_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r15, _k12_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r23, _k20_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r24, _k21_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r25, _k22_1, _sum12);

                    _mm256_storeu_ps(outptr0 + 16, _sum02);
                    _mm256_storeu_ps(outptr1 + 16, _sum12);

                    __m256 _r06 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r26 = _mm256_broadcast_ss(r2 + 5);

                    __m256 _sum03 = _mm256_loadu_ps(outptr0 + 24);
                    __m256 _sum13 = _mm256_loadu_ps(outptr1 + 24);

                    _sum03 = _mm256_comp_fmadd_ps(_r04, _k00_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r05, _k01_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r06, _k02_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r14, _k10_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r15, _k11_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r16, _k12_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r24, _k20_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r25, _k21_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r26, _k22_0, _sum03);

                    _sum13 = _mm256_comp_fmadd_ps(_r04, _k00_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r05, _k01_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r06, _k02_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r14, _k10_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r15, _k11_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r16, _k12_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r24, _k20_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r25, _k21_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r26, _k22_1, _sum13);

                    _mm256_storeu_ps(outptr0 + 24, _sum03);
                    _mm256_storeu_ps(outptr1 + 24, _sum13);

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    outptr0 += 32;
                    outptr1 += 32;
                }

                for (; j + 1 < outw; j += 2)
                {
                    __m256 _sum00 = _mm256_loadu_ps(outptr0);
                    __m256 _sum10 = _mm256_loadu_ps(outptr1);

                    __m256 _r01 = _mm256_broadcast_ss(r0);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r11 = _mm256_broadcast_ss(r1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r21 = _mm256_broadcast_ss(r2);
                    __m256 _r22 = _mm256_broadcast_ss(r2 + 1);
                    __m256 _r23 = _mm256_broadcast_ss(r2 + 2);

                    _sum00 = _mm256_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm256_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm256_storeu_ps(outptr0, _sum00);
                    _mm256_storeu_ps(outptr1, _sum10);

                    __m256 _sum01 = _mm256_loadu_ps(outptr0 + 8);
                    __m256 _sum11 = _mm256_loadu_ps(outptr1 + 8);

                    __m256 _r04 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r24 = _mm256_broadcast_ss(r2 + 3);

                    _sum01 = _mm256_comp_fmadd_ps(_r02, _k00_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r03, _k01_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r04, _k02_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r12, _k10_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r13, _k11_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r14, _k12_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r22, _k20_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r23, _k21_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r24, _k22_0, _sum01);

                    _sum11 = _mm256_comp_fmadd_ps(_r02, _k00_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r03, _k01_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r04, _k02_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r12, _k10_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r13, _k11_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r14, _k12_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r22, _k20_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r23, _k21_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r24, _k22_1, _sum11);

                    _mm256_storeu_ps(outptr0 + 8, _sum01);
                    _mm256_storeu_ps(outptr1 + 8, _sum11);

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    outptr0 += 16;
                    outptr1 += 16;
                }

                for (; j < outw; j++)
                {
                    __m256 _sum00 = _mm256_loadu_ps(outptr0);
                    __m256 _sum10 = _mm256_loadu_ps(outptr1);

                    __m256 _r01 = _mm256_broadcast_ss(r0);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r11 = _mm256_broadcast_ss(r1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r21 = _mm256_broadcast_ss(r2);
                    __m256 _r22 = _mm256_broadcast_ss(r2 + 1);
                    __m256 _r23 = _mm256_broadcast_ss(r2 + 2);

                    _sum00 = _mm256_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm256_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm256_storeu_ps(outptr0, _sum00);
                    _mm256_storeu_ps(outptr1, _sum10);

                    r0 += 1;
                    r1 += 1;
                    r2 += 1;
                    outptr0 += 8;
                    outptr1 += 8;
                }

                r0 += 2;
                r1 += 2;
                r2 += 2;
            }

            k0 += 9 * 8;
            k1 += 9 * 8;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + p * 8) : _mm256_set1_ps(0.f);
        out0.fill(_bias0);

        const float* k0 = kernel.channel(p);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);
            const float* r2 = img0.row(2);

            __m256 _k00 = _mm256_loadu_ps(k0);
            __m256 _k01 = _mm256_loadu_ps(k0 + 8);
            __m256 _k02 = _mm256_loadu_ps(k0 + 16);
            __m256 _k10 = _mm256_loadu_ps(k0 + 24);
            __m256 _k11 = _mm256_loadu_ps(k0 + 32);
            __m256 _k12 = _mm256_loadu_ps(k0 + 40);
            __m256 _k20 = _mm256_loadu_ps(k0 + 48);
            __m256 _k21 = _mm256_loadu_ps(k0 + 56);
            __m256 _k22 = _mm256_loadu_ps(k0 + 64);

            int i = 0;

            for (; i < outh; i++)
            {
                int j = 0;
                for (; j + 3 < outw; j += 4)
                {
                    __m256 _sum0 = _mm256_loadu_ps(outptr0);

                    __m256 _r01 = _mm256_broadcast_ss(r0);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r11 = _mm256_broadcast_ss(r1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r21 = _mm256_broadcast_ss(r2);
                    __m256 _r22 = _mm256_broadcast_ss(r2 + 1);
                    __m256 _r23 = _mm256_broadcast_ss(r2 + 2);

                    _sum0 = _mm256_comp_fmadd_ps(_r01, _k00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r02, _k01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r03, _k02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r11, _k10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r12, _k11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r13, _k12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r21, _k20, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r22, _k21, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r23, _k22, _sum0);

                    __m256 _sum1 = _mm256_loadu_ps(outptr0 + 8);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r24 = _mm256_broadcast_ss(r2 + 3);
                    _mm256_storeu_ps(outptr0, _sum0);

                    _sum1 = _mm256_comp_fmadd_ps(_r02, _k00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r03, _k01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r04, _k02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r12, _k10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r13, _k11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r14, _k12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r22, _k20, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r23, _k21, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r24, _k22, _sum1);

                    __m256 _sum2 = _mm256_loadu_ps(outptr0 + 16);
                    __m256 _r05 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r25 = _mm256_broadcast_ss(r2 + 4);
                    _mm256_storeu_ps(outptr0 + 8, _sum1);

                    _sum2 = _mm256_comp_fmadd_ps(_r03, _k00, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r04, _k01, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r05, _k02, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r13, _k10, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r14, _k11, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r15, _k12, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r23, _k20, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r24, _k21, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r25, _k22, _sum2);

                    __m256 _sum3 = _mm256_loadu_ps(outptr0 + 24);
                    __m256 _r06 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r26 = _mm256_broadcast_ss(r2 + 5);
                    _mm256_storeu_ps(outptr0 + 16, _sum2);

                    _sum3 = _mm256_comp_fmadd_ps(_r04, _k00, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r05, _k01, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r06, _k02, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r14, _k10, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r15, _k11, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r16, _k12, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r24, _k20, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r25, _k21, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r26, _k22, _sum3);

                    _mm256_storeu_ps(outptr0 + 24, _sum3);

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    outptr0 += 32;
                }
                for (; j + 1 < outw; j += 2)
                {
                    __m256 _sum0 = _mm256_loadu_ps(outptr0);

                    __m256 _r01 = _mm256_broadcast_ss(r0);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r11 = _mm256_broadcast_ss(r1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r21 = _mm256_broadcast_ss(r2);
                    __m256 _r22 = _mm256_broadcast_ss(r2 + 1);
                    __m256 _r23 = _mm256_broadcast_ss(r2 + 2);

                    _sum0 = _mm256_comp_fmadd_ps(_r01, _k00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r02, _k01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r03, _k02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r11, _k10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r12, _k11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r13, _k12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r21, _k20, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r22, _k21, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r23, _k22, _sum0);

                    __m256 _sum1 = _mm256_loadu_ps(outptr0 + 8);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r24 = _mm256_broadcast_ss(r2 + 3);
                    _mm256_storeu_ps(outptr0, _sum0);

                    _sum1 = _mm256_comp_fmadd_ps(_r02, _k00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r03, _k01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r04, _k02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r12, _k10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r13, _k11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r14, _k12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r22, _k20, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r23, _k21, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r24, _k22, _sum1);

                    _mm256_storeu_ps(outptr0 + 8, _sum1);

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    outptr0 += 16;
                }
                for (; j < outw; j++)
                {
                    __m256 _sum0 = _mm256_loadu_ps(outptr0);

                    __m256 _r01 = _mm256_broadcast_ss(r0);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r11 = _mm256_broadcast_ss(r1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r21 = _mm256_broadcast_ss(r2);
                    __m256 _r22 = _mm256_broadcast_ss(r2 + 1);
                    __m256 _r23 = _mm256_broadcast_ss(r2 + 2);

                    _sum0 = _mm256_comp_fmadd_ps(_r01, _k00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r02, _k01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r03, _k02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r11, _k10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r12, _k11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r13, _k12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r21, _k20, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r22, _k21, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r23, _k22, _sum0);

                    _mm256_storeu_ps(outptr0, _sum0);
                    r0 += 1;
                    r1 += 1;
                    r2 += 1;
                    outptr0 += 8;
                }

                r0 += 2;
                r1 += 2;
                r2 += 2;
            }

            k0 += 9 * 8;
        }
    }
}